

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# requantize_x86.cpp
# Opt level: O0

void ncnn::requantize(int *intptr,char *ptr,Mat *scale_in_data,Mat *bias_data,Mat *scale_out_data,
                     int activation_type,Mat *activation_params,int elemcount,int elempack)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar160;
  undefined8 uVar161;
  float fVar162;
  float fVar163;
  undefined8 uVar164;
  float fVar165;
  ulong uVar166;
  ulong uVar167;
  float *pfVar168;
  long *in_RCX;
  long *in_RDX;
  undefined8 *in_RSI;
  int *in_RDI;
  long *in_R8;
  undefined4 in_R9D;
  ushort uVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  ushort uVar178;
  float fVar173;
  float fVar174;
  float fVar175;
  ushort uVar186;
  float fVar183;
  float fVar184;
  double dVar176;
  ushort uVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar185;
  ushort uVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  ushort uVar194;
  float fVar191;
  float fVar192;
  float fVar193;
  ushort uVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  undefined1 auVar177 [16];
  ushort uVar202;
  float fVar199;
  float fVar200;
  float fVar201;
  int iVar203;
  ulong uVar204;
  ulong uVar205;
  long *in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  float v_3;
  int32_t v_2;
  __m128 _v_1;
  __m128 _v1_1;
  __m128 _v0_1;
  int i_1;
  __m128 _bias1;
  __m128 _bias0;
  float bias;
  float v_1;
  int32_t v;
  __m128 _v;
  __m128 _v1;
  __m128 _v0;
  int i;
  __m128 _scale_out1;
  __m128 _scale_out0;
  float scale_out;
  __m128 _scale_in1;
  __m128 _scale_in0;
  float scale_in;
  int size;
  int scale_out_data_size;
  int bias_data_size;
  int scale_in_data_size;
  __m128 _b_5;
  __m128 _a_5;
  __m128 max_6;
  __m128 min_6;
  __m128 _b_4;
  __m128 _a_4;
  __m128 max_5;
  __m128 min_5;
  __m128 _b_3;
  __m128 _a_3;
  __m128 max_4;
  __m128 min_4;
  __m128 _b_2;
  __m128 _a_2;
  __m128 max_2;
  __m128 min_2;
  __m128 _b_1;
  __m128 _a_1;
  __m128 max_1;
  __m128 min_1;
  __m128 _b;
  __m128 _a;
  __m128 max;
  __m128 min;
  __m128i _v8_2;
  __m128i _v01_s16_1;
  __m128i _v1_i_1;
  __m128i _v0_i_2;
  __m128 _v1_adj_1;
  __m128 _v0_adj_2;
  __m128 _v1_p5_1;
  __m128 _v0_p5_2;
  __m128 _sign1_1;
  __m128 _sign0_2;
  __m128 _signmask_2;
  __m128 _p5_2;
  __m128i _v8;
  __m128i _v01_s16;
  __m128i _v1_i;
  __m128i _v0_i;
  __m128 _v1_adj;
  __m128 _v0_adj;
  __m128 _v1_p5;
  __m128 _v0_p5;
  __m128 _sign1;
  __m128 _sign0;
  __m128 _signmask;
  __m128 _p5;
  __m128i _v8_3;
  __m128i _v0_s16_1;
  __m128i _v0_i_3;
  __m128 _v0_adj_3;
  __m128 _v0_p5_3;
  __m128 _sign0_3;
  __m128 _signmask_3;
  __m128 _p5_3;
  __m128i _v8_1;
  __m128i _v0_s16;
  __m128i _v0_i_1;
  __m128 _v0_adj_1;
  __m128 _v0_p5_1;
  __m128 _sign0_1;
  __m128 _signmask_1;
  __m128 _p5_1;
  float upper_1;
  float lower_1;
  float beta_1;
  float alpha_1;
  float max_7;
  float min_7;
  float slope_1;
  float upper;
  float lower;
  float beta;
  float alpha;
  float max_3;
  float min_3;
  float slope;
  int int32_1;
  int int32;
  __m128 neg;
  __m128 pos;
  __m128 neg_1;
  __m128 pos_1;
  __m128 neg_2;
  __m128 pos_2;
  __m128 neg_3;
  __m128 pos_3;
  __m128 neg_4;
  __m128 pos_4;
  __m128 neg_5;
  __m128 pos_5;
  __m128 one;
  __m128 one_8;
  __m128 one_16;
  __m128 one_24;
  __m128 one_32;
  __m128 one_40;
  __m128 one_7;
  __m128 one_15;
  __m128 one_23;
  __m128 one_31;
  __m128 one_39;
  __m128 one_47;
  v4sf pow2n_16;
  v4sf y_21;
  v4sf mask_21;
  v4sf one_42;
  v4si emm0_21;
  v4sf fx_16;
  v4sf tmp_21;
  v4sf pow2n_13;
  v4sf y_17;
  v4sf mask_17;
  v4sf one_34;
  v4si emm0_17;
  v4sf fx_13;
  v4sf tmp_17;
  v4sf pow2n_10;
  v4sf y_13;
  v4sf mask_13;
  v4sf one_26;
  v4si emm0_13;
  v4sf fx_10;
  v4sf tmp_13;
  v4sf pow2n_7;
  v4sf y_9;
  v4sf mask_9;
  v4sf one_18;
  v4si emm0_9;
  v4sf fx_7;
  v4sf tmp_9;
  v4sf pow2n_4;
  v4sf y_5;
  v4sf mask_5;
  v4sf one_10;
  v4si emm0_5;
  v4sf fx_4;
  v4sf tmp_5;
  v4sf pow2n_1;
  v4sf y_1;
  v4sf mask_1;
  v4sf one_2;
  v4si emm0_1;
  v4sf fx_1;
  v4sf tmp_1;
  v4sf pow2n_15;
  v4sf y_20;
  v4sf mask_20;
  v4sf one_41;
  v4si emm0_20;
  v4sf fx_15;
  v4sf tmp_20;
  v4sf pow2n_12;
  v4sf y_16;
  v4sf mask_16;
  v4sf one_33;
  v4si emm0_16;
  v4sf fx_12;
  v4sf tmp_16;
  v4sf pow2n_9;
  v4sf y_12;
  v4sf mask_12;
  v4sf one_25;
  v4si emm0_12;
  v4sf fx_9;
  v4sf tmp_12;
  v4sf pow2n_6;
  v4sf y_8;
  v4sf mask_8;
  v4sf one_17;
  v4si emm0_8;
  v4sf fx_6;
  v4sf tmp_8;
  v4sf pow2n_3;
  v4sf y_4;
  v4sf mask_4;
  v4sf one_9;
  v4si emm0_4;
  v4sf fx_3;
  v4sf tmp_4;
  v4sf pow2n;
  v4sf y;
  v4sf mask;
  v4sf one_1;
  v4si emm0;
  v4sf fx;
  v4sf tmp;
  __m128 two_5;
  __m128 one_44;
  __m128 one_45;
  v4sf pow2n_17;
  v4sf y_23;
  v4sf mask_23;
  v4sf one_46;
  v4si emm0_23;
  v4sf fx_17;
  v4sf tmp_23;
  __m128 two_4;
  __m128 one_36;
  __m128 one_37;
  v4sf pow2n_14;
  v4sf y_19;
  v4sf mask_19;
  v4sf one_38;
  v4si emm0_19;
  v4sf fx_14;
  v4sf tmp_19;
  __m128 two_3;
  __m128 one_28;
  __m128 one_29;
  v4sf pow2n_11;
  v4sf y_15;
  v4sf mask_15;
  v4sf one_30;
  v4si emm0_15;
  v4sf fx_11;
  v4sf tmp_15;
  __m128 two_2;
  __m128 one_20;
  __m128 one_21;
  v4sf pow2n_8;
  v4sf y_11;
  v4sf mask_11;
  v4sf one_22;
  v4si emm0_11;
  v4sf fx_8;
  v4sf tmp_11;
  __m128 two_1;
  __m128 one_12;
  __m128 one_13;
  v4sf pow2n_5;
  v4sf y_7;
  v4sf mask_7;
  v4sf one_14;
  v4si emm0_7;
  v4sf fx_5;
  v4sf tmp_7;
  __m128 two;
  __m128 one_4;
  __m128 one_5;
  v4sf pow2n_2;
  v4sf y_3;
  v4sf mask_3;
  v4sf one_6;
  v4si emm0_3;
  v4sf fx_2;
  v4sf tmp_3;
  v4sf y_22;
  v4sf z_5;
  v4sf tmp_22;
  v4sf mask_22;
  v4sf e_5;
  v4sf invalid_mask_5;
  v4sf one_43;
  v4si emm0_22;
  v4sf y_18;
  v4sf z_4;
  v4sf tmp_18;
  v4sf mask_18;
  v4sf e_4;
  v4sf invalid_mask_4;
  v4sf one_35;
  v4si emm0_18;
  v4sf y_14;
  v4sf z_3;
  v4sf tmp_14;
  v4sf mask_14;
  v4sf e_3;
  v4sf invalid_mask_3;
  v4sf one_27;
  v4si emm0_14;
  v4sf y_10;
  v4sf z_2;
  v4sf tmp_10;
  v4sf mask_10;
  v4sf e_2;
  v4sf invalid_mask_2;
  v4sf one_19;
  v4si emm0_10;
  v4sf y_6;
  v4sf z_1;
  v4sf tmp_6;
  v4sf mask_6;
  v4sf e_1;
  v4sf invalid_mask_1;
  v4sf one_11;
  v4si emm0_6;
  v4sf y_2;
  v4sf z;
  v4sf tmp_2;
  v4sf mask_2;
  v4sf e;
  v4sf invalid_mask;
  v4sf one_3;
  v4si emm0_2;
  float local_c22c;
  float local_c17c;
  undefined8 local_c0c8;
  undefined8 uStack_c0c0;
  undefined8 local_c0b8;
  undefined8 uStack_c0b0;
  undefined8 local_c0a8;
  undefined8 uStack_c0a0;
  int local_c08c;
  undefined8 local_c088;
  undefined8 uStack_c080;
  undefined8 local_c078;
  undefined8 uStack_c070;
  float local_c064;
  float local_c060;
  undefined4 local_c05c;
  undefined8 local_c058;
  undefined8 uStack_c050;
  undefined8 local_c048;
  undefined8 uStack_c040;
  undefined8 local_c038;
  undefined8 uStack_c030;
  int local_c01c;
  undefined8 local_c018;
  undefined8 uStack_c010;
  undefined8 local_c008;
  undefined8 uStack_c000;
  float local_bfec;
  undefined8 local_bfe8;
  undefined8 uStack_bfe0;
  undefined8 local_bfd8;
  undefined8 uStack_bfd0;
  float local_bfc8;
  int local_bfc4;
  int local_bfc0;
  int local_bfbc;
  int local_bfb8;
  undefined4 local_bfb4;
  undefined8 *local_bf98;
  int *local_bf90;
  undefined8 local_bf88;
  undefined8 local_bf78;
  undefined8 local_bf68;
  float local_bf58;
  float fStack_bf54;
  float fStack_bf50;
  float fStack_bf4c;
  float local_bf48;
  float local_bf38;
  float fStack_bf34;
  float fStack_bf30;
  float fStack_bf2c;
  float local_bf28;
  float local_bf18;
  float fStack_bf14;
  float fStack_bf10;
  float fStack_bf0c;
  float local_bf08;
  undefined8 *local_bef8;
  undefined8 *local_bef0;
  undefined8 *local_bee8;
  undefined8 *local_bee0;
  undefined8 *local_bed8;
  undefined8 *local_bed0;
  undefined8 local_be98;
  undefined8 uStack_be90;
  undefined8 local_be88;
  undefined8 uStack_be80;
  undefined8 local_be78;
  undefined8 uStack_be70;
  undefined8 local_be68;
  undefined8 uStack_be60;
  undefined8 local_be58;
  undefined8 uStack_be50;
  undefined8 local_be48;
  undefined8 uStack_be40;
  int *local_be38;
  int *local_be30;
  int *local_be28;
  int *local_be20;
  int *local_be18;
  int *local_be10;
  undefined8 local_be08;
  undefined8 uStack_be00;
  undefined8 local_bdf8;
  undefined8 uStack_bdf0;
  undefined8 local_bde8;
  undefined8 uStack_bde0;
  undefined8 local_bdd8;
  undefined8 uStack_bdd0;
  undefined8 local_bdc8;
  undefined8 uStack_bdc0;
  undefined8 local_bdb8;
  undefined8 uStack_bdb0;
  undefined8 local_bda8;
  undefined8 uStack_bda0;
  undefined8 local_bd98;
  undefined8 uStack_bd90;
  undefined8 local_bd88;
  undefined8 uStack_bd80;
  undefined8 local_bd78;
  undefined8 uStack_bd70;
  undefined8 local_bd68;
  undefined8 uStack_bd60;
  undefined8 local_bd58;
  undefined8 uStack_bd50;
  undefined8 local_bd48;
  undefined8 uStack_bd40;
  undefined8 local_bd38;
  undefined8 uStack_bd30;
  undefined8 local_bd28;
  undefined8 uStack_bd20;
  undefined8 local_bd18;
  undefined8 uStack_bd10;
  undefined8 local_bd08;
  undefined8 uStack_bd00;
  undefined8 local_bcf8;
  undefined8 uStack_bcf0;
  undefined8 local_bce8;
  undefined8 uStack_bce0;
  undefined8 local_bcd8;
  undefined8 uStack_bcd0;
  undefined8 local_bcc8;
  undefined8 uStack_bcc0;
  undefined8 local_bcb8;
  undefined8 uStack_bcb0;
  undefined8 local_bc98;
  undefined8 uStack_bc90;
  undefined1 local_bc88 [8];
  undefined8 uStack_bc80;
  undefined8 local_bc78;
  undefined8 local_bc68;
  undefined8 local_bc58;
  undefined8 local_bc48;
  undefined8 local_bc38;
  float local_bc28;
  float fStack_bc24;
  float fStack_bc20;
  float fStack_bc1c;
  float local_bc0c;
  float local_bc08;
  float fStack_bc04;
  float fStack_bc00;
  float fStack_bbfc;
  float local_bbec;
  undefined4 local_bbe8;
  undefined4 uStack_bbe4;
  undefined4 uStack_bbe0;
  undefined4 uStack_bbdc;
  undefined4 local_bbd8;
  undefined4 local_bbc8;
  undefined4 uStack_bbc4;
  undefined4 uStack_bbc0;
  undefined4 uStack_bbbc;
  undefined4 local_bbac;
  undefined8 local_bba8;
  undefined8 uStack_bba0;
  undefined8 local_bb98;
  undefined8 uStack_bb90;
  undefined8 local_bb88;
  undefined8 uStack_bb80;
  undefined8 local_bb78;
  undefined8 uStack_bb70;
  undefined8 local_bb58;
  undefined8 uStack_bb50;
  undefined1 local_bb48 [8];
  undefined8 uStack_bb40;
  undefined8 local_bb38;
  undefined8 local_bb28;
  undefined8 local_bb18;
  undefined8 local_bb08;
  undefined8 local_baf8;
  float local_bae8;
  float fStack_bae4;
  float fStack_bae0;
  float fStack_badc;
  float local_bacc;
  float local_bac8;
  float fStack_bac4;
  float fStack_bac0;
  float fStack_babc;
  float local_baac;
  undefined4 local_baa8;
  undefined4 uStack_baa4;
  undefined4 uStack_baa0;
  undefined4 uStack_ba9c;
  undefined4 local_ba98;
  undefined4 local_ba88;
  undefined4 uStack_ba84;
  undefined4 uStack_ba80;
  undefined4 uStack_ba7c;
  undefined4 local_ba6c;
  undefined8 local_ba68;
  undefined8 uStack_ba60;
  undefined8 local_ba58;
  undefined8 uStack_ba50;
  undefined8 local_ba48;
  undefined8 uStack_ba40;
  undefined8 local_ba38;
  undefined8 uStack_ba30;
  undefined8 local_ba18;
  undefined8 uStack_ba10;
  undefined1 local_ba08 [8];
  undefined8 uStack_ba00;
  undefined8 local_b9f8;
  undefined8 local_b9e8;
  undefined8 local_b9d8;
  undefined8 local_b9c8;
  undefined8 local_b9b8;
  float local_b9a8;
  float fStack_b9a4;
  float fStack_b9a0;
  float fStack_b99c;
  float local_b98c;
  float local_b988;
  float fStack_b984;
  float fStack_b980;
  float fStack_b97c;
  float local_b96c;
  undefined4 local_b968;
  undefined4 uStack_b964;
  undefined4 uStack_b960;
  undefined4 uStack_b95c;
  undefined4 local_b958;
  undefined4 local_b948;
  undefined4 uStack_b944;
  undefined4 uStack_b940;
  undefined4 uStack_b93c;
  undefined4 local_b92c;
  undefined8 local_b928;
  undefined8 uStack_b920;
  undefined8 local_b918;
  undefined8 uStack_b910;
  undefined8 local_b908;
  undefined8 uStack_b900;
  undefined8 local_b8f8;
  undefined8 uStack_b8f0;
  undefined8 local_b8d8;
  undefined8 uStack_b8d0;
  undefined1 local_b8c8 [8];
  undefined8 uStack_b8c0;
  undefined8 local_b8b8;
  undefined8 local_b8a8;
  undefined8 local_b898;
  undefined8 local_b888;
  undefined8 local_b878;
  float local_b868;
  float fStack_b864;
  float fStack_b860;
  float fStack_b85c;
  float local_b84c;
  float local_b848;
  float fStack_b844;
  float fStack_b840;
  float fStack_b83c;
  float local_b82c;
  undefined4 local_b828;
  undefined4 uStack_b824;
  undefined4 uStack_b820;
  undefined4 uStack_b81c;
  undefined4 local_b818;
  undefined4 local_b808;
  undefined4 uStack_b804;
  undefined4 uStack_b800;
  undefined4 uStack_b7fc;
  undefined4 local_b7ec;
  undefined8 local_b7e8;
  undefined8 uStack_b7e0;
  undefined8 local_b7d8;
  undefined8 uStack_b7d0;
  undefined8 local_b7c8;
  undefined8 uStack_b7c0;
  undefined8 local_b7b8;
  undefined8 uStack_b7b0;
  undefined8 local_b798;
  undefined8 uStack_b790;
  undefined1 local_b788 [8];
  undefined8 uStack_b780;
  undefined8 local_b778;
  undefined8 local_b768;
  undefined8 local_b758;
  undefined8 local_b748;
  undefined8 local_b738;
  float local_b728;
  float fStack_b724;
  float fStack_b720;
  float fStack_b71c;
  float local_b70c;
  float local_b708;
  float fStack_b704;
  float fStack_b700;
  float fStack_b6fc;
  float local_b6ec;
  undefined4 local_b6e8;
  undefined4 uStack_b6e4;
  undefined4 uStack_b6e0;
  undefined4 uStack_b6dc;
  undefined4 local_b6d8;
  undefined4 local_b6c8;
  undefined4 uStack_b6c4;
  undefined4 uStack_b6c0;
  undefined4 uStack_b6bc;
  undefined4 local_b6ac;
  undefined8 local_b6a8;
  undefined8 uStack_b6a0;
  undefined8 local_b698;
  undefined8 uStack_b690;
  undefined8 local_b688;
  undefined8 uStack_b680;
  undefined8 local_b678;
  undefined8 uStack_b670;
  undefined8 local_b658;
  undefined8 uStack_b650;
  undefined1 local_b648 [8];
  undefined8 uStack_b640;
  undefined8 local_b638;
  undefined8 local_b628;
  undefined8 local_b618;
  undefined8 local_b608;
  undefined8 local_b5f8;
  float local_b5e8;
  float fStack_b5e4;
  float fStack_b5e0;
  float fStack_b5dc;
  float local_b5cc;
  float local_b5c8;
  float fStack_b5c4;
  float fStack_b5c0;
  float fStack_b5bc;
  float local_b5ac;
  undefined4 local_b5a8;
  undefined4 uStack_b5a4;
  undefined4 uStack_b5a0;
  undefined4 uStack_b59c;
  undefined4 local_b598;
  undefined4 local_b588;
  undefined4 uStack_b584;
  undefined4 uStack_b580;
  undefined4 uStack_b57c;
  undefined4 local_b56c;
  undefined1 local_b568 [16];
  undefined8 local_b558;
  undefined8 uStack_b550;
  int local_b548;
  int iStack_b544;
  int iStack_b540;
  int iStack_b53c;
  int local_b538;
  int iStack_b534;
  int iStack_b530;
  int iStack_b52c;
  float local_b528;
  float fStack_b524;
  float fStack_b520;
  float fStack_b51c;
  float local_b518;
  float fStack_b514;
  float fStack_b510;
  float fStack_b50c;
  ulong local_b508;
  ulong uStack_b500;
  ulong local_b4f8;
  ulong uStack_b4f0;
  ulong local_b4e8;
  ulong uStack_b4e0;
  ulong local_b4d8;
  ulong uStack_b4d0;
  undefined8 local_b4c8;
  undefined8 uStack_b4c0;
  undefined8 local_b4b8;
  undefined8 uStack_b4b0;
  undefined8 *local_b4a8;
  undefined8 *local_b4a0;
  undefined4 local_b498;
  undefined4 uStack_b494;
  undefined4 uStack_b490;
  undefined4 uStack_b48c;
  undefined4 local_b47c;
  undefined1 local_b478 [16];
  undefined8 local_b468;
  undefined8 uStack_b460;
  int local_b458;
  int iStack_b454;
  int iStack_b450;
  int iStack_b44c;
  int local_b448;
  int iStack_b444;
  int iStack_b440;
  int iStack_b43c;
  float local_b438;
  float fStack_b434;
  float fStack_b430;
  float fStack_b42c;
  float local_b428;
  float fStack_b424;
  float fStack_b420;
  float fStack_b41c;
  ulong local_b418;
  ulong uStack_b410;
  ulong local_b408;
  ulong uStack_b400;
  ulong local_b3f8;
  ulong uStack_b3f0;
  ulong local_b3e8;
  ulong uStack_b3e0;
  undefined8 local_b3d8;
  undefined8 uStack_b3d0;
  undefined8 local_b3c8;
  undefined8 uStack_b3c0;
  undefined8 *local_b3b8;
  undefined8 *local_b3b0;
  undefined4 local_b3a8;
  undefined4 uStack_b3a4;
  undefined4 uStack_b3a0;
  undefined4 uStack_b39c;
  undefined4 local_b38c;
  undefined1 local_b388 [16];
  undefined8 local_b378;
  undefined8 uStack_b370;
  int local_b368;
  int iStack_b364;
  int iStack_b360;
  int iStack_b35c;
  float local_b358;
  float fStack_b354;
  float fStack_b350;
  float fStack_b34c;
  ulong local_b348;
  ulong uStack_b340;
  ulong local_b338;
  ulong uStack_b330;
  undefined8 local_b328;
  undefined8 uStack_b320;
  undefined8 local_b318;
  undefined8 uStack_b310;
  undefined8 *local_b300;
  undefined4 local_b2f8;
  undefined4 uStack_b2f4;
  undefined4 uStack_b2f0;
  undefined4 uStack_b2ec;
  undefined4 local_b2dc;
  undefined1 local_b2d8 [16];
  undefined8 local_b2c8;
  undefined8 uStack_b2c0;
  int local_b2b8;
  int iStack_b2b4;
  int iStack_b2b0;
  int iStack_b2ac;
  float local_b2a8;
  float fStack_b2a4;
  float fStack_b2a0;
  float fStack_b29c;
  ulong local_b298;
  ulong uStack_b290;
  ulong local_b288;
  ulong uStack_b280;
  undefined8 local_b278;
  undefined8 uStack_b270;
  undefined8 local_b268;
  undefined8 uStack_b260;
  undefined8 *local_b250;
  undefined4 local_b248;
  undefined4 uStack_b244;
  undefined4 uStack_b240;
  undefined4 uStack_b23c;
  undefined4 local_b238;
  float local_b234;
  float local_b230;
  float local_b22c;
  float local_b228;
  float local_b224;
  float local_b220;
  float local_b21c;
  float local_b218;
  float local_b214;
  undefined4 local_b208;
  float local_b204 [5];
  undefined8 local_b1f0;
  undefined8 local_b1e0;
  undefined8 local_b1d0;
  undefined8 local_b1c0;
  float local_b1ac;
  float local_b1a8;
  float local_b1a4;
  float local_b1a0;
  float local_b19c;
  float local_b198;
  float local_b194;
  float local_b190;
  float local_b18c;
  undefined4 local_b180;
  float local_b17c [5];
  undefined8 local_b168;
  undefined8 local_b158;
  undefined8 local_b148;
  undefined8 local_b138;
  int local_b128;
  float local_b124;
  undefined1 local_b11d;
  int local_b11c;
  float local_b118;
  undefined1 local_b111;
  undefined8 *local_b110;
  undefined8 *local_b108;
  undefined8 *local_b100;
  undefined8 local_b0f8;
  undefined8 uStack_b0f0;
  undefined8 local_b0e8;
  undefined8 uStack_b0e0;
  undefined8 *local_b0d0;
  undefined8 *local_b0c8;
  undefined8 *local_b0c0;
  undefined8 local_b0b8;
  undefined8 uStack_b0b0;
  undefined8 local_b0a8;
  undefined8 uStack_b0a0;
  undefined8 *local_b090;
  undefined8 *local_b088;
  undefined8 *local_b080;
  undefined8 local_b078;
  undefined8 uStack_b070;
  undefined8 local_b068;
  undefined8 uStack_b060;
  undefined8 local_b058;
  undefined8 uStack_b050;
  undefined8 local_b048;
  undefined8 uStack_b040;
  undefined8 local_b038;
  undefined8 uStack_b030;
  undefined8 local_b028;
  undefined8 uStack_b020;
  undefined8 local_b018;
  undefined8 uStack_b010;
  undefined8 local_b008;
  undefined8 uStack_b000;
  undefined8 local_aff8;
  undefined8 uStack_aff0;
  undefined8 local_afe8;
  undefined8 uStack_afe0;
  undefined8 local_afd8;
  undefined8 uStack_afd0;
  undefined8 local_afc8;
  undefined8 uStack_afc0;
  undefined8 local_afb8;
  undefined8 uStack_afb0;
  undefined8 local_afa8;
  undefined8 uStack_afa0;
  undefined8 local_af98;
  undefined8 uStack_af90;
  undefined8 local_af88;
  undefined8 uStack_af80;
  undefined8 local_af78;
  undefined8 uStack_af70;
  undefined8 local_af68;
  undefined8 uStack_af60;
  undefined8 local_af58;
  undefined8 uStack_af50;
  undefined8 local_af48;
  undefined8 uStack_af40;
  undefined8 local_af38;
  undefined8 uStack_af30;
  undefined8 local_af28;
  undefined8 uStack_af20;
  undefined8 local_af18;
  undefined8 uStack_af10;
  undefined8 local_af08;
  undefined8 uStack_af00;
  undefined8 local_aef8;
  undefined8 uStack_aef0;
  undefined8 local_aee8;
  undefined8 uStack_aee0;
  undefined8 local_aed8;
  undefined8 uStack_aed0;
  undefined8 local_aec8;
  undefined8 uStack_aec0;
  undefined8 local_aeb8;
  undefined8 uStack_aeb0;
  undefined8 local_aea8;
  undefined8 uStack_aea0;
  undefined8 local_ae98;
  undefined8 uStack_ae90;
  undefined8 local_ae88;
  undefined8 uStack_ae80;
  undefined1 local_ae78 [16];
  undefined1 local_ae68 [16];
  float local_ae4c;
  undefined8 local_ae48;
  undefined8 uStack_ae40;
  float local_ae38;
  float fStack_ae34;
  float fStack_ae30;
  float fStack_ae2c;
  float local_ae28;
  undefined8 local_ae18;
  undefined8 uStack_ae10;
  undefined8 local_ae08;
  undefined8 uStack_ae00;
  undefined8 local_adf8;
  undefined8 uStack_adf0;
  undefined8 local_ade8;
  undefined8 uStack_ade0;
  undefined8 local_add8;
  undefined8 uStack_add0;
  undefined8 local_adc8;
  undefined8 uStack_adc0;
  undefined1 local_adb8 [16];
  undefined1 local_ada8 [16];
  float local_ad8c;
  undefined8 local_ad88;
  undefined8 uStack_ad80;
  float local_ad78;
  float fStack_ad74;
  float fStack_ad70;
  float fStack_ad6c;
  float local_ad68;
  undefined8 local_ad58;
  undefined8 uStack_ad50;
  undefined8 local_ad48;
  undefined8 uStack_ad40;
  undefined8 local_ad38;
  undefined8 uStack_ad30;
  undefined8 local_ad28;
  undefined8 uStack_ad20;
  undefined8 local_ad18;
  undefined8 uStack_ad10;
  undefined8 local_ad08;
  undefined8 uStack_ad00;
  undefined1 local_acf8 [16];
  undefined1 local_ace8 [16];
  float local_accc;
  undefined8 local_acc8;
  undefined8 uStack_acc0;
  float local_acb8;
  float fStack_acb4;
  float fStack_acb0;
  float fStack_acac;
  float local_aca8;
  undefined8 local_ac98;
  undefined8 uStack_ac90;
  undefined8 local_ac88;
  undefined8 uStack_ac80;
  undefined8 local_ac78;
  undefined8 uStack_ac70;
  undefined8 local_ac68;
  undefined8 uStack_ac60;
  undefined8 local_ac58;
  undefined8 uStack_ac50;
  undefined8 local_ac48;
  undefined8 uStack_ac40;
  undefined1 local_ac38 [16];
  undefined1 local_ac28 [16];
  float local_ac0c;
  undefined8 local_ac08;
  undefined8 uStack_ac00;
  float local_abf8;
  float fStack_abf4;
  float fStack_abf0;
  float fStack_abec;
  float local_abe8;
  undefined8 local_abd8;
  undefined8 uStack_abd0;
  undefined8 local_abc8;
  undefined8 uStack_abc0;
  undefined8 local_abb8;
  undefined8 uStack_abb0;
  undefined8 local_aba8;
  undefined8 uStack_aba0;
  undefined8 local_ab98;
  undefined8 uStack_ab90;
  undefined8 local_ab88;
  undefined8 uStack_ab80;
  undefined1 local_ab78 [16];
  undefined1 local_ab68 [16];
  float local_ab4c;
  undefined8 local_ab48;
  undefined8 uStack_ab40;
  float local_ab38;
  float fStack_ab34;
  float fStack_ab30;
  float fStack_ab2c;
  float local_ab28;
  undefined8 local_ab18;
  undefined8 uStack_ab10;
  undefined8 local_ab08;
  undefined8 uStack_ab00;
  undefined8 local_aaf8;
  undefined8 uStack_aaf0;
  undefined8 local_aae8;
  undefined8 uStack_aae0;
  undefined8 local_aad8;
  undefined8 uStack_aad0;
  undefined8 local_aac8;
  undefined8 uStack_aac0;
  undefined1 local_aab8 [16];
  undefined1 local_aaa8 [16];
  float local_aa8c;
  undefined8 local_aa88;
  undefined8 uStack_aa80;
  float local_aa78;
  float fStack_aa74;
  float fStack_aa70;
  float fStack_aa6c;
  float local_aa68;
  undefined8 local_aa58;
  undefined8 uStack_aa50;
  undefined8 local_aa48;
  undefined8 uStack_aa40;
  undefined8 local_aa38;
  undefined8 uStack_aa30;
  undefined8 local_aa28;
  undefined8 uStack_aa20;
  undefined8 local_aa18;
  undefined8 uStack_aa10;
  undefined8 local_aa08;
  undefined8 uStack_aa00;
  undefined8 local_a9f8;
  undefined8 uStack_a9f0;
  undefined8 local_a9e8;
  undefined8 uStack_a9e0;
  undefined8 local_a9d8;
  undefined8 uStack_a9d0;
  undefined8 local_a9c8;
  undefined8 uStack_a9c0;
  undefined8 local_a9b8;
  undefined8 uStack_a9b0;
  undefined8 local_a9a8;
  undefined8 uStack_a9a0;
  undefined8 local_a998;
  undefined8 uStack_a990;
  undefined8 local_a988;
  undefined8 uStack_a980;
  undefined8 local_a978;
  undefined8 uStack_a970;
  undefined8 local_a968;
  undefined8 uStack_a960;
  undefined8 local_a958;
  undefined8 uStack_a950;
  undefined8 local_a948;
  undefined8 uStack_a940;
  undefined8 local_a938;
  undefined8 uStack_a930;
  undefined1 local_a928 [16];
  undefined8 local_a918;
  undefined8 uStack_a910;
  undefined1 local_a908 [16];
  undefined8 local_a8f8;
  undefined8 uStack_a8f0;
  undefined1 local_a8e8 [16];
  undefined8 local_a8d8;
  undefined8 uStack_a8d0;
  undefined1 local_a8c8 [16];
  undefined8 local_a8b8;
  undefined8 uStack_a8b0;
  undefined1 local_a8a8 [16];
  undefined8 local_a898;
  undefined8 uStack_a890;
  undefined1 local_a888 [16];
  undefined8 local_a878;
  undefined8 uStack_a870;
  undefined8 local_a868;
  undefined8 uStack_a860;
  undefined4 local_a858;
  undefined4 uStack_a854;
  undefined4 uStack_a850;
  undefined4 uStack_a84c;
  undefined4 local_a83c;
  undefined8 local_a838;
  undefined8 uStack_a830;
  undefined8 local_a828;
  undefined8 uStack_a820;
  undefined8 local_a818;
  undefined8 uStack_a810;
  undefined4 local_a808;
  undefined4 uStack_a804;
  undefined4 uStack_a800;
  undefined4 uStack_a7fc;
  undefined4 local_a7ec;
  undefined8 local_a7e8;
  undefined8 uStack_a7e0;
  undefined8 local_a7d8;
  undefined8 uStack_a7d0;
  undefined8 local_a7c8;
  undefined8 uStack_a7c0;
  undefined4 local_a7b8;
  undefined4 uStack_a7b4;
  undefined4 uStack_a7b0;
  undefined4 uStack_a7ac;
  undefined4 local_a79c;
  undefined8 local_a798;
  undefined8 uStack_a790;
  undefined8 local_a788;
  undefined8 uStack_a780;
  undefined8 local_a778;
  undefined8 uStack_a770;
  undefined4 local_a768;
  undefined4 uStack_a764;
  undefined4 uStack_a760;
  undefined4 uStack_a75c;
  undefined4 local_a74c;
  undefined8 local_a748;
  undefined8 uStack_a740;
  undefined8 local_a738;
  undefined8 uStack_a730;
  undefined8 local_a728;
  undefined8 uStack_a720;
  undefined4 local_a718;
  undefined4 uStack_a714;
  undefined4 uStack_a710;
  undefined4 uStack_a70c;
  undefined4 local_a6fc;
  undefined8 local_a6f8;
  undefined8 uStack_a6f0;
  undefined8 local_a6e8;
  undefined8 uStack_a6e0;
  undefined8 local_a6d8;
  undefined8 uStack_a6d0;
  undefined4 local_a6c8;
  undefined4 uStack_a6c4;
  undefined4 uStack_a6c0;
  undefined4 uStack_a6bc;
  undefined4 local_a6ac;
  undefined8 local_a6a8;
  undefined8 uStack_a6a0;
  undefined8 local_a698;
  undefined8 uStack_a690;
  undefined4 local_a688;
  undefined4 uStack_a684;
  undefined4 uStack_a680;
  undefined4 uStack_a67c;
  undefined4 local_a66c;
  float local_a668;
  float fStack_a664;
  float fStack_a660;
  float fStack_a65c;
  undefined8 local_a658;
  undefined8 uStack_a650;
  undefined8 local_a648;
  undefined8 uStack_a640;
  undefined4 local_a638;
  undefined4 uStack_a634;
  undefined4 uStack_a630;
  undefined4 uStack_a62c;
  undefined4 local_a61c;
  float local_a618;
  float fStack_a614;
  float fStack_a610;
  float fStack_a60c;
  undefined8 local_a608;
  undefined8 uStack_a600;
  undefined8 local_a5f8;
  undefined8 uStack_a5f0;
  undefined4 local_a5e8;
  undefined4 uStack_a5e4;
  undefined4 uStack_a5e0;
  undefined4 uStack_a5dc;
  undefined4 local_a5cc;
  float local_a5c8;
  float fStack_a5c4;
  float fStack_a5c0;
  float fStack_a5bc;
  undefined8 local_a5b8;
  undefined8 uStack_a5b0;
  undefined8 local_a5a8;
  undefined8 uStack_a5a0;
  undefined4 local_a598;
  undefined4 uStack_a594;
  undefined4 uStack_a590;
  undefined4 uStack_a58c;
  undefined4 local_a57c;
  float local_a578;
  float fStack_a574;
  float fStack_a570;
  float fStack_a56c;
  undefined8 local_a568;
  undefined8 uStack_a560;
  undefined8 local_a558;
  undefined8 uStack_a550;
  undefined4 local_a548;
  undefined4 uStack_a544;
  undefined4 uStack_a540;
  undefined4 uStack_a53c;
  undefined4 local_a52c;
  float local_a528;
  float fStack_a524;
  float fStack_a520;
  float fStack_a51c;
  undefined8 local_a518;
  undefined8 uStack_a510;
  undefined8 local_a508;
  undefined8 uStack_a500;
  undefined4 local_a4f8;
  undefined4 uStack_a4f4;
  undefined4 uStack_a4f0;
  undefined4 uStack_a4ec;
  undefined4 local_a4dc;
  float local_a4d8;
  float fStack_a4d4;
  float fStack_a4d0;
  float fStack_a4cc;
  undefined8 local_a4c8;
  undefined8 uStack_a4c0;
  undefined8 local_a4b8;
  undefined8 uStack_a4b0;
  undefined1 local_a4a8 [8];
  undefined8 uStack_a4a0;
  undefined8 local_a498;
  undefined8 uStack_a490;
  undefined8 local_a488;
  undefined8 uStack_a480;
  undefined4 local_a478;
  undefined4 uStack_a474;
  undefined4 uStack_a470;
  undefined4 uStack_a46c;
  undefined4 local_a45c;
  undefined8 local_a458;
  undefined8 uStack_a450;
  undefined8 local_a448;
  undefined8 uStack_a440;
  undefined8 local_a438;
  undefined8 uStack_a430;
  undefined8 local_a428;
  undefined8 uStack_a420;
  undefined8 local_a418;
  undefined8 uStack_a410;
  undefined8 local_a408;
  undefined8 uStack_a400;
  undefined8 local_a3f8;
  undefined8 uStack_a3f0;
  undefined8 local_a3e8;
  undefined8 uStack_a3e0;
  undefined8 local_a3d8;
  undefined8 uStack_a3d0;
  undefined8 local_a3c8;
  undefined8 uStack_a3c0;
  undefined1 local_a3b8 [8];
  undefined8 uStack_a3b0;
  undefined8 local_a3a8;
  undefined8 uStack_a3a0;
  undefined8 local_a398;
  undefined8 uStack_a390;
  undefined4 local_a388;
  undefined4 uStack_a384;
  undefined4 uStack_a380;
  undefined4 uStack_a37c;
  undefined4 local_a36c;
  undefined8 local_a368;
  undefined8 uStack_a360;
  undefined8 local_a358;
  undefined8 uStack_a350;
  undefined8 local_a348;
  undefined8 uStack_a340;
  undefined8 local_a338;
  undefined8 uStack_a330;
  undefined8 local_a328;
  undefined8 uStack_a320;
  undefined8 local_a318;
  undefined8 uStack_a310;
  undefined8 local_a308;
  undefined8 uStack_a300;
  undefined8 local_a2f8;
  undefined8 uStack_a2f0;
  undefined8 local_a2e8;
  undefined8 uStack_a2e0;
  undefined8 local_a2d8;
  undefined8 uStack_a2d0;
  undefined1 local_a2c8 [8];
  undefined8 uStack_a2c0;
  undefined8 local_a2b8;
  undefined8 uStack_a2b0;
  undefined8 local_a2a8;
  undefined8 uStack_a2a0;
  undefined4 local_a298;
  undefined4 uStack_a294;
  undefined4 uStack_a290;
  undefined4 uStack_a28c;
  undefined4 local_a27c;
  undefined8 local_a278;
  undefined8 uStack_a270;
  undefined8 local_a268;
  undefined8 uStack_a260;
  undefined8 local_a258;
  undefined8 uStack_a250;
  undefined8 local_a248;
  undefined8 uStack_a240;
  undefined8 local_a238;
  undefined8 uStack_a230;
  undefined8 local_a228;
  undefined8 uStack_a220;
  undefined8 local_a218;
  undefined8 uStack_a210;
  undefined8 local_a208;
  undefined8 uStack_a200;
  undefined8 local_a1f8;
  undefined8 uStack_a1f0;
  undefined8 local_a1e8;
  undefined8 uStack_a1e0;
  undefined1 local_a1d8 [8];
  undefined8 uStack_a1d0;
  undefined8 local_a1c8;
  undefined8 uStack_a1c0;
  undefined8 local_a1b8;
  undefined8 uStack_a1b0;
  undefined4 local_a1a8;
  undefined4 uStack_a1a4;
  undefined4 uStack_a1a0;
  undefined4 uStack_a19c;
  undefined4 local_a18c;
  undefined8 local_a188;
  undefined8 uStack_a180;
  undefined8 local_a178;
  undefined8 uStack_a170;
  undefined8 local_a168;
  undefined8 uStack_a160;
  undefined8 local_a158;
  undefined8 uStack_a150;
  undefined8 local_a148;
  undefined8 uStack_a140;
  undefined8 local_a138;
  undefined8 uStack_a130;
  undefined8 local_a128;
  undefined8 uStack_a120;
  undefined8 local_a118;
  undefined8 uStack_a110;
  undefined8 local_a108;
  undefined8 uStack_a100;
  undefined8 local_a0f8;
  undefined8 uStack_a0f0;
  undefined1 local_a0e8 [8];
  undefined8 uStack_a0e0;
  undefined8 local_a0d8;
  undefined8 uStack_a0d0;
  undefined8 local_a0c8;
  undefined8 uStack_a0c0;
  undefined4 local_a0b8;
  undefined4 uStack_a0b4;
  undefined4 uStack_a0b0;
  undefined4 uStack_a0ac;
  undefined4 local_a09c;
  undefined8 local_a098;
  undefined8 uStack_a090;
  undefined8 local_a088;
  undefined8 uStack_a080;
  undefined8 local_a078;
  undefined8 uStack_a070;
  undefined8 local_a068;
  undefined8 uStack_a060;
  undefined8 local_a058;
  undefined8 uStack_a050;
  undefined8 local_a048;
  undefined8 uStack_a040;
  undefined8 local_a038;
  undefined8 uStack_a030;
  undefined8 local_a028;
  undefined8 uStack_a020;
  undefined8 local_a018;
  undefined8 uStack_a010;
  undefined8 local_a008;
  undefined8 uStack_a000;
  undefined1 local_9ff8 [8];
  undefined8 uStack_9ff0;
  undefined8 local_9fe8;
  undefined8 uStack_9fe0;
  undefined8 local_9fd8;
  undefined8 uStack_9fd0;
  undefined4 local_9fc8;
  undefined4 uStack_9fc4;
  undefined4 uStack_9fc0;
  undefined4 uStack_9fbc;
  undefined4 local_9fac;
  undefined8 local_9fa8;
  undefined8 uStack_9fa0;
  undefined8 local_9f98;
  undefined8 uStack_9f90;
  undefined8 local_9f88;
  undefined8 uStack_9f80;
  undefined8 local_9f78;
  undefined8 uStack_9f70;
  undefined8 local_9f68;
  undefined8 uStack_9f60;
  undefined8 local_9f58;
  undefined8 uStack_9f50;
  undefined8 local_9f48;
  undefined8 uStack_9f40;
  undefined8 local_9f38;
  undefined8 uStack_9f30;
  undefined8 local_9f28;
  undefined8 uStack_9f20;
  undefined8 local_9f18;
  undefined8 uStack_9f10;
  float local_9f08;
  float fStack_9f04;
  float fStack_9f00;
  float fStack_9efc;
  undefined8 local_9ef8;
  undefined8 uStack_9ef0;
  float local_9ee8;
  float fStack_9ee4;
  float fStack_9ee0;
  float fStack_9edc;
  undefined8 local_9ed8;
  undefined8 uStack_9ed0;
  float local_9ec8;
  float fStack_9ec4;
  float fStack_9ec0;
  float fStack_9ebc;
  undefined8 local_9eb8;
  undefined8 uStack_9eb0;
  float local_9ea8;
  float fStack_9ea4;
  float fStack_9ea0;
  float fStack_9e9c;
  undefined8 local_9e98;
  undefined8 uStack_9e90;
  float local_9e88;
  float fStack_9e84;
  float fStack_9e80;
  float fStack_9e7c;
  undefined8 local_9e78;
  undefined8 uStack_9e70;
  float local_9e68;
  float fStack_9e64;
  float fStack_9e60;
  float fStack_9e5c;
  undefined8 local_9e58;
  undefined8 uStack_9e50;
  undefined8 local_9e48;
  undefined8 uStack_9e40;
  undefined8 local_9e38;
  undefined8 uStack_9e30;
  undefined8 local_9e28;
  undefined8 uStack_9e20;
  undefined8 local_9e18;
  undefined8 uStack_9e10;
  undefined8 local_9e08;
  undefined8 uStack_9e00;
  undefined8 local_9df8;
  undefined8 uStack_9df0;
  undefined8 local_9de8;
  undefined8 uStack_9de0;
  undefined8 local_9dd8;
  undefined8 uStack_9dd0;
  undefined8 local_9dc8;
  undefined8 uStack_9dc0;
  undefined8 local_9db8;
  undefined8 uStack_9db0;
  undefined8 local_9da8;
  undefined8 uStack_9da0;
  undefined8 local_9d98;
  undefined8 uStack_9d90;
  undefined8 local_9d88;
  undefined8 uStack_9d80;
  undefined8 local_9d78;
  undefined8 uStack_9d70;
  undefined8 local_9d68;
  undefined8 uStack_9d60;
  undefined8 local_9d58;
  undefined8 uStack_9d50;
  undefined8 local_9d48;
  undefined8 uStack_9d40;
  undefined8 local_9d38;
  undefined8 uStack_9d30;
  undefined8 local_9d28;
  undefined8 uStack_9d20;
  undefined8 local_9d18;
  undefined8 uStack_9d10;
  undefined8 local_9d08;
  undefined8 uStack_9d00;
  undefined8 local_9cf8;
  undefined8 uStack_9cf0;
  undefined8 local_9ce8;
  undefined8 uStack_9ce0;
  float local_9cd8;
  float fStack_9cd4;
  float fStack_9cd0;
  float fStack_9ccc;
  undefined8 local_9cc8;
  undefined8 uStack_9cc0;
  float local_9cb8;
  float fStack_9cb4;
  float fStack_9cb0;
  float fStack_9cac;
  undefined8 local_9ca8;
  undefined8 uStack_9ca0;
  float local_9c98;
  float fStack_9c94;
  float fStack_9c90;
  float fStack_9c8c;
  undefined8 local_9c88;
  undefined8 uStack_9c80;
  float local_9c78;
  float fStack_9c74;
  float fStack_9c70;
  float fStack_9c6c;
  undefined8 local_9c68;
  undefined8 uStack_9c60;
  float local_9c58;
  float fStack_9c54;
  float fStack_9c50;
  float fStack_9c4c;
  undefined8 local_9c48;
  undefined8 uStack_9c40;
  float local_9c38;
  float fStack_9c34;
  float fStack_9c30;
  float fStack_9c2c;
  undefined8 local_9c28;
  undefined8 uStack_9c20;
  undefined8 local_9c18;
  undefined8 uStack_9c10;
  float local_9c08;
  float fStack_9c04;
  float fStack_9c00;
  float fStack_9bfc;
  undefined8 local_9bf8;
  undefined8 uStack_9bf0;
  float local_9be8;
  float fStack_9be4;
  float fStack_9be0;
  float fStack_9bdc;
  undefined8 local_9bd8;
  undefined8 uStack_9bd0;
  float local_9bc8;
  float fStack_9bc4;
  float fStack_9bc0;
  float fStack_9bbc;
  undefined8 local_9bb8;
  undefined8 uStack_9bb0;
  ulong local_9ba8;
  ulong uStack_9ba0;
  undefined8 local_9b98;
  undefined8 uStack_9b90;
  ulong local_9b88;
  ulong uStack_9b80;
  undefined8 local_9b78;
  undefined8 uStack_9b70;
  ulong local_9b68;
  ulong uStack_9b60;
  undefined8 local_9b58;
  undefined8 uStack_9b50;
  ulong local_9b48;
  ulong uStack_9b40;
  undefined8 local_9b38;
  undefined8 uStack_9b30;
  ulong local_9b28;
  ulong uStack_9b20;
  undefined8 local_9b18;
  undefined8 uStack_9b10;
  ulong local_9b08;
  ulong uStack_9b00;
  float local_9af8;
  float fStack_9af4;
  float fStack_9af0;
  float fStack_9aec;
  undefined8 local_9ae8;
  undefined8 uStack_9ae0;
  float local_9ad8;
  float fStack_9ad4;
  float fStack_9ad0;
  float fStack_9acc;
  undefined8 local_9ac8;
  undefined8 uStack_9ac0;
  float local_9ab8;
  float fStack_9ab4;
  float fStack_9ab0;
  float fStack_9aac;
  undefined8 local_9aa8;
  undefined8 uStack_9aa0;
  float local_9a98;
  float fStack_9a94;
  float fStack_9a90;
  float fStack_9a8c;
  undefined8 local_9a88;
  undefined8 uStack_9a80;
  float local_9a78;
  float fStack_9a74;
  float fStack_9a70;
  float fStack_9a6c;
  undefined8 local_9a68;
  undefined8 uStack_9a60;
  float local_9a58;
  float fStack_9a54;
  float fStack_9a50;
  float fStack_9a4c;
  undefined8 local_9a48;
  undefined8 uStack_9a40;
  undefined8 local_9a38;
  undefined8 uStack_9a30;
  undefined8 local_9a28;
  undefined8 uStack_9a20;
  undefined8 local_9a18;
  undefined8 uStack_9a10;
  undefined8 local_9a08;
  undefined8 uStack_9a00;
  float local_99f8;
  float fStack_99f4;
  float fStack_99f0;
  float fStack_99ec;
  float local_99e8;
  float fStack_99e4;
  float fStack_99e0;
  float fStack_99dc;
  undefined8 local_99d8;
  undefined8 uStack_99d0;
  undefined8 local_99c8;
  undefined8 uStack_99c0;
  undefined8 local_99b8;
  undefined8 uStack_99b0;
  undefined8 local_99a8;
  undefined8 uStack_99a0;
  undefined8 local_9998;
  undefined8 uStack_9990;
  undefined8 local_9988;
  undefined8 uStack_9980;
  undefined8 local_9978;
  undefined8 uStack_9970;
  undefined8 local_9968;
  undefined8 uStack_9960;
  undefined8 local_9958;
  undefined8 uStack_9950;
  undefined8 *local_9940;
  undefined8 *local_9938;
  undefined8 *local_9930;
  undefined8 local_9928;
  undefined8 uStack_9920;
  undefined8 local_9918;
  undefined8 uStack_9910;
  float *local_9900;
  undefined8 *local_98f8;
  undefined8 *local_98f0;
  undefined8 local_98e8;
  undefined8 uStack_98e0;
  undefined8 local_98d8;
  undefined8 uStack_98d0;
  float *local_98c0;
  undefined8 *local_98b8;
  undefined8 *local_98b0;
  undefined8 local_98a8;
  undefined8 uStack_98a0;
  undefined8 local_9898;
  undefined8 uStack_9890;
  float *local_9880;
  undefined8 *local_9878;
  undefined8 *local_9870;
  undefined8 local_9868;
  undefined8 uStack_9860;
  undefined8 local_9858;
  undefined8 uStack_9850;
  float *local_9840;
  undefined8 *local_9838;
  undefined8 *local_9830;
  undefined8 local_9828;
  undefined8 uStack_9820;
  undefined8 local_9818;
  undefined8 uStack_9810;
  float *local_9800;
  undefined8 *local_97f8;
  undefined8 *local_97f0;
  undefined8 local_97e8;
  undefined8 uStack_97e0;
  undefined8 local_97d8;
  undefined8 uStack_97d0;
  undefined8 local_97c8;
  undefined8 uStack_97c0;
  undefined8 local_97b8;
  undefined8 uStack_97b0;
  undefined8 local_97a8;
  undefined8 uStack_97a0;
  undefined8 local_9798;
  undefined8 uStack_9790;
  undefined8 local_9788;
  undefined8 uStack_9780;
  float local_9778 [2];
  float afStack_9770 [2];
  float local_9768;
  float fStack_9764;
  float fStack_9760;
  float fStack_975c;
  float local_9758 [2];
  float afStack_9750 [2];
  float local_9748;
  float fStack_9744;
  float fStack_9740;
  float fStack_973c;
  float local_9738 [2];
  float afStack_9730 [2];
  float local_9728;
  float fStack_9724;
  float fStack_9720;
  float fStack_971c;
  float local_9718 [2];
  float afStack_9710 [2];
  float local_9708;
  float fStack_9704;
  float fStack_9700;
  float fStack_96fc;
  float local_96f8 [2];
  float afStack_96f0 [2];
  float local_96e8;
  float fStack_96e4;
  float fStack_96e0;
  float fStack_96dc;
  undefined8 local_96d8;
  undefined8 uStack_96d0;
  float local_96c8;
  float fStack_96c4;
  float fStack_96c0;
  float fStack_96bc;
  undefined8 local_96b8;
  undefined8 uStack_96b0;
  undefined8 local_96a8;
  undefined8 uStack_96a0;
  undefined8 local_9698;
  undefined8 uStack_9690;
  undefined8 local_9688;
  undefined8 uStack_9680;
  undefined8 local_9678;
  undefined8 uStack_9670;
  undefined8 local_9668;
  undefined8 uStack_9660;
  undefined8 local_9658;
  undefined8 uStack_9650;
  undefined8 local_9648;
  undefined8 uStack_9640;
  float local_9638;
  float fStack_9634;
  float fStack_9630;
  float fStack_962c;
  float local_9628;
  float fStack_9624;
  float fStack_9620;
  float fStack_961c;
  undefined8 local_9618;
  undefined8 uStack_9610;
  undefined8 local_9608;
  undefined8 uStack_9600;
  undefined8 local_95f8;
  undefined8 uStack_95f0;
  undefined8 local_95e8;
  undefined8 uStack_95e0;
  undefined8 local_95d8;
  undefined8 uStack_95d0;
  undefined8 local_95c8;
  undefined8 uStack_95c0;
  undefined8 local_95b8;
  undefined8 uStack_95b0;
  undefined8 local_95a8;
  undefined8 uStack_95a0;
  undefined8 local_9598;
  undefined8 uStack_9590;
  undefined8 *local_9580;
  undefined8 *local_9578;
  undefined8 *local_9570;
  undefined8 local_9568;
  undefined8 uStack_9560;
  undefined8 local_9558;
  undefined8 uStack_9550;
  float *local_9540;
  undefined8 *local_9538;
  undefined8 *local_9530;
  undefined8 local_9528;
  undefined8 uStack_9520;
  undefined8 local_9518;
  undefined8 uStack_9510;
  float *local_9500;
  undefined8 *local_94f8;
  undefined8 *local_94f0;
  undefined8 local_94e8;
  undefined8 uStack_94e0;
  undefined8 local_94d8;
  undefined8 uStack_94d0;
  float *local_94c0;
  undefined8 *local_94b8;
  undefined8 *local_94b0;
  undefined8 local_94a8;
  undefined8 uStack_94a0;
  undefined8 local_9498;
  undefined8 uStack_9490;
  float *local_9480;
  undefined8 *local_9478;
  undefined8 *local_9470;
  undefined8 local_9468;
  undefined8 uStack_9460;
  undefined8 local_9458;
  undefined8 uStack_9450;
  float *local_9440;
  undefined8 *local_9438;
  undefined8 *local_9430;
  undefined8 local_9428;
  undefined8 uStack_9420;
  undefined8 local_9418;
  undefined8 uStack_9410;
  undefined8 local_9408;
  undefined8 uStack_9400;
  undefined8 local_93f8;
  undefined8 uStack_93f0;
  undefined8 local_93e8;
  undefined8 uStack_93e0;
  undefined8 local_93d8;
  undefined8 uStack_93d0;
  undefined8 local_93c8;
  undefined8 uStack_93c0;
  float local_93b8 [2];
  float afStack_93b0 [2];
  float local_93a8;
  float fStack_93a4;
  float fStack_93a0;
  float fStack_939c;
  float local_9398 [2];
  float afStack_9390 [2];
  float local_9388;
  float fStack_9384;
  float fStack_9380;
  float fStack_937c;
  float local_9378 [2];
  float afStack_9370 [2];
  float local_9368;
  float fStack_9364;
  float fStack_9360;
  float fStack_935c;
  float local_9358 [2];
  float afStack_9350 [2];
  float local_9348;
  float fStack_9344;
  float fStack_9340;
  float fStack_933c;
  float local_9338 [2];
  float afStack_9330 [2];
  float local_9328;
  float fStack_9324;
  float fStack_9320;
  float fStack_931c;
  undefined8 local_9318;
  undefined8 uStack_9310;
  float local_9308;
  float fStack_9304;
  float fStack_9300;
  float fStack_92fc;
  undefined8 local_92f8;
  undefined8 uStack_92f0;
  undefined8 local_92e8;
  undefined8 uStack_92e0;
  undefined8 local_92d8;
  undefined8 uStack_92d0;
  undefined8 local_92c8;
  undefined8 uStack_92c0;
  undefined8 local_92b8;
  undefined8 uStack_92b0;
  undefined8 local_92a8;
  undefined8 uStack_92a0;
  undefined8 local_9298;
  undefined8 uStack_9290;
  undefined8 local_9288;
  undefined8 uStack_9280;
  float local_9278;
  float fStack_9274;
  float fStack_9270;
  float fStack_926c;
  float local_9268;
  float fStack_9264;
  float fStack_9260;
  float fStack_925c;
  undefined8 local_9258;
  undefined8 uStack_9250;
  undefined8 local_9248;
  undefined8 uStack_9240;
  undefined8 local_9238;
  undefined8 uStack_9230;
  undefined8 local_9228;
  undefined8 uStack_9220;
  undefined8 local_9218;
  undefined8 uStack_9210;
  undefined8 local_9208;
  undefined8 uStack_9200;
  undefined8 local_91f8;
  undefined8 uStack_91f0;
  undefined8 local_91e8;
  undefined8 uStack_91e0;
  undefined8 local_91d8;
  undefined8 uStack_91d0;
  undefined8 *local_91c0;
  undefined8 *local_91b8;
  undefined8 *local_91b0;
  undefined8 local_91a8;
  undefined8 uStack_91a0;
  undefined8 local_9198;
  undefined8 uStack_9190;
  float *local_9180;
  undefined8 *local_9178;
  undefined8 *local_9170;
  undefined8 local_9168;
  undefined8 uStack_9160;
  undefined8 local_9158;
  undefined8 uStack_9150;
  float *local_9140;
  undefined8 *local_9138;
  undefined8 *local_9130;
  undefined8 local_9128;
  undefined8 uStack_9120;
  undefined8 local_9118;
  undefined8 uStack_9110;
  float *local_9100;
  undefined8 *local_90f8;
  undefined8 *local_90f0;
  undefined8 local_90e8;
  undefined8 uStack_90e0;
  undefined8 local_90d8;
  undefined8 uStack_90d0;
  float *local_90c0;
  undefined8 *local_90b8;
  undefined8 *local_90b0;
  undefined8 local_90a8;
  undefined8 uStack_90a0;
  undefined8 local_9098;
  undefined8 uStack_9090;
  float *local_9080;
  undefined8 *local_9078;
  undefined8 *local_9070;
  undefined8 local_9068;
  undefined8 uStack_9060;
  undefined8 local_9058;
  undefined8 uStack_9050;
  undefined8 local_9048;
  undefined8 uStack_9040;
  undefined8 local_9038;
  undefined8 uStack_9030;
  undefined8 local_9028;
  undefined8 uStack_9020;
  undefined8 local_9018;
  undefined8 uStack_9010;
  undefined8 local_9008;
  undefined8 uStack_9000;
  float local_8ff8 [2];
  float afStack_8ff0 [2];
  float local_8fe8;
  float fStack_8fe4;
  float fStack_8fe0;
  float fStack_8fdc;
  float local_8fd8 [2];
  float afStack_8fd0 [2];
  float local_8fc8;
  float fStack_8fc4;
  float fStack_8fc0;
  float fStack_8fbc;
  float local_8fb8 [2];
  float afStack_8fb0 [2];
  float local_8fa8;
  float fStack_8fa4;
  float fStack_8fa0;
  float fStack_8f9c;
  float local_8f98 [2];
  float afStack_8f90 [2];
  float local_8f88;
  float fStack_8f84;
  float fStack_8f80;
  float fStack_8f7c;
  float local_8f78 [2];
  float afStack_8f70 [2];
  float local_8f68;
  float fStack_8f64;
  float fStack_8f60;
  float fStack_8f5c;
  undefined8 local_8f58;
  undefined8 uStack_8f50;
  float local_8f48;
  float fStack_8f44;
  float fStack_8f40;
  float fStack_8f3c;
  undefined8 local_8f38;
  undefined8 uStack_8f30;
  undefined8 local_8f28;
  undefined8 uStack_8f20;
  undefined8 local_8f18;
  undefined8 uStack_8f10;
  undefined8 local_8f08;
  undefined8 uStack_8f00;
  undefined8 local_8ef8;
  undefined8 uStack_8ef0;
  undefined8 local_8ee8;
  undefined8 uStack_8ee0;
  undefined8 local_8ed8;
  undefined8 uStack_8ed0;
  undefined8 local_8ec8;
  undefined8 uStack_8ec0;
  float local_8eb8;
  float fStack_8eb4;
  float fStack_8eb0;
  float fStack_8eac;
  float local_8ea8;
  float fStack_8ea4;
  float fStack_8ea0;
  float fStack_8e9c;
  undefined8 local_8e98;
  undefined8 uStack_8e90;
  undefined8 local_8e88;
  undefined8 uStack_8e80;
  undefined8 local_8e78;
  undefined8 uStack_8e70;
  undefined8 local_8e68;
  undefined8 uStack_8e60;
  undefined8 local_8e58;
  undefined8 uStack_8e50;
  undefined8 local_8e48;
  undefined8 uStack_8e40;
  undefined8 local_8e38;
  undefined8 uStack_8e30;
  undefined8 local_8e28;
  undefined8 uStack_8e20;
  undefined8 local_8e18;
  undefined8 uStack_8e10;
  undefined8 *local_8e00;
  undefined8 *local_8df8;
  undefined8 *local_8df0;
  undefined8 local_8de8;
  undefined8 uStack_8de0;
  undefined8 local_8dd8;
  undefined8 uStack_8dd0;
  float *local_8dc0;
  undefined8 *local_8db8;
  undefined8 *local_8db0;
  undefined8 local_8da8;
  undefined8 uStack_8da0;
  undefined8 local_8d98;
  undefined8 uStack_8d90;
  float *local_8d80;
  undefined8 *local_8d78;
  undefined8 *local_8d70;
  undefined8 local_8d68;
  undefined8 uStack_8d60;
  undefined8 local_8d58;
  undefined8 uStack_8d50;
  float *local_8d40;
  undefined8 *local_8d38;
  undefined8 *local_8d30;
  undefined8 local_8d28;
  undefined8 uStack_8d20;
  undefined8 local_8d18;
  undefined8 uStack_8d10;
  float *local_8d00;
  undefined8 *local_8cf8;
  undefined8 *local_8cf0;
  undefined8 local_8ce8;
  undefined8 uStack_8ce0;
  undefined8 local_8cd8;
  undefined8 uStack_8cd0;
  float *local_8cc0;
  undefined8 *local_8cb8;
  undefined8 *local_8cb0;
  undefined8 local_8ca8;
  undefined8 uStack_8ca0;
  undefined8 local_8c98;
  undefined8 uStack_8c90;
  undefined8 local_8c88;
  undefined8 uStack_8c80;
  undefined8 local_8c78;
  undefined8 uStack_8c70;
  undefined8 local_8c68;
  undefined8 uStack_8c60;
  undefined8 local_8c58;
  undefined8 uStack_8c50;
  undefined8 local_8c48;
  undefined8 uStack_8c40;
  float local_8c38 [2];
  float afStack_8c30 [2];
  float local_8c28;
  float fStack_8c24;
  float fStack_8c20;
  float fStack_8c1c;
  float local_8c18 [2];
  float afStack_8c10 [2];
  float local_8c08;
  float fStack_8c04;
  float fStack_8c00;
  float fStack_8bfc;
  float local_8bf8 [2];
  float afStack_8bf0 [2];
  float local_8be8;
  float fStack_8be4;
  float fStack_8be0;
  float fStack_8bdc;
  float local_8bd8 [2];
  float afStack_8bd0 [2];
  float local_8bc8;
  float fStack_8bc4;
  float fStack_8bc0;
  float fStack_8bbc;
  float local_8bb8 [2];
  float afStack_8bb0 [2];
  float local_8ba8;
  float fStack_8ba4;
  float fStack_8ba0;
  float fStack_8b9c;
  undefined8 local_8b98;
  undefined8 uStack_8b90;
  float local_8b88;
  float fStack_8b84;
  float fStack_8b80;
  float fStack_8b7c;
  undefined8 local_8b78;
  undefined8 uStack_8b70;
  undefined8 local_8b68;
  undefined8 uStack_8b60;
  undefined8 local_8b58;
  undefined8 uStack_8b50;
  undefined8 local_8b48;
  undefined8 uStack_8b40;
  undefined8 local_8b38;
  undefined8 uStack_8b30;
  undefined8 local_8b28;
  undefined8 uStack_8b20;
  undefined8 local_8b18;
  undefined8 uStack_8b10;
  undefined8 local_8b08;
  undefined8 uStack_8b00;
  float local_8af8;
  float fStack_8af4;
  float fStack_8af0;
  float fStack_8aec;
  float local_8ae8;
  float fStack_8ae4;
  float fStack_8ae0;
  float fStack_8adc;
  undefined8 local_8ad8;
  undefined8 uStack_8ad0;
  undefined8 local_8ac8;
  undefined8 uStack_8ac0;
  undefined8 local_8ab8;
  undefined8 uStack_8ab0;
  undefined8 local_8aa8;
  undefined8 uStack_8aa0;
  undefined8 local_8a98;
  undefined8 uStack_8a90;
  undefined8 local_8a88;
  undefined8 uStack_8a80;
  undefined8 local_8a78;
  undefined8 uStack_8a70;
  undefined8 local_8a68;
  undefined8 uStack_8a60;
  undefined8 local_8a58;
  undefined8 uStack_8a50;
  undefined8 *local_8a40;
  undefined8 *local_8a38;
  undefined8 *local_8a30;
  undefined8 local_8a28;
  undefined8 uStack_8a20;
  undefined8 local_8a18;
  undefined8 uStack_8a10;
  float *local_8a00;
  undefined8 *local_89f8;
  undefined8 *local_89f0;
  undefined8 local_89e8;
  undefined8 uStack_89e0;
  undefined8 local_89d8;
  undefined8 uStack_89d0;
  float *local_89c0;
  undefined8 *local_89b8;
  undefined8 *local_89b0;
  undefined8 local_89a8;
  undefined8 uStack_89a0;
  undefined8 local_8998;
  undefined8 uStack_8990;
  float *local_8980;
  undefined8 *local_8978;
  undefined8 *local_8970;
  undefined8 local_8968;
  undefined8 uStack_8960;
  undefined8 local_8958;
  undefined8 uStack_8950;
  float *local_8940;
  undefined8 *local_8938;
  undefined8 *local_8930;
  undefined8 local_8928;
  undefined8 uStack_8920;
  undefined8 local_8918;
  undefined8 uStack_8910;
  float *local_8900;
  undefined8 *local_88f8;
  undefined8 *local_88f0;
  undefined8 local_88e8;
  undefined8 uStack_88e0;
  undefined8 local_88d8;
  undefined8 uStack_88d0;
  undefined8 local_88c8;
  undefined8 uStack_88c0;
  undefined8 local_88b8;
  undefined8 uStack_88b0;
  undefined8 local_88a8;
  undefined8 uStack_88a0;
  undefined8 local_8898;
  undefined8 uStack_8890;
  undefined8 local_8888;
  undefined8 uStack_8880;
  float local_8878 [2];
  float afStack_8870 [2];
  float local_8868;
  float fStack_8864;
  float fStack_8860;
  float fStack_885c;
  float local_8858 [2];
  float afStack_8850 [2];
  float local_8848;
  float fStack_8844;
  float fStack_8840;
  float fStack_883c;
  float local_8838 [2];
  float afStack_8830 [2];
  float local_8828;
  float fStack_8824;
  float fStack_8820;
  float fStack_881c;
  float local_8818 [2];
  float afStack_8810 [2];
  float local_8808;
  float fStack_8804;
  float fStack_8800;
  float fStack_87fc;
  float local_87f8 [2];
  float afStack_87f0 [2];
  float local_87e8;
  float fStack_87e4;
  float fStack_87e0;
  float fStack_87dc;
  undefined8 local_87d8;
  undefined8 uStack_87d0;
  float local_87c8;
  float fStack_87c4;
  float fStack_87c0;
  float fStack_87bc;
  undefined8 local_87b8;
  undefined8 uStack_87b0;
  undefined8 local_87a8;
  undefined8 uStack_87a0;
  undefined8 local_8798;
  undefined8 uStack_8790;
  undefined8 local_8788;
  undefined8 uStack_8780;
  undefined8 local_8778;
  undefined8 uStack_8770;
  undefined8 local_8768;
  undefined8 uStack_8760;
  undefined8 local_8758;
  undefined8 uStack_8750;
  undefined8 local_8748;
  undefined8 uStack_8740;
  float local_8738;
  float fStack_8734;
  float fStack_8730;
  float fStack_872c;
  float local_8728;
  float fStack_8724;
  float fStack_8720;
  float fStack_871c;
  undefined8 local_8718;
  undefined8 uStack_8710;
  undefined8 local_8708;
  undefined8 uStack_8700;
  undefined8 local_86f8;
  undefined8 uStack_86f0;
  undefined8 local_86e8;
  undefined8 uStack_86e0;
  undefined8 local_86d8;
  undefined8 uStack_86d0;
  undefined8 local_86c8;
  undefined8 uStack_86c0;
  undefined8 local_86b8;
  undefined8 uStack_86b0;
  undefined8 local_86a8;
  undefined8 uStack_86a0;
  undefined8 local_8698;
  undefined8 uStack_8690;
  undefined8 *local_8680;
  undefined8 *local_8678;
  undefined8 *local_8670;
  undefined8 local_8668;
  undefined8 uStack_8660;
  undefined8 local_8658;
  undefined8 uStack_8650;
  float *local_8640;
  undefined8 *local_8638;
  undefined8 *local_8630;
  undefined8 local_8628;
  undefined8 uStack_8620;
  undefined8 local_8618;
  undefined8 uStack_8610;
  float *local_8600;
  undefined8 *local_85f8;
  undefined8 *local_85f0;
  undefined8 local_85e8;
  undefined8 uStack_85e0;
  undefined8 local_85d8;
  undefined8 uStack_85d0;
  float *local_85c0;
  undefined8 *local_85b8;
  undefined8 *local_85b0;
  undefined8 local_85a8;
  undefined8 uStack_85a0;
  undefined8 local_8598;
  undefined8 uStack_8590;
  float *local_8580;
  undefined8 *local_8578;
  undefined8 *local_8570;
  undefined8 local_8568;
  undefined8 uStack_8560;
  undefined8 local_8558;
  undefined8 uStack_8550;
  float *local_8540;
  undefined8 *local_8538;
  undefined8 *local_8530;
  undefined8 local_8528;
  undefined8 uStack_8520;
  undefined8 local_8518;
  undefined8 uStack_8510;
  undefined8 local_8508;
  undefined8 uStack_8500;
  undefined8 local_84f8;
  undefined8 uStack_84f0;
  undefined8 local_84e8;
  undefined8 uStack_84e0;
  undefined8 local_84d8;
  undefined8 uStack_84d0;
  undefined8 local_84c8;
  undefined8 uStack_84c0;
  float local_84b8 [2];
  float afStack_84b0 [2];
  float local_84a8;
  float fStack_84a4;
  float fStack_84a0;
  float fStack_849c;
  float local_8498 [2];
  float afStack_8490 [2];
  float local_8488;
  float fStack_8484;
  float fStack_8480;
  float fStack_847c;
  float local_8478 [2];
  float afStack_8470 [2];
  float local_8468;
  float fStack_8464;
  float fStack_8460;
  float fStack_845c;
  float local_8458 [2];
  float afStack_8450 [2];
  float local_8448;
  float fStack_8444;
  float fStack_8440;
  float fStack_843c;
  float local_8438 [2];
  float afStack_8430 [2];
  float local_8428;
  float fStack_8424;
  float fStack_8420;
  float fStack_841c;
  undefined8 local_8418;
  undefined8 uStack_8410;
  float local_8408;
  float fStack_8404;
  float fStack_8400;
  float fStack_83fc;
  undefined8 local_83f8;
  undefined8 uStack_83f0;
  undefined8 local_83e8;
  undefined8 uStack_83e0;
  undefined8 local_83d8;
  undefined8 uStack_83d0;
  undefined8 local_83c8;
  undefined8 uStack_83c0;
  undefined8 local_83b8;
  undefined8 uStack_83b0;
  undefined8 local_83a8;
  undefined8 uStack_83a0;
  undefined8 local_8398;
  undefined8 uStack_8390;
  undefined8 local_8388;
  undefined8 uStack_8380;
  float local_8378;
  float fStack_8374;
  float fStack_8370;
  float fStack_836c;
  float local_8368;
  float fStack_8364;
  float fStack_8360;
  float fStack_835c;
  undefined8 local_8358;
  undefined8 uStack_8350;
  undefined8 local_8348;
  undefined8 uStack_8340;
  undefined8 local_8338;
  undefined8 uStack_8330;
  undefined8 local_8328;
  undefined8 uStack_8320;
  undefined8 local_8318;
  undefined8 uStack_8310;
  undefined8 local_8308;
  undefined8 uStack_8300;
  undefined8 local_82f8;
  undefined8 uStack_82f0;
  undefined8 local_82e8;
  undefined8 uStack_82e0;
  undefined8 local_82d8;
  undefined8 uStack_82d0;
  undefined8 *local_82c0;
  undefined8 *local_82b8;
  undefined8 *local_82b0;
  undefined8 local_82a8;
  undefined8 uStack_82a0;
  undefined8 local_8298;
  undefined8 uStack_8290;
  float *local_8280;
  undefined8 *local_8278;
  undefined8 *local_8270;
  undefined8 local_8268;
  undefined8 uStack_8260;
  undefined8 local_8258;
  undefined8 uStack_8250;
  float *local_8240;
  undefined8 *local_8238;
  undefined8 *local_8230;
  undefined8 local_8228;
  undefined8 uStack_8220;
  undefined8 local_8218;
  undefined8 uStack_8210;
  float *local_8200;
  undefined8 *local_81f8;
  undefined8 *local_81f0;
  undefined8 local_81e8;
  undefined8 uStack_81e0;
  undefined8 local_81d8;
  undefined8 uStack_81d0;
  float *local_81c0;
  undefined8 *local_81b8;
  undefined8 *local_81b0;
  undefined8 local_81a8;
  undefined8 uStack_81a0;
  undefined8 local_8198;
  undefined8 uStack_8190;
  float *local_8180;
  undefined8 *local_8178;
  undefined8 *local_8170;
  undefined8 local_8168;
  undefined8 uStack_8160;
  undefined8 local_8158;
  undefined8 uStack_8150;
  undefined8 local_8148;
  undefined8 uStack_8140;
  undefined8 local_8138;
  undefined8 uStack_8130;
  undefined8 local_8128;
  undefined8 uStack_8120;
  undefined8 local_8118;
  undefined8 uStack_8110;
  undefined8 local_8108;
  undefined8 uStack_8100;
  float local_80f8 [2];
  float afStack_80f0 [2];
  float local_80e8;
  float fStack_80e4;
  float fStack_80e0;
  float fStack_80dc;
  float local_80d8 [2];
  float afStack_80d0 [2];
  float local_80c8;
  float fStack_80c4;
  float fStack_80c0;
  float fStack_80bc;
  float local_80b8 [2];
  float afStack_80b0 [2];
  float local_80a8;
  float fStack_80a4;
  float fStack_80a0;
  float fStack_809c;
  float local_8098 [2];
  float afStack_8090 [2];
  float local_8088;
  float fStack_8084;
  float fStack_8080;
  float fStack_807c;
  float local_8078 [2];
  float afStack_8070 [2];
  float local_8068;
  float fStack_8064;
  float fStack_8060;
  float fStack_805c;
  undefined8 local_8058;
  undefined8 uStack_8050;
  float local_8048;
  float fStack_8044;
  float fStack_8040;
  float fStack_803c;
  undefined8 local_8038;
  undefined8 uStack_8030;
  undefined8 local_8028;
  undefined8 uStack_8020;
  undefined8 local_8018;
  undefined8 uStack_8010;
  undefined8 local_8008;
  undefined8 uStack_8000;
  undefined8 local_7ff8;
  undefined8 uStack_7ff0;
  undefined8 local_7fe8;
  undefined8 uStack_7fe0;
  undefined8 local_7fd8;
  undefined8 uStack_7fd0;
  undefined8 local_7fc8;
  undefined8 uStack_7fc0;
  float local_7fb8;
  float fStack_7fb4;
  float fStack_7fb0;
  float fStack_7fac;
  float local_7fa8;
  float fStack_7fa4;
  float fStack_7fa0;
  float fStack_7f9c;
  undefined8 local_7f98;
  undefined8 uStack_7f90;
  undefined8 local_7f88;
  undefined8 uStack_7f80;
  undefined8 local_7f78;
  undefined8 uStack_7f70;
  undefined8 local_7f68;
  undefined8 uStack_7f60;
  undefined8 local_7f58;
  undefined8 uStack_7f50;
  undefined8 local_7f48;
  undefined8 uStack_7f40;
  undefined8 local_7f38;
  undefined8 uStack_7f30;
  undefined8 local_7f28;
  undefined8 uStack_7f20;
  undefined8 local_7f18;
  undefined8 uStack_7f10;
  undefined8 *local_7f00;
  undefined8 *local_7ef8;
  undefined8 *local_7ef0;
  undefined8 local_7ee8;
  undefined8 uStack_7ee0;
  undefined8 local_7ed8;
  undefined8 uStack_7ed0;
  float *local_7ec0;
  undefined8 *local_7eb8;
  undefined8 *local_7eb0;
  undefined8 local_7ea8;
  undefined8 uStack_7ea0;
  undefined8 local_7e98;
  undefined8 uStack_7e90;
  float *local_7e80;
  undefined8 *local_7e78;
  undefined8 *local_7e70;
  undefined8 local_7e68;
  undefined8 uStack_7e60;
  undefined8 local_7e58;
  undefined8 uStack_7e50;
  float *local_7e40;
  undefined8 *local_7e38;
  undefined8 *local_7e30;
  undefined8 local_7e28;
  undefined8 uStack_7e20;
  undefined8 local_7e18;
  undefined8 uStack_7e10;
  float *local_7e00;
  undefined8 *local_7df8;
  undefined8 *local_7df0;
  undefined8 local_7de8;
  undefined8 uStack_7de0;
  undefined8 local_7dd8;
  undefined8 uStack_7dd0;
  float *local_7dc0;
  undefined8 *local_7db8;
  undefined8 *local_7db0;
  undefined8 local_7da8;
  undefined8 uStack_7da0;
  undefined8 local_7d98;
  undefined8 uStack_7d90;
  undefined8 local_7d88;
  undefined8 uStack_7d80;
  undefined8 local_7d78;
  undefined8 uStack_7d70;
  undefined8 local_7d68;
  undefined8 uStack_7d60;
  undefined8 local_7d58;
  undefined8 uStack_7d50;
  undefined8 local_7d48;
  undefined8 uStack_7d40;
  float local_7d38 [2];
  float afStack_7d30 [2];
  float local_7d28;
  float fStack_7d24;
  float fStack_7d20;
  float fStack_7d1c;
  float local_7d18 [2];
  float afStack_7d10 [2];
  float local_7d08;
  float fStack_7d04;
  float fStack_7d00;
  float fStack_7cfc;
  float local_7cf8 [2];
  float afStack_7cf0 [2];
  float local_7ce8;
  float fStack_7ce4;
  float fStack_7ce0;
  float fStack_7cdc;
  float local_7cd8 [2];
  float afStack_7cd0 [2];
  float local_7cc8;
  float fStack_7cc4;
  float fStack_7cc0;
  float fStack_7cbc;
  float local_7cb8 [2];
  float afStack_7cb0 [2];
  float local_7ca8;
  float fStack_7ca4;
  float fStack_7ca0;
  float fStack_7c9c;
  undefined8 local_7c98;
  undefined8 uStack_7c90;
  float local_7c88;
  float fStack_7c84;
  float fStack_7c80;
  float fStack_7c7c;
  undefined8 local_7c78;
  undefined8 uStack_7c70;
  undefined8 local_7c68;
  undefined8 uStack_7c60;
  undefined8 local_7c58;
  undefined8 uStack_7c50;
  undefined8 local_7c48;
  undefined8 uStack_7c40;
  undefined8 local_7c38;
  undefined8 uStack_7c30;
  undefined8 local_7c28;
  undefined8 uStack_7c20;
  undefined8 local_7c18;
  undefined8 uStack_7c10;
  undefined8 local_7c08;
  undefined8 uStack_7c00;
  float local_7bf8;
  float fStack_7bf4;
  float fStack_7bf0;
  float fStack_7bec;
  float local_7be8;
  float fStack_7be4;
  float fStack_7be0;
  float fStack_7bdc;
  undefined8 local_7bd8;
  undefined8 uStack_7bd0;
  undefined8 local_7bc8;
  undefined8 uStack_7bc0;
  undefined8 local_7bb8;
  undefined8 uStack_7bb0;
  undefined8 local_7ba8;
  undefined8 uStack_7ba0;
  undefined8 local_7b98;
  undefined8 uStack_7b90;
  undefined8 local_7b88;
  undefined8 uStack_7b80;
  undefined8 local_7b78;
  undefined8 uStack_7b70;
  undefined8 local_7b68;
  undefined8 uStack_7b60;
  undefined8 local_7b58;
  undefined8 uStack_7b50;
  undefined8 *local_7b40;
  undefined8 *local_7b38;
  undefined8 *local_7b30;
  undefined8 local_7b28;
  undefined8 uStack_7b20;
  undefined8 local_7b18;
  undefined8 uStack_7b10;
  float *local_7b00;
  undefined8 *local_7af8;
  undefined8 *local_7af0;
  undefined8 local_7ae8;
  undefined8 uStack_7ae0;
  undefined8 local_7ad8;
  undefined8 uStack_7ad0;
  float *local_7ac0;
  undefined8 *local_7ab8;
  undefined8 *local_7ab0;
  undefined8 local_7aa8;
  undefined8 uStack_7aa0;
  undefined8 local_7a98;
  undefined8 uStack_7a90;
  float *local_7a80;
  undefined8 *local_7a78;
  undefined8 *local_7a70;
  undefined8 local_7a68;
  undefined8 uStack_7a60;
  undefined8 local_7a58;
  undefined8 uStack_7a50;
  float *local_7a40;
  undefined8 *local_7a38;
  undefined8 *local_7a30;
  undefined8 local_7a28;
  undefined8 uStack_7a20;
  undefined8 local_7a18;
  undefined8 uStack_7a10;
  float *local_7a00;
  undefined8 *local_79f8;
  undefined8 *local_79f0;
  undefined8 local_79e8;
  undefined8 uStack_79e0;
  undefined8 local_79d8;
  undefined8 uStack_79d0;
  undefined8 local_79c8;
  undefined8 uStack_79c0;
  undefined8 local_79b8;
  undefined8 uStack_79b0;
  undefined8 local_79a8;
  undefined8 uStack_79a0;
  undefined8 local_7998;
  undefined8 uStack_7990;
  undefined8 local_7988;
  undefined8 uStack_7980;
  float local_7978 [2];
  float afStack_7970 [2];
  float local_7968;
  float fStack_7964;
  float fStack_7960;
  float fStack_795c;
  float local_7958 [2];
  float afStack_7950 [2];
  float local_7948;
  float fStack_7944;
  float fStack_7940;
  float fStack_793c;
  float local_7938 [2];
  float afStack_7930 [2];
  float local_7928;
  float fStack_7924;
  float fStack_7920;
  float fStack_791c;
  float local_7918 [2];
  float afStack_7910 [2];
  float local_7908;
  float fStack_7904;
  float fStack_7900;
  float fStack_78fc;
  float local_78f8 [2];
  float afStack_78f0 [2];
  float local_78e8;
  float fStack_78e4;
  float fStack_78e0;
  float fStack_78dc;
  undefined8 local_78d8;
  undefined8 uStack_78d0;
  float local_78c8;
  float fStack_78c4;
  float fStack_78c0;
  float fStack_78bc;
  undefined8 local_78b8;
  undefined8 uStack_78b0;
  undefined8 local_78a8;
  undefined8 uStack_78a0;
  undefined8 local_7898;
  undefined8 uStack_7890;
  undefined8 local_7888;
  undefined8 uStack_7880;
  undefined8 local_7878;
  undefined8 uStack_7870;
  undefined8 local_7868;
  undefined8 uStack_7860;
  undefined8 local_7858;
  undefined8 uStack_7850;
  undefined8 local_7848;
  undefined8 uStack_7840;
  float local_7838;
  float fStack_7834;
  float fStack_7830;
  float fStack_782c;
  float local_7828;
  float fStack_7824;
  float fStack_7820;
  float fStack_781c;
  undefined8 local_7818;
  undefined8 uStack_7810;
  undefined8 local_7808;
  undefined8 uStack_7800;
  undefined8 local_77f8;
  undefined8 uStack_77f0;
  undefined8 local_77e8;
  undefined8 uStack_77e0;
  undefined8 local_77d8;
  undefined8 uStack_77d0;
  undefined8 local_77c8;
  undefined8 uStack_77c0;
  undefined8 local_77b8;
  undefined8 uStack_77b0;
  undefined8 local_77a8;
  undefined8 uStack_77a0;
  undefined8 local_7798;
  undefined8 uStack_7790;
  undefined8 *local_7780;
  undefined8 *local_7778;
  undefined8 *local_7770;
  undefined8 local_7768;
  undefined8 uStack_7760;
  undefined8 local_7758;
  undefined8 uStack_7750;
  float *local_7740;
  undefined8 *local_7738;
  undefined8 *local_7730;
  undefined8 local_7728;
  undefined8 uStack_7720;
  undefined8 local_7718;
  undefined8 uStack_7710;
  float *local_7700;
  undefined8 *local_76f8;
  undefined8 *local_76f0;
  undefined8 local_76e8;
  undefined8 uStack_76e0;
  undefined8 local_76d8;
  undefined8 uStack_76d0;
  float *local_76c0;
  undefined8 *local_76b8;
  undefined8 *local_76b0;
  undefined8 local_76a8;
  undefined8 uStack_76a0;
  undefined8 local_7698;
  undefined8 uStack_7690;
  float *local_7680;
  undefined8 *local_7678;
  undefined8 *local_7670;
  undefined8 local_7668;
  undefined8 uStack_7660;
  undefined8 local_7658;
  undefined8 uStack_7650;
  float *local_7640;
  undefined8 *local_7638;
  undefined8 *local_7630;
  undefined8 local_7628;
  undefined8 uStack_7620;
  undefined8 local_7618;
  undefined8 uStack_7610;
  undefined8 local_7608;
  undefined8 uStack_7600;
  undefined8 local_75f8;
  undefined8 uStack_75f0;
  undefined8 local_75e8;
  undefined8 uStack_75e0;
  undefined8 local_75d8;
  undefined8 uStack_75d0;
  undefined8 local_75c8;
  undefined8 uStack_75c0;
  float local_75b8 [2];
  float afStack_75b0 [2];
  float local_75a8;
  float fStack_75a4;
  float fStack_75a0;
  float fStack_759c;
  float local_7598 [2];
  float afStack_7590 [2];
  float local_7588;
  float fStack_7584;
  float fStack_7580;
  float fStack_757c;
  float local_7578 [2];
  float afStack_7570 [2];
  float local_7568;
  float fStack_7564;
  float fStack_7560;
  float fStack_755c;
  float local_7558 [2];
  float afStack_7550 [2];
  float local_7548;
  float fStack_7544;
  float fStack_7540;
  float fStack_753c;
  float local_7538 [2];
  float afStack_7530 [2];
  float local_7528;
  float fStack_7524;
  float fStack_7520;
  float fStack_751c;
  undefined8 local_7518;
  undefined8 uStack_7510;
  float local_7508;
  float fStack_7504;
  float fStack_7500;
  float fStack_74fc;
  undefined8 local_74f8;
  undefined8 uStack_74f0;
  undefined8 local_74e8;
  undefined8 uStack_74e0;
  undefined8 local_74d8;
  undefined8 uStack_74d0;
  undefined8 local_74c8;
  undefined8 uStack_74c0;
  undefined8 local_74b8;
  undefined8 uStack_74b0;
  undefined8 local_74a8;
  undefined8 uStack_74a0;
  undefined8 local_7498;
  undefined8 uStack_7490;
  undefined8 local_7488;
  undefined8 uStack_7480;
  float local_7478;
  float fStack_7474;
  float fStack_7470;
  float fStack_746c;
  float local_7468;
  float fStack_7464;
  float fStack_7460;
  float fStack_745c;
  undefined8 local_7458;
  undefined8 uStack_7450;
  undefined8 local_7448;
  undefined8 uStack_7440;
  undefined8 local_7438;
  undefined8 uStack_7430;
  undefined8 local_7428;
  undefined8 uStack_7420;
  undefined8 local_7418;
  undefined8 uStack_7410;
  undefined8 local_7408;
  undefined8 uStack_7400;
  undefined8 local_73f8;
  undefined8 uStack_73f0;
  undefined8 local_73e8;
  undefined8 uStack_73e0;
  undefined8 local_73d8;
  undefined8 uStack_73d0;
  undefined8 *local_73c0;
  undefined8 *local_73b8;
  undefined8 *local_73b0;
  undefined8 local_73a8;
  undefined8 uStack_73a0;
  undefined8 local_7398;
  undefined8 uStack_7390;
  float *local_7380;
  undefined8 *local_7378;
  undefined8 *local_7370;
  undefined8 local_7368;
  undefined8 uStack_7360;
  undefined8 local_7358;
  undefined8 uStack_7350;
  float *local_7340;
  undefined8 *local_7338;
  undefined8 *local_7330;
  undefined8 local_7328;
  undefined8 uStack_7320;
  undefined8 local_7318;
  undefined8 uStack_7310;
  float *local_7300;
  undefined8 *local_72f8;
  undefined8 *local_72f0;
  undefined8 local_72e8;
  undefined8 uStack_72e0;
  undefined8 local_72d8;
  undefined8 uStack_72d0;
  float *local_72c0;
  undefined8 *local_72b8;
  undefined8 *local_72b0;
  undefined8 local_72a8;
  undefined8 uStack_72a0;
  undefined8 local_7298;
  undefined8 uStack_7290;
  float *local_7280;
  undefined8 *local_7278;
  undefined8 *local_7270;
  undefined8 local_7268;
  undefined8 uStack_7260;
  undefined8 local_7258;
  undefined8 uStack_7250;
  undefined8 local_7248;
  undefined8 uStack_7240;
  undefined8 local_7238;
  undefined8 uStack_7230;
  undefined8 local_7228;
  undefined8 uStack_7220;
  undefined8 local_7218;
  undefined8 uStack_7210;
  undefined8 local_7208;
  undefined8 uStack_7200;
  float local_71f8 [2];
  float afStack_71f0 [2];
  float local_71e8;
  float fStack_71e4;
  float fStack_71e0;
  float fStack_71dc;
  float local_71d8 [2];
  float afStack_71d0 [2];
  float local_71c8;
  float fStack_71c4;
  float fStack_71c0;
  float fStack_71bc;
  float local_71b8 [2];
  float afStack_71b0 [2];
  float local_71a8;
  float fStack_71a4;
  float fStack_71a0;
  float fStack_719c;
  float local_7198 [2];
  float afStack_7190 [2];
  float local_7188;
  float fStack_7184;
  float fStack_7180;
  float fStack_717c;
  float local_7178 [2];
  float afStack_7170 [2];
  float local_7168;
  float fStack_7164;
  float fStack_7160;
  float fStack_715c;
  undefined8 local_7158;
  undefined8 uStack_7150;
  float local_7148;
  float fStack_7144;
  float fStack_7140;
  float fStack_713c;
  undefined8 local_7138;
  undefined8 uStack_7130;
  undefined8 local_7128;
  undefined8 uStack_7120;
  undefined8 local_7118;
  undefined8 uStack_7110;
  undefined8 local_7108;
  undefined8 uStack_7100;
  undefined8 local_70f8;
  undefined8 uStack_70f0;
  undefined8 local_70e8;
  undefined8 uStack_70e0;
  undefined8 local_70d8;
  undefined8 uStack_70d0;
  undefined8 local_70c8;
  undefined8 uStack_70c0;
  float local_70b8;
  float fStack_70b4;
  float fStack_70b0;
  float fStack_70ac;
  float local_70a8;
  float fStack_70a4;
  float fStack_70a0;
  float fStack_709c;
  undefined8 local_7098;
  undefined8 uStack_7090;
  undefined8 local_7088;
  undefined8 uStack_7080;
  undefined8 local_7078;
  undefined8 uStack_7070;
  undefined8 local_7068;
  undefined8 uStack_7060;
  undefined8 local_7058;
  undefined8 uStack_7050;
  undefined8 local_7048;
  undefined8 uStack_7040;
  undefined8 local_7038;
  undefined8 uStack_7030;
  undefined8 local_7028;
  undefined8 uStack_7020;
  undefined8 local_7018;
  undefined8 uStack_7010;
  undefined8 *local_7000;
  undefined8 *local_6ff8;
  undefined8 *local_6ff0;
  undefined8 local_6fe8;
  undefined8 uStack_6fe0;
  undefined8 local_6fd8;
  undefined8 uStack_6fd0;
  float *local_6fc0;
  undefined8 *local_6fb8;
  undefined8 *local_6fb0;
  undefined8 local_6fa8;
  undefined8 uStack_6fa0;
  undefined8 local_6f98;
  undefined8 uStack_6f90;
  float *local_6f80;
  undefined8 *local_6f78;
  undefined8 *local_6f70;
  undefined8 local_6f68;
  undefined8 uStack_6f60;
  undefined8 local_6f58;
  undefined8 uStack_6f50;
  float *local_6f40;
  undefined8 *local_6f38;
  undefined8 *local_6f30;
  undefined8 local_6f28;
  undefined8 uStack_6f20;
  undefined8 local_6f18;
  undefined8 uStack_6f10;
  float *local_6f00;
  undefined8 *local_6ef8;
  undefined8 *local_6ef0;
  undefined8 local_6ee8;
  undefined8 uStack_6ee0;
  undefined8 local_6ed8;
  undefined8 uStack_6ed0;
  float *local_6ec0;
  undefined8 *local_6eb8;
  undefined8 *local_6eb0;
  undefined8 local_6ea8;
  undefined8 uStack_6ea0;
  undefined8 local_6e98;
  undefined8 uStack_6e90;
  undefined8 local_6e88;
  undefined8 uStack_6e80;
  undefined8 local_6e78;
  undefined8 uStack_6e70;
  undefined8 local_6e68;
  undefined8 uStack_6e60;
  undefined8 local_6e58;
  undefined8 uStack_6e50;
  undefined8 local_6e48;
  undefined8 uStack_6e40;
  float local_6e38 [2];
  float afStack_6e30 [2];
  float local_6e28;
  float fStack_6e24;
  float fStack_6e20;
  float fStack_6e1c;
  float local_6e18 [2];
  float afStack_6e10 [2];
  float local_6e08;
  float fStack_6e04;
  float fStack_6e00;
  float fStack_6dfc;
  float local_6df8 [2];
  float afStack_6df0 [2];
  float local_6de8;
  float fStack_6de4;
  float fStack_6de0;
  float fStack_6ddc;
  float local_6dd8 [2];
  float afStack_6dd0 [2];
  float local_6dc8;
  float fStack_6dc4;
  float fStack_6dc0;
  float fStack_6dbc;
  float local_6db8 [2];
  float afStack_6db0 [2];
  float local_6da8;
  float fStack_6da4;
  float fStack_6da0;
  float fStack_6d9c;
  undefined8 local_6d98;
  undefined8 uStack_6d90;
  float local_6d88;
  float fStack_6d84;
  float fStack_6d80;
  float fStack_6d7c;
  undefined8 local_6d78;
  undefined8 uStack_6d70;
  undefined8 local_6d68;
  undefined8 uStack_6d60;
  undefined8 local_6d58;
  undefined8 uStack_6d50;
  undefined8 local_6d48;
  undefined8 uStack_6d40;
  undefined8 local_6d38;
  undefined8 uStack_6d30;
  undefined8 local_6d28;
  undefined8 uStack_6d20;
  undefined8 local_6d18;
  undefined8 uStack_6d10;
  undefined8 local_6d08;
  undefined8 uStack_6d00;
  undefined8 local_6cf8;
  undefined8 uStack_6cf0;
  undefined8 local_6ce8;
  undefined8 uStack_6ce0;
  undefined8 local_6cd8;
  undefined8 uStack_6cd0;
  undefined8 local_6cc8;
  undefined8 uStack_6cc0;
  undefined8 local_6cb8;
  undefined8 uStack_6cb0;
  undefined8 local_6ca8;
  undefined8 uStack_6ca0;
  undefined8 local_6c98;
  undefined8 uStack_6c90;
  undefined8 local_6c88;
  undefined8 uStack_6c80;
  undefined8 local_6c78;
  undefined8 uStack_6c70;
  undefined8 local_6c68;
  undefined8 uStack_6c60;
  undefined8 local_6c58;
  undefined8 uStack_6c50;
  undefined8 local_6c48;
  undefined8 uStack_6c40;
  undefined8 local_6c38;
  undefined8 uStack_6c30;
  undefined8 local_6c28;
  undefined8 uStack_6c20;
  undefined8 local_6c18;
  undefined8 uStack_6c10;
  undefined8 local_6c08;
  undefined8 uStack_6c00;
  undefined8 local_6bf8;
  undefined8 uStack_6bf0;
  undefined8 local_6be8;
  undefined8 uStack_6be0;
  undefined8 local_6bd8;
  undefined8 uStack_6bd0;
  undefined8 local_6bc8;
  undefined8 uStack_6bc0;
  undefined8 local_6bb8;
  undefined8 uStack_6bb0;
  undefined8 local_6ba8;
  undefined8 uStack_6ba0;
  undefined8 local_6b98;
  undefined8 uStack_6b90;
  undefined8 local_6b88;
  undefined8 uStack_6b80;
  undefined8 local_6b78;
  undefined8 uStack_6b70;
  undefined8 local_6b68;
  undefined8 uStack_6b60;
  undefined8 local_6b58;
  undefined8 uStack_6b50;
  undefined8 local_6b48;
  undefined8 uStack_6b40;
  undefined8 local_6b38;
  undefined8 uStack_6b30;
  undefined8 local_6b28;
  undefined8 uStack_6b20;
  undefined8 local_6b18;
  undefined8 uStack_6b10;
  undefined8 local_6b08;
  undefined8 uStack_6b00;
  undefined8 local_6af8;
  undefined8 uStack_6af0;
  undefined8 local_6ae8;
  undefined8 uStack_6ae0;
  undefined8 local_6ad8;
  undefined8 uStack_6ad0;
  undefined8 local_6ac8;
  undefined8 uStack_6ac0;
  undefined8 local_6ab8;
  undefined8 uStack_6ab0;
  undefined8 local_6aa8;
  undefined8 uStack_6aa0;
  undefined8 local_6a98;
  undefined8 uStack_6a90;
  undefined8 local_6a88;
  undefined8 uStack_6a80;
  undefined8 local_6a78;
  undefined8 uStack_6a70;
  undefined8 local_6a68;
  undefined8 uStack_6a60;
  undefined8 local_6a58;
  undefined8 uStack_6a50;
  undefined8 local_6a48;
  undefined8 uStack_6a40;
  undefined8 local_6a38;
  undefined8 uStack_6a30;
  undefined8 local_6a28;
  undefined8 uStack_6a20;
  undefined8 local_6a18;
  undefined8 uStack_6a10;
  undefined8 local_6a08;
  undefined8 uStack_6a00;
  undefined8 local_69f8;
  undefined8 uStack_69f0;
  undefined8 local_69e8;
  undefined8 uStack_69e0;
  undefined8 local_69d8;
  undefined8 uStack_69d0;
  undefined8 local_69c8;
  undefined8 uStack_69c0;
  undefined8 local_69b8;
  undefined8 uStack_69b0;
  undefined8 local_69a8;
  undefined8 uStack_69a0;
  undefined8 local_6998;
  undefined8 uStack_6990;
  undefined8 local_6988;
  undefined8 uStack_6980;
  undefined8 local_6978;
  undefined8 uStack_6970;
  undefined8 local_6968;
  undefined8 uStack_6960;
  undefined8 local_6958;
  undefined8 uStack_6950;
  undefined8 local_6948;
  undefined8 uStack_6940;
  undefined8 local_6938;
  undefined8 uStack_6930;
  undefined8 local_6928;
  undefined8 uStack_6920;
  undefined8 local_6918;
  undefined8 uStack_6910;
  undefined8 local_6908;
  undefined8 uStack_6900;
  undefined8 local_68f8;
  undefined8 uStack_68f0;
  undefined8 local_68e8;
  undefined8 uStack_68e0;
  undefined8 local_68d8;
  undefined8 uStack_68d0;
  undefined8 local_68c8;
  undefined8 uStack_68c0;
  undefined8 local_68b8;
  undefined8 uStack_68b0;
  undefined8 local_68a8;
  undefined8 uStack_68a0;
  undefined8 local_6898;
  undefined8 uStack_6890;
  undefined8 local_6888;
  undefined8 uStack_6880;
  undefined8 local_6878;
  undefined8 uStack_6870;
  undefined8 local_6868;
  undefined8 uStack_6860;
  undefined8 local_6858;
  undefined8 uStack_6850;
  undefined8 local_6848;
  undefined8 uStack_6840;
  undefined8 local_6838;
  undefined8 uStack_6830;
  undefined8 local_6828;
  undefined8 uStack_6820;
  undefined8 local_6818;
  undefined8 uStack_6810;
  undefined8 local_6808;
  undefined8 uStack_6800;
  undefined8 local_67f8;
  undefined8 uStack_67f0;
  undefined8 local_67e8;
  undefined8 uStack_67e0;
  undefined8 local_67d8;
  undefined8 uStack_67d0;
  undefined8 local_67c8;
  undefined8 uStack_67c0;
  undefined8 local_67b8;
  undefined8 uStack_67b0;
  undefined8 local_67a8;
  undefined8 uStack_67a0;
  undefined8 local_6798;
  undefined8 uStack_6790;
  ulong local_6788;
  ulong uStack_6780;
  undefined8 local_6778;
  undefined8 uStack_6770;
  ulong local_6768;
  ulong uStack_6760;
  undefined8 local_6758;
  undefined8 uStack_6750;
  ulong local_6748;
  ulong uStack_6740;
  undefined8 local_6738;
  undefined8 uStack_6730;
  ulong local_6728;
  ulong uStack_6720;
  undefined8 local_6718;
  undefined8 uStack_6710;
  ulong local_6708;
  ulong uStack_6700;
  undefined8 local_66f8;
  undefined8 uStack_66f0;
  ulong local_66e8;
  ulong uStack_66e0;
  undefined8 local_66d8;
  undefined8 uStack_66d0;
  ulong local_66c8;
  ulong uStack_66c0;
  undefined8 local_66b8;
  undefined8 uStack_66b0;
  ulong local_66a8;
  ulong uStack_66a0;
  undefined8 local_6698;
  undefined8 uStack_6690;
  ulong local_6688;
  ulong uStack_6680;
  undefined8 local_6678;
  undefined8 uStack_6670;
  ulong local_6668;
  ulong uStack_6660;
  undefined8 local_6658;
  undefined8 uStack_6650;
  ulong local_6648;
  ulong uStack_6640;
  undefined8 local_6638;
  undefined8 uStack_6630;
  ulong local_6628;
  ulong uStack_6620;
  undefined8 local_6618;
  undefined8 uStack_6610;
  ulong local_6608;
  ulong uStack_6600;
  undefined8 local_65f8;
  undefined8 uStack_65f0;
  ulong local_65e8;
  ulong uStack_65e0;
  undefined8 local_65d8;
  undefined8 uStack_65d0;
  ulong local_65c8;
  ulong uStack_65c0;
  undefined8 local_65b8;
  undefined8 uStack_65b0;
  ulong local_65a8;
  ulong uStack_65a0;
  undefined8 local_6598;
  undefined8 uStack_6590;
  ulong local_6588;
  ulong uStack_6580;
  undefined8 local_6578;
  undefined8 uStack_6570;
  ulong local_6568;
  ulong uStack_6560;
  undefined8 *local_6550;
  float *local_6548;
  float *local_6540;
  float local_6538 [2];
  float afStack_6530 [2];
  undefined8 local_6528;
  undefined8 uStack_6520;
  float local_6518;
  float fStack_6514;
  float fStack_6510;
  float fStack_650c;
  undefined8 local_6508;
  undefined8 uStack_6500;
  undefined8 *local_64f0;
  float *local_64e8;
  float *local_64e0;
  float local_64d8 [2];
  float afStack_64d0 [2];
  undefined8 local_64c8;
  undefined8 uStack_64c0;
  float local_64b8;
  float fStack_64b4;
  float fStack_64b0;
  float fStack_64ac;
  undefined8 local_64a8;
  undefined8 uStack_64a0;
  undefined8 *local_6490;
  float *local_6488;
  float *local_6480;
  float local_6478 [2];
  float afStack_6470 [2];
  undefined8 local_6468;
  undefined8 uStack_6460;
  float local_6458;
  float fStack_6454;
  float fStack_6450;
  float fStack_644c;
  undefined8 local_6448;
  undefined8 uStack_6440;
  undefined8 *local_6430;
  float *local_6428;
  float *local_6420;
  float local_6418 [2];
  float afStack_6410 [2];
  undefined8 local_6408;
  undefined8 uStack_6400;
  float local_63f8;
  float fStack_63f4;
  float fStack_63f0;
  float fStack_63ec;
  undefined8 local_63e8;
  undefined8 uStack_63e0;
  undefined8 *local_63d0;
  float *local_63c8;
  float *local_63c0;
  float local_63b8 [2];
  float afStack_63b0 [2];
  undefined8 local_63a8;
  undefined8 uStack_63a0;
  float local_6398;
  float fStack_6394;
  float fStack_6390;
  float fStack_638c;
  undefined8 local_6388;
  undefined8 uStack_6380;
  undefined8 *local_6370;
  float *local_6368;
  float *local_6360;
  float local_6358 [2];
  float afStack_6350 [2];
  undefined8 local_6348;
  undefined8 uStack_6340;
  float local_6338;
  float fStack_6334;
  float fStack_6330;
  float fStack_632c;
  undefined8 local_6328;
  undefined8 uStack_6320;
  undefined8 *local_6310;
  float *local_6308;
  float *local_6300;
  float local_62f8 [2];
  float afStack_62f0 [2];
  undefined8 local_62e8;
  undefined8 uStack_62e0;
  float local_62d8;
  float fStack_62d4;
  float fStack_62d0;
  float fStack_62cc;
  undefined8 local_62c8;
  undefined8 uStack_62c0;
  undefined8 *local_62b0;
  float *local_62a8;
  float *local_62a0;
  float local_6298 [2];
  float afStack_6290 [2];
  undefined8 local_6288;
  undefined8 uStack_6280;
  float local_6278;
  float fStack_6274;
  float fStack_6270;
  float fStack_626c;
  undefined8 local_6268;
  undefined8 uStack_6260;
  undefined8 *local_6250;
  float *local_6248;
  float *local_6240;
  float local_6238 [2];
  float afStack_6230 [2];
  undefined8 local_6228;
  undefined8 uStack_6220;
  float local_6218;
  float fStack_6214;
  float fStack_6210;
  float fStack_620c;
  undefined8 local_6208;
  undefined8 uStack_6200;
  undefined8 *local_61f0;
  float *local_61e8;
  float *local_61e0;
  float local_61d8 [2];
  float afStack_61d0 [2];
  undefined8 local_61c8;
  undefined8 uStack_61c0;
  float local_61b8;
  float fStack_61b4;
  float fStack_61b0;
  float fStack_61ac;
  undefined8 local_61a8;
  undefined8 uStack_61a0;
  undefined8 *local_6190;
  float *local_6188;
  float *local_6180;
  float local_6178 [2];
  float afStack_6170 [2];
  undefined8 local_6168;
  undefined8 uStack_6160;
  float local_6158;
  float fStack_6154;
  float fStack_6150;
  float fStack_614c;
  undefined8 local_6148;
  undefined8 uStack_6140;
  undefined8 *local_6130;
  float *local_6128;
  float *local_6120;
  float local_6118 [2];
  float afStack_6110 [2];
  undefined8 local_6108;
  undefined8 uStack_6100;
  float local_60f8;
  float fStack_60f4;
  float fStack_60f0;
  float fStack_60ec;
  undefined8 local_60e8;
  undefined8 uStack_60e0;
  undefined8 *local_60d0;
  float *local_60c8;
  float *local_60c0;
  float local_60b8 [2];
  float afStack_60b0 [2];
  undefined8 local_60a8;
  undefined8 uStack_60a0;
  float local_6098;
  float fStack_6094;
  float fStack_6090;
  float fStack_608c;
  undefined8 local_6088;
  undefined8 uStack_6080;
  undefined8 *local_6070;
  float *local_6068;
  float *local_6060;
  float local_6058 [2];
  float afStack_6050 [2];
  undefined8 local_6048;
  undefined8 uStack_6040;
  float local_6038;
  float fStack_6034;
  float fStack_6030;
  float fStack_602c;
  undefined8 local_6028;
  undefined8 uStack_6020;
  undefined8 *local_6010;
  float *local_6008;
  float *local_6000;
  float local_5ff8 [2];
  float afStack_5ff0 [2];
  undefined8 local_5fe8;
  undefined8 uStack_5fe0;
  float local_5fd8;
  float fStack_5fd4;
  float fStack_5fd0;
  float fStack_5fcc;
  undefined8 local_5fc8;
  undefined8 uStack_5fc0;
  undefined8 *local_5fb0;
  float *local_5fa8;
  float *local_5fa0;
  float local_5f98 [2];
  float afStack_5f90 [2];
  undefined8 local_5f88;
  undefined8 uStack_5f80;
  float local_5f78;
  float fStack_5f74;
  float fStack_5f70;
  float fStack_5f6c;
  undefined8 local_5f68;
  undefined8 uStack_5f60;
  undefined8 *local_5f50;
  float *local_5f48;
  float *local_5f40;
  float local_5f38 [2];
  float afStack_5f30 [2];
  undefined8 local_5f28;
  undefined8 uStack_5f20;
  float local_5f18;
  float fStack_5f14;
  float fStack_5f10;
  float fStack_5f0c;
  undefined8 local_5f08;
  undefined8 uStack_5f00;
  undefined8 *local_5ef0;
  float *local_5ee8;
  float *local_5ee0;
  float local_5ed8 [2];
  float afStack_5ed0 [2];
  undefined8 local_5ec8;
  undefined8 uStack_5ec0;
  float local_5eb8;
  float fStack_5eb4;
  float fStack_5eb0;
  float fStack_5eac;
  undefined8 local_5ea8;
  undefined8 uStack_5ea0;
  undefined8 *local_5e90;
  float *local_5e88;
  float *local_5e80;
  float local_5e78 [2];
  float afStack_5e70 [2];
  undefined8 local_5e68;
  undefined8 uStack_5e60;
  float local_5e58;
  float fStack_5e54;
  float fStack_5e50;
  float fStack_5e4c;
  undefined8 local_5e48;
  undefined8 uStack_5e40;
  undefined8 *local_5e30;
  float *local_5e28;
  float *local_5e20;
  float local_5e18 [2];
  float afStack_5e10 [2];
  undefined8 local_5e08;
  undefined8 uStack_5e00;
  float local_5df8;
  float fStack_5df4;
  float fStack_5df0;
  float fStack_5dec;
  undefined8 local_5de8;
  undefined8 uStack_5de0;
  undefined8 *local_5dd0;
  float *local_5dc8;
  float *local_5dc0;
  float local_5db8 [2];
  float afStack_5db0 [2];
  undefined8 local_5da8;
  undefined8 uStack_5da0;
  float local_5d98;
  float fStack_5d94;
  float fStack_5d90;
  float fStack_5d8c;
  undefined8 local_5d88;
  undefined8 uStack_5d80;
  undefined8 *local_5d70;
  float *local_5d68;
  float *local_5d60;
  float local_5d58 [2];
  float afStack_5d50 [2];
  undefined8 local_5d48;
  undefined8 uStack_5d40;
  float local_5d38;
  float fStack_5d34;
  float fStack_5d30;
  float fStack_5d2c;
  undefined8 local_5d28;
  undefined8 uStack_5d20;
  undefined8 *local_5d10;
  float *local_5d08;
  float *local_5d00;
  float local_5cf8 [2];
  float afStack_5cf0 [2];
  undefined8 local_5ce8;
  undefined8 uStack_5ce0;
  float local_5cd8;
  float fStack_5cd4;
  float fStack_5cd0;
  float fStack_5ccc;
  undefined8 local_5cc8;
  undefined8 uStack_5cc0;
  undefined8 *local_5cb0;
  float *local_5ca8;
  float *local_5ca0;
  float local_5c98 [2];
  float afStack_5c90 [2];
  undefined8 local_5c88;
  undefined8 uStack_5c80;
  float local_5c78;
  float fStack_5c74;
  float fStack_5c70;
  float fStack_5c6c;
  undefined8 local_5c68;
  undefined8 uStack_5c60;
  undefined8 local_5c58;
  undefined8 uStack_5c50;
  undefined8 local_5c48;
  undefined8 uStack_5c40;
  undefined8 local_5c38;
  undefined8 uStack_5c30;
  undefined8 local_5c28;
  undefined8 uStack_5c20;
  undefined8 local_5c18;
  undefined8 uStack_5c10;
  undefined8 local_5c08;
  undefined8 uStack_5c00;
  undefined8 local_5bf8;
  undefined8 uStack_5bf0;
  undefined8 local_5be8;
  undefined8 uStack_5be0;
  undefined8 local_5bd8;
  undefined8 uStack_5bd0;
  undefined8 local_5bc8;
  undefined8 uStack_5bc0;
  undefined8 local_5bb8;
  undefined8 uStack_5bb0;
  undefined8 local_5ba8;
  undefined8 uStack_5ba0;
  undefined8 local_5b98;
  undefined8 uStack_5b90;
  undefined8 local_5b88;
  undefined8 uStack_5b80;
  undefined8 local_5b78;
  undefined8 uStack_5b70;
  undefined8 local_5b68;
  undefined8 uStack_5b60;
  undefined8 local_5b58;
  undefined8 uStack_5b50;
  undefined8 local_5b48;
  undefined8 uStack_5b40;
  undefined8 local_5b38;
  undefined8 uStack_5b30;
  undefined8 local_5b28;
  undefined8 uStack_5b20;
  undefined8 local_5b18;
  undefined8 uStack_5b10;
  undefined8 local_5b08;
  undefined8 uStack_5b00;
  undefined8 local_5af8;
  undefined8 uStack_5af0;
  undefined8 local_5ae8;
  undefined8 uStack_5ae0;
  undefined4 local_5acc;
  undefined8 local_5ac8;
  undefined8 uStack_5ac0;
  undefined4 local_5aac;
  undefined8 local_5aa8;
  undefined8 uStack_5aa0;
  undefined4 local_5a8c;
  undefined8 local_5a88;
  undefined8 uStack_5a80;
  undefined4 local_5a6c;
  undefined8 local_5a68;
  undefined8 uStack_5a60;
  undefined4 local_5a4c;
  undefined8 local_5a48;
  undefined8 uStack_5a40;
  undefined4 local_5a2c;
  undefined8 local_5a28;
  undefined8 uStack_5a20;
  undefined4 local_5a0c;
  undefined8 local_5a08;
  undefined8 uStack_5a00;
  undefined4 local_59ec;
  undefined8 local_59e8;
  undefined8 uStack_59e0;
  undefined4 local_59cc;
  undefined8 local_59c8;
  undefined8 uStack_59c0;
  undefined4 local_59ac;
  undefined8 local_59a8;
  undefined8 uStack_59a0;
  undefined4 local_598c;
  undefined8 local_5988;
  undefined8 uStack_5980;
  undefined4 local_596c;
  undefined8 local_5968;
  undefined8 uStack_5960;
  undefined8 local_5958;
  undefined8 uStack_5950;
  undefined8 local_5948;
  undefined8 uStack_5940;
  undefined8 local_5938;
  undefined8 uStack_5930;
  undefined8 local_5928;
  undefined8 uStack_5920;
  undefined8 local_5918;
  undefined8 uStack_5910;
  undefined8 local_5908;
  undefined8 uStack_5900;
  undefined8 local_58f8;
  undefined8 uStack_58f0;
  undefined8 local_58e8;
  undefined8 uStack_58e0;
  undefined8 local_58d8;
  undefined8 uStack_58d0;
  undefined8 local_58c8;
  undefined8 uStack_58c0;
  undefined8 local_58b8;
  undefined8 uStack_58b0;
  undefined8 local_58a8;
  undefined8 uStack_58a0;
  undefined8 local_5898;
  undefined8 uStack_5890;
  undefined8 local_5888;
  undefined8 uStack_5880;
  undefined8 local_5878;
  undefined8 uStack_5870;
  undefined8 local_5868;
  undefined8 uStack_5860;
  undefined8 local_5858;
  undefined8 uStack_5850;
  undefined8 local_5848;
  undefined8 uStack_5840;
  ulong local_5838;
  ulong uStack_5830;
  undefined4 local_5828;
  undefined4 uStack_5824;
  undefined4 uStack_5820;
  undefined4 uStack_581c;
  undefined4 local_580c;
  undefined4 local_5808;
  undefined4 uStack_5804;
  undefined4 uStack_5800;
  undefined4 uStack_57fc;
  undefined4 local_57ec;
  undefined8 local_57e8;
  undefined8 uStack_57e0;
  undefined1 local_57d8 [8];
  float fStack_57d0;
  float fStack_57cc;
  undefined8 local_57c8;
  undefined8 uStack_57c0;
  undefined8 local_57b8;
  undefined8 uStack_57b0;
  undefined8 local_57a8;
  undefined8 uStack_57a0;
  float local_5798;
  float fStack_5794;
  float fStack_5790;
  float fStack_578c;
  undefined4 local_5788;
  undefined4 uStack_5784;
  undefined4 uStack_5780;
  undefined4 uStack_577c;
  undefined4 local_576c;
  undefined8 local_5768;
  undefined8 uStack_5760;
  undefined8 local_5758;
  undefined8 uStack_5750;
  undefined8 local_5748;
  undefined8 uStack_5740;
  float local_5738;
  float fStack_5734;
  float fStack_5730;
  float fStack_572c;
  undefined8 local_5728;
  undefined8 uStack_5720;
  undefined8 local_5718;
  undefined8 uStack_5710;
  undefined8 local_5708;
  undefined8 uStack_5700;
  undefined8 local_56f8;
  undefined8 uStack_56f0;
  undefined8 local_56e8;
  undefined8 uStack_56e0;
  float local_56d8;
  float fStack_56d4;
  float fStack_56d0;
  float fStack_56cc;
  float local_56c8;
  float fStack_56c4;
  float fStack_56c0;
  float fStack_56bc;
  float local_56b8;
  float fStack_56b4;
  float fStack_56b0;
  float fStack_56ac;
  undefined8 local_56a8;
  undefined8 uStack_56a0;
  undefined8 local_5698;
  undefined8 uStack_5690;
  undefined8 local_5688;
  undefined8 uStack_5680;
  undefined8 local_5678;
  undefined8 uStack_5670;
  undefined8 local_5668;
  undefined8 uStack_5660;
  undefined8 local_5658;
  undefined8 uStack_5650;
  undefined8 local_5648;
  undefined8 uStack_5640;
  undefined8 local_5638;
  undefined8 uStack_5630;
  undefined8 *local_5620;
  float *local_5618;
  undefined8 *local_5610;
  undefined8 local_5608;
  undefined8 uStack_5600;
  undefined8 local_55f8;
  undefined8 uStack_55f0;
  float *local_55e0;
  undefined8 *local_55d8;
  undefined8 *local_55d0;
  undefined8 local_55c8;
  undefined8 uStack_55c0;
  undefined8 local_55b8;
  undefined8 uStack_55b0;
  float *local_55a0;
  undefined8 *local_5598;
  undefined8 *local_5590;
  undefined8 local_5588;
  undefined8 uStack_5580;
  undefined8 local_5578;
  undefined8 uStack_5570;
  float *local_5560;
  undefined8 *local_5558;
  undefined8 *local_5550;
  undefined8 local_5548;
  undefined8 uStack_5540;
  undefined8 local_5538;
  undefined8 uStack_5530;
  float *local_5520;
  undefined8 *local_5518;
  undefined8 *local_5510;
  undefined8 local_5508;
  undefined8 uStack_5500;
  undefined8 local_54f8;
  undefined8 uStack_54f0;
  float *local_54e0;
  undefined8 *local_54d8;
  undefined8 *local_54d0;
  undefined8 local_54c8;
  undefined8 uStack_54c0;
  undefined8 local_54b8;
  undefined8 uStack_54b0;
  undefined8 local_54a8;
  undefined8 uStack_54a0;
  undefined8 local_5498;
  undefined8 uStack_5490;
  undefined8 local_5488;
  undefined8 uStack_5480;
  undefined8 local_5478;
  undefined8 uStack_5470;
  undefined8 local_5468;
  undefined8 uStack_5460;
  float local_5458 [2];
  float afStack_5450 [2];
  float local_5448;
  float fStack_5444;
  float fStack_5440;
  float fStack_543c;
  float local_5438 [2];
  float afStack_5430 [2];
  float local_5428;
  float fStack_5424;
  float fStack_5420;
  float fStack_541c;
  float local_5418 [2];
  float afStack_5410 [2];
  float local_5408;
  float fStack_5404;
  float fStack_5400;
  float fStack_53fc;
  float local_53f8 [2];
  float afStack_53f0 [2];
  float local_53e8;
  float fStack_53e4;
  float fStack_53e0;
  float fStack_53dc;
  float local_53d8 [2];
  float afStack_53d0 [2];
  float local_53c8;
  float fStack_53c4;
  float fStack_53c0;
  float fStack_53bc;
  undefined8 local_53b8;
  undefined8 uStack_53b0;
  float local_53a8;
  float fStack_53a4;
  float fStack_53a0;
  float fStack_539c;
  undefined8 local_5398;
  undefined8 uStack_5390;
  undefined8 local_5388;
  undefined8 uStack_5380;
  undefined8 local_5378;
  undefined8 uStack_5370;
  undefined8 local_5368;
  undefined8 uStack_5360;
  undefined8 local_5358;
  undefined8 uStack_5350;
  undefined8 local_5348;
  undefined8 uStack_5340;
  undefined8 local_5338;
  undefined8 uStack_5330;
  undefined8 local_5328;
  undefined8 uStack_5320;
  undefined8 local_5318;
  undefined8 uStack_5310;
  float local_5308;
  float fStack_5304;
  float fStack_5300;
  float fStack_52fc;
  undefined8 local_52f8;
  undefined8 uStack_52f0;
  undefined8 local_52e8;
  undefined8 uStack_52e0;
  undefined8 local_52d8;
  undefined8 uStack_52d0;
  undefined8 local_52c8;
  undefined8 uStack_52c0;
  undefined8 local_52b8;
  undefined8 uStack_52b0;
  ulong local_52a8;
  ulong uStack_52a0;
  undefined8 *local_5290;
  float *local_5288;
  float *local_5280;
  float local_5278 [2];
  float afStack_5270 [2];
  undefined8 local_5268;
  undefined8 uStack_5260;
  float local_5258;
  float fStack_5254;
  float fStack_5250;
  float fStack_524c;
  undefined8 local_5248;
  undefined8 uStack_5240;
  undefined8 *local_5230;
  float *local_5228;
  float *local_5220;
  float local_5218 [2];
  float afStack_5210 [2];
  undefined8 local_5208;
  undefined8 uStack_5200;
  float local_51f8;
  float fStack_51f4;
  float fStack_51f0;
  float fStack_51ec;
  undefined8 local_51e8;
  undefined8 uStack_51e0;
  undefined8 local_51d8;
  undefined8 uStack_51d0;
  undefined8 local_51c8;
  undefined8 uStack_51c0;
  undefined4 local_51ac;
  undefined8 local_51a8;
  undefined8 uStack_51a0;
  undefined8 local_5198;
  undefined8 uStack_5190;
  undefined8 local_5188;
  undefined8 uStack_5180;
  undefined8 local_5178;
  undefined8 uStack_5170;
  ulong local_5168;
  ulong uStack_5160;
  undefined4 local_5158;
  undefined4 uStack_5154;
  undefined4 uStack_5150;
  undefined4 uStack_514c;
  undefined4 local_513c;
  undefined4 local_5138;
  undefined4 uStack_5134;
  undefined4 uStack_5130;
  undefined4 uStack_512c;
  undefined4 local_511c;
  undefined8 local_5118;
  undefined8 uStack_5110;
  undefined1 local_5108 [8];
  float fStack_5100;
  float fStack_50fc;
  undefined8 local_50f8;
  undefined8 uStack_50f0;
  undefined8 local_50e8;
  undefined8 uStack_50e0;
  undefined8 local_50d8;
  undefined8 uStack_50d0;
  float local_50c8;
  float fStack_50c4;
  float fStack_50c0;
  float fStack_50bc;
  undefined4 local_50b8;
  undefined4 uStack_50b4;
  undefined4 uStack_50b0;
  undefined4 uStack_50ac;
  undefined4 local_509c;
  undefined8 local_5098;
  undefined8 uStack_5090;
  undefined8 local_5088;
  undefined8 uStack_5080;
  undefined8 local_5078;
  undefined8 uStack_5070;
  float local_5068;
  float fStack_5064;
  float fStack_5060;
  float fStack_505c;
  undefined8 local_5058;
  undefined8 uStack_5050;
  undefined8 local_5048;
  undefined8 uStack_5040;
  undefined8 local_5038;
  undefined8 uStack_5030;
  undefined8 local_5028;
  undefined8 uStack_5020;
  undefined8 local_5018;
  undefined8 uStack_5010;
  float local_5008;
  float fStack_5004;
  float fStack_5000;
  float fStack_4ffc;
  float local_4ff8;
  float fStack_4ff4;
  float fStack_4ff0;
  float fStack_4fec;
  float local_4fe8;
  float fStack_4fe4;
  float fStack_4fe0;
  float fStack_4fdc;
  undefined8 local_4fd8;
  undefined8 uStack_4fd0;
  undefined8 local_4fc8;
  undefined8 uStack_4fc0;
  undefined8 local_4fb8;
  undefined8 uStack_4fb0;
  undefined8 local_4fa8;
  undefined8 uStack_4fa0;
  undefined8 local_4f98;
  undefined8 uStack_4f90;
  undefined8 local_4f88;
  undefined8 uStack_4f80;
  undefined8 local_4f78;
  undefined8 uStack_4f70;
  undefined8 local_4f68;
  undefined8 uStack_4f60;
  undefined8 *local_4f50;
  float *local_4f48;
  undefined8 *local_4f40;
  undefined8 local_4f38;
  undefined8 uStack_4f30;
  undefined8 local_4f28;
  undefined8 uStack_4f20;
  float *local_4f10;
  undefined8 *local_4f08;
  undefined8 *local_4f00;
  undefined8 local_4ef8;
  undefined8 uStack_4ef0;
  undefined8 local_4ee8;
  undefined8 uStack_4ee0;
  float *local_4ed0;
  undefined8 *local_4ec8;
  undefined8 *local_4ec0;
  undefined8 local_4eb8;
  undefined8 uStack_4eb0;
  undefined8 local_4ea8;
  undefined8 uStack_4ea0;
  float *local_4e90;
  undefined8 *local_4e88;
  undefined8 *local_4e80;
  undefined8 local_4e78;
  undefined8 uStack_4e70;
  undefined8 local_4e68;
  undefined8 uStack_4e60;
  float *local_4e50;
  undefined8 *local_4e48;
  undefined8 *local_4e40;
  undefined8 local_4e38;
  undefined8 uStack_4e30;
  undefined8 local_4e28;
  undefined8 uStack_4e20;
  float *local_4e10;
  undefined8 *local_4e08;
  undefined8 *local_4e00;
  undefined8 local_4df8;
  undefined8 uStack_4df0;
  undefined8 local_4de8;
  undefined8 uStack_4de0;
  undefined8 local_4dd8;
  undefined8 uStack_4dd0;
  undefined8 local_4dc8;
  undefined8 uStack_4dc0;
  undefined8 local_4db8;
  undefined8 uStack_4db0;
  undefined8 local_4da8;
  undefined8 uStack_4da0;
  undefined8 local_4d98;
  undefined8 uStack_4d90;
  float local_4d88 [2];
  float afStack_4d80 [2];
  float local_4d78;
  float fStack_4d74;
  float fStack_4d70;
  float fStack_4d6c;
  float local_4d68 [2];
  float afStack_4d60 [2];
  float local_4d58;
  float fStack_4d54;
  float fStack_4d50;
  float fStack_4d4c;
  float local_4d48 [2];
  float afStack_4d40 [2];
  float local_4d38;
  float fStack_4d34;
  float fStack_4d30;
  float fStack_4d2c;
  float local_4d28 [2];
  float afStack_4d20 [2];
  float local_4d18;
  float fStack_4d14;
  float fStack_4d10;
  float fStack_4d0c;
  float local_4d08 [2];
  float afStack_4d00 [2];
  float local_4cf8;
  float fStack_4cf4;
  float fStack_4cf0;
  float fStack_4cec;
  undefined8 local_4ce8;
  undefined8 uStack_4ce0;
  float local_4cd8;
  float fStack_4cd4;
  float fStack_4cd0;
  float fStack_4ccc;
  undefined8 local_4cc8;
  undefined8 uStack_4cc0;
  undefined8 local_4cb8;
  undefined8 uStack_4cb0;
  undefined8 local_4ca8;
  undefined8 uStack_4ca0;
  undefined8 local_4c98;
  undefined8 uStack_4c90;
  undefined8 local_4c88;
  undefined8 uStack_4c80;
  undefined8 local_4c78;
  undefined8 uStack_4c70;
  undefined8 local_4c68;
  undefined8 uStack_4c60;
  undefined8 local_4c58;
  undefined8 uStack_4c50;
  undefined8 local_4c48;
  undefined8 uStack_4c40;
  float local_4c38;
  float fStack_4c34;
  float fStack_4c30;
  float fStack_4c2c;
  undefined8 local_4c28;
  undefined8 uStack_4c20;
  undefined8 local_4c18;
  undefined8 uStack_4c10;
  undefined8 local_4c08;
  undefined8 uStack_4c00;
  undefined8 local_4bf8;
  undefined8 uStack_4bf0;
  undefined8 local_4be8;
  undefined8 uStack_4be0;
  ulong local_4bd8;
  ulong uStack_4bd0;
  undefined8 *local_4bc0;
  float *local_4bb8;
  float *local_4bb0;
  float local_4ba8 [2];
  float afStack_4ba0 [2];
  undefined8 local_4b98;
  undefined8 uStack_4b90;
  float local_4b88;
  float fStack_4b84;
  float fStack_4b80;
  float fStack_4b7c;
  undefined8 local_4b78;
  undefined8 uStack_4b70;
  undefined8 *local_4b60;
  float *local_4b58;
  float *local_4b50;
  float local_4b48 [2];
  float afStack_4b40 [2];
  undefined8 local_4b38;
  undefined8 uStack_4b30;
  float local_4b28;
  float fStack_4b24;
  float fStack_4b20;
  float fStack_4b1c;
  undefined8 local_4b18;
  undefined8 uStack_4b10;
  undefined8 local_4b08;
  undefined8 uStack_4b00;
  undefined8 local_4af8;
  undefined8 uStack_4af0;
  undefined4 local_4adc;
  undefined8 local_4ad8;
  undefined8 uStack_4ad0;
  undefined8 local_4ac8;
  undefined8 uStack_4ac0;
  undefined8 local_4ab8;
  undefined8 uStack_4ab0;
  undefined8 local_4aa8;
  undefined8 uStack_4aa0;
  ulong local_4a98;
  ulong uStack_4a90;
  undefined4 local_4a88;
  undefined4 uStack_4a84;
  undefined4 uStack_4a80;
  undefined4 uStack_4a7c;
  undefined4 local_4a6c;
  undefined4 local_4a68;
  undefined4 uStack_4a64;
  undefined4 uStack_4a60;
  undefined4 uStack_4a5c;
  undefined4 local_4a4c;
  undefined8 local_4a48;
  undefined8 uStack_4a40;
  undefined1 local_4a38 [8];
  float fStack_4a30;
  float fStack_4a2c;
  undefined8 local_4a28;
  undefined8 uStack_4a20;
  undefined8 local_4a18;
  undefined8 uStack_4a10;
  undefined8 local_4a08;
  undefined8 uStack_4a00;
  float local_49f8;
  float fStack_49f4;
  float fStack_49f0;
  float fStack_49ec;
  undefined4 local_49e8;
  undefined4 uStack_49e4;
  undefined4 uStack_49e0;
  undefined4 uStack_49dc;
  undefined4 local_49cc;
  undefined8 local_49c8;
  undefined8 uStack_49c0;
  undefined8 local_49b8;
  undefined8 uStack_49b0;
  undefined8 local_49a8;
  undefined8 uStack_49a0;
  float local_4998;
  float fStack_4994;
  float fStack_4990;
  float fStack_498c;
  undefined8 local_4988;
  undefined8 uStack_4980;
  undefined8 local_4978;
  undefined8 uStack_4970;
  undefined8 local_4968;
  undefined8 uStack_4960;
  undefined8 local_4958;
  undefined8 uStack_4950;
  undefined8 local_4948;
  undefined8 uStack_4940;
  float local_4938;
  float fStack_4934;
  float fStack_4930;
  float fStack_492c;
  float local_4928;
  float fStack_4924;
  float fStack_4920;
  float fStack_491c;
  float local_4918;
  float fStack_4914;
  float fStack_4910;
  float fStack_490c;
  undefined8 local_4908;
  undefined8 uStack_4900;
  undefined8 local_48f8;
  undefined8 uStack_48f0;
  undefined8 local_48e8;
  undefined8 uStack_48e0;
  undefined8 local_48d8;
  undefined8 uStack_48d0;
  undefined8 local_48c8;
  undefined8 uStack_48c0;
  undefined8 local_48b8;
  undefined8 uStack_48b0;
  undefined8 local_48a8;
  undefined8 uStack_48a0;
  undefined8 local_4898;
  undefined8 uStack_4890;
  undefined8 *local_4880;
  float *local_4878;
  undefined8 *local_4870;
  undefined8 local_4868;
  undefined8 uStack_4860;
  undefined8 local_4858;
  undefined8 uStack_4850;
  float *local_4840;
  undefined8 *local_4838;
  undefined8 *local_4830;
  undefined8 local_4828;
  undefined8 uStack_4820;
  undefined8 local_4818;
  undefined8 uStack_4810;
  float *local_4800;
  undefined8 *local_47f8;
  undefined8 *local_47f0;
  undefined8 local_47e8;
  undefined8 uStack_47e0;
  undefined8 local_47d8;
  undefined8 uStack_47d0;
  float *local_47c0;
  undefined8 *local_47b8;
  undefined8 *local_47b0;
  undefined8 local_47a8;
  undefined8 uStack_47a0;
  undefined8 local_4798;
  undefined8 uStack_4790;
  float *local_4780;
  undefined8 *local_4778;
  undefined8 *local_4770;
  undefined8 local_4768;
  undefined8 uStack_4760;
  undefined8 local_4758;
  undefined8 uStack_4750;
  float *local_4740;
  undefined8 *local_4738;
  undefined8 *local_4730;
  undefined8 local_4728;
  undefined8 uStack_4720;
  undefined8 local_4718;
  undefined8 uStack_4710;
  undefined8 local_4708;
  undefined8 uStack_4700;
  undefined8 local_46f8;
  undefined8 uStack_46f0;
  undefined8 local_46e8;
  undefined8 uStack_46e0;
  undefined8 local_46d8;
  undefined8 uStack_46d0;
  undefined8 local_46c8;
  undefined8 uStack_46c0;
  float local_46b8 [2];
  float afStack_46b0 [2];
  float local_46a8;
  float fStack_46a4;
  float fStack_46a0;
  float fStack_469c;
  float local_4698 [2];
  float afStack_4690 [2];
  float local_4688;
  float fStack_4684;
  float fStack_4680;
  float fStack_467c;
  float local_4678 [2];
  float afStack_4670 [2];
  float local_4668;
  float fStack_4664;
  float fStack_4660;
  float fStack_465c;
  float local_4658 [2];
  float afStack_4650 [2];
  float local_4648;
  float fStack_4644;
  float fStack_4640;
  float fStack_463c;
  float local_4638 [2];
  float afStack_4630 [2];
  float local_4628;
  float fStack_4624;
  float fStack_4620;
  float fStack_461c;
  undefined8 local_4618;
  undefined8 uStack_4610;
  float local_4608;
  float fStack_4604;
  float fStack_4600;
  float fStack_45fc;
  undefined8 local_45f8;
  undefined8 uStack_45f0;
  undefined8 local_45e8;
  undefined8 uStack_45e0;
  undefined8 local_45d8;
  undefined8 uStack_45d0;
  undefined8 local_45c8;
  undefined8 uStack_45c0;
  undefined8 local_45b8;
  undefined8 uStack_45b0;
  undefined8 local_45a8;
  undefined8 uStack_45a0;
  undefined8 local_4598;
  undefined8 uStack_4590;
  undefined8 local_4588;
  undefined8 uStack_4580;
  undefined8 local_4578;
  undefined8 uStack_4570;
  float local_4568;
  float fStack_4564;
  float fStack_4560;
  float fStack_455c;
  undefined8 local_4558;
  undefined8 uStack_4550;
  undefined8 local_4548;
  undefined8 uStack_4540;
  undefined8 local_4538;
  undefined8 uStack_4530;
  undefined8 local_4528;
  undefined8 uStack_4520;
  undefined8 local_4518;
  undefined8 uStack_4510;
  ulong local_4508;
  ulong uStack_4500;
  undefined8 *local_44f0;
  float *local_44e8;
  float *local_44e0;
  float local_44d8 [2];
  float afStack_44d0 [2];
  undefined8 local_44c8;
  undefined8 uStack_44c0;
  float local_44b8;
  float fStack_44b4;
  float fStack_44b0;
  float fStack_44ac;
  undefined8 local_44a8;
  undefined8 uStack_44a0;
  undefined8 *local_4490;
  float *local_4488;
  float *local_4480;
  float local_4478 [2];
  float afStack_4470 [2];
  undefined8 local_4468;
  undefined8 uStack_4460;
  float local_4458;
  float fStack_4454;
  float fStack_4450;
  float fStack_444c;
  undefined8 local_4448;
  undefined8 uStack_4440;
  undefined8 local_4438;
  undefined8 uStack_4430;
  undefined8 local_4428;
  undefined8 uStack_4420;
  undefined4 local_440c;
  undefined8 local_4408;
  undefined8 uStack_4400;
  undefined8 local_43f8;
  undefined8 uStack_43f0;
  undefined8 local_43e8;
  undefined8 uStack_43e0;
  undefined8 local_43d8;
  undefined8 uStack_43d0;
  ulong local_43c8;
  ulong uStack_43c0;
  undefined4 local_43b8;
  undefined4 uStack_43b4;
  undefined4 uStack_43b0;
  undefined4 uStack_43ac;
  undefined4 local_439c;
  undefined4 local_4398;
  undefined4 uStack_4394;
  undefined4 uStack_4390;
  undefined4 uStack_438c;
  undefined4 local_437c;
  undefined8 local_4378;
  undefined8 uStack_4370;
  undefined1 local_4368 [8];
  float fStack_4360;
  float fStack_435c;
  undefined8 local_4358;
  undefined8 uStack_4350;
  undefined8 local_4348;
  undefined8 uStack_4340;
  undefined8 local_4338;
  undefined8 uStack_4330;
  float local_4328;
  float fStack_4324;
  float fStack_4320;
  float fStack_431c;
  undefined4 local_4318;
  undefined4 uStack_4314;
  undefined4 uStack_4310;
  undefined4 uStack_430c;
  undefined4 local_42fc;
  undefined8 local_42f8;
  undefined8 uStack_42f0;
  undefined8 local_42e8;
  undefined8 uStack_42e0;
  undefined8 local_42d8;
  undefined8 uStack_42d0;
  float local_42c8;
  float fStack_42c4;
  float fStack_42c0;
  float fStack_42bc;
  undefined8 local_42b8;
  undefined8 uStack_42b0;
  undefined8 local_42a8;
  undefined8 uStack_42a0;
  undefined8 local_4298;
  undefined8 uStack_4290;
  undefined8 local_4288;
  undefined8 uStack_4280;
  undefined8 local_4278;
  undefined8 uStack_4270;
  float local_4268;
  float fStack_4264;
  float fStack_4260;
  float fStack_425c;
  float local_4258;
  float fStack_4254;
  float fStack_4250;
  float fStack_424c;
  float local_4248;
  float fStack_4244;
  float fStack_4240;
  float fStack_423c;
  undefined8 local_4238;
  undefined8 uStack_4230;
  undefined8 local_4228;
  undefined8 uStack_4220;
  undefined8 local_4218;
  undefined8 uStack_4210;
  undefined8 local_4208;
  undefined8 uStack_4200;
  undefined8 local_41f8;
  undefined8 uStack_41f0;
  undefined8 local_41e8;
  undefined8 uStack_41e0;
  undefined8 local_41d8;
  undefined8 uStack_41d0;
  undefined8 local_41c8;
  undefined8 uStack_41c0;
  undefined8 *local_41b0;
  float *local_41a8;
  undefined8 *local_41a0;
  undefined8 local_4198;
  undefined8 uStack_4190;
  undefined8 local_4188;
  undefined8 uStack_4180;
  float *local_4170;
  undefined8 *local_4168;
  undefined8 *local_4160;
  undefined8 local_4158;
  undefined8 uStack_4150;
  undefined8 local_4148;
  undefined8 uStack_4140;
  float *local_4130;
  undefined8 *local_4128;
  undefined8 *local_4120;
  undefined8 local_4118;
  undefined8 uStack_4110;
  undefined8 local_4108;
  undefined8 uStack_4100;
  float *local_40f0;
  undefined8 *local_40e8;
  undefined8 *local_40e0;
  undefined8 local_40d8;
  undefined8 uStack_40d0;
  undefined8 local_40c8;
  undefined8 uStack_40c0;
  float *local_40b0;
  undefined8 *local_40a8;
  undefined8 *local_40a0;
  undefined8 local_4098;
  undefined8 uStack_4090;
  undefined8 local_4088;
  undefined8 uStack_4080;
  float *local_4070;
  undefined8 *local_4068;
  undefined8 *local_4060;
  undefined8 local_4058;
  undefined8 uStack_4050;
  undefined8 local_4048;
  undefined8 uStack_4040;
  undefined8 local_4038;
  undefined8 uStack_4030;
  undefined8 local_4028;
  undefined8 uStack_4020;
  undefined8 local_4018;
  undefined8 uStack_4010;
  undefined8 local_4008;
  undefined8 uStack_4000;
  undefined8 local_3ff8;
  undefined8 uStack_3ff0;
  float local_3fe8 [2];
  float afStack_3fe0 [2];
  float local_3fd8;
  float fStack_3fd4;
  float fStack_3fd0;
  float fStack_3fcc;
  float local_3fc8 [2];
  float afStack_3fc0 [2];
  float local_3fb8;
  float fStack_3fb4;
  float fStack_3fb0;
  float fStack_3fac;
  float local_3fa8 [2];
  float afStack_3fa0 [2];
  float local_3f98;
  float fStack_3f94;
  float fStack_3f90;
  float fStack_3f8c;
  float local_3f88 [2];
  float afStack_3f80 [2];
  float local_3f78;
  float fStack_3f74;
  float fStack_3f70;
  float fStack_3f6c;
  float local_3f68 [2];
  float afStack_3f60 [2];
  float local_3f58;
  float fStack_3f54;
  float fStack_3f50;
  float fStack_3f4c;
  undefined8 local_3f48;
  undefined8 uStack_3f40;
  float local_3f38;
  float fStack_3f34;
  float fStack_3f30;
  float fStack_3f2c;
  undefined8 local_3f28;
  undefined8 uStack_3f20;
  undefined8 local_3f18;
  undefined8 uStack_3f10;
  undefined8 local_3f08;
  undefined8 uStack_3f00;
  undefined8 local_3ef8;
  undefined8 uStack_3ef0;
  undefined8 local_3ee8;
  undefined8 uStack_3ee0;
  undefined8 local_3ed8;
  undefined8 uStack_3ed0;
  undefined8 local_3ec8;
  undefined8 uStack_3ec0;
  undefined8 local_3eb8;
  undefined8 uStack_3eb0;
  undefined8 local_3ea8;
  undefined8 uStack_3ea0;
  float local_3e98;
  float fStack_3e94;
  float fStack_3e90;
  float fStack_3e8c;
  undefined8 local_3e88;
  undefined8 uStack_3e80;
  undefined8 local_3e78;
  undefined8 uStack_3e70;
  undefined8 local_3e68;
  undefined8 uStack_3e60;
  undefined8 local_3e58;
  undefined8 uStack_3e50;
  undefined8 local_3e48;
  undefined8 uStack_3e40;
  ulong local_3e38;
  ulong uStack_3e30;
  undefined8 *local_3e20;
  float *local_3e18;
  float *local_3e10;
  float local_3e08 [2];
  float afStack_3e00 [2];
  undefined8 local_3df8;
  undefined8 uStack_3df0;
  float local_3de8;
  float fStack_3de4;
  float fStack_3de0;
  float fStack_3ddc;
  undefined8 local_3dd8;
  undefined8 uStack_3dd0;
  undefined8 *local_3dc0;
  float *local_3db8;
  float *local_3db0;
  float local_3da8 [2];
  float afStack_3da0 [2];
  undefined8 local_3d98;
  undefined8 uStack_3d90;
  float local_3d88;
  float fStack_3d84;
  float fStack_3d80;
  float fStack_3d7c;
  undefined8 local_3d78;
  undefined8 uStack_3d70;
  undefined8 local_3d68;
  undefined8 uStack_3d60;
  undefined8 local_3d58;
  undefined8 uStack_3d50;
  undefined4 local_3d3c;
  undefined8 local_3d38;
  undefined8 uStack_3d30;
  undefined8 local_3d28;
  undefined8 uStack_3d20;
  undefined8 local_3d18;
  undefined8 uStack_3d10;
  undefined8 local_3d08;
  undefined8 uStack_3d00;
  ulong local_3cf8;
  ulong uStack_3cf0;
  undefined4 local_3ce8;
  undefined4 uStack_3ce4;
  undefined4 uStack_3ce0;
  undefined4 uStack_3cdc;
  undefined4 local_3ccc;
  undefined4 local_3cc8;
  undefined4 uStack_3cc4;
  undefined4 uStack_3cc0;
  undefined4 uStack_3cbc;
  undefined4 local_3cac;
  undefined8 local_3ca8;
  undefined8 uStack_3ca0;
  undefined1 local_3c98 [8];
  float fStack_3c90;
  float fStack_3c8c;
  undefined8 local_3c88;
  undefined8 uStack_3c80;
  undefined8 local_3c78;
  undefined8 uStack_3c70;
  undefined8 local_3c68;
  undefined8 uStack_3c60;
  float local_3c58;
  float fStack_3c54;
  float fStack_3c50;
  float fStack_3c4c;
  undefined4 local_3c48;
  undefined4 uStack_3c44;
  undefined4 uStack_3c40;
  undefined4 uStack_3c3c;
  undefined4 local_3c2c;
  undefined8 local_3c28;
  undefined8 uStack_3c20;
  undefined8 local_3c18;
  undefined8 uStack_3c10;
  undefined8 local_3c08;
  undefined8 uStack_3c00;
  float local_3bf8;
  float fStack_3bf4;
  float fStack_3bf0;
  float fStack_3bec;
  undefined8 local_3be8;
  undefined8 uStack_3be0;
  undefined8 local_3bd8;
  undefined8 uStack_3bd0;
  undefined8 local_3bc8;
  undefined8 uStack_3bc0;
  undefined8 local_3bb8;
  undefined8 uStack_3bb0;
  undefined8 local_3ba8;
  undefined8 uStack_3ba0;
  float local_3b98;
  float fStack_3b94;
  float fStack_3b90;
  float fStack_3b8c;
  float local_3b88;
  float fStack_3b84;
  float fStack_3b80;
  float fStack_3b7c;
  float local_3b78;
  float fStack_3b74;
  float fStack_3b70;
  float fStack_3b6c;
  undefined8 local_3b68;
  undefined8 uStack_3b60;
  undefined8 local_3b58;
  undefined8 uStack_3b50;
  undefined8 local_3b48;
  undefined8 uStack_3b40;
  undefined8 local_3b38;
  undefined8 uStack_3b30;
  undefined8 local_3b28;
  undefined8 uStack_3b20;
  undefined8 local_3b18;
  undefined8 uStack_3b10;
  undefined8 local_3b08;
  undefined8 uStack_3b00;
  undefined8 local_3af8;
  undefined8 uStack_3af0;
  undefined8 *local_3ae0;
  float *local_3ad8;
  undefined8 *local_3ad0;
  undefined8 local_3ac8;
  undefined8 uStack_3ac0;
  undefined8 local_3ab8;
  undefined8 uStack_3ab0;
  float *local_3aa0;
  undefined8 *local_3a98;
  undefined8 *local_3a90;
  undefined8 local_3a88;
  undefined8 uStack_3a80;
  undefined8 local_3a78;
  undefined8 uStack_3a70;
  float *local_3a60;
  undefined8 *local_3a58;
  undefined8 *local_3a50;
  undefined8 local_3a48;
  undefined8 uStack_3a40;
  undefined8 local_3a38;
  undefined8 uStack_3a30;
  float *local_3a20;
  undefined8 *local_3a18;
  undefined8 *local_3a10;
  undefined8 local_3a08;
  undefined8 uStack_3a00;
  undefined8 local_39f8;
  undefined8 uStack_39f0;
  float *local_39e0;
  undefined8 *local_39d8;
  undefined8 *local_39d0;
  undefined8 local_39c8;
  undefined8 uStack_39c0;
  undefined8 local_39b8;
  undefined8 uStack_39b0;
  float *local_39a0;
  undefined8 *local_3998;
  undefined8 *local_3990;
  undefined8 local_3988;
  undefined8 uStack_3980;
  undefined8 local_3978;
  undefined8 uStack_3970;
  undefined8 local_3968;
  undefined8 uStack_3960;
  undefined8 local_3958;
  undefined8 uStack_3950;
  undefined8 local_3948;
  undefined8 uStack_3940;
  undefined8 local_3938;
  undefined8 uStack_3930;
  undefined8 local_3928;
  undefined8 uStack_3920;
  float local_3918 [2];
  float afStack_3910 [2];
  float local_3908;
  float fStack_3904;
  float fStack_3900;
  float fStack_38fc;
  float local_38f8 [2];
  float afStack_38f0 [2];
  float local_38e8;
  float fStack_38e4;
  float fStack_38e0;
  float fStack_38dc;
  float local_38d8 [2];
  float afStack_38d0 [2];
  float local_38c8;
  float fStack_38c4;
  float fStack_38c0;
  float fStack_38bc;
  float local_38b8 [2];
  float afStack_38b0 [2];
  float local_38a8;
  float fStack_38a4;
  float fStack_38a0;
  float fStack_389c;
  float local_3898 [2];
  float afStack_3890 [2];
  float local_3888;
  float fStack_3884;
  float fStack_3880;
  float fStack_387c;
  undefined8 local_3878;
  undefined8 uStack_3870;
  float local_3868;
  float fStack_3864;
  float fStack_3860;
  float fStack_385c;
  undefined8 local_3858;
  undefined8 uStack_3850;
  undefined8 local_3848;
  undefined8 uStack_3840;
  undefined8 local_3838;
  undefined8 uStack_3830;
  undefined8 local_3828;
  undefined8 uStack_3820;
  undefined8 local_3818;
  undefined8 uStack_3810;
  undefined8 local_3808;
  undefined8 uStack_3800;
  undefined8 local_37f8;
  undefined8 uStack_37f0;
  undefined8 local_37e8;
  undefined8 uStack_37e0;
  undefined8 local_37d8;
  undefined8 uStack_37d0;
  float local_37c8;
  float fStack_37c4;
  float fStack_37c0;
  float fStack_37bc;
  undefined8 local_37b8;
  undefined8 uStack_37b0;
  undefined8 local_37a8;
  undefined8 uStack_37a0;
  undefined8 local_3798;
  undefined8 uStack_3790;
  undefined8 local_3788;
  undefined8 uStack_3780;
  undefined8 local_3778;
  undefined8 uStack_3770;
  ulong local_3768;
  ulong uStack_3760;
  undefined8 *local_3750;
  float *local_3748;
  float *local_3740;
  float local_3738 [2];
  float afStack_3730 [2];
  undefined8 local_3728;
  undefined8 uStack_3720;
  float local_3718;
  float fStack_3714;
  float fStack_3710;
  float fStack_370c;
  undefined8 local_3708;
  undefined8 uStack_3700;
  undefined8 *local_36f0;
  float *local_36e8;
  float *local_36e0;
  float local_36d8 [2];
  float afStack_36d0 [2];
  undefined8 local_36c8;
  undefined8 uStack_36c0;
  float local_36b8;
  float fStack_36b4;
  float fStack_36b0;
  float fStack_36ac;
  undefined8 local_36a8;
  undefined8 uStack_36a0;
  undefined8 local_3698;
  undefined8 uStack_3690;
  undefined8 local_3688;
  undefined8 uStack_3680;
  undefined4 local_366c;
  undefined8 local_3668;
  undefined8 uStack_3660;
  undefined8 local_3658;
  undefined8 uStack_3650;
  undefined8 local_3648;
  undefined8 uStack_3640;
  undefined8 local_3638;
  undefined8 uStack_3630;
  ulong local_3628;
  ulong uStack_3620;
  undefined4 local_3618;
  undefined4 uStack_3614;
  undefined4 uStack_3610;
  undefined4 uStack_360c;
  undefined4 local_35fc;
  undefined4 local_35f8;
  undefined4 uStack_35f4;
  undefined4 uStack_35f0;
  undefined4 uStack_35ec;
  undefined4 local_35dc;
  undefined8 local_35d8;
  undefined8 uStack_35d0;
  undefined1 local_35c8 [8];
  float fStack_35c0;
  float fStack_35bc;
  undefined8 local_35b8;
  undefined8 uStack_35b0;
  undefined8 local_35a8;
  undefined8 uStack_35a0;
  undefined8 local_3598;
  undefined8 uStack_3590;
  float local_3588;
  float fStack_3584;
  float fStack_3580;
  float fStack_357c;
  undefined4 local_3578;
  undefined4 uStack_3574;
  undefined4 uStack_3570;
  undefined4 uStack_356c;
  undefined4 local_355c;
  undefined8 local_3558;
  undefined8 uStack_3550;
  undefined8 local_3548;
  undefined8 uStack_3540;
  undefined8 local_3538;
  undefined8 uStack_3530;
  float local_3528;
  float fStack_3524;
  float fStack_3520;
  float fStack_351c;
  undefined8 local_3518;
  undefined8 uStack_3510;
  undefined8 local_3508;
  undefined8 uStack_3500;
  undefined8 local_34f8;
  undefined8 uStack_34f0;
  undefined8 local_34e8;
  undefined8 uStack_34e0;
  undefined8 local_34d8;
  undefined8 uStack_34d0;
  float local_34c8;
  float fStack_34c4;
  float fStack_34c0;
  float fStack_34bc;
  float local_34b8;
  float fStack_34b4;
  float fStack_34b0;
  float fStack_34ac;
  float local_34a8;
  float fStack_34a4;
  float fStack_34a0;
  float fStack_349c;
  undefined8 local_3498;
  undefined8 uStack_3490;
  undefined8 local_3488;
  undefined8 uStack_3480;
  undefined8 local_3478;
  undefined8 uStack_3470;
  undefined8 local_3468;
  undefined8 uStack_3460;
  undefined8 local_3458;
  undefined8 uStack_3450;
  undefined8 local_3448;
  undefined8 uStack_3440;
  undefined8 local_3438;
  undefined8 uStack_3430;
  undefined8 local_3428;
  undefined8 uStack_3420;
  undefined8 *local_3410;
  float *local_3408;
  undefined8 *local_3400;
  undefined8 local_33f8;
  undefined8 uStack_33f0;
  undefined8 local_33e8;
  undefined8 uStack_33e0;
  float *local_33d0;
  undefined8 *local_33c8;
  undefined8 *local_33c0;
  undefined8 local_33b8;
  undefined8 uStack_33b0;
  undefined8 local_33a8;
  undefined8 uStack_33a0;
  float *local_3390;
  undefined8 *local_3388;
  undefined8 *local_3380;
  undefined8 local_3378;
  undefined8 uStack_3370;
  undefined8 local_3368;
  undefined8 uStack_3360;
  float *local_3350;
  undefined8 *local_3348;
  undefined8 *local_3340;
  undefined8 local_3338;
  undefined8 uStack_3330;
  undefined8 local_3328;
  undefined8 uStack_3320;
  float *local_3310;
  undefined8 *local_3308;
  undefined8 *local_3300;
  undefined8 local_32f8;
  undefined8 uStack_32f0;
  undefined8 local_32e8;
  undefined8 uStack_32e0;
  float *local_32d0;
  undefined8 *local_32c8;
  undefined8 *local_32c0;
  undefined8 local_32b8;
  undefined8 uStack_32b0;
  undefined8 local_32a8;
  undefined8 uStack_32a0;
  undefined8 local_3298;
  undefined8 uStack_3290;
  undefined8 local_3288;
  undefined8 uStack_3280;
  undefined8 local_3278;
  undefined8 uStack_3270;
  undefined8 local_3268;
  undefined8 uStack_3260;
  undefined8 local_3258;
  undefined8 uStack_3250;
  float local_3248 [2];
  float afStack_3240 [2];
  float local_3238;
  float fStack_3234;
  float fStack_3230;
  float fStack_322c;
  float local_3228 [2];
  float afStack_3220 [2];
  float local_3218;
  float fStack_3214;
  float fStack_3210;
  float fStack_320c;
  float local_3208 [2];
  float afStack_3200 [2];
  float local_31f8;
  float fStack_31f4;
  float fStack_31f0;
  float fStack_31ec;
  float local_31e8 [2];
  float afStack_31e0 [2];
  float local_31d8;
  float fStack_31d4;
  float fStack_31d0;
  float fStack_31cc;
  float local_31c8 [2];
  float afStack_31c0 [2];
  float local_31b8;
  float fStack_31b4;
  float fStack_31b0;
  float fStack_31ac;
  undefined8 local_31a8;
  undefined8 uStack_31a0;
  float local_3198;
  float fStack_3194;
  float fStack_3190;
  float fStack_318c;
  undefined8 local_3188;
  undefined8 uStack_3180;
  undefined8 local_3178;
  undefined8 uStack_3170;
  undefined8 local_3168;
  undefined8 uStack_3160;
  undefined8 local_3158;
  undefined8 uStack_3150;
  undefined8 local_3148;
  undefined8 uStack_3140;
  undefined8 local_3138;
  undefined8 uStack_3130;
  undefined8 local_3128;
  undefined8 uStack_3120;
  undefined8 local_3118;
  undefined8 uStack_3110;
  undefined8 local_3108;
  undefined8 uStack_3100;
  float local_30f8;
  float fStack_30f4;
  float fStack_30f0;
  float fStack_30ec;
  undefined8 local_30e8;
  undefined8 uStack_30e0;
  undefined8 local_30d8;
  undefined8 uStack_30d0;
  undefined8 local_30c8;
  undefined8 uStack_30c0;
  undefined8 local_30b8;
  undefined8 uStack_30b0;
  undefined8 local_30a8;
  undefined8 uStack_30a0;
  ulong local_3098;
  ulong uStack_3090;
  undefined8 *local_3080;
  float *local_3078;
  float *local_3070;
  float local_3068 [2];
  float afStack_3060 [2];
  undefined8 local_3058;
  undefined8 uStack_3050;
  float local_3048;
  float fStack_3044;
  float fStack_3040;
  float fStack_303c;
  undefined8 local_3038;
  undefined8 uStack_3030;
  undefined8 *local_3020;
  float *local_3018;
  float *local_3010;
  float local_3008 [2];
  float afStack_3000 [2];
  undefined8 local_2ff8;
  undefined8 uStack_2ff0;
  float local_2fe8;
  float fStack_2fe4;
  float fStack_2fe0;
  float fStack_2fdc;
  undefined8 local_2fd8;
  undefined8 uStack_2fd0;
  undefined8 local_2fc8;
  undefined8 uStack_2fc0;
  undefined8 local_2fb8;
  undefined8 uStack_2fb0;
  undefined4 local_2f9c;
  undefined8 local_2f98;
  undefined8 uStack_2f90;
  undefined8 local_2f88;
  undefined8 uStack_2f80;
  undefined8 local_2f78;
  undefined8 uStack_2f70;
  float local_2f68;
  float fStack_2f64;
  float fStack_2f60;
  float fStack_2f5c;
  ulong local_2f58;
  ulong uStack_2f50;
  int local_2f48;
  int iStack_2f44;
  int iStack_2f40;
  int iStack_2f3c;
  float local_2f38;
  float fStack_2f34;
  float fStack_2f30;
  float fStack_2f2c;
  int local_2f28;
  int iStack_2f24;
  int iStack_2f20;
  int iStack_2f1c;
  undefined8 local_2f18;
  undefined8 uStack_2f10;
  int local_2f08;
  int iStack_2f04;
  int iStack_2f00;
  int iStack_2efc;
  undefined8 local_2ef8;
  undefined8 uStack_2ef0;
  undefined8 local_2ee8;
  undefined8 uStack_2ee0;
  undefined8 local_2ed8;
  undefined8 uStack_2ed0;
  undefined8 local_2ec8;
  undefined8 uStack_2ec0;
  undefined8 local_2eb8;
  undefined8 uStack_2eb0;
  undefined8 local_2ea8;
  undefined8 uStack_2ea0;
  undefined8 local_2e98;
  undefined8 uStack_2e90;
  undefined8 local_2e88;
  undefined8 uStack_2e80;
  undefined8 *local_2e70;
  float *local_2e68;
  float *local_2e60;
  float local_2e58 [2];
  float afStack_2e50 [2];
  undefined8 local_2e48;
  undefined8 uStack_2e40;
  undefined8 *local_2e30;
  float *local_2e28;
  float *local_2e20;
  float local_2e18 [2];
  float afStack_2e10 [2];
  undefined8 local_2e08;
  undefined8 uStack_2e00;
  float *local_2df0;
  undefined8 *local_2de8;
  undefined8 *local_2de0;
  undefined8 local_2dd8;
  undefined8 uStack_2dd0;
  undefined8 local_2dc8;
  undefined8 uStack_2dc0;
  float *local_2db0;
  undefined8 *local_2da8;
  undefined8 *local_2da0;
  undefined8 local_2d98;
  undefined8 uStack_2d90;
  undefined8 local_2d88;
  undefined8 uStack_2d80;
  float *local_2d70;
  undefined8 *local_2d68;
  undefined8 *local_2d60;
  undefined8 local_2d58;
  undefined8 uStack_2d50;
  undefined8 local_2d48;
  undefined8 uStack_2d40;
  float *local_2d30;
  undefined8 *local_2d28;
  undefined8 *local_2d20;
  undefined8 local_2d18;
  undefined8 uStack_2d10;
  undefined8 local_2d08;
  undefined8 uStack_2d00;
  float *local_2cf0;
  undefined8 *local_2ce8;
  undefined8 *local_2ce0;
  undefined8 local_2cd8;
  undefined8 uStack_2cd0;
  undefined8 local_2cc8;
  undefined8 uStack_2cc0;
  float *local_2cb0;
  undefined8 *local_2ca8;
  undefined8 *local_2ca0;
  undefined8 local_2c98;
  undefined8 uStack_2c90;
  undefined8 local_2c88;
  undefined8 uStack_2c80;
  float *local_2c70;
  undefined8 *local_2c68;
  undefined8 *local_2c60;
  undefined8 local_2c58;
  undefined8 uStack_2c50;
  undefined8 local_2c48;
  undefined8 uStack_2c40;
  float *local_2c30;
  undefined8 *local_2c28;
  undefined8 *local_2c20;
  undefined8 local_2c18;
  undefined8 uStack_2c10;
  undefined8 local_2c08;
  undefined8 uStack_2c00;
  undefined8 local_2bf8;
  undefined8 uStack_2bf0;
  undefined8 local_2be8;
  undefined8 uStack_2be0;
  undefined8 local_2bd8;
  undefined8 uStack_2bd0;
  float local_2bc8 [2];
  float afStack_2bc0 [2];
  float local_2bb8;
  float fStack_2bb4;
  float fStack_2bb0;
  float fStack_2bac;
  float local_2ba8 [2];
  float afStack_2ba0 [2];
  float local_2b98;
  float fStack_2b94;
  float fStack_2b90;
  float fStack_2b8c;
  float local_2b88 [2];
  float afStack_2b80 [2];
  float local_2b78;
  float fStack_2b74;
  float fStack_2b70;
  float fStack_2b6c;
  float local_2b68 [2];
  float afStack_2b60 [2];
  float local_2b58;
  float fStack_2b54;
  float fStack_2b50;
  float fStack_2b4c;
  float local_2b48 [2];
  float afStack_2b40 [2];
  float local_2b38;
  float fStack_2b34;
  float fStack_2b30;
  float fStack_2b2c;
  float local_2b28 [2];
  float afStack_2b20 [2];
  float local_2b18;
  float fStack_2b14;
  float fStack_2b10;
  float fStack_2b0c;
  float local_2b08 [2];
  float afStack_2b00 [2];
  float local_2af8;
  float fStack_2af4;
  float fStack_2af0;
  float fStack_2aec;
  float local_2ae8 [2];
  float afStack_2ae0 [2];
  float local_2ad8;
  float fStack_2ad4;
  float fStack_2ad0;
  float fStack_2acc;
  undefined8 local_2ac8;
  undefined8 uStack_2ac0;
  float local_2ab8;
  float fStack_2ab4;
  float fStack_2ab0;
  float fStack_2aac;
  undefined8 local_2aa8;
  undefined8 uStack_2aa0;
  float local_2a98;
  float fStack_2a94;
  float fStack_2a90;
  float fStack_2a8c;
  undefined8 local_2a88;
  undefined8 uStack_2a80;
  undefined8 local_2a78;
  undefined8 uStack_2a70;
  undefined8 local_2a68;
  undefined8 uStack_2a60;
  undefined8 local_2a58;
  undefined8 uStack_2a50;
  undefined8 local_2a48;
  undefined8 uStack_2a40;
  undefined8 local_2a38;
  undefined8 uStack_2a30;
  undefined8 local_2a28;
  undefined8 uStack_2a20;
  undefined8 local_2a18;
  undefined8 uStack_2a10;
  undefined8 local_2a08;
  undefined8 uStack_2a00;
  ulong local_29f8;
  ulong uStack_29f0;
  ulong local_29e8;
  ulong uStack_29e0;
  undefined8 local_29d8;
  undefined8 uStack_29d0;
  ulong local_29c8;
  ulong uStack_29c0;
  ulong local_29b8;
  ulong uStack_29b0;
  undefined8 local_29a8;
  undefined8 uStack_29a0;
  ulong local_2998;
  ulong uStack_2990;
  undefined8 *local_2980;
  float *local_2978;
  float *local_2970;
  float local_2968 [2];
  float afStack_2960 [2];
  undefined8 local_2958;
  undefined8 uStack_2950;
  float local_2948;
  float fStack_2944;
  float fStack_2940;
  float fStack_293c;
  undefined8 local_2938;
  undefined8 uStack_2930;
  undefined8 local_2928;
  undefined8 uStack_2920;
  float local_2918;
  float fStack_2914;
  float fStack_2910;
  float fStack_290c;
  ulong local_2908;
  ulong uStack_2900;
  int local_28f8;
  int iStack_28f4;
  int iStack_28f0;
  int iStack_28ec;
  float local_28e8;
  float fStack_28e4;
  float fStack_28e0;
  float fStack_28dc;
  int local_28d8;
  int iStack_28d4;
  int iStack_28d0;
  int iStack_28cc;
  undefined8 local_28c8;
  undefined8 uStack_28c0;
  int local_28b8;
  int iStack_28b4;
  int iStack_28b0;
  int iStack_28ac;
  undefined8 local_28a8;
  undefined8 uStack_28a0;
  undefined8 local_2898;
  undefined8 uStack_2890;
  undefined8 local_2888;
  undefined8 uStack_2880;
  undefined8 local_2878;
  undefined8 uStack_2870;
  undefined8 local_2868;
  undefined8 uStack_2860;
  undefined8 local_2858;
  undefined8 uStack_2850;
  undefined8 local_2848;
  undefined8 uStack_2840;
  undefined8 local_2838;
  undefined8 uStack_2830;
  undefined8 *local_2820;
  float *local_2818;
  float *local_2810;
  float local_2808 [2];
  float afStack_2800 [2];
  undefined8 local_27f8;
  undefined8 uStack_27f0;
  undefined8 *local_27e0;
  float *local_27d8;
  float *local_27d0;
  float local_27c8 [2];
  float afStack_27c0 [2];
  undefined8 local_27b8;
  undefined8 uStack_27b0;
  float *local_27a0;
  undefined8 *local_2798;
  undefined8 *local_2790;
  undefined8 local_2788;
  undefined8 uStack_2780;
  undefined8 local_2778;
  undefined8 uStack_2770;
  float *local_2760;
  undefined8 *local_2758;
  undefined8 *local_2750;
  undefined8 local_2748;
  undefined8 uStack_2740;
  undefined8 local_2738;
  undefined8 uStack_2730;
  float *local_2720;
  undefined8 *local_2718;
  undefined8 *local_2710;
  undefined8 local_2708;
  undefined8 uStack_2700;
  undefined8 local_26f8;
  undefined8 uStack_26f0;
  float *local_26e0;
  undefined8 *local_26d8;
  undefined8 *local_26d0;
  undefined8 local_26c8;
  undefined8 uStack_26c0;
  undefined8 local_26b8;
  undefined8 uStack_26b0;
  float *local_26a0;
  undefined8 *local_2698;
  undefined8 *local_2690;
  undefined8 local_2688;
  undefined8 uStack_2680;
  undefined8 local_2678;
  undefined8 uStack_2670;
  float *local_2660;
  undefined8 *local_2658;
  undefined8 *local_2650;
  undefined8 local_2648;
  undefined8 uStack_2640;
  undefined8 local_2638;
  undefined8 uStack_2630;
  float *local_2620;
  undefined8 *local_2618;
  undefined8 *local_2610;
  undefined8 local_2608;
  undefined8 uStack_2600;
  undefined8 local_25f8;
  undefined8 uStack_25f0;
  float *local_25e0;
  undefined8 *local_25d8;
  undefined8 *local_25d0;
  undefined8 local_25c8;
  undefined8 uStack_25c0;
  undefined8 local_25b8;
  undefined8 uStack_25b0;
  undefined8 local_25a8;
  undefined8 uStack_25a0;
  undefined8 local_2598;
  undefined8 uStack_2590;
  undefined8 local_2588;
  undefined8 uStack_2580;
  float local_2578 [2];
  float afStack_2570 [2];
  float local_2568;
  float fStack_2564;
  float fStack_2560;
  float fStack_255c;
  float local_2558 [2];
  float afStack_2550 [2];
  float local_2548;
  float fStack_2544;
  float fStack_2540;
  float fStack_253c;
  float local_2538 [2];
  float afStack_2530 [2];
  float local_2528;
  float fStack_2524;
  float fStack_2520;
  float fStack_251c;
  float local_2518 [2];
  float afStack_2510 [2];
  float local_2508;
  float fStack_2504;
  float fStack_2500;
  float fStack_24fc;
  float local_24f8 [2];
  float afStack_24f0 [2];
  float local_24e8;
  float fStack_24e4;
  float fStack_24e0;
  float fStack_24dc;
  float local_24d8 [2];
  float afStack_24d0 [2];
  float local_24c8;
  float fStack_24c4;
  float fStack_24c0;
  float fStack_24bc;
  float local_24b8 [2];
  float afStack_24b0 [2];
  float local_24a8;
  float fStack_24a4;
  float fStack_24a0;
  float fStack_249c;
  float local_2498 [2];
  float afStack_2490 [2];
  float local_2488;
  float fStack_2484;
  float fStack_2480;
  float fStack_247c;
  undefined8 local_2478;
  undefined8 uStack_2470;
  float local_2468;
  float fStack_2464;
  float fStack_2460;
  float fStack_245c;
  undefined8 local_2458;
  undefined8 uStack_2450;
  float local_2448;
  float fStack_2444;
  float fStack_2440;
  float fStack_243c;
  undefined8 local_2438;
  undefined8 uStack_2430;
  undefined8 local_2428;
  undefined8 uStack_2420;
  undefined8 local_2418;
  undefined8 uStack_2410;
  undefined8 local_2408;
  undefined8 uStack_2400;
  undefined8 local_23f8;
  undefined8 uStack_23f0;
  undefined8 local_23e8;
  undefined8 uStack_23e0;
  undefined8 local_23d8;
  undefined8 uStack_23d0;
  undefined8 local_23c8;
  undefined8 uStack_23c0;
  undefined8 local_23b8;
  undefined8 uStack_23b0;
  ulong local_23a8;
  ulong uStack_23a0;
  ulong local_2398;
  ulong uStack_2390;
  undefined8 local_2388;
  undefined8 uStack_2380;
  ulong local_2378;
  ulong uStack_2370;
  ulong local_2368;
  ulong uStack_2360;
  undefined8 local_2358;
  undefined8 uStack_2350;
  ulong local_2348;
  ulong uStack_2340;
  undefined8 *local_2330;
  float *local_2328;
  float *local_2320;
  float local_2318 [2];
  float afStack_2310 [2];
  undefined8 local_2308;
  undefined8 uStack_2300;
  float local_22f8;
  float fStack_22f4;
  float fStack_22f0;
  float fStack_22ec;
  undefined8 local_22e8;
  undefined8 uStack_22e0;
  undefined8 local_22d8;
  undefined8 uStack_22d0;
  float local_22c8;
  float fStack_22c4;
  float fStack_22c0;
  float fStack_22bc;
  ulong local_22b8;
  ulong uStack_22b0;
  int local_22a8;
  int iStack_22a4;
  int iStack_22a0;
  int iStack_229c;
  float local_2298;
  float fStack_2294;
  float fStack_2290;
  float fStack_228c;
  int local_2288;
  int iStack_2284;
  int iStack_2280;
  int iStack_227c;
  undefined8 local_2278;
  undefined8 uStack_2270;
  int local_2268;
  int iStack_2264;
  int iStack_2260;
  int iStack_225c;
  undefined8 local_2258;
  undefined8 uStack_2250;
  undefined8 local_2248;
  undefined8 uStack_2240;
  undefined8 local_2238;
  undefined8 uStack_2230;
  undefined8 local_2228;
  undefined8 uStack_2220;
  undefined8 local_2218;
  undefined8 uStack_2210;
  undefined8 local_2208;
  undefined8 uStack_2200;
  undefined8 local_21f8;
  undefined8 uStack_21f0;
  undefined8 local_21e8;
  undefined8 uStack_21e0;
  undefined8 *local_21d0;
  float *local_21c8;
  float *local_21c0;
  float local_21b8 [2];
  float afStack_21b0 [2];
  undefined8 local_21a8;
  undefined8 uStack_21a0;
  undefined8 *local_2190;
  float *local_2188;
  float *local_2180;
  float local_2178 [2];
  float afStack_2170 [2];
  undefined8 local_2168;
  undefined8 uStack_2160;
  float *local_2150;
  undefined8 *local_2148;
  undefined8 *local_2140;
  undefined8 local_2138;
  undefined8 uStack_2130;
  undefined8 local_2128;
  undefined8 uStack_2120;
  float *local_2110;
  undefined8 *local_2108;
  undefined8 *local_2100;
  undefined8 local_20f8;
  undefined8 uStack_20f0;
  undefined8 local_20e8;
  undefined8 uStack_20e0;
  float *local_20d0;
  undefined8 *local_20c8;
  undefined8 *local_20c0;
  undefined8 local_20b8;
  undefined8 uStack_20b0;
  undefined8 local_20a8;
  undefined8 uStack_20a0;
  float *local_2090;
  undefined8 *local_2088;
  undefined8 *local_2080;
  undefined8 local_2078;
  undefined8 uStack_2070;
  undefined8 local_2068;
  undefined8 uStack_2060;
  float *local_2050;
  undefined8 *local_2048;
  undefined8 *local_2040;
  undefined8 local_2038;
  undefined8 uStack_2030;
  undefined8 local_2028;
  undefined8 uStack_2020;
  float *local_2010;
  undefined8 *local_2008;
  undefined8 *local_2000;
  undefined8 local_1ff8;
  undefined8 uStack_1ff0;
  undefined8 local_1fe8;
  undefined8 uStack_1fe0;
  float *local_1fd0;
  undefined8 *local_1fc8;
  undefined8 *local_1fc0;
  undefined8 local_1fb8;
  undefined8 uStack_1fb0;
  undefined8 local_1fa8;
  undefined8 uStack_1fa0;
  float *local_1f90;
  undefined8 *local_1f88;
  undefined8 *local_1f80;
  undefined8 local_1f78;
  undefined8 uStack_1f70;
  undefined8 local_1f68;
  undefined8 uStack_1f60;
  undefined8 local_1f58;
  undefined8 uStack_1f50;
  undefined8 local_1f48;
  undefined8 uStack_1f40;
  undefined8 local_1f38;
  undefined8 uStack_1f30;
  float local_1f28 [2];
  float afStack_1f20 [2];
  float local_1f18;
  float fStack_1f14;
  float fStack_1f10;
  float fStack_1f0c;
  float local_1f08 [2];
  float afStack_1f00 [2];
  float local_1ef8;
  float fStack_1ef4;
  float fStack_1ef0;
  float fStack_1eec;
  float local_1ee8 [2];
  float afStack_1ee0 [2];
  float local_1ed8;
  float fStack_1ed4;
  float fStack_1ed0;
  float fStack_1ecc;
  float local_1ec8 [2];
  float afStack_1ec0 [2];
  float local_1eb8;
  float fStack_1eb4;
  float fStack_1eb0;
  float fStack_1eac;
  float local_1ea8 [2];
  float afStack_1ea0 [2];
  float local_1e98;
  float fStack_1e94;
  float fStack_1e90;
  float fStack_1e8c;
  float local_1e88 [2];
  float afStack_1e80 [2];
  float local_1e78;
  float fStack_1e74;
  float fStack_1e70;
  float fStack_1e6c;
  float local_1e68 [2];
  float afStack_1e60 [2];
  float local_1e58;
  float fStack_1e54;
  float fStack_1e50;
  float fStack_1e4c;
  float local_1e48 [2];
  float afStack_1e40 [2];
  float local_1e38;
  float fStack_1e34;
  float fStack_1e30;
  float fStack_1e2c;
  undefined8 local_1e28;
  undefined8 uStack_1e20;
  float local_1e18;
  float fStack_1e14;
  float fStack_1e10;
  float fStack_1e0c;
  undefined8 local_1e08;
  undefined8 uStack_1e00;
  float local_1df8;
  float fStack_1df4;
  float fStack_1df0;
  float fStack_1dec;
  undefined8 local_1de8;
  undefined8 uStack_1de0;
  undefined8 local_1dd8;
  undefined8 uStack_1dd0;
  undefined8 local_1dc8;
  undefined8 uStack_1dc0;
  undefined8 local_1db8;
  undefined8 uStack_1db0;
  undefined8 local_1da8;
  undefined8 uStack_1da0;
  undefined8 local_1d98;
  undefined8 uStack_1d90;
  undefined8 local_1d88;
  undefined8 uStack_1d80;
  undefined8 local_1d78;
  undefined8 uStack_1d70;
  undefined8 local_1d68;
  undefined8 uStack_1d60;
  ulong local_1d58;
  ulong uStack_1d50;
  ulong local_1d48;
  ulong uStack_1d40;
  undefined8 local_1d38;
  undefined8 uStack_1d30;
  ulong local_1d28;
  ulong uStack_1d20;
  ulong local_1d18;
  ulong uStack_1d10;
  undefined8 local_1d08;
  undefined8 uStack_1d00;
  ulong local_1cf8;
  ulong uStack_1cf0;
  undefined8 *local_1ce0;
  float *local_1cd8;
  float *local_1cd0;
  float local_1cc8 [2];
  float afStack_1cc0 [2];
  undefined8 local_1cb8;
  undefined8 uStack_1cb0;
  float local_1ca8;
  float fStack_1ca4;
  float fStack_1ca0;
  float fStack_1c9c;
  undefined8 local_1c98;
  undefined8 uStack_1c90;
  undefined8 local_1c88;
  undefined8 uStack_1c80;
  float local_1c78;
  float fStack_1c74;
  float fStack_1c70;
  float fStack_1c6c;
  ulong local_1c68;
  ulong uStack_1c60;
  int local_1c58;
  int iStack_1c54;
  int iStack_1c50;
  int iStack_1c4c;
  float local_1c48;
  float fStack_1c44;
  float fStack_1c40;
  float fStack_1c3c;
  int local_1c38;
  int iStack_1c34;
  int iStack_1c30;
  int iStack_1c2c;
  undefined8 local_1c28;
  undefined8 uStack_1c20;
  int local_1c18;
  int iStack_1c14;
  int iStack_1c10;
  int iStack_1c0c;
  undefined8 local_1c08;
  undefined8 uStack_1c00;
  undefined8 local_1bf8;
  undefined8 uStack_1bf0;
  undefined8 local_1be8;
  undefined8 uStack_1be0;
  undefined8 local_1bd8;
  undefined8 uStack_1bd0;
  undefined8 local_1bc8;
  undefined8 uStack_1bc0;
  undefined8 local_1bb8;
  undefined8 uStack_1bb0;
  undefined8 local_1ba8;
  undefined8 uStack_1ba0;
  undefined8 local_1b98;
  undefined8 uStack_1b90;
  undefined8 *local_1b80;
  float *local_1b78;
  float *local_1b70;
  float local_1b68 [2];
  float afStack_1b60 [2];
  undefined8 local_1b58;
  undefined8 uStack_1b50;
  undefined8 *local_1b40;
  float *local_1b38;
  float *local_1b30;
  float local_1b28 [2];
  float afStack_1b20 [2];
  undefined8 local_1b18;
  undefined8 uStack_1b10;
  float *local_1b00;
  undefined8 *local_1af8;
  undefined8 *local_1af0;
  undefined8 local_1ae8;
  undefined8 uStack_1ae0;
  undefined8 local_1ad8;
  undefined8 uStack_1ad0;
  float *local_1ac0;
  undefined8 *local_1ab8;
  undefined8 *local_1ab0;
  undefined8 local_1aa8;
  undefined8 uStack_1aa0;
  undefined8 local_1a98;
  undefined8 uStack_1a90;
  float *local_1a80;
  undefined8 *local_1a78;
  undefined8 *local_1a70;
  undefined8 local_1a68;
  undefined8 uStack_1a60;
  undefined8 local_1a58;
  undefined8 uStack_1a50;
  float *local_1a40;
  undefined8 *local_1a38;
  undefined8 *local_1a30;
  undefined8 local_1a28;
  undefined8 uStack_1a20;
  undefined8 local_1a18;
  undefined8 uStack_1a10;
  float *local_1a00;
  undefined8 *local_19f8;
  undefined8 *local_19f0;
  undefined8 local_19e8;
  undefined8 uStack_19e0;
  undefined8 local_19d8;
  undefined8 uStack_19d0;
  float *local_19c0;
  undefined8 *local_19b8;
  undefined8 *local_19b0;
  undefined8 local_19a8;
  undefined8 uStack_19a0;
  undefined8 local_1998;
  undefined8 uStack_1990;
  float *local_1980;
  undefined8 *local_1978;
  undefined8 *local_1970;
  undefined8 local_1968;
  undefined8 uStack_1960;
  undefined8 local_1958;
  undefined8 uStack_1950;
  float *local_1940;
  undefined8 *local_1938;
  undefined8 *local_1930;
  undefined8 local_1928;
  undefined8 uStack_1920;
  undefined8 local_1918;
  undefined8 uStack_1910;
  undefined8 local_1908;
  undefined8 uStack_1900;
  undefined8 local_18f8;
  undefined8 uStack_18f0;
  undefined8 local_18e8;
  undefined8 uStack_18e0;
  float local_18d8 [2];
  float afStack_18d0 [2];
  float local_18c8;
  float fStack_18c4;
  float fStack_18c0;
  float fStack_18bc;
  float local_18b8 [2];
  float afStack_18b0 [2];
  float local_18a8;
  float fStack_18a4;
  float fStack_18a0;
  float fStack_189c;
  float local_1898 [2];
  float afStack_1890 [2];
  float local_1888;
  float fStack_1884;
  float fStack_1880;
  float fStack_187c;
  float local_1878 [2];
  float afStack_1870 [2];
  float local_1868;
  float fStack_1864;
  float fStack_1860;
  float fStack_185c;
  float local_1858 [2];
  float afStack_1850 [2];
  float local_1848;
  float fStack_1844;
  float fStack_1840;
  float fStack_183c;
  float local_1838 [2];
  float afStack_1830 [2];
  float local_1828;
  float fStack_1824;
  float fStack_1820;
  float fStack_181c;
  float local_1818 [2];
  float afStack_1810 [2];
  float local_1808;
  float fStack_1804;
  float fStack_1800;
  float fStack_17fc;
  float local_17f8 [2];
  float afStack_17f0 [2];
  float local_17e8;
  float fStack_17e4;
  float fStack_17e0;
  float fStack_17dc;
  undefined8 local_17d8;
  undefined8 uStack_17d0;
  float local_17c8;
  float fStack_17c4;
  float fStack_17c0;
  float fStack_17bc;
  undefined8 local_17b8;
  undefined8 uStack_17b0;
  float local_17a8;
  float fStack_17a4;
  float fStack_17a0;
  float fStack_179c;
  undefined8 local_1798;
  undefined8 uStack_1790;
  undefined8 local_1788;
  undefined8 uStack_1780;
  undefined8 local_1778;
  undefined8 uStack_1770;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined8 local_1758;
  undefined8 uStack_1750;
  undefined8 local_1748;
  undefined8 uStack_1740;
  undefined8 local_1738;
  undefined8 uStack_1730;
  undefined8 local_1728;
  undefined8 uStack_1720;
  undefined8 local_1718;
  undefined8 uStack_1710;
  ulong local_1708;
  ulong uStack_1700;
  ulong local_16f8;
  ulong uStack_16f0;
  undefined8 local_16e8;
  undefined8 uStack_16e0;
  ulong local_16d8;
  ulong uStack_16d0;
  ulong local_16c8;
  ulong uStack_16c0;
  undefined8 local_16b8;
  undefined8 uStack_16b0;
  ulong local_16a8;
  ulong uStack_16a0;
  undefined8 *local_1690;
  float *local_1688;
  float *local_1680;
  float local_1678 [2];
  float afStack_1670 [2];
  undefined8 local_1668;
  undefined8 uStack_1660;
  float local_1658;
  float fStack_1654;
  float fStack_1650;
  float fStack_164c;
  undefined8 local_1648;
  undefined8 uStack_1640;
  undefined8 local_1638;
  undefined8 uStack_1630;
  float local_1628;
  float fStack_1624;
  float fStack_1620;
  float fStack_161c;
  ulong local_1618;
  ulong uStack_1610;
  int local_1608;
  int iStack_1604;
  int iStack_1600;
  int iStack_15fc;
  float local_15f8;
  float fStack_15f4;
  float fStack_15f0;
  float fStack_15ec;
  int local_15e8;
  int iStack_15e4;
  int iStack_15e0;
  int iStack_15dc;
  undefined8 local_15d8;
  undefined8 uStack_15d0;
  int local_15c8;
  int iStack_15c4;
  int iStack_15c0;
  int iStack_15bc;
  undefined8 local_15b8;
  undefined8 uStack_15b0;
  undefined8 local_15a8;
  undefined8 uStack_15a0;
  undefined8 local_1598;
  undefined8 uStack_1590;
  undefined8 local_1588;
  undefined8 uStack_1580;
  undefined8 local_1578;
  undefined8 uStack_1570;
  undefined8 local_1568;
  undefined8 uStack_1560;
  undefined8 local_1558;
  undefined8 uStack_1550;
  undefined8 local_1548;
  undefined8 uStack_1540;
  undefined8 *local_1530;
  float *local_1528;
  float *local_1520;
  float local_1518 [2];
  float afStack_1510 [2];
  undefined8 local_1508;
  undefined8 uStack_1500;
  undefined8 *local_14f0;
  float *local_14e8;
  float *local_14e0;
  float local_14d8 [2];
  float afStack_14d0 [2];
  undefined8 local_14c8;
  undefined8 uStack_14c0;
  float *local_14b0;
  undefined8 *local_14a8;
  undefined8 *local_14a0;
  undefined8 local_1498;
  undefined8 uStack_1490;
  undefined8 local_1488;
  undefined8 uStack_1480;
  float *local_1470;
  undefined8 *local_1468;
  undefined8 *local_1460;
  undefined8 local_1458;
  undefined8 uStack_1450;
  undefined8 local_1448;
  undefined8 uStack_1440;
  float *local_1430;
  undefined8 *local_1428;
  undefined8 *local_1420;
  undefined8 local_1418;
  undefined8 uStack_1410;
  undefined8 local_1408;
  undefined8 uStack_1400;
  float *local_13f0;
  undefined8 *local_13e8;
  undefined8 *local_13e0;
  undefined8 local_13d8;
  undefined8 uStack_13d0;
  undefined8 local_13c8;
  undefined8 uStack_13c0;
  float *local_13b0;
  undefined8 *local_13a8;
  undefined8 *local_13a0;
  undefined8 local_1398;
  undefined8 uStack_1390;
  undefined8 local_1388;
  undefined8 uStack_1380;
  float *local_1370;
  undefined8 *local_1368;
  undefined8 *local_1360;
  undefined8 local_1358;
  undefined8 uStack_1350;
  undefined8 local_1348;
  undefined8 uStack_1340;
  float *local_1330;
  undefined8 *local_1328;
  undefined8 *local_1320;
  undefined8 local_1318;
  undefined8 uStack_1310;
  undefined8 local_1308;
  undefined8 uStack_1300;
  float *local_12f0;
  undefined8 *local_12e8;
  undefined8 *local_12e0;
  undefined8 local_12d8;
  undefined8 uStack_12d0;
  undefined8 local_12c8;
  undefined8 uStack_12c0;
  undefined8 local_12b8;
  undefined8 uStack_12b0;
  undefined8 local_12a8;
  undefined8 uStack_12a0;
  undefined8 local_1298;
  undefined8 uStack_1290;
  float local_1288 [2];
  float afStack_1280 [2];
  float local_1278;
  float fStack_1274;
  float fStack_1270;
  float fStack_126c;
  float local_1268 [2];
  float afStack_1260 [2];
  float local_1258;
  float fStack_1254;
  float fStack_1250;
  float fStack_124c;
  float local_1248 [2];
  float afStack_1240 [2];
  float local_1238;
  float fStack_1234;
  float fStack_1230;
  float fStack_122c;
  float local_1228 [2];
  float afStack_1220 [2];
  float local_1218;
  float fStack_1214;
  float fStack_1210;
  float fStack_120c;
  float local_1208 [2];
  float afStack_1200 [2];
  float local_11f8;
  float fStack_11f4;
  float fStack_11f0;
  float fStack_11ec;
  float local_11e8 [2];
  float afStack_11e0 [2];
  float local_11d8;
  float fStack_11d4;
  float fStack_11d0;
  float fStack_11cc;
  float local_11c8 [2];
  float afStack_11c0 [2];
  float local_11b8;
  float fStack_11b4;
  float fStack_11b0;
  float fStack_11ac;
  float local_11a8 [2];
  float afStack_11a0 [2];
  float local_1198;
  float fStack_1194;
  float fStack_1190;
  float fStack_118c;
  undefined8 local_1188;
  undefined8 uStack_1180;
  float local_1178;
  float fStack_1174;
  float fStack_1170;
  float fStack_116c;
  undefined8 local_1168;
  undefined8 uStack_1160;
  float local_1158;
  float fStack_1154;
  float fStack_1150;
  float fStack_114c;
  undefined8 local_1148;
  undefined8 uStack_1140;
  undefined8 local_1138;
  undefined8 uStack_1130;
  undefined8 local_1128;
  undefined8 uStack_1120;
  undefined8 local_1118;
  undefined8 uStack_1110;
  undefined8 local_1108;
  undefined8 uStack_1100;
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  undefined8 local_10e8;
  undefined8 uStack_10e0;
  undefined8 local_10d8;
  undefined8 uStack_10d0;
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  ulong local_10b8;
  ulong uStack_10b0;
  ulong local_10a8;
  ulong uStack_10a0;
  undefined8 local_1098;
  undefined8 uStack_1090;
  ulong local_1088;
  ulong uStack_1080;
  ulong local_1078;
  ulong uStack_1070;
  undefined8 local_1068;
  undefined8 uStack_1060;
  ulong local_1058;
  ulong uStack_1050;
  undefined8 *local_1040;
  float *local_1038;
  float *local_1030;
  float local_1028 [2];
  float afStack_1020 [2];
  undefined8 local_1018;
  undefined8 uStack_1010;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  undefined8 local_fe8;
  undefined8 uStack_fe0;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  ulong local_fc8;
  ulong uStack_fc0;
  int local_fb8;
  int iStack_fb4;
  int iStack_fb0;
  int iStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  int local_f98;
  int iStack_f94;
  int iStack_f90;
  int iStack_f8c;
  undefined8 local_f88;
  undefined8 uStack_f80;
  int local_f78;
  int iStack_f74;
  int iStack_f70;
  int iStack_f6c;
  undefined8 local_f68;
  undefined8 uStack_f60;
  undefined8 local_f58;
  undefined8 uStack_f50;
  undefined8 local_f48;
  undefined8 uStack_f40;
  undefined8 local_f38;
  undefined8 uStack_f30;
  undefined8 local_f28;
  undefined8 uStack_f20;
  undefined8 local_f18;
  undefined8 uStack_f10;
  undefined8 local_f08;
  undefined8 uStack_f00;
  undefined8 local_ef8;
  undefined8 uStack_ef0;
  undefined8 *local_ee0;
  float *local_ed8;
  float *local_ed0;
  float local_ec8 [2];
  float afStack_ec0 [2];
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  undefined8 *local_ea0;
  float *local_e98;
  float *local_e90;
  float local_e88 [2];
  float afStack_e80 [2];
  undefined8 local_e78;
  undefined8 uStack_e70;
  float *local_e60;
  undefined8 *local_e58;
  undefined8 *local_e50;
  undefined8 local_e48;
  undefined8 uStack_e40;
  undefined8 local_e38;
  undefined8 uStack_e30;
  float *local_e20;
  undefined8 *local_e18;
  undefined8 *local_e10;
  undefined8 local_e08;
  undefined8 uStack_e00;
  undefined8 local_df8;
  undefined8 uStack_df0;
  float *local_de0;
  undefined8 *local_dd8;
  undefined8 *local_dd0;
  undefined8 local_dc8;
  undefined8 uStack_dc0;
  undefined8 local_db8;
  undefined8 uStack_db0;
  float *local_da0;
  undefined8 *local_d98;
  undefined8 *local_d90;
  undefined8 local_d88;
  undefined8 uStack_d80;
  undefined8 local_d78;
  undefined8 uStack_d70;
  float *local_d60;
  undefined8 *local_d58;
  undefined8 *local_d50;
  undefined8 local_d48;
  undefined8 uStack_d40;
  undefined8 local_d38;
  undefined8 uStack_d30;
  float *local_d20;
  undefined8 *local_d18;
  undefined8 *local_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  float *local_ce0;
  undefined8 *local_cd8;
  undefined8 *local_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  float *local_ca0;
  undefined8 *local_c98;
  undefined8 *local_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 local_c78;
  undefined8 uStack_c70;
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  float local_c38 [2];
  float afStack_c30 [2];
  float local_c28;
  float fStack_c24;
  float fStack_c20;
  float fStack_c1c;
  float local_c18 [2];
  float afStack_c10 [2];
  float local_c08;
  float fStack_c04;
  float fStack_c00;
  float fStack_bfc;
  float local_bf8 [2];
  float afStack_bf0 [2];
  float local_be8;
  float fStack_be4;
  float fStack_be0;
  float fStack_bdc;
  float local_bd8 [2];
  float afStack_bd0 [2];
  float local_bc8;
  float fStack_bc4;
  float fStack_bc0;
  float fStack_bbc;
  float local_bb8 [2];
  float afStack_bb0 [2];
  float local_ba8;
  float fStack_ba4;
  float fStack_ba0;
  float fStack_b9c;
  float local_b98 [2];
  float afStack_b90 [2];
  float local_b88;
  float fStack_b84;
  float fStack_b80;
  float fStack_b7c;
  float local_b78 [2];
  float afStack_b70 [2];
  float local_b68;
  float fStack_b64;
  float fStack_b60;
  float fStack_b5c;
  float local_b58 [2];
  float afStack_b50 [2];
  float local_b48;
  float fStack_b44;
  float fStack_b40;
  float fStack_b3c;
  undefined8 local_b38;
  undefined8 uStack_b30;
  float local_b28;
  float fStack_b24;
  float fStack_b20;
  float fStack_b1c;
  undefined8 local_b18;
  undefined8 uStack_b10;
  float local_b08;
  float fStack_b04;
  float fStack_b00;
  float fStack_afc;
  undefined8 local_af8;
  undefined8 uStack_af0;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  ulong local_a68;
  ulong uStack_a60;
  ulong local_a58;
  ulong uStack_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  ulong local_a38;
  ulong uStack_a30;
  ulong local_a28;
  ulong uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  ulong local_a08;
  ulong uStack_a00;
  undefined8 *local_9f0;
  float *local_9e8;
  float *local_9e0;
  float local_9d8 [2];
  float afStack_9d0 [2];
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  float local_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined4 local_8cc;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined4 local_8ac;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined4 local_88c;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined4 local_86c;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined4 local_84c;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined4 local_82c;
  undefined8 local_828;
  undefined8 uStack_820;
  ulong local_818;
  ulong uStack_810;
  ulong local_808;
  ulong uStack_800;
  ulong local_7f8;
  ulong uStack_7f0;
  ulong local_7e8;
  ulong uStack_7e0;
  ulong local_7d8;
  ulong uStack_7d0;
  ulong local_7c8;
  ulong uStack_7c0;
  ulong local_7b8;
  ulong uStack_7b0;
  ulong local_7a8;
  ulong uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  ulong local_788;
  ulong uStack_780;
  ulong local_778;
  ulong uStack_770;
  ulong local_768;
  ulong uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  ulong local_748;
  ulong uStack_740;
  ulong local_738;
  ulong uStack_730;
  ulong local_728;
  ulong uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  ulong local_708;
  ulong uStack_700;
  ulong local_6f8;
  ulong uStack_6f0;
  ulong local_6e8;
  ulong uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  ulong local_6c8;
  ulong uStack_6c0;
  ulong local_6b8;
  ulong uStack_6b0;
  ulong local_6a8;
  ulong uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  ulong local_688;
  ulong uStack_680;
  ulong local_678;
  ulong uStack_670;
  ulong local_668;
  ulong uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  ulong local_648;
  ulong uStack_640;
  ulong local_638;
  ulong uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  ulong local_618;
  ulong uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  ulong local_5f8;
  ulong uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  ulong local_5d8;
  ulong uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  ulong local_5b8;
  ulong uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  ulong local_598;
  ulong uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined4 local_3f8;
  undefined4 local_3f4;
  undefined4 local_3f0;
  undefined4 local_3ec;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined2 local_2e8;
  undefined2 local_2e6;
  undefined2 local_2e4;
  undefined2 local_2e2;
  undefined2 local_2e0;
  undefined2 local_2de;
  undefined2 local_2dc;
  undefined2 local_2da;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined4 local_188;
  undefined4 local_184;
  undefined4 local_180;
  undefined4 local_17c;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined4 local_168;
  undefined4 local_164;
  undefined4 local_160;
  undefined4 local_15c;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined4 local_148;
  undefined4 local_144;
  undefined4 local_140;
  undefined4 local_13c;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined4 local_128;
  undefined4 local_124;
  undefined4 local_120;
  undefined4 local_11c;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined2 local_108;
  undefined2 local_106;
  undefined2 local_104;
  undefined2 local_102;
  undefined2 local_100;
  undefined2 local_fe;
  undefined2 local_fc;
  undefined2 local_fa;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined2 local_e8;
  undefined2 local_e6;
  undefined2 local_e4;
  undefined2 local_e2;
  undefined2 local_e0;
  undefined2 local_de;
  undefined2 local_dc;
  undefined2 local_da;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined2 local_c8;
  undefined2 local_c6;
  undefined2 local_c4;
  undefined2 local_c2;
  undefined2 local_c0;
  undefined2 local_be;
  undefined2 local_bc;
  undefined2 local_ba;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined2 local_a8;
  undefined2 local_a6;
  undefined2 local_a4;
  undefined2 local_a2;
  undefined2 local_a0;
  undefined2 local_9e;
  undefined2 local_9c;
  undefined2 local_9a;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined2 local_88;
  undefined2 local_86;
  undefined2 local_84;
  undefined2 local_82;
  undefined2 local_80;
  undefined2 local_7e;
  undefined2 local_7c;
  undefined2 local_7a;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined2 local_68;
  undefined2 local_66;
  undefined2 local_64;
  undefined2 local_62;
  undefined2 local_60;
  undefined2 local_5e;
  undefined2 local_5c;
  undefined2 local_5a;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined2 local_48;
  undefined2 local_46;
  undefined2 local_44;
  undefined2 local_42;
  undefined2 local_40;
  undefined2 local_3e;
  undefined2 local_3c;
  undefined2 local_3a;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined2 local_20;
  undefined2 local_1e;
  undefined2 local_1c;
  undefined2 local_1a;
  undefined2 local_18;
  undefined2 local_16;
  undefined2 local_14;
  undefined2 local_12;
  
  uVar164 = uStack_bd00;
  uVar161 = local_bd08;
  uVar6 = uStack_bd20;
  uVar5 = local_bd28;
  uVar4 = uStack_bd40;
  uVar3 = local_bd48;
  uVar2 = uStack_bd60;
  uVar1 = local_bd68;
  local_bfb8 = *(int *)((long)in_RDX + 0x2c);
  local_bfbc = *(int *)((long)in_RCX + 0x2c);
  local_bfc0 = *(int *)((long)in_R8 + 0x2c);
  local_bfc4 = in_stack_00000010 * in_stack_00000018;
  local_bf68 = 0;
  local_bfc8 = *(float *)*in_RDX;
  local_bfe8 = CONCAT44(local_bfc8,local_bfc8);
  uStack_bfe0 = CONCAT44(local_bfc8,local_bfc8);
  local_bfd8 = local_bfe8;
  uStack_bfd0 = uStack_bfe0;
  if ((1 < local_bfb8) && (in_stack_00000018 == 8)) {
    local_bed0 = (undefined8 *)*in_RDX;
    local_bfd8 = *local_bed0;
    uStack_bfd0 = local_bed0[1];
    local_bed8 = (undefined8 *)(*in_RDX + 0x10);
    local_bfe8 = *local_bed8;
    uStack_bfe0 = *(undefined8 *)(*in_RDX + 0x18);
  }
  local_bf78 = 0;
  local_bfec = *(float *)*in_R8;
  local_c018 = CONCAT44(local_bfec,local_bfec);
  uStack_c010 = CONCAT44(local_bfec,local_bfec);
  local_c008 = local_c018;
  uStack_c000 = uStack_c010;
  if ((1 < local_bfc0) && (in_stack_00000018 == 8)) {
    local_bee0 = (undefined8 *)*in_R8;
    local_c008 = *local_bee0;
    uStack_c000 = local_bee0[1];
    local_bee8 = (undefined8 *)(*in_R8 + 0x10);
    local_c018 = *local_bee8;
    uStack_c010 = *(undefined8 *)(*in_R8 + 0x18);
  }
  local_bd68._0_4_ = (float)local_c018;
  fVar173 = (float)local_bd68;
  local_bd68._4_4_ = (float)((ulong)local_c018 >> 0x20);
  fVar183 = local_bd68._4_4_;
  uStack_bd60._0_4_ = (float)uStack_c010;
  fVar191 = (float)uStack_bd60;
  uStack_bd60._4_4_ = (float)((ulong)uStack_c010 >> 0x20);
  fVar199 = uStack_bd60._4_4_;
  local_bd48._0_4_ = (float)local_c008;
  fVar175 = (float)local_bd48;
  local_bd48._4_4_ = (float)((ulong)local_c008 >> 0x20);
  fVar185 = local_bd48._4_4_;
  uStack_bd40._0_4_ = (float)uStack_c000;
  fVar193 = (float)uStack_bd40;
  uStack_bd40._4_4_ = (float)((ulong)uStack_c000 >> 0x20);
  fVar201 = uStack_bd40._4_4_;
  local_bd08._0_4_ = (float)local_bfd8;
  fVar160 = (float)local_bd08;
  local_bd08._4_4_ = (float)((ulong)local_bfd8 >> 0x20);
  fVar162 = local_bd08._4_4_;
  uStack_bd00._0_4_ = (float)uStack_bfd0;
  fVar163 = (float)uStack_bd00;
  uStack_bd00._4_4_ = (float)((ulong)uStack_bfd0 >> 0x20);
  fVar165 = uStack_bd00._4_4_;
  local_bd28._0_4_ = (float)local_bfe8;
  fVar174 = (float)local_bd28;
  local_bd28._4_4_ = (float)((ulong)local_bfe8 >> 0x20);
  fVar184 = local_bd28._4_4_;
  uStack_bd20._0_4_ = (float)uStack_bfe0;
  fVar192 = (float)uStack_bd20;
  uStack_bd20._4_4_ = (float)((ulong)uStack_bfe0 >> 0x20);
  fVar200 = uStack_bd20._4_4_;
  local_bfb4 = in_R9D;
  local_bf98 = in_RSI;
  local_bf90 = in_RDI;
  local_bf38 = local_bfec;
  fStack_bf34 = local_bfec;
  fStack_bf30 = local_bfec;
  fStack_bf2c = local_bfec;
  local_bf28 = local_bfec;
  local_bf18 = local_bfc8;
  fStack_bf14 = local_bfc8;
  fStack_bf10 = local_bfc8;
  fStack_bf0c = local_bfc8;
  local_bf08 = local_bfc8;
  if (local_bfbc == 0) {
    local_bd68 = uVar1;
    uStack_bd60 = uVar2;
    local_bd48 = uVar3;
    uStack_bd40 = uVar4;
    local_bd28 = uVar5;
    uStack_bd20 = uVar6;
    local_bd08 = uVar161;
    uStack_bd00 = uVar164;
    for (local_c01c = 0; local_c01c + 7 < local_bfc4; local_c01c = local_c01c + 8) {
      local_be10 = local_bf90;
      uVar1 = *(undefined8 *)local_bf90;
      uVar2 = *(undefined8 *)(local_bf90 + 2);
      local_be48._0_4_ = (int)uVar1;
      local_be48._4_4_ = (int)((ulong)uVar1 >> 0x20);
      uStack_be40._0_4_ = (int)uVar2;
      uStack_be40._4_4_ = (int)((ulong)uVar2 >> 0x20);
      local_c038 = CONCAT44((float)local_be48._4_4_,(float)(int)local_be48);
      uStack_c030 = CONCAT44((float)uStack_be40._4_4_,(float)(int)uStack_be40);
      local_be18 = local_bf90 + 4;
      uVar3 = *(undefined8 *)local_be18;
      uVar4 = *(undefined8 *)(local_bf90 + 6);
      local_be58._0_4_ = (int)uVar3;
      local_be58._4_4_ = (int)((ulong)uVar3 >> 0x20);
      uStack_be50._0_4_ = (int)uVar4;
      uStack_be50._4_4_ = (int)((ulong)uVar4 >> 0x20);
      local_c048 = CONCAT44((float)local_be58._4_4_,(float)(int)local_be58);
      uStack_c040 = CONCAT44((float)uStack_be50._4_4_,(float)(int)uStack_be50);
      local_bcf8 = local_c038;
      uStack_bcf0 = uStack_c030;
      local_bd08 = local_bfd8;
      uStack_bd00 = uStack_bfd0;
      fVar170 = (float)(int)local_be48 * fVar160;
      fVar180 = (float)local_be48._4_4_ * fVar162;
      fVar188 = (float)(int)uStack_be40 * fVar163;
      fVar196 = (float)uStack_be40._4_4_ * fVar165;
      local_c038 = CONCAT44(fVar180,fVar170);
      uStack_c030 = CONCAT44(fVar196,fVar188);
      local_bd18 = local_c048;
      uStack_bd10 = uStack_c040;
      local_bd28 = local_bfe8;
      uStack_bd20 = uStack_bfe0;
      fVar171 = (float)(int)local_be58 * fVar174;
      fVar181 = (float)local_be58._4_4_ * fVar184;
      fVar189 = (float)(int)uStack_be50 * fVar192;
      fVar197 = (float)uStack_be50._4_4_ * fVar200;
      local_c048 = CONCAT44(fVar181,fVar171);
      uStack_c040 = CONCAT44(fVar197,fVar189);
      local_b658 = local_c038;
      uStack_b650 = uStack_c030;
      switch(in_R9D) {
      case 1:
        local_aed8 = 0;
        uStack_aed0 = 0;
        local_b048 = local_c038;
        uStack_b040 = uStack_c030;
        local_b058 = 0;
        uStack_b050 = 0;
        auVar7._8_8_ = uStack_c030;
        auVar7._0_8_ = local_c038;
        _local_b648 = maxps(auVar7,ZEXT816(0));
        break;
      case 2:
        local_b5f8 = 0;
        local_ae4c = *(float *)*in_stack_00000008;
        local_ae48 = local_c038;
        uStack_ae40 = uStack_c030;
        local_adc8 = 0;
        uStack_adc0 = 0;
        local_ade8 = 0;
        uStack_ade0 = 0;
        local_adf8 = local_c038;
        uStack_adf0 = uStack_c030;
        auVar25._8_8_ = uStack_c030;
        auVar25._0_8_ = local_c038;
        local_ae68 = maxps(ZEXT816(0),auVar25);
        local_add8 = 0;
        uStack_add0 = 0;
        local_a948 = 0;
        uStack_a940 = 0;
        local_a958 = local_c038;
        uStack_a950 = uStack_c030;
        auVar36._8_8_ = uStack_c030;
        auVar36._0_8_ = local_c038;
        local_ae78 = minps(ZEXT816(0),auVar36);
        local_ae08 = CONCAT44(local_ae4c,local_ae4c);
        uStack_ae00 = CONCAT44(local_ae4c,local_ae4c);
        local_ae18 = local_ae78._0_8_;
        uVar5 = local_ae18;
        uStack_ae10 = local_ae78._8_8_;
        uVar6 = uStack_ae10;
        local_ae18._0_4_ = local_ae78._0_4_;
        local_ae18._4_4_ = local_ae78._4_4_;
        uStack_ae10._0_4_ = local_ae78._8_4_;
        uStack_ae10._4_4_ = local_ae78._12_4_;
        local_9c38 = local_ae4c * (float)local_ae18;
        fStack_9c34 = local_ae4c * local_ae18._4_4_;
        fStack_9c30 = local_ae4c * (float)uStack_ae10;
        fStack_9c2c = local_ae4c * uStack_ae10._4_4_;
        local_9c28 = local_ae68._0_8_;
        uVar161 = local_9c28;
        uStack_9c20 = local_ae68._8_8_;
        uVar164 = uStack_9c20;
        local_9c28._0_4_ = local_ae68._0_4_;
        local_9c28._4_4_ = local_ae68._4_4_;
        uStack_9c20._0_4_ = local_ae68._8_4_;
        uStack_9c20._4_4_ = local_ae68._12_4_;
        local_b648._4_4_ = local_9c28._4_4_ + fStack_9c34;
        local_b648._0_4_ = (float)local_9c28 + local_9c38;
        uStack_b640._0_4_ = (float)uStack_9c20 + fStack_9c30;
        uStack_b640._4_4_ = uStack_9c20._4_4_ + fStack_9c2c;
        local_ae38 = local_ae4c;
        fStack_ae34 = local_ae4c;
        fStack_ae30 = local_ae4c;
        fStack_ae2c = local_ae4c;
        local_ae28 = local_ae4c;
        local_ae18 = uVar5;
        uStack_ae10 = uVar6;
        local_9c28 = uVar161;
        uStack_9c20 = uVar164;
        break;
      case 3:
        local_b608 = 0;
        local_b588 = *(undefined4 *)*in_stack_00000008;
        local_b678 = CONCAT44(local_b588,local_b588);
        uStack_b670 = CONCAT44(local_b588,local_b588);
        local_b618 = 1;
        local_b5a8 = *(undefined4 *)(*in_stack_00000008 + 4);
        local_b688 = CONCAT44(local_b5a8,local_b5a8);
        uStack_b680 = CONCAT44(local_b5a8,local_b5a8);
        local_b028 = local_c038;
        uStack_b020 = uStack_c030;
        auVar9._8_8_ = uStack_c030;
        auVar9._0_8_ = local_c038;
        auVar8._8_8_ = uStack_b670;
        auVar8._0_8_ = local_b678;
        local_a928 = maxps(auVar9,auVar8);
        auVar37._8_8_ = uStack_b680;
        auVar37._0_8_ = local_b688;
        _local_b648 = minps(local_a928,auVar37);
        uStack_b5a4 = local_b5a8;
        uStack_b5a0 = local_b5a8;
        uStack_b59c = local_b5a8;
        local_b598 = local_b5a8;
        uStack_b584 = local_b588;
        uStack_b580 = local_b588;
        uStack_b57c = local_b588;
        local_b56c = local_b588;
        local_b038 = local_b678;
        uStack_b030 = uStack_b670;
        local_a938 = local_b688;
        uStack_a930 = uStack_b680;
        break;
      case 4:
        local_a868 = local_c038;
        uStack_a860 = uStack_c030;
        local_a83c = 0x3f800000;
        local_a858 = 0x3f800000;
        uStack_a854 = 0x3f800000;
        uStack_a850 = 0x3f800000;
        uStack_a84c = 0x3f800000;
        local_a878 = 0x3f8000003f800000;
        uStack_a870 = 0x3f8000003f800000;
        local_a838 = 0;
        uStack_a830 = 0;
        local_6b08 = 0;
        uStack_6b00 = 0;
        local_6b18 = local_c038;
        uStack_6b10 = uStack_c030;
        local_7088 = CONCAT44(0.0 - fVar180,0.0 - fVar170);
        uStack_7080._0_4_ = 0.0 - fVar188;
        uStack_7080._4_4_ = 0.0 - fVar196;
        local_6e68 = 0;
        uStack_6e60 = 0;
        local_70c8 = 0x3f8000003f800000;
        uStack_70c0 = 0x3f8000003f800000;
        local_6e48 = local_7088;
        uStack_6e40 = uStack_7080;
        local_6e58 = 0x42b0c0a542b0c0a5;
        uStack_6e50 = 0x42b0c0a542b0c0a5;
        auVar101._8_8_ = uStack_7080;
        auVar101._0_8_ = local_7088;
        auVar100._8_8_ = 0x42b0c0a542b0c0a5;
        auVar100._0_8_ = 0x42b0c0a542b0c0a5;
        auVar177 = minps(auVar101,auVar100);
        local_7088 = auVar177._0_8_;
        uStack_7080 = auVar177._8_8_;
        local_6e78 = local_7088;
        uStack_6e70 = uStack_7080;
        local_6e88 = 0xc2b0c0a5c2b0c0a5;
        uStack_6e80 = 0xc2b0c0a5c2b0c0a5;
        auVar99._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar99._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar177 = maxps(auVar177,auVar99);
        local_7088 = auVar177._0_8_;
        uStack_7080 = auVar177._8_8_;
        local_7018 = local_7088;
        uVar5 = local_7018;
        uStack_7010 = uStack_7080;
        uVar6 = uStack_7010;
        local_7028 = 0x3fb8aa3b3fb8aa3b;
        uStack_7020 = 0x3fb8aa3b3fb8aa3b;
        local_7018._0_4_ = auVar177._0_4_;
        local_7018._4_4_ = auVar177._4_4_;
        uStack_7010._0_4_ = auVar177._8_4_;
        uStack_7010._4_4_ = auVar177._12_4_;
        local_6d48 = CONCAT44(local_7018._4_4_ * 1.442695,(float)local_7018 * 1.442695);
        uStack_6d40 = CONCAT44(uStack_7010._4_4_ * 1.442695,(float)uStack_7010 * 1.442695);
        local_6d58 = 0x3f0000003f000000;
        uStack_6d50 = 0x3f0000003f000000;
        fVar170 = (float)local_7018 * 1.442695 + 0.5;
        fVar180 = local_7018._4_4_ * 1.442695 + 0.5;
        fVar188 = (float)uStack_7010 * 1.442695 + 0.5;
        fVar196 = uStack_7010._4_4_ * 1.442695 + 0.5;
        local_6ae8 = CONCAT44(fVar180,fVar170);
        uStack_6ae0 = CONCAT44(fVar196,fVar188);
        local_7078 = CONCAT44((int)fVar180,(int)fVar170);
        uStack_7070 = CONCAT44((int)fVar196,(int)fVar188);
        local_70a8 = (float)(int)fVar170;
        fStack_70a4 = (float)(int)fVar180;
        fStack_70a0 = (float)(int)fVar188;
        fStack_709c = (float)(int)fVar196;
        local_7098 = CONCAT44(fStack_70a4,local_70a8);
        uStack_7090 = CONCAT44(fStack_709c,fStack_70a0);
        local_6918 = CONCAT44(fVar180,fVar170);
        uStack_6910 = CONCAT44(fVar196,fVar188);
        local_6908 = local_7098;
        uStack_6900 = uStack_7090;
        local_70d8 = CONCAT44(-(uint)(fVar180 < fStack_70a4),-(uint)(fVar170 < local_70a8));
        uStack_70d0 = CONCAT44(-(uint)(fVar196 < fStack_709c),-(uint)(fVar188 < fStack_70a0));
        local_6788 = local_70d8;
        uStack_6780 = uStack_70d0;
        local_6798 = 0x3f8000003f800000;
        uStack_6790 = 0x3f8000003f800000;
        local_70d8 = local_70d8 & 0x3f8000003f800000;
        uStack_70d0 = uStack_70d0 & 0x3f8000003f800000;
        local_6d28 = local_7098;
        uStack_6d20 = uStack_7090;
        local_6d38._0_4_ = (float)local_70d8;
        local_6d38._4_4_ = (float)(local_70d8 >> 0x20);
        uStack_6d30._0_4_ = (float)uStack_70d0;
        uStack_6d30._4_4_ = (float)(uStack_70d0 >> 0x20);
        local_70a8 = local_70a8 - (float)local_6d38;
        fStack_70a4 = fStack_70a4 - local_6d38._4_4_;
        fStack_70a0 = fStack_70a0 - (float)uStack_6d30;
        fStack_709c = fStack_709c - uStack_6d30._4_4_;
        local_6540 = &local_70a8;
        local_64e8 = ::_ps_cephes_exp_C1;
        local_7000 = &local_7088;
        local_64a8 = local_7088;
        uStack_64a0 = uStack_7080;
        local_64c8 = CONCAT44(fStack_70a4,local_70a8);
        uStack_64c0 = CONCAT44(fStack_709c,fStack_70a0);
        local_64d8[0] = 0.6933594;
        local_64d8[1] = 0.6933594;
        afStack_64d0[0] = 0.6933594;
        afStack_64d0[1] = 0.6933594;
        local_64b8 = local_70a8 * 0.6933594;
        fStack_64b4 = fStack_70a4 * 0.6933594;
        fStack_64b0 = fStack_70a0 * 0.6933594;
        fStack_64ac = fStack_709c * 0.6933594;
        local_7088 = CONCAT44(local_7018._4_4_ - fStack_64b4,(float)local_7018 - local_64b8);
        uStack_7080._0_4_ = (float)uStack_7010 - fStack_64b0;
        uStack_7080._4_4_ = uStack_7010._4_4_ - fStack_64ac;
        local_6548 = ::_ps_cephes_exp_C2;
        local_6508 = local_7088;
        uStack_6500 = uStack_7080;
        local_6528 = CONCAT44(fStack_70a4,local_70a8);
        uStack_6520 = CONCAT44(fStack_709c,fStack_70a0);
        local_6538[0] = -0.00021219444;
        local_6538[1] = -0.00021219444;
        afStack_6530[0] = -0.00021219444;
        afStack_6530[1] = -0.00021219444;
        local_6518 = local_70a8 * -0.00021219444;
        fStack_6514 = fStack_70a4 * -0.00021219444;
        fStack_6510 = fStack_70a0 * -0.00021219444;
        fStack_650c = fStack_709c * -0.00021219444;
        fVar170 = ((float)local_7018 - local_64b8) - local_6518;
        fVar180 = (local_7018._4_4_ - fStack_64b4) - fStack_6514;
        fVar188 = ((float)uStack_7010 - fStack_64b0) - fStack_6510;
        fVar196 = (uStack_7010._4_4_ - fStack_64ac) - fStack_650c;
        local_7088 = CONCAT44(fVar180,fVar170);
        uStack_7080._0_4_ = fVar188;
        uStack_7080._4_4_ = fVar196;
        local_7038 = local_7088;
        uStack_7030 = uStack_7080;
        local_7048 = local_7088;
        uStack_7040 = uStack_7080;
        local_7098 = CONCAT44(fVar180 * fVar180,fVar170 * fVar170);
        uStack_7090 = CONCAT44(fVar196 * fVar196,fVar188 * fVar188);
        local_6ff0 = &local_70e8;
        local_6ec0 = ::_ps_cephes_exp_p1;
        local_6e98 = 0x3950696739506967;
        uStack_6e90 = 0x3950696739506967;
        local_6ea8 = local_7088;
        uStack_6ea0 = uStack_7080;
        local_6e28 = fVar170 * 0.00019875691;
        fStack_6e24 = fVar180 * 0.00019875691;
        fStack_6e20 = fVar188 * 0.00019875691;
        fStack_6e1c = fVar196 * 0.00019875691;
        local_6e38[0] = 0.0013981999;
        local_6e38[1] = 0.0013981999;
        afStack_6e30[0] = 0.0013981999;
        afStack_6e30[1] = 0.0013981999;
        local_70e8 = CONCAT44(fStack_6e24 + 0.0013981999,local_6e28 + 0.0013981999);
        uStack_70e0 = CONCAT44(fStack_6e1c + 0.0013981999,fStack_6e20 + 0.0013981999);
        local_6f00 = ::_ps_cephes_exp_p2;
        local_6ed8 = local_70e8;
        uStack_6ed0 = uStack_70e0;
        local_6ee8 = local_7088;
        uStack_6ee0 = uStack_7080;
        local_6e08 = (local_6e28 + 0.0013981999) * fVar170;
        fStack_6e04 = (fStack_6e24 + 0.0013981999) * fVar180;
        fStack_6e00 = (fStack_6e20 + 0.0013981999) * fVar188;
        fStack_6dfc = (fStack_6e1c + 0.0013981999) * fVar196;
        local_6e18[0] = 0.008333452;
        local_6e18[1] = 0.008333452;
        afStack_6e10[0] = 0.008333452;
        afStack_6e10[1] = 0.008333452;
        local_70e8 = CONCAT44(fStack_6e04 + 0.008333452,local_6e08 + 0.008333452);
        uStack_70e0 = CONCAT44(fStack_6dfc + 0.008333452,fStack_6e00 + 0.008333452);
        local_6f40 = ::_ps_cephes_exp_p3;
        local_6f18 = local_70e8;
        uStack_6f10 = uStack_70e0;
        local_6f28 = local_7088;
        uStack_6f20 = uStack_7080;
        local_6de8 = (local_6e08 + 0.008333452) * fVar170;
        fStack_6de4 = (fStack_6e04 + 0.008333452) * fVar180;
        fStack_6de0 = (fStack_6e00 + 0.008333452) * fVar188;
        fStack_6ddc = (fStack_6dfc + 0.008333452) * fVar196;
        local_6df8[0] = 0.041665796;
        local_6df8[1] = 0.041665796;
        afStack_6df0[0] = 0.041665796;
        afStack_6df0[1] = 0.041665796;
        local_70e8 = CONCAT44(fStack_6de4 + 0.041665796,local_6de8 + 0.041665796);
        uStack_70e0 = CONCAT44(fStack_6ddc + 0.041665796,fStack_6de0 + 0.041665796);
        local_6f80 = ::_ps_cephes_exp_p4;
        local_6f58 = local_70e8;
        uStack_6f50 = uStack_70e0;
        local_6f68 = local_7088;
        uStack_6f60 = uStack_7080;
        local_6dc8 = (local_6de8 + 0.041665796) * fVar170;
        fStack_6dc4 = (fStack_6de4 + 0.041665796) * fVar180;
        fStack_6dc0 = (fStack_6de0 + 0.041665796) * fVar188;
        fStack_6dbc = (fStack_6ddc + 0.041665796) * fVar196;
        local_6dd8[0] = 0.16666666;
        local_6dd8[1] = 0.16666666;
        afStack_6dd0[0] = 0.16666666;
        afStack_6dd0[1] = 0.16666666;
        local_70e8 = CONCAT44(fStack_6dc4 + 0.16666666,local_6dc8 + 0.16666666);
        uStack_70e0 = CONCAT44(fStack_6dbc + 0.16666666,fStack_6dc0 + 0.16666666);
        local_6fc0 = ::_ps_cephes_exp_p5;
        local_6f98 = local_70e8;
        uStack_6f90 = uStack_70e0;
        local_6fa8 = local_7088;
        uStack_6fa0 = uStack_7080;
        local_6da8 = (local_6dc8 + 0.16666666) * fVar170;
        fStack_6da4 = (fStack_6dc4 + 0.16666666) * fVar180;
        fStack_6da0 = (fStack_6dc0 + 0.16666666) * fVar188;
        fStack_6d9c = (fStack_6dbc + 0.16666666) * fVar196;
        local_6db8[0] = 0.5;
        local_6db8[1] = 0.5;
        afStack_6db0[0] = 0.5;
        afStack_6db0[1] = 0.5;
        local_70e8 = CONCAT44(fStack_6da4 + 0.5,local_6da8 + 0.5);
        uStack_70e0 = CONCAT44(fStack_6d9c + 0.5,fStack_6da0 + 0.5);
        local_6ff8 = &local_7098;
        local_6fd8 = local_70e8;
        uStack_6fd0 = uStack_70e0;
        local_6fe8 = local_7098;
        uStack_6fe0 = uStack_7090;
        local_6d88 = (local_6da8 + 0.5) * fVar170 * fVar170;
        fStack_6d84 = (fStack_6da4 + 0.5) * fVar180 * fVar180;
        fStack_6d80 = (fStack_6da0 + 0.5) * fVar188 * fVar188;
        fStack_6d7c = (fStack_6d9c + 0.5) * fVar196 * fVar196;
        local_6d98 = local_7088;
        uStack_6d90 = uStack_7080;
        local_70e8 = CONCAT44(fStack_6d84 + fVar180,local_6d88 + fVar170);
        uStack_70e0 = CONCAT44(fStack_6d7c + fVar196,fStack_6d80 + fVar188);
        local_6d68 = local_70e8;
        uStack_6d60 = uStack_70e0;
        local_6d78 = 0x3f8000003f800000;
        uStack_6d70 = 0x3f8000003f800000;
        local_9a58 = local_6d88 + fVar170 + 1.0;
        fStack_9a54 = fStack_6d84 + fVar180 + 1.0;
        fStack_9a50 = fStack_6d80 + fVar188 + 1.0;
        fStack_9a4c = fStack_6d7c + fVar196 + 1.0;
        local_70e8 = CONCAT44(fStack_9a54,local_9a58);
        uStack_70e0 = CONCAT44(fStack_9a4c,fStack_9a50);
        local_6af8 = CONCAT44(fStack_70a4,local_70a8);
        uStack_6af0 = CONCAT44(fStack_709c,fStack_70a0);
        local_5c48 = CONCAT44((int)fStack_70a4,(int)local_70a8);
        uStack_5c40 = CONCAT44((int)fStack_709c,(int)fStack_70a0);
        local_5c58 = 0x7f0000007f;
        uStack_5c50 = 0x7f0000007f;
        iVar203 = (int)local_70a8 + 0x7f;
        fStack_70b4 = (float)((int)fStack_70a4 + 0x7f);
        fStack_70b0 = (float)((int)fStack_70a0 + 0x7f);
        fStack_70ac = (float)((int)fStack_709c + 0x7f);
        local_5ac8 = CONCAT44(fStack_70b4,iVar203);
        uStack_5ac0 = CONCAT44(fStack_70ac,fStack_70b0);
        local_5acc = 0x17;
        local_70b8 = (float)(iVar203 * 0x800000);
        local_70f8 = CONCAT44(fStack_70b4,local_70b8);
        uStack_70f0 = CONCAT44(fStack_70ac,fStack_70b0);
        local_7058 = local_70e8;
        uStack_7050 = uStack_70e0;
        local_9a58 = local_9a58 * local_70b8;
        fStack_9a54 = fStack_9a54 * fStack_70b4;
        fStack_9a50 = fStack_9a50 * fStack_70b0;
        fStack_9a4c = fStack_9a4c * fStack_70ac;
        local_70e8 = CONCAT44(fStack_9a54,local_9a58);
        uStack_70e0 = CONCAT44(fStack_9a4c,fStack_9a50);
        local_9cf8 = local_70e8;
        uStack_9cf0 = uStack_70e0;
        local_9a58 = local_9a58 + 1.0;
        fStack_9a54 = fStack_9a54 + 1.0;
        fStack_9a50 = fStack_9a50 + 1.0;
        fStack_9a4c = fStack_9a4c + 1.0;
        auVar65._8_8_ = 0x3f8000003f800000;
        auVar65._0_8_ = 0x3f8000003f800000;
        auVar64._4_4_ = fStack_9a54;
        auVar64._0_4_ = local_9a58;
        auVar64._8_4_ = fStack_9a50;
        auVar64._12_4_ = fStack_9a4c;
        _local_b648 = divps(auVar65,auVar64);
        local_9ce8 = local_a878;
        uStack_9ce0 = uStack_a870;
        local_9a48 = local_a878;
        uStack_9a40 = uStack_a870;
        local_7068 = local_70f8;
        uStack_7060 = uStack_70f0;
        local_7018 = uVar5;
        uStack_7010 = uVar6;
        local_6fb8 = local_7000;
        local_6fb0 = local_6ff0;
        local_6f78 = local_7000;
        local_6f70 = local_6ff0;
        local_6f38 = local_7000;
        local_6f30 = local_6ff0;
        local_6ef8 = local_7000;
        local_6ef0 = local_6ff0;
        local_6eb8 = local_7000;
        local_6eb0 = local_6ff0;
        local_6d38 = local_70d8;
        uStack_6d30 = uStack_70d0;
        local_6550 = local_7000;
        local_64f0 = local_7000;
        local_64e0 = local_6540;
        local_5958 = local_70f8;
        uStack_5950 = uStack_70f0;
        break;
      case 5:
        local_a698 = local_c038;
        uStack_a690 = uStack_c030;
        local_84e8 = 0;
        uStack_84e0 = 0;
        local_8748 = 0x3f8000003f800000;
        uStack_8740 = 0x3f8000003f800000;
        local_84c8 = local_c038;
        uStack_84c0 = uStack_c030;
        local_84d8 = 0x42b0c0a542b0c0a5;
        uStack_84d0 = 0x42b0c0a542b0c0a5;
        auVar83._8_8_ = uStack_c030;
        auVar83._0_8_ = local_c038;
        auVar82._8_8_ = 0x42b0c0a542b0c0a5;
        auVar82._0_8_ = 0x42b0c0a542b0c0a5;
        auVar177 = minps(auVar83,auVar82);
        local_8708 = auVar177._0_8_;
        uStack_8700 = auVar177._8_8_;
        local_84f8 = local_8708;
        uStack_84f0 = uStack_8700;
        local_8508 = 0xc2b0c0a5c2b0c0a5;
        uStack_8500 = 0xc2b0c0a5c2b0c0a5;
        auVar81._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar81._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar177 = maxps(auVar177,auVar81);
        local_8708 = auVar177._0_8_;
        uStack_8700 = auVar177._8_8_;
        local_8698 = local_8708;
        uVar5 = local_8698;
        uStack_8690 = uStack_8700;
        uVar6 = uStack_8690;
        local_86a8 = 0x3fb8aa3b3fb8aa3b;
        uStack_86a0 = 0x3fb8aa3b3fb8aa3b;
        local_8698._0_4_ = auVar177._0_4_;
        local_8698._4_4_ = auVar177._4_4_;
        uStack_8690._0_4_ = auVar177._8_4_;
        uStack_8690._4_4_ = auVar177._12_4_;
        local_83c8 = CONCAT44(local_8698._4_4_ * 1.442695,(float)local_8698 * 1.442695);
        uStack_83c0 = CONCAT44(uStack_8690._4_4_ * 1.442695,(float)uStack_8690 * 1.442695);
        local_83d8 = 0x3f0000003f000000;
        uStack_83d0 = 0x3f0000003f000000;
        fVar172 = (float)local_8698 * 1.442695 + 0.5;
        fVar182 = local_8698._4_4_ * 1.442695 + 0.5;
        fVar190 = (float)uStack_8690 * 1.442695 + 0.5;
        fVar198 = uStack_8690._4_4_ * 1.442695 + 0.5;
        local_6a28 = CONCAT44(fVar182,fVar172);
        uStack_6a20 = CONCAT44(fVar198,fVar190);
        local_86f8 = CONCAT44((int)fVar182,(int)fVar172);
        uStack_86f0 = CONCAT44((int)fVar198,(int)fVar190);
        local_8728 = (float)(int)fVar172;
        fStack_8724 = (float)(int)fVar182;
        fStack_8720 = (float)(int)fVar190;
        fStack_871c = (float)(int)fVar198;
        local_8718 = CONCAT44(fStack_8724,local_8728);
        uStack_8710 = CONCAT44(fStack_871c,fStack_8720);
        local_6858 = CONCAT44(fVar182,fVar172);
        uStack_6850 = CONCAT44(fVar198,fVar190);
        local_6848 = local_8718;
        uStack_6840 = uStack_8710;
        local_8758 = CONCAT44(-(uint)(fVar182 < fStack_8724),-(uint)(fVar172 < local_8728));
        uStack_8750 = CONCAT44(-(uint)(fVar198 < fStack_871c),-(uint)(fVar190 < fStack_8720));
        local_66c8 = local_8758;
        uStack_66c0 = uStack_8750;
        local_66d8 = 0x3f8000003f800000;
        uStack_66d0 = 0x3f8000003f800000;
        local_8758 = local_8758 & 0x3f8000003f800000;
        uStack_8750 = uStack_8750 & 0x3f8000003f800000;
        local_6c68 = local_8718;
        uStack_6c60 = uStack_8710;
        local_6c78._0_4_ = (float)local_8758;
        local_6c78._4_4_ = (float)(local_8758 >> 0x20);
        uStack_6c70._0_4_ = (float)uStack_8750;
        uStack_6c70._4_4_ = (float)(uStack_8750 >> 0x20);
        local_8728 = local_8728 - (float)local_6c78;
        fStack_8724 = fStack_8724 - local_6c78._4_4_;
        fStack_8720 = fStack_8720 - (float)uStack_6c70;
        fStack_871c = fStack_871c - uStack_6c70._4_4_;
        local_60c0 = &local_8728;
        local_6068 = ::_ps_cephes_exp_C1;
        local_8680 = &local_8708;
        local_6028 = local_8708;
        uStack_6020 = uStack_8700;
        local_6048 = CONCAT44(fStack_8724,local_8728);
        uStack_6040 = CONCAT44(fStack_871c,fStack_8720);
        local_6058[0] = 0.6933594;
        local_6058[1] = 0.6933594;
        afStack_6050[0] = 0.6933594;
        afStack_6050[1] = 0.6933594;
        local_6038 = local_8728 * 0.6933594;
        fStack_6034 = fStack_8724 * 0.6933594;
        fStack_6030 = fStack_8720 * 0.6933594;
        fStack_602c = fStack_871c * 0.6933594;
        local_8708 = CONCAT44(local_8698._4_4_ - fStack_6034,(float)local_8698 - local_6038);
        uStack_8700._0_4_ = (float)uStack_8690 - fStack_6030;
        uStack_8700._4_4_ = uStack_8690._4_4_ - fStack_602c;
        local_60c8 = ::_ps_cephes_exp_C2;
        local_6088 = local_8708;
        uStack_6080 = uStack_8700;
        local_60a8 = CONCAT44(fStack_8724,local_8728);
        uStack_60a0 = CONCAT44(fStack_871c,fStack_8720);
        local_60b8[0] = -0.00021219444;
        local_60b8[1] = -0.00021219444;
        afStack_60b0[0] = -0.00021219444;
        afStack_60b0[1] = -0.00021219444;
        local_6098 = local_8728 * -0.00021219444;
        fStack_6094 = fStack_8724 * -0.00021219444;
        fStack_6090 = fStack_8720 * -0.00021219444;
        fStack_608c = fStack_871c * -0.00021219444;
        fVar172 = ((float)local_8698 - local_6038) - local_6098;
        fVar182 = (local_8698._4_4_ - fStack_6034) - fStack_6094;
        fVar190 = ((float)uStack_8690 - fStack_6030) - fStack_6090;
        fVar198 = (uStack_8690._4_4_ - fStack_602c) - fStack_608c;
        local_8708 = CONCAT44(fVar182,fVar172);
        uStack_8700._0_4_ = fVar190;
        uStack_8700._4_4_ = fVar198;
        local_86b8 = local_8708;
        uStack_86b0 = uStack_8700;
        local_86c8 = local_8708;
        uStack_86c0 = uStack_8700;
        local_8718 = CONCAT44(fVar182 * fVar182,fVar172 * fVar172);
        uStack_8710 = CONCAT44(fVar198 * fVar198,fVar190 * fVar190);
        local_8670 = &local_8768;
        local_8540 = ::_ps_cephes_exp_p1;
        local_8518 = 0x3950696739506967;
        uStack_8510 = 0x3950696739506967;
        local_8528 = local_8708;
        uStack_8520 = uStack_8700;
        local_84a8 = fVar172 * 0.00019875691;
        fStack_84a4 = fVar182 * 0.00019875691;
        fStack_84a0 = fVar190 * 0.00019875691;
        fStack_849c = fVar198 * 0.00019875691;
        local_84b8[0] = 0.0013981999;
        local_84b8[1] = 0.0013981999;
        afStack_84b0[0] = 0.0013981999;
        afStack_84b0[1] = 0.0013981999;
        local_8768 = CONCAT44(fStack_84a4 + 0.0013981999,local_84a8 + 0.0013981999);
        uStack_8760 = CONCAT44(fStack_849c + 0.0013981999,fStack_84a0 + 0.0013981999);
        local_8580 = ::_ps_cephes_exp_p2;
        local_8558 = local_8768;
        uStack_8550 = uStack_8760;
        local_8568 = local_8708;
        uStack_8560 = uStack_8700;
        local_8488 = (local_84a8 + 0.0013981999) * fVar172;
        fStack_8484 = (fStack_84a4 + 0.0013981999) * fVar182;
        fStack_8480 = (fStack_84a0 + 0.0013981999) * fVar190;
        fStack_847c = (fStack_849c + 0.0013981999) * fVar198;
        local_8498[0] = 0.008333452;
        local_8498[1] = 0.008333452;
        afStack_8490[0] = 0.008333452;
        afStack_8490[1] = 0.008333452;
        local_8768 = CONCAT44(fStack_8484 + 0.008333452,local_8488 + 0.008333452);
        uStack_8760 = CONCAT44(fStack_847c + 0.008333452,fStack_8480 + 0.008333452);
        local_85c0 = ::_ps_cephes_exp_p3;
        local_8598 = local_8768;
        uStack_8590 = uStack_8760;
        local_85a8 = local_8708;
        uStack_85a0 = uStack_8700;
        local_8468 = (local_8488 + 0.008333452) * fVar172;
        fStack_8464 = (fStack_8484 + 0.008333452) * fVar182;
        fStack_8460 = (fStack_8480 + 0.008333452) * fVar190;
        fStack_845c = (fStack_847c + 0.008333452) * fVar198;
        local_8478[0] = 0.041665796;
        local_8478[1] = 0.041665796;
        afStack_8470[0] = 0.041665796;
        afStack_8470[1] = 0.041665796;
        local_8768 = CONCAT44(fStack_8464 + 0.041665796,local_8468 + 0.041665796);
        uStack_8760 = CONCAT44(fStack_845c + 0.041665796,fStack_8460 + 0.041665796);
        local_8600 = ::_ps_cephes_exp_p4;
        local_85d8 = local_8768;
        uStack_85d0 = uStack_8760;
        local_85e8 = local_8708;
        uStack_85e0 = uStack_8700;
        local_8448 = (local_8468 + 0.041665796) * fVar172;
        fStack_8444 = (fStack_8464 + 0.041665796) * fVar182;
        fStack_8440 = (fStack_8460 + 0.041665796) * fVar190;
        fStack_843c = (fStack_845c + 0.041665796) * fVar198;
        local_8458[0] = 0.16666666;
        local_8458[1] = 0.16666666;
        afStack_8450[0] = 0.16666666;
        afStack_8450[1] = 0.16666666;
        local_8768 = CONCAT44(fStack_8444 + 0.16666666,local_8448 + 0.16666666);
        uStack_8760 = CONCAT44(fStack_843c + 0.16666666,fStack_8440 + 0.16666666);
        local_8640 = ::_ps_cephes_exp_p5;
        local_8618 = local_8768;
        uStack_8610 = uStack_8760;
        local_8628 = local_8708;
        uStack_8620 = uStack_8700;
        local_8428 = (local_8448 + 0.16666666) * fVar172;
        fStack_8424 = (fStack_8444 + 0.16666666) * fVar182;
        fStack_8420 = (fStack_8440 + 0.16666666) * fVar190;
        fStack_841c = (fStack_843c + 0.16666666) * fVar198;
        local_8438[0] = 0.5;
        local_8438[1] = 0.5;
        afStack_8430[0] = 0.5;
        afStack_8430[1] = 0.5;
        local_8768 = CONCAT44(fStack_8424 + 0.5,local_8428 + 0.5);
        uStack_8760 = CONCAT44(fStack_841c + 0.5,fStack_8420 + 0.5);
        local_8678 = &local_8718;
        local_8658 = local_8768;
        uStack_8650 = uStack_8760;
        local_8668 = local_8718;
        uStack_8660 = uStack_8710;
        local_8408 = (local_8428 + 0.5) * fVar172 * fVar172;
        fStack_8404 = (fStack_8424 + 0.5) * fVar182 * fVar182;
        fStack_8400 = (fStack_8420 + 0.5) * fVar190 * fVar190;
        fStack_83fc = (fStack_841c + 0.5) * fVar198 * fVar198;
        local_8418 = local_8708;
        uStack_8410 = uStack_8700;
        local_8768 = CONCAT44(fStack_8404 + fVar182,local_8408 + fVar172);
        uStack_8760 = CONCAT44(fStack_83fc + fVar198,fStack_8400 + fVar190);
        local_83e8 = local_8768;
        uStack_83e0 = uStack_8760;
        local_83f8 = 0x3f8000003f800000;
        uStack_83f0 = 0x3f8000003f800000;
        fVar172 = local_8408 + fVar172 + 1.0;
        fVar182 = fStack_8404 + fVar182 + 1.0;
        fVar190 = fStack_8400 + fVar190 + 1.0;
        fVar198 = fStack_83fc + fVar198 + 1.0;
        local_8768 = CONCAT44(fVar182,fVar172);
        uStack_8760 = CONCAT44(fVar198,fVar190);
        local_6a38 = CONCAT44(fStack_8724,local_8728);
        uStack_6a30 = CONCAT44(fStack_871c,fStack_8720);
        local_5b88 = CONCAT44((int)fStack_8724,(int)local_8728);
        uStack_5b80 = CONCAT44((int)fStack_871c,(int)fStack_8720);
        local_5b98 = 0x7f0000007f;
        uStack_5b90 = 0x7f0000007f;
        iVar203 = (int)local_8728 + 0x7f;
        fStack_8734 = (float)((int)fStack_8724 + 0x7f);
        fStack_8730 = (float)((int)fStack_8720 + 0x7f);
        fStack_872c = (float)((int)fStack_871c + 0x7f);
        local_5a08 = CONCAT44(fStack_8734,iVar203);
        uStack_5a00 = CONCAT44(fStack_872c,fStack_8730);
        local_5a0c = 0x17;
        local_8738 = (float)(iVar203 * 0x800000);
        local_8778 = CONCAT44(fStack_8734,local_8738);
        uStack_8770 = CONCAT44(fStack_872c,fStack_8730);
        local_86d8 = local_8768;
        uStack_86d0 = uStack_8760;
        fVar172 = fVar172 * local_8738;
        fVar182 = fVar182 * fStack_8734;
        fVar190 = fVar190 * fStack_8730;
        fVar198 = fVar198 * fStack_872c;
        local_8768 = CONCAT44(fVar182,fVar172);
        uStack_8760 = CONCAT44(fVar198,fVar190);
        local_a66c = 0x3f800000;
        local_a688 = 0x3f800000;
        uStack_a684 = 0x3f800000;
        uStack_a680 = 0x3f800000;
        uStack_a67c = 0x3f800000;
        local_9db8 = 0x3f8000003f800000;
        uStack_9db0 = 0x3f8000003f800000;
        local_9da8 = local_8768;
        uStack_9da0 = uStack_8760;
        fVar172 = fVar172 + 1.0;
        fVar182 = fVar182 + 1.0;
        fVar190 = fVar190 + 1.0;
        fVar198 = fVar198 + 1.0;
        local_f68 = CONCAT44(fVar182,fVar172);
        uStack_f60._0_4_ = fVar190;
        uStack_f60._4_4_ = fVar198;
        local_f88 = 0x3f8000003f800000;
        uStack_f80 = 0x3f8000003f800000;
        local_c48 = 0;
        uStack_c40 = 0;
        local_988 = local_f68;
        uStack_980 = uStack_f60;
        local_998 = 0;
        uStack_990 = 0;
        local_f98 = -(uint)(fVar172 <= 0.0);
        iStack_f94 = -(uint)(fVar182 <= 0.0);
        iStack_f90 = -(uint)(fVar190 <= 0.0);
        iStack_f8c = -(uint)(fVar198 <= 0.0);
        local_c58 = local_f68;
        uStack_c50 = uStack_f60;
        local_c68 = 0x80000000800000;
        uStack_c60 = 0x80000000800000;
        auVar143._8_8_ = uStack_f60;
        auVar143._0_8_ = local_f68;
        auVar142._8_8_ = 0x80000000800000;
        auVar142._0_8_ = 0x80000000800000;
        auVar177 = maxps(auVar143,auVar142);
        local_f68 = auVar177._0_8_;
        uStack_f60 = auVar177._8_8_;
        local_818 = local_f68;
        uStack_810 = uStack_f60;
        local_8c8 = local_f68;
        uVar166 = local_8c8;
        uStack_8c0 = uStack_f60;
        uVar167 = uStack_8c0;
        local_8cc = 0x17;
        local_8c8._0_4_ = auVar177._0_4_;
        local_8c8._4_4_ = auVar177._4_4_;
        uStack_8c0._0_4_ = auVar177._8_4_;
        uStack_8c0._4_4_ = auVar177._12_4_;
        local_a08 = local_f68;
        uStack_a00 = uStack_f60;
        local_a18 = 0x807fffff807fffff;
        uStack_a10 = 0x807fffff807fffff;
        local_788 = local_f68 & 0x807fffff807fffff;
        uStack_780 = uStack_f60 & 0x807fffff807fffff;
        local_798 = 0x3f0000003f000000;
        uStack_790 = 0x3f0000003f000000;
        local_a68 = local_788 | 0x3f0000003f000000;
        uStack_a60 = uStack_780 | 0x3f0000003f000000;
        local_568 = CONCAT44(local_8c8._4_4_ >> 0x17,(uint)local_8c8 >> 0x17);
        uStack_560 = CONCAT44(uStack_8c0._4_4_ >> 0x17,(uint)uStack_8c0 >> 0x17);
        local_578 = 0x7f0000007f;
        uStack_570 = 0x7f0000007f;
        local_f78 = ((uint)local_8c8 >> 0x17) - 0x7f;
        iStack_f74 = (local_8c8._4_4_ >> 0x17) - 0x7f;
        iStack_f70 = ((uint)uStack_8c0 >> 0x17) - 0x7f;
        iStack_f6c = (uStack_8c0._4_4_ >> 0x17) - 0x7f;
        local_f58 = CONCAT44(iStack_f74,local_f78);
        uStack_f50 = CONCAT44(iStack_f6c,iStack_f70);
        local_aa8 = CONCAT44((float)iStack_f74,(float)local_f78);
        uStack_aa0 = CONCAT44((float)iStack_f6c,(float)iStack_f70);
        local_ab8 = 0x3f8000003f800000;
        uStack_ab0 = 0x3f8000003f800000;
        local_fa8 = (float)local_f78 + 1.0;
        fStack_fa4 = (float)iStack_f74 + 1.0;
        fStack_fa0 = (float)iStack_f70 + 1.0;
        fStack_f9c = (float)iStack_f6c + 1.0;
        local_4b8 = 0x3f3504f33f3504f3;
        uStack_4b0 = 0x3f3504f33f3504f3;
        local_4a8._0_4_ = (float)local_a68;
        local_4a8._4_4_ = (float)(local_a68 >> 0x20);
        uStack_4a0._0_4_ = (float)uStack_a60;
        uStack_4a0._4_4_ = (float)(uStack_a60 >> 0x20);
        local_fb8 = -(uint)((float)local_4a8 < 0.70710677);
        iStack_fb4 = -(uint)(local_4a8._4_4_ < 0.70710677);
        iStack_fb0 = -(uint)((float)uStack_4a0 < 0.70710677);
        iStack_fac = -(uint)(uStack_4a0._4_4_ < 0.70710677);
        local_a38 = CONCAT44(iStack_fb4,local_fb8);
        uStack_a30 = CONCAT44(iStack_fac,iStack_fb0);
        local_fc8 = local_a68 & local_a38;
        uStack_fc0 = uStack_a60 & uStack_a30;
        local_a78 = 0x3f8000003f800000;
        uStack_a70 = 0x3f8000003f800000;
        local_f68 = CONCAT44(local_4a8._4_4_ - 1.0,(float)local_4a8 - 1.0);
        uStack_f60._0_4_ = (float)uStack_4a0 - 1.0;
        uStack_f60._4_4_ = uStack_4a0._4_4_ - 1.0;
        local_a88 = CONCAT44(fStack_fa4,local_fa8);
        uStack_a80 = CONCAT44(fStack_f9c,fStack_fa0);
        local_a58 = CONCAT44(iStack_fb4,local_fb8);
        uStack_a50 = CONCAT44(iStack_fac,iStack_fb0);
        local_a48 = 0x3f8000003f800000;
        uStack_a40 = 0x3f8000003f800000;
        uVar204 = local_a58 & 0x3f8000003f800000;
        uVar205 = uStack_a50 & 0x3f8000003f800000;
        local_a98._0_4_ = (float)uVar204;
        local_a98._4_4_ = (float)(uVar204 >> 0x20);
        uStack_a90._0_4_ = (float)uVar205;
        uStack_a90._4_4_ = (float)(uVar205 >> 0x20);
        local_fa8 = local_fa8 - (float)local_a98;
        fStack_fa4 = fStack_fa4 - local_a98._4_4_;
        fStack_fa0 = fStack_fa0 - (float)uStack_a90;
        fStack_f9c = fStack_f9c - uStack_a90._4_4_;
        local_ac8 = local_f68;
        uStack_ac0 = uStack_f60;
        local_ad8._0_4_ = (float)local_fc8;
        local_ad8._4_4_ = (float)(local_fc8 >> 0x20);
        uStack_ad0._0_4_ = (float)uStack_fc0;
        uStack_ad0._4_4_ = (float)(uStack_fc0 >> 0x20);
        local_ad8._0_4_ = ((float)local_4a8 - 1.0) + (float)local_ad8;
        local_ad8._4_4_ = (local_4a8._4_4_ - 1.0) + local_ad8._4_4_;
        uStack_ad0._0_4_ = ((float)uStack_4a0 - 1.0) + (float)uStack_ad0;
        uStack_ad0._4_4_ = (uStack_4a0._4_4_ - 1.0) + uStack_ad0._4_4_;
        local_f68 = CONCAT44(local_ad8._4_4_,(float)local_ad8);
        uStack_f60._0_4_ = (float)uStack_ad0;
        uStack_f60._4_4_ = uStack_ad0._4_4_;
        local_ef8 = local_f68;
        uStack_ef0 = uStack_f60;
        local_f08 = local_f68;
        uStack_f00 = uStack_f60;
        local_fd8 = (float)local_ad8 * (float)local_ad8;
        fStack_fd4 = local_ad8._4_4_ * local_ad8._4_4_;
        fStack_fd0 = (float)uStack_ad0 * (float)uStack_ad0;
        fStack_fcc = uStack_ad0._4_4_ * uStack_ad0._4_4_;
        local_ea0 = &local_fe8;
        local_ee0 = &local_f68;
        local_ca0 = ::_ps_cephes_log_p1;
        local_c78 = 0x3d9021bb3d9021bb;
        uStack_c70 = 0x3d9021bb3d9021bb;
        local_c88 = local_f68;
        uStack_c80 = uStack_f60;
        local_c28 = (float)local_ad8 * 0.070376836;
        fStack_c24 = local_ad8._4_4_ * 0.070376836;
        fStack_c20 = (float)uStack_ad0 * 0.070376836;
        fStack_c1c = uStack_ad0._4_4_ * 0.070376836;
        local_c38[0] = -0.1151461;
        local_c38[1] = -0.1151461;
        afStack_c30[0] = -0.1151461;
        afStack_c30[1] = -0.1151461;
        local_fe8 = CONCAT44(fStack_c24 + -0.1151461,local_c28 + -0.1151461);
        uStack_fe0 = CONCAT44(fStack_c1c + -0.1151461,fStack_c20 + -0.1151461);
        local_ce0 = ::_ps_cephes_log_p2;
        local_cb8 = local_fe8;
        uStack_cb0 = uStack_fe0;
        local_cc8 = local_f68;
        uStack_cc0 = uStack_f60;
        local_c08 = (local_c28 + -0.1151461) * (float)local_ad8;
        fStack_c04 = (fStack_c24 + -0.1151461) * local_ad8._4_4_;
        fStack_c00 = (fStack_c20 + -0.1151461) * (float)uStack_ad0;
        fStack_bfc = (fStack_c1c + -0.1151461) * uStack_ad0._4_4_;
        local_c18[0] = 0.116769984;
        local_c18[1] = 0.116769984;
        afStack_c10[0] = 0.116769984;
        afStack_c10[1] = 0.116769984;
        local_fe8 = CONCAT44(fStack_c04 + 0.116769984,local_c08 + 0.116769984);
        uStack_fe0 = CONCAT44(fStack_bfc + 0.116769984,fStack_c00 + 0.116769984);
        local_d20 = ::_ps_cephes_log_p3;
        local_cf8 = local_fe8;
        uStack_cf0 = uStack_fe0;
        local_d08 = local_f68;
        uStack_d00 = uStack_f60;
        local_be8 = (local_c08 + 0.116769984) * (float)local_ad8;
        fStack_be4 = (fStack_c04 + 0.116769984) * local_ad8._4_4_;
        fStack_be0 = (fStack_c00 + 0.116769984) * (float)uStack_ad0;
        fStack_bdc = (fStack_bfc + 0.116769984) * uStack_ad0._4_4_;
        local_bf8[0] = -0.12420141;
        local_bf8[1] = -0.12420141;
        afStack_bf0[0] = -0.12420141;
        afStack_bf0[1] = -0.12420141;
        local_fe8 = CONCAT44(fStack_be4 + -0.12420141,local_be8 + -0.12420141);
        uStack_fe0 = CONCAT44(fStack_bdc + -0.12420141,fStack_be0 + -0.12420141);
        local_d60 = ::_ps_cephes_log_p4;
        local_d38 = local_fe8;
        uStack_d30 = uStack_fe0;
        local_d48 = local_f68;
        uStack_d40 = uStack_f60;
        local_bc8 = (local_be8 + -0.12420141) * (float)local_ad8;
        fStack_bc4 = (fStack_be4 + -0.12420141) * local_ad8._4_4_;
        fStack_bc0 = (fStack_be0 + -0.12420141) * (float)uStack_ad0;
        fStack_bbc = (fStack_bdc + -0.12420141) * uStack_ad0._4_4_;
        local_bd8[0] = 0.14249323;
        local_bd8[1] = 0.14249323;
        afStack_bd0[0] = 0.14249323;
        afStack_bd0[1] = 0.14249323;
        local_fe8 = CONCAT44(fStack_bc4 + 0.14249323,local_bc8 + 0.14249323);
        uStack_fe0 = CONCAT44(fStack_bbc + 0.14249323,fStack_bc0 + 0.14249323);
        local_da0 = ::_ps_cephes_log_p5;
        local_d78 = local_fe8;
        uStack_d70 = uStack_fe0;
        local_d88 = local_f68;
        uStack_d80 = uStack_f60;
        local_ba8 = (local_bc8 + 0.14249323) * (float)local_ad8;
        fStack_ba4 = (fStack_bc4 + 0.14249323) * local_ad8._4_4_;
        fStack_ba0 = (fStack_bc0 + 0.14249323) * (float)uStack_ad0;
        fStack_b9c = (fStack_bbc + 0.14249323) * uStack_ad0._4_4_;
        local_bb8[0] = -0.16668057;
        local_bb8[1] = -0.16668057;
        afStack_bb0[0] = -0.16668057;
        afStack_bb0[1] = -0.16668057;
        local_fe8 = CONCAT44(fStack_ba4 + -0.16668057,local_ba8 + -0.16668057);
        uStack_fe0 = CONCAT44(fStack_b9c + -0.16668057,fStack_ba0 + -0.16668057);
        local_de0 = ::_ps_cephes_log_p6;
        local_db8 = local_fe8;
        uStack_db0 = uStack_fe0;
        local_dc8 = local_f68;
        uStack_dc0 = uStack_f60;
        local_b88 = (local_ba8 + -0.16668057) * (float)local_ad8;
        fStack_b84 = (fStack_ba4 + -0.16668057) * local_ad8._4_4_;
        fStack_b80 = (fStack_ba0 + -0.16668057) * (float)uStack_ad0;
        fStack_b7c = (fStack_b9c + -0.16668057) * uStack_ad0._4_4_;
        local_b98[0] = 0.20000714;
        local_b98[1] = 0.20000714;
        afStack_b90[0] = 0.20000714;
        afStack_b90[1] = 0.20000714;
        local_fe8 = CONCAT44(fStack_b84 + 0.20000714,local_b88 + 0.20000714);
        uStack_fe0 = CONCAT44(fStack_b7c + 0.20000714,fStack_b80 + 0.20000714);
        local_e20 = ::_ps_cephes_log_p7;
        local_df8 = local_fe8;
        uStack_df0 = uStack_fe0;
        local_e08 = local_f68;
        uStack_e00 = uStack_f60;
        local_b68 = (local_b88 + 0.20000714) * (float)local_ad8;
        fStack_b64 = (fStack_b84 + 0.20000714) * local_ad8._4_4_;
        fStack_b60 = (fStack_b80 + 0.20000714) * (float)uStack_ad0;
        fStack_b5c = (fStack_b7c + 0.20000714) * uStack_ad0._4_4_;
        local_b78[0] = -0.24999994;
        local_b78[1] = -0.24999994;
        afStack_b70[0] = -0.24999994;
        afStack_b70[1] = -0.24999994;
        local_fe8 = CONCAT44(fStack_b64 + -0.24999994,local_b68 + -0.24999994);
        uStack_fe0 = CONCAT44(fStack_b5c + -0.24999994,fStack_b60 + -0.24999994);
        local_e60 = ::_ps_cephes_log_p8;
        local_e38 = local_fe8;
        uStack_e30 = uStack_fe0;
        local_e48 = local_f68;
        uStack_e40 = uStack_f60;
        local_b48 = (local_b68 + -0.24999994) * (float)local_ad8;
        fStack_b44 = (fStack_b64 + -0.24999994) * local_ad8._4_4_;
        fStack_b40 = (fStack_b60 + -0.24999994) * (float)uStack_ad0;
        fStack_b3c = (fStack_b5c + -0.24999994) * uStack_ad0._4_4_;
        local_b58[0] = 0.3333333;
        local_b58[1] = 0.3333333;
        afStack_b50[0] = 0.3333333;
        afStack_b50[1] = 0.3333333;
        local_fe8 = CONCAT44(fStack_b44 + 0.3333333,local_b48 + 0.3333333);
        uStack_fe0 = CONCAT44(fStack_b3c + 0.3333333,fStack_b40 + 0.3333333);
        local_f18 = local_fe8;
        uStack_f10 = uStack_fe0;
        local_f28 = local_f68;
        uStack_f20 = uStack_f60;
        fVar172 = (local_b48 + 0.3333333) * (float)local_ad8;
        fVar182 = (fStack_b44 + 0.3333333) * local_ad8._4_4_;
        fVar190 = (fStack_b40 + 0.3333333) * (float)uStack_ad0;
        fVar198 = (fStack_b3c + 0.3333333) * uStack_ad0._4_4_;
        local_fe8 = CONCAT44(fVar182,fVar172);
        uStack_fe0 = CONCAT44(fVar198,fVar190);
        local_f48 = CONCAT44(fStack_fd4,local_fd8);
        uStack_f40 = CONCAT44(fStack_fcc,fStack_fd0);
        local_f38 = local_fe8;
        uStack_f30 = uStack_fe0;
        fVar172 = fVar172 * local_fd8;
        fVar182 = fVar182 * fStack_fd4;
        fVar190 = fVar190 * fStack_fd0;
        fVar198 = fVar198 * fStack_fcc;
        local_fe8 = CONCAT44(fVar182,fVar172);
        uStack_fe0 = CONCAT44(fVar198,fVar190);
        local_ed0 = &local_fa8;
        local_e98 = ::_ps_cephes_log_q1;
        local_e78 = CONCAT44(fStack_fa4,local_fa8);
        uStack_e70 = CONCAT44(fStack_f9c,fStack_fa0);
        local_e88[0] = -0.00021219444;
        local_e88[1] = -0.00021219444;
        afStack_e80[0] = -0.00021219444;
        afStack_e80[1] = -0.00021219444;
        local_b28 = local_fa8 * -0.00021219444;
        fStack_b24 = fStack_fa4 * -0.00021219444;
        fStack_b20 = fStack_fa0 * -0.00021219444;
        fStack_b1c = fStack_f9c * -0.00021219444;
        local_b38 = local_fe8;
        uStack_b30 = uStack_fe0;
        fVar172 = local_b28 + fVar172;
        fVar182 = fStack_b24 + fVar182;
        fVar190 = fStack_b20 + fVar190;
        fVar198 = fStack_b1c + fVar198;
        local_fe8 = CONCAT44(fVar182,fVar172);
        uStack_fe0 = CONCAT44(fVar198,fVar190);
        local_9e0 = &local_fd8;
        local_9e8 = ::_ps_0p5;
        local_9a8 = local_fe8;
        uStack_9a0 = uStack_fe0;
        local_9c8 = CONCAT44(fStack_fd4,local_fd8);
        uStack_9c0 = CONCAT44(fStack_fcc,fStack_fd0);
        local_9d8[0] = 0.5;
        local_9d8[1] = 0.5;
        afStack_9d0[0] = 0.5;
        afStack_9d0[1] = 0.5;
        local_9b8 = local_fd8 * 0.5;
        fStack_9b4 = fStack_fd4 * 0.5;
        fStack_9b0 = fStack_fd0 * 0.5;
        fStack_9ac = fStack_fcc * 0.5;
        fVar172 = fVar172 - local_9b8;
        fVar182 = fVar182 - fStack_9b4;
        fVar190 = fVar190 - fStack_9b0;
        fVar198 = fVar198 - fStack_9ac;
        local_fe8 = CONCAT44(fVar182,fVar172);
        uStack_fe0 = CONCAT44(fVar198,fVar190);
        local_ae8 = local_f68;
        uStack_ae0 = uStack_f60;
        local_af8 = local_fe8;
        uStack_af0 = uStack_fe0;
        local_ad8._0_4_ = (float)local_ad8 + fVar172;
        local_ad8._4_4_ = local_ad8._4_4_ + fVar182;
        uStack_ad0._0_4_ = (float)uStack_ad0 + fVar190;
        uStack_ad0._4_4_ = uStack_ad0._4_4_ + fVar198;
        local_f68 = CONCAT44(local_ad8._4_4_,(float)local_ad8);
        uStack_f60._0_4_ = (float)uStack_ad0;
        uStack_f60._4_4_ = uStack_ad0._4_4_;
        local_ed8 = ::_ps_cephes_log_q2;
        local_eb8 = CONCAT44(fStack_fa4,local_fa8);
        uStack_eb0 = CONCAT44(fStack_f9c,fStack_fa0);
        local_ec8[0] = 0.6933594;
        local_ec8[1] = 0.6933594;
        afStack_ec0[0] = 0.6933594;
        afStack_ec0[1] = 0.6933594;
        local_b08 = local_fa8 * 0.6933594;
        fStack_b04 = fStack_fa4 * 0.6933594;
        fStack_b00 = fStack_fa0 * 0.6933594;
        fStack_afc = fStack_f9c * 0.6933594;
        local_b18 = local_f68;
        uStack_b10 = uStack_f60;
        local_f68 = CONCAT44(fStack_b04 + local_ad8._4_4_,local_b08 + (float)local_ad8);
        uStack_f60._0_4_ = fStack_b00 + (float)uStack_ad0;
        uStack_f60._4_4_ = fStack_afc + uStack_ad0._4_4_;
        local_7b8 = CONCAT44(iStack_f94,local_f98);
        uStack_7b0 = CONCAT44(iStack_f8c,iStack_f90);
        local_7a8 = local_f68;
        uStack_7a0 = uStack_f60;
        local_3628 = local_f68 | local_7b8;
        uStack_3620 = uStack_f60 | uStack_7b0;
        uStack_f60 = uStack_3620;
        local_f68 = local_3628;
        local_35dc = 0x3f800000;
        local_35f8 = 0x3f800000;
        uStack_35f4 = 0x3f800000;
        uStack_35f0 = 0x3f800000;
        uStack_35ec = 0x3f800000;
        local_3638 = 0x3f8000003f800000;
        uStack_3630 = 0x3f8000003f800000;
        local_35fc = 0x40000000;
        local_3618 = 0x40000000;
        uStack_3614 = 0x40000000;
        uStack_3610 = 0x40000000;
        uStack_360c = 0x40000000;
        local_3648 = 0x4000000040000000;
        uStack_3640 = 0x4000000040000000;
        local_35a8._0_4_ = (float)local_3628;
        local_35a8._4_4_ = (float)(local_3628 >> 0x20);
        uStack_35a0._0_4_ = (float)uStack_3620;
        uStack_35a0._4_4_ = (float)(uStack_3620 >> 0x20);
        local_3588 = (float)local_35a8 * 2.0;
        fStack_3584 = local_35a8._4_4_ * 2.0;
        fStack_3580 = (float)uStack_35a0 * 2.0;
        fStack_357c = uStack_35a0._4_4_ * 2.0;
        local_355c = 0x3f800000;
        local_3578 = 0x3f800000;
        uStack_3574 = 0x3f800000;
        uStack_3570 = 0x3f800000;
        uStack_356c = 0x3f800000;
        local_3598 = 0x3f8000003f800000;
        uStack_3590 = 0x3f8000003f800000;
        local_3558 = 0;
        uStack_3550 = 0;
        local_3128 = CONCAT44(fStack_3584,local_3588);
        uStack_3120 = CONCAT44(fStack_357c,fStack_3580);
        local_3118 = 0;
        uStack_3110 = 0;
        local_3498 = CONCAT44(0.0 - fStack_3584,0.0 - local_3588);
        uStack_3490._0_4_ = 0.0 - fStack_3580;
        uStack_3490._4_4_ = 0.0 - fStack_357c;
        local_3278 = 0;
        uStack_3270 = 0;
        local_34d8 = 0x3f8000003f800000;
        uStack_34d0 = 0x3f8000003f800000;
        local_3258 = local_3498;
        uStack_3250 = uStack_3490;
        local_3268 = 0x42b0c0a542b0c0a5;
        uStack_3260 = 0x42b0c0a542b0c0a5;
        auVar131._8_8_ = uStack_3490;
        auVar131._0_8_ = local_3498;
        auVar130._8_8_ = 0x42b0c0a542b0c0a5;
        auVar130._0_8_ = 0x42b0c0a542b0c0a5;
        auVar177 = minps(auVar131,auVar130);
        local_3498 = auVar177._0_8_;
        uStack_3490 = auVar177._8_8_;
        local_3288 = local_3498;
        uStack_3280 = uStack_3490;
        local_3298 = 0xc2b0c0a5c2b0c0a5;
        uStack_3290 = 0xc2b0c0a5c2b0c0a5;
        auVar129._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar129._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar177 = maxps(auVar177,auVar129);
        local_3498 = auVar177._0_8_;
        uStack_3490 = auVar177._8_8_;
        local_3428 = local_3498;
        uVar161 = local_3428;
        uStack_3420 = uStack_3490;
        uVar164 = uStack_3420;
        local_3438 = 0x3fb8aa3b3fb8aa3b;
        uStack_3430 = 0x3fb8aa3b3fb8aa3b;
        local_3428._0_4_ = auVar177._0_4_;
        local_3428._4_4_ = auVar177._4_4_;
        uStack_3420._0_4_ = auVar177._8_4_;
        uStack_3420._4_4_ = auVar177._12_4_;
        local_3158 = CONCAT44(local_3428._4_4_ * 1.442695,(float)local_3428 * 1.442695);
        uStack_3150 = CONCAT44(uStack_3420._4_4_ * 1.442695,(float)uStack_3420 * 1.442695);
        local_3168 = 0x3f0000003f000000;
        uStack_3160 = 0x3f0000003f000000;
        fVar172 = (float)local_3428 * 1.442695 + 0.5;
        fVar182 = local_3428._4_4_ * 1.442695 + 0.5;
        fVar190 = (float)uStack_3420 * 1.442695 + 0.5;
        fVar198 = uStack_3420._4_4_ * 1.442695 + 0.5;
        local_30d8 = CONCAT44(fVar182,fVar172);
        uStack_30d0 = CONCAT44(fVar198,fVar190);
        local_3488 = CONCAT44((int)fVar182,(int)fVar172);
        uStack_3480 = CONCAT44((int)fVar198,(int)fVar190);
        local_34b8 = (float)(int)fVar172;
        fStack_34b4 = (float)(int)fVar182;
        fStack_34b0 = (float)(int)fVar190;
        fStack_34ac = (float)(int)fVar198;
        local_30b8 = CONCAT44(fStack_34b4,local_34b8);
        uStack_30b0 = CONCAT44(fStack_34ac,fStack_34b0);
        local_30c8 = CONCAT44(fVar182,fVar172);
        uStack_30c0 = CONCAT44(fVar198,fVar190);
        local_34e8 = CONCAT44(-(uint)(fVar182 < fStack_34b4),-(uint)(fVar172 < local_34b8));
        uStack_34e0 = CONCAT44(-(uint)(fVar198 < fStack_34ac),-(uint)(fVar190 < fStack_34b0));
        local_3098 = local_34e8;
        uStack_3090 = uStack_34e0;
        local_30a8 = 0x3f8000003f800000;
        uStack_30a0 = 0x3f8000003f800000;
        local_34e8 = local_34e8 & 0x3f8000003f800000;
        uStack_34e0 = uStack_34e0 & 0x3f8000003f800000;
        local_3138 = CONCAT44(fStack_34b4,local_34b8);
        uStack_3130 = CONCAT44(fStack_34ac,fStack_34b0);
        local_3148._0_4_ = (float)local_34e8;
        local_3148._4_4_ = (float)(local_34e8 >> 0x20);
        uStack_3140._0_4_ = (float)uStack_34e0;
        uStack_3140._4_4_ = (float)(uStack_34e0 >> 0x20);
        local_34b8 = local_34b8 - (float)local_3148;
        fStack_34b4 = fStack_34b4 - local_3148._4_4_;
        fStack_34b0 = fStack_34b0 - (float)uStack_3140;
        fStack_34ac = fStack_34ac - uStack_3140._4_4_;
        local_3070 = &local_34b8;
        local_3018 = ::_ps_cephes_exp_C1;
        local_3410 = &local_3498;
        local_2fd8 = local_3498;
        uStack_2fd0 = uStack_3490;
        local_2ff8 = CONCAT44(fStack_34b4,local_34b8);
        uStack_2ff0 = CONCAT44(fStack_34ac,fStack_34b0);
        local_3008[0] = 0.6933594;
        local_3008[1] = 0.6933594;
        afStack_3000[0] = 0.6933594;
        afStack_3000[1] = 0.6933594;
        local_2fe8 = local_34b8 * 0.6933594;
        fStack_2fe4 = fStack_34b4 * 0.6933594;
        fStack_2fe0 = fStack_34b0 * 0.6933594;
        fStack_2fdc = fStack_34ac * 0.6933594;
        local_3498 = CONCAT44(local_3428._4_4_ - fStack_2fe4,(float)local_3428 - local_2fe8);
        uStack_3490._0_4_ = (float)uStack_3420 - fStack_2fe0;
        uStack_3490._4_4_ = uStack_3420._4_4_ - fStack_2fdc;
        local_3078 = ::_ps_cephes_exp_C2;
        local_3038 = local_3498;
        uStack_3030 = uStack_3490;
        local_3058 = CONCAT44(fStack_34b4,local_34b8);
        uStack_3050 = CONCAT44(fStack_34ac,fStack_34b0);
        local_3068[0] = -0.00021219444;
        local_3068[1] = -0.00021219444;
        afStack_3060[0] = -0.00021219444;
        afStack_3060[1] = -0.00021219444;
        local_3048 = local_34b8 * -0.00021219444;
        fStack_3044 = fStack_34b4 * -0.00021219444;
        fStack_3040 = fStack_34b0 * -0.00021219444;
        fStack_303c = fStack_34ac * -0.00021219444;
        fVar172 = ((float)local_3428 - local_2fe8) - local_3048;
        fVar182 = (local_3428._4_4_ - fStack_2fe4) - fStack_3044;
        fVar190 = ((float)uStack_3420 - fStack_2fe0) - fStack_3040;
        fVar198 = (uStack_3420._4_4_ - fStack_2fdc) - fStack_303c;
        local_3498 = CONCAT44(fVar182,fVar172);
        uStack_3490._0_4_ = fVar190;
        uStack_3490._4_4_ = fVar198;
        local_3448 = local_3498;
        uStack_3440 = uStack_3490;
        local_3458 = local_3498;
        uStack_3450 = uStack_3490;
        local_34a8 = fVar172 * fVar172;
        fStack_34a4 = fVar182 * fVar182;
        fStack_34a0 = fVar190 * fVar190;
        fStack_349c = fVar198 * fVar198;
        local_3400 = &local_34f8;
        local_32d0 = ::_ps_cephes_exp_p1;
        local_32a8 = 0x3950696739506967;
        uStack_32a0 = 0x3950696739506967;
        local_32b8 = local_3498;
        uStack_32b0 = uStack_3490;
        local_3238 = fVar172 * 0.00019875691;
        fStack_3234 = fVar182 * 0.00019875691;
        fStack_3230 = fVar190 * 0.00019875691;
        fStack_322c = fVar198 * 0.00019875691;
        local_3248[0] = 0.0013981999;
        local_3248[1] = 0.0013981999;
        afStack_3240[0] = 0.0013981999;
        afStack_3240[1] = 0.0013981999;
        local_34f8 = CONCAT44(fStack_3234 + 0.0013981999,local_3238 + 0.0013981999);
        uStack_34f0 = CONCAT44(fStack_322c + 0.0013981999,fStack_3230 + 0.0013981999);
        local_3310 = ::_ps_cephes_exp_p2;
        local_32e8 = local_34f8;
        uStack_32e0 = uStack_34f0;
        local_32f8 = local_3498;
        uStack_32f0 = uStack_3490;
        local_3218 = (local_3238 + 0.0013981999) * fVar172;
        fStack_3214 = (fStack_3234 + 0.0013981999) * fVar182;
        fStack_3210 = (fStack_3230 + 0.0013981999) * fVar190;
        fStack_320c = (fStack_322c + 0.0013981999) * fVar198;
        local_3228[0] = 0.008333452;
        local_3228[1] = 0.008333452;
        afStack_3220[0] = 0.008333452;
        afStack_3220[1] = 0.008333452;
        local_34f8 = CONCAT44(fStack_3214 + 0.008333452,local_3218 + 0.008333452);
        uStack_34f0 = CONCAT44(fStack_320c + 0.008333452,fStack_3210 + 0.008333452);
        local_3350 = ::_ps_cephes_exp_p3;
        local_3328 = local_34f8;
        uStack_3320 = uStack_34f0;
        local_3338 = local_3498;
        uStack_3330 = uStack_3490;
        local_31f8 = (local_3218 + 0.008333452) * fVar172;
        fStack_31f4 = (fStack_3214 + 0.008333452) * fVar182;
        fStack_31f0 = (fStack_3210 + 0.008333452) * fVar190;
        fStack_31ec = (fStack_320c + 0.008333452) * fVar198;
        local_3208[0] = 0.041665796;
        local_3208[1] = 0.041665796;
        afStack_3200[0] = 0.041665796;
        afStack_3200[1] = 0.041665796;
        local_34f8 = CONCAT44(fStack_31f4 + 0.041665796,local_31f8 + 0.041665796);
        uStack_34f0 = CONCAT44(fStack_31ec + 0.041665796,fStack_31f0 + 0.041665796);
        local_3390 = ::_ps_cephes_exp_p4;
        local_3368 = local_34f8;
        uStack_3360 = uStack_34f0;
        local_3378 = local_3498;
        uStack_3370 = uStack_3490;
        local_31d8 = (local_31f8 + 0.041665796) * fVar172;
        fStack_31d4 = (fStack_31f4 + 0.041665796) * fVar182;
        fStack_31d0 = (fStack_31f0 + 0.041665796) * fVar190;
        fStack_31cc = (fStack_31ec + 0.041665796) * fVar198;
        local_31e8[0] = 0.16666666;
        local_31e8[1] = 0.16666666;
        afStack_31e0[0] = 0.16666666;
        afStack_31e0[1] = 0.16666666;
        local_34f8 = CONCAT44(fStack_31d4 + 0.16666666,local_31d8 + 0.16666666);
        uStack_34f0 = CONCAT44(fStack_31cc + 0.16666666,fStack_31d0 + 0.16666666);
        local_33d0 = ::_ps_cephes_exp_p5;
        local_33a8 = local_34f8;
        uStack_33a0 = uStack_34f0;
        local_33b8 = local_3498;
        uStack_33b0 = uStack_3490;
        local_31b8 = (local_31d8 + 0.16666666) * fVar172;
        fStack_31b4 = (fStack_31d4 + 0.16666666) * fVar182;
        fStack_31b0 = (fStack_31d0 + 0.16666666) * fVar190;
        fStack_31ac = (fStack_31cc + 0.16666666) * fVar198;
        local_31c8[0] = 0.5;
        local_31c8[1] = 0.5;
        afStack_31c0[0] = 0.5;
        afStack_31c0[1] = 0.5;
        local_34f8 = CONCAT44(fStack_31b4 + 0.5,local_31b8 + 0.5);
        uStack_34f0 = CONCAT44(fStack_31ac + 0.5,fStack_31b0 + 0.5);
        local_3408 = &local_34a8;
        local_33e8 = local_34f8;
        uStack_33e0 = uStack_34f0;
        local_33f8 = CONCAT44(fStack_34a4,local_34a8);
        uStack_33f0 = CONCAT44(fStack_349c,fStack_34a0);
        local_3198 = (local_31b8 + 0.5) * local_34a8;
        fStack_3194 = (fStack_31b4 + 0.5) * fStack_34a4;
        fStack_3190 = (fStack_31b0 + 0.5) * fStack_34a0;
        fStack_318c = (fStack_31ac + 0.5) * fStack_349c;
        local_31a8 = local_3498;
        uStack_31a0 = uStack_3490;
        local_34f8 = CONCAT44(fStack_3194 + fVar182,local_3198 + fVar172);
        uStack_34f0 = CONCAT44(fStack_318c + fVar198,fStack_3190 + fVar190);
        local_3178 = local_34f8;
        uStack_3170 = uStack_34f0;
        local_3188 = 0x3f8000003f800000;
        uStack_3180 = 0x3f8000003f800000;
        local_3528 = local_3198 + fVar172 + 1.0;
        fStack_3524 = fStack_3194 + fVar182 + 1.0;
        fStack_3520 = fStack_3190 + fVar190 + 1.0;
        fStack_351c = fStack_318c + fVar198 + 1.0;
        local_34f8 = CONCAT44(fStack_3524,local_3528);
        uStack_34f0 = CONCAT44(fStack_351c,fStack_3520);
        local_30e8 = CONCAT44(fStack_34b4,local_34b8);
        uStack_30e0 = CONCAT44(fStack_34ac,fStack_34b0);
        local_2fb8 = CONCAT44((int)fStack_34b4,(int)local_34b8);
        uStack_2fb0 = CONCAT44((int)fStack_34ac,(int)fStack_34b0);
        local_2fc8 = 0x7f0000007f;
        uStack_2fc0 = 0x7f0000007f;
        iVar203 = (int)local_34b8 + 0x7f;
        fStack_34c4 = (float)((int)fStack_34b4 + 0x7f);
        fStack_34c0 = (float)((int)fStack_34b0 + 0x7f);
        fStack_34bc = (float)((int)fStack_34ac + 0x7f);
        local_2f98 = CONCAT44(fStack_34c4,iVar203);
        uStack_2f90 = CONCAT44(fStack_34bc,fStack_34c0);
        local_2f9c = 0x17;
        local_34c8 = (float)(iVar203 * 0x800000);
        local_3508 = CONCAT44(fStack_34c4,local_34c8);
        uStack_3500 = CONCAT44(fStack_34bc,fStack_34c0);
        local_3468 = local_34f8;
        uStack_3460 = uStack_34f0;
        local_3528 = local_3528 * local_34c8;
        fStack_3524 = fStack_3524 * fStack_34c4;
        fStack_3520 = fStack_3520 * fStack_34c0;
        fStack_351c = fStack_351c * fStack_34bc;
        local_34f8 = CONCAT44(fStack_3524,local_3528);
        uStack_34f0 = CONCAT44(fStack_351c,fStack_3520);
        local_3548 = local_34f8;
        uStack_3540 = uStack_34f0;
        local_3528 = local_3528 + 1.0;
        fStack_3524 = fStack_3524 + 1.0;
        fStack_3520 = fStack_3520 + 1.0;
        fStack_351c = fStack_351c + 1.0;
        auVar128._8_8_ = 0x3f8000003f800000;
        auVar128._0_8_ = 0x3f8000003f800000;
        auVar127._4_4_ = fStack_3524;
        auVar127._0_4_ = local_3528;
        auVar127._8_4_ = fStack_3520;
        auVar127._12_4_ = fStack_351c;
        _local_35c8 = divps(auVar128,auVar127);
        local_30f8 = (float)local_35c8._0_4_ * 2.0;
        fStack_30f4 = (float)local_35c8._4_4_ * 2.0;
        fStack_30f0 = fStack_35c0 * 2.0;
        fStack_30ec = fStack_35bc * 2.0;
        local_a668 = local_30f8 - 1.0;
        fStack_a664 = fStack_30f4 - 1.0;
        fStack_a660 = fStack_30f0 - 1.0;
        fStack_a65c = fStack_30ec - 1.0;
        local_a658 = local_c038;
        uStack_a650 = uStack_c030;
        local_b648._4_4_ = fVar180 * fStack_a664;
        local_b648._0_4_ = fVar170 * local_a668;
        uStack_b640._0_4_ = fVar188 * fStack_a660;
        uStack_b640._4_4_ = fVar196 * fStack_a65c;
        local_86e8 = local_8778;
        uStack_86e0 = uStack_8770;
        local_8698 = uVar5;
        uStack_8690 = uVar6;
        local_8638 = local_8680;
        local_8630 = local_8670;
        local_85f8 = local_8680;
        local_85f0 = local_8670;
        local_85b8 = local_8680;
        local_85b0 = local_8670;
        local_8578 = local_8680;
        local_8570 = local_8670;
        local_8538 = local_8680;
        local_8530 = local_8670;
        local_6c78 = local_8758;
        uStack_6c70 = uStack_8750;
        local_60d0 = local_8680;
        local_6070 = local_8680;
        local_6060 = local_60c0;
        local_58f8 = local_8778;
        uStack_58f0 = uStack_8770;
        local_35d8 = local_3648;
        uStack_35d0 = uStack_3640;
        local_35b8 = local_3648;
        uStack_35b0 = uStack_3640;
        local_35a8 = local_3628;
        uStack_35a0 = uStack_3620;
        local_3538 = local_3598;
        uStack_3530 = uStack_3590;
        local_3518 = local_3598;
        uStack_3510 = uStack_3590;
        local_3478 = local_3508;
        uStack_3470 = uStack_3500;
        local_3428 = uVar161;
        uStack_3420 = uVar164;
        local_33c8 = local_3410;
        local_33c0 = local_3400;
        local_3388 = local_3410;
        local_3380 = local_3400;
        local_3348 = local_3410;
        local_3340 = local_3400;
        local_3308 = local_3410;
        local_3300 = local_3400;
        local_32c8 = local_3410;
        local_32c0 = local_3400;
        local_3148 = local_34e8;
        uStack_3140 = uStack_34e0;
        local_3108 = local_3638;
        uStack_3100 = uStack_3630;
        local_3080 = local_3410;
        local_3020 = local_3410;
        local_3010 = local_3070;
        local_2f88 = local_3508;
        uStack_2f80 = uStack_3500;
        local_e90 = local_ed0;
        local_e58 = local_ee0;
        local_e50 = local_ea0;
        local_e18 = local_ee0;
        local_e10 = local_ea0;
        local_dd8 = local_ee0;
        local_dd0 = local_ea0;
        local_d98 = local_ee0;
        local_d90 = local_ea0;
        local_d58 = local_ee0;
        local_d50 = local_ea0;
        local_d18 = local_ee0;
        local_d10 = local_ea0;
        local_cd8 = local_ee0;
        local_cd0 = local_ea0;
        local_c98 = local_ee0;
        local_c90 = local_ea0;
        local_ad8 = local_fc8;
        uStack_ad0 = uStack_fc0;
        local_a98 = uVar204;
        uStack_a90 = uVar205;
        local_a28 = local_a68;
        uStack_a20 = uStack_a60;
        local_9f0 = local_ea0;
        local_8c8 = uVar166;
        uStack_8c0 = uVar167;
        local_4a8 = local_a68;
        uStack_4a0 = uStack_a60;
        break;
      case 6:
        local_b628 = 0;
        local_b5c8 = *(float *)*in_stack_00000008;
        local_b698 = CONCAT44(local_b5c8,local_b5c8);
        uStack_b690 = CONCAT44(local_b5c8,local_b5c8);
        local_b638 = 1;
        local_b5e8 = *(float *)(*in_stack_00000008 + 4);
        local_b6a8 = CONCAT44(local_b5e8,local_b5e8);
        uStack_b6a0 = CONCAT44(local_b5e8,local_b5e8);
        local_a488 = local_c038;
        uStack_a480 = uStack_c030;
        local_a45c = 0x3f800000;
        local_a478 = 0x3f800000;
        uStack_a474 = 0x3f800000;
        uStack_a470 = 0x3f800000;
        uStack_a46c = 0x3f800000;
        local_a4b8 = 0x3f8000003f800000;
        uStack_a4b0 = 0x3f8000003f800000;
        local_a428 = local_c038;
        uStack_a420 = uStack_c030;
        local_9e68 = fVar170 * local_b5c8;
        fStack_9e64 = fVar180 * local_b5c8;
        fStack_9e60 = fVar188 * local_b5c8;
        fStack_9e5c = fVar196 * local_b5c8;
        local_a4a8._4_4_ = fStack_9e64 + local_b5e8;
        local_a4a8._0_4_ = local_9e68 + local_b5e8;
        uStack_a4a0._0_4_ = fStack_9e60 + local_b5e8;
        uStack_a4a0._4_4_ = fStack_9e5c + local_b5e8;
        local_a3f8 = 0;
        uStack_a3f0 = 0;
        local_a408 = local_a4a8;
        uStack_a400 = uStack_a4a0;
        local_a418 = 0;
        uStack_a410 = 0;
        auVar43._8_8_ = uStack_a4a0;
        auVar43._0_8_ = local_a4a8;
        auVar177 = maxps(auVar43,ZEXT816(0));
        local_a4a8 = auVar177._0_8_;
        uStack_a4a0 = auVar177._8_8_;
        local_a3d8 = local_a4a8;
        uStack_a3d0 = uStack_a4a0;
        auVar44._8_8_ = 0x3f8000003f800000;
        auVar44._0_8_ = 0x3f8000003f800000;
        _local_a4a8 = minps(auVar177,auVar44);
        local_a448 = local_a4a8;
        uVar5 = local_a448;
        uStack_a440 = uStack_a4a0;
        uVar6 = uStack_a440;
        local_a458 = local_c038;
        uStack_a450 = uStack_c030;
        local_a448._0_4_ = local_a4a8._0_4_;
        local_a448._4_4_ = local_a4a8._4_4_;
        uStack_a440._0_4_ = local_a4a8._8_4_;
        uStack_a440._4_4_ = local_a4a8._12_4_;
        local_b648._4_4_ = local_a448._4_4_ * fVar180;
        local_b648._0_4_ = (float)local_a448 * fVar170;
        uStack_b640._0_4_ = (float)uStack_a440 * fVar188;
        uStack_b640._4_4_ = uStack_a440._4_4_ * fVar196;
        fStack_b5e4 = local_b5e8;
        fStack_b5e0 = local_b5e8;
        fStack_b5dc = local_b5e8;
        local_b5cc = local_b5e8;
        fStack_b5c4 = local_b5c8;
        fStack_b5c0 = local_b5c8;
        fStack_b5bc = local_b5c8;
        local_b5ac = local_b5c8;
        local_a498 = local_b698;
        uStack_a490 = uStack_b690;
        local_a448 = uVar5;
        uStack_a440 = uVar6;
        local_a438 = local_b698;
        uStack_a430 = uStack_b690;
        local_a3e8 = local_a4b8;
        uStack_a3e0 = uStack_a4b0;
        local_9e78 = local_b6a8;
        uStack_9e70 = uStack_b6a0;
        break;
      default:
        uStack_b640 = uStack_c030;
        local_b648 = (undefined1  [8])local_c038;
      }
      local_b798 = local_c048;
      uStack_b790 = uStack_c040;
      switch(in_R9D) {
      case 1:
        local_aec8 = 0;
        uStack_aec0 = 0;
        local_b008 = local_c048;
        uStack_b000 = uStack_c040;
        local_b018 = 0;
        uStack_b010 = 0;
        auVar10._8_8_ = uStack_c040;
        auVar10._0_8_ = local_c048;
        _local_b788 = maxps(auVar10,ZEXT816(0));
        break;
      case 2:
        local_b738 = 0;
        local_ad8c = *(float *)*in_stack_00000008;
        local_ad88 = local_c048;
        uStack_ad80 = uStack_c040;
        local_ad08 = 0;
        uStack_ad00 = 0;
        local_ad28 = 0;
        uStack_ad20 = 0;
        local_ad38 = local_c048;
        uStack_ad30 = uStack_c040;
        auVar26._8_8_ = uStack_c040;
        auVar26._0_8_ = local_c048;
        local_ada8 = maxps(ZEXT816(0),auVar26);
        local_ad18 = 0;
        uStack_ad10 = 0;
        local_a968 = 0;
        uStack_a960 = 0;
        local_a978 = local_c048;
        uStack_a970 = uStack_c040;
        auVar35._8_8_ = uStack_c040;
        auVar35._0_8_ = local_c048;
        local_adb8 = minps(ZEXT816(0),auVar35);
        local_ad48 = CONCAT44(local_ad8c,local_ad8c);
        uStack_ad40 = CONCAT44(local_ad8c,local_ad8c);
        local_ad58 = local_adb8._0_8_;
        uVar5 = local_ad58;
        uStack_ad50 = local_adb8._8_8_;
        uVar6 = uStack_ad50;
        local_ad58._0_4_ = local_adb8._0_4_;
        local_ad58._4_4_ = local_adb8._4_4_;
        uStack_ad50._0_4_ = local_adb8._8_4_;
        uStack_ad50._4_4_ = local_adb8._12_4_;
        local_9c58 = local_ad8c * (float)local_ad58;
        fStack_9c54 = local_ad8c * local_ad58._4_4_;
        fStack_9c50 = local_ad8c * (float)uStack_ad50;
        fStack_9c4c = local_ad8c * uStack_ad50._4_4_;
        local_9c48 = local_ada8._0_8_;
        uVar161 = local_9c48;
        uStack_9c40 = local_ada8._8_8_;
        uVar164 = uStack_9c40;
        local_9c48._0_4_ = local_ada8._0_4_;
        local_9c48._4_4_ = local_ada8._4_4_;
        uStack_9c40._0_4_ = local_ada8._8_4_;
        uStack_9c40._4_4_ = local_ada8._12_4_;
        local_b788._4_4_ = local_9c48._4_4_ + fStack_9c54;
        local_b788._0_4_ = (float)local_9c48 + local_9c58;
        uStack_b780._0_4_ = (float)uStack_9c40 + fStack_9c50;
        uStack_b780._4_4_ = uStack_9c40._4_4_ + fStack_9c4c;
        local_ad78 = local_ad8c;
        fStack_ad74 = local_ad8c;
        fStack_ad70 = local_ad8c;
        fStack_ad6c = local_ad8c;
        local_ad68 = local_ad8c;
        local_ad58 = uVar5;
        uStack_ad50 = uVar6;
        local_9c48 = uVar161;
        uStack_9c40 = uVar164;
        break;
      case 3:
        local_b748 = 0;
        local_b6c8 = *(undefined4 *)*in_stack_00000008;
        local_b7b8 = CONCAT44(local_b6c8,local_b6c8);
        uStack_b7b0 = CONCAT44(local_b6c8,local_b6c8);
        local_b758 = 1;
        local_b6e8 = *(undefined4 *)(*in_stack_00000008 + 4);
        local_b7c8 = CONCAT44(local_b6e8,local_b6e8);
        uStack_b7c0 = CONCAT44(local_b6e8,local_b6e8);
        local_afe8 = local_c048;
        uStack_afe0 = uStack_c040;
        auVar12._8_8_ = uStack_c040;
        auVar12._0_8_ = local_c048;
        auVar11._8_8_ = uStack_b7b0;
        auVar11._0_8_ = local_b7b8;
        local_a908 = maxps(auVar12,auVar11);
        auVar38._8_8_ = uStack_b7c0;
        auVar38._0_8_ = local_b7c8;
        _local_b788 = minps(local_a908,auVar38);
        uStack_b6e4 = local_b6e8;
        uStack_b6e0 = local_b6e8;
        uStack_b6dc = local_b6e8;
        local_b6d8 = local_b6e8;
        uStack_b6c4 = local_b6c8;
        uStack_b6c0 = local_b6c8;
        uStack_b6bc = local_b6c8;
        local_b6ac = local_b6c8;
        local_aff8 = local_b7b8;
        uStack_aff0 = uStack_b7b0;
        local_a918 = local_b7c8;
        uStack_a910 = uStack_b7c0;
        break;
      case 4:
        local_a818 = local_c048;
        uStack_a810 = uStack_c040;
        local_a7ec = 0x3f800000;
        local_a808 = 0x3f800000;
        uStack_a804 = 0x3f800000;
        uStack_a800 = 0x3f800000;
        uStack_a7fc = 0x3f800000;
        local_a828 = 0x3f8000003f800000;
        uStack_a820 = 0x3f8000003f800000;
        local_a7e8 = 0;
        uStack_a7e0 = 0;
        local_6b28 = 0;
        uStack_6b20 = 0;
        local_6b38 = local_c048;
        uStack_6b30 = uStack_c040;
        local_7448 = CONCAT44(0.0 - fVar181,0.0 - fVar171);
        uStack_7440._0_4_ = 0.0 - fVar189;
        uStack_7440._4_4_ = 0.0 - fVar197;
        local_7228 = 0;
        uStack_7220 = 0;
        local_7488 = 0x3f8000003f800000;
        uStack_7480 = 0x3f8000003f800000;
        local_7208 = local_7448;
        uStack_7200 = uStack_7440;
        local_7218 = 0x42b0c0a542b0c0a5;
        uStack_7210 = 0x42b0c0a542b0c0a5;
        auVar98._8_8_ = uStack_7440;
        auVar98._0_8_ = local_7448;
        auVar97._8_8_ = 0x42b0c0a542b0c0a5;
        auVar97._0_8_ = 0x42b0c0a542b0c0a5;
        auVar177 = minps(auVar98,auVar97);
        local_7448 = auVar177._0_8_;
        uStack_7440 = auVar177._8_8_;
        local_7238 = local_7448;
        uStack_7230 = uStack_7440;
        local_7248 = 0xc2b0c0a5c2b0c0a5;
        uStack_7240 = 0xc2b0c0a5c2b0c0a5;
        auVar96._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar96._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar177 = maxps(auVar177,auVar96);
        local_7448 = auVar177._0_8_;
        uStack_7440 = auVar177._8_8_;
        local_73d8 = local_7448;
        uVar5 = local_73d8;
        uStack_73d0 = uStack_7440;
        uVar6 = uStack_73d0;
        local_73e8 = 0x3fb8aa3b3fb8aa3b;
        uStack_73e0 = 0x3fb8aa3b3fb8aa3b;
        local_73d8._0_4_ = auVar177._0_4_;
        local_73d8._4_4_ = auVar177._4_4_;
        uStack_73d0._0_4_ = auVar177._8_4_;
        uStack_73d0._4_4_ = auVar177._12_4_;
        local_7108 = CONCAT44(local_73d8._4_4_ * 1.442695,(float)local_73d8 * 1.442695);
        uStack_7100 = CONCAT44(uStack_73d0._4_4_ * 1.442695,(float)uStack_73d0 * 1.442695);
        local_7118 = 0x3f0000003f000000;
        uStack_7110 = 0x3f0000003f000000;
        fVar170 = (float)local_73d8 * 1.442695 + 0.5;
        fVar171 = local_73d8._4_4_ * 1.442695 + 0.5;
        fVar180 = (float)uStack_73d0 * 1.442695 + 0.5;
        fVar181 = uStack_73d0._4_4_ * 1.442695 + 0.5;
        local_6ac8 = CONCAT44(fVar171,fVar170);
        uStack_6ac0 = CONCAT44(fVar181,fVar180);
        local_7438 = CONCAT44((int)fVar171,(int)fVar170);
        uStack_7430 = CONCAT44((int)fVar181,(int)fVar180);
        local_7468 = (float)(int)fVar170;
        fStack_7464 = (float)(int)fVar171;
        fStack_7460 = (float)(int)fVar180;
        fStack_745c = (float)(int)fVar181;
        local_7458 = CONCAT44(fStack_7464,local_7468);
        uStack_7450 = CONCAT44(fStack_745c,fStack_7460);
        local_68f8 = CONCAT44(fVar171,fVar170);
        uStack_68f0 = CONCAT44(fVar181,fVar180);
        local_68e8 = local_7458;
        uStack_68e0 = uStack_7450;
        local_7498 = CONCAT44(-(uint)(fVar171 < fStack_7464),-(uint)(fVar170 < local_7468));
        uStack_7490 = CONCAT44(-(uint)(fVar181 < fStack_745c),-(uint)(fVar180 < fStack_7460));
        local_6768 = local_7498;
        uStack_6760 = uStack_7490;
        local_6778 = 0x3f8000003f800000;
        uStack_6770 = 0x3f8000003f800000;
        local_7498 = local_7498 & 0x3f8000003f800000;
        uStack_7490 = uStack_7490 & 0x3f8000003f800000;
        local_6d08 = local_7458;
        uStack_6d00 = uStack_7450;
        local_6d18._0_4_ = (float)local_7498;
        local_6d18._4_4_ = (float)(local_7498 >> 0x20);
        uStack_6d10._0_4_ = (float)uStack_7490;
        uStack_6d10._4_4_ = (float)(uStack_7490 >> 0x20);
        local_7468 = local_7468 - (float)local_6d18;
        fStack_7464 = fStack_7464 - local_6d18._4_4_;
        fStack_7460 = fStack_7460 - (float)uStack_6d10;
        fStack_745c = fStack_745c - uStack_6d10._4_4_;
        local_6480 = &local_7468;
        local_6428 = ::_ps_cephes_exp_C1;
        local_73c0 = &local_7448;
        local_63e8 = local_7448;
        uStack_63e0 = uStack_7440;
        local_6408 = CONCAT44(fStack_7464,local_7468);
        uStack_6400 = CONCAT44(fStack_745c,fStack_7460);
        local_6418[0] = 0.6933594;
        local_6418[1] = 0.6933594;
        afStack_6410[0] = 0.6933594;
        afStack_6410[1] = 0.6933594;
        local_63f8 = local_7468 * 0.6933594;
        fStack_63f4 = fStack_7464 * 0.6933594;
        fStack_63f0 = fStack_7460 * 0.6933594;
        fStack_63ec = fStack_745c * 0.6933594;
        local_7448 = CONCAT44(local_73d8._4_4_ - fStack_63f4,(float)local_73d8 - local_63f8);
        uStack_7440._0_4_ = (float)uStack_73d0 - fStack_63f0;
        uStack_7440._4_4_ = uStack_73d0._4_4_ - fStack_63ec;
        local_6488 = ::_ps_cephes_exp_C2;
        local_6448 = local_7448;
        uStack_6440 = uStack_7440;
        local_6468 = CONCAT44(fStack_7464,local_7468);
        uStack_6460 = CONCAT44(fStack_745c,fStack_7460);
        local_6478[0] = -0.00021219444;
        local_6478[1] = -0.00021219444;
        afStack_6470[0] = -0.00021219444;
        afStack_6470[1] = -0.00021219444;
        local_6458 = local_7468 * -0.00021219444;
        fStack_6454 = fStack_7464 * -0.00021219444;
        fStack_6450 = fStack_7460 * -0.00021219444;
        fStack_644c = fStack_745c * -0.00021219444;
        fVar170 = ((float)local_73d8 - local_63f8) - local_6458;
        fVar171 = (local_73d8._4_4_ - fStack_63f4) - fStack_6454;
        fVar180 = ((float)uStack_73d0 - fStack_63f0) - fStack_6450;
        fVar181 = (uStack_73d0._4_4_ - fStack_63ec) - fStack_644c;
        local_7448 = CONCAT44(fVar171,fVar170);
        uStack_7440._0_4_ = fVar180;
        uStack_7440._4_4_ = fVar181;
        local_73f8 = local_7448;
        uStack_73f0 = uStack_7440;
        local_7408 = local_7448;
        uStack_7400 = uStack_7440;
        local_7458 = CONCAT44(fVar171 * fVar171,fVar170 * fVar170);
        uStack_7450 = CONCAT44(fVar181 * fVar181,fVar180 * fVar180);
        local_73b0 = &local_74a8;
        local_7280 = ::_ps_cephes_exp_p1;
        local_7258 = 0x3950696739506967;
        uStack_7250 = 0x3950696739506967;
        local_7268 = local_7448;
        uStack_7260 = uStack_7440;
        local_71e8 = fVar170 * 0.00019875691;
        fStack_71e4 = fVar171 * 0.00019875691;
        fStack_71e0 = fVar180 * 0.00019875691;
        fStack_71dc = fVar181 * 0.00019875691;
        local_71f8[0] = 0.0013981999;
        local_71f8[1] = 0.0013981999;
        afStack_71f0[0] = 0.0013981999;
        afStack_71f0[1] = 0.0013981999;
        local_74a8 = CONCAT44(fStack_71e4 + 0.0013981999,local_71e8 + 0.0013981999);
        uStack_74a0 = CONCAT44(fStack_71dc + 0.0013981999,fStack_71e0 + 0.0013981999);
        local_72c0 = ::_ps_cephes_exp_p2;
        local_7298 = local_74a8;
        uStack_7290 = uStack_74a0;
        local_72a8 = local_7448;
        uStack_72a0 = uStack_7440;
        local_71c8 = (local_71e8 + 0.0013981999) * fVar170;
        fStack_71c4 = (fStack_71e4 + 0.0013981999) * fVar171;
        fStack_71c0 = (fStack_71e0 + 0.0013981999) * fVar180;
        fStack_71bc = (fStack_71dc + 0.0013981999) * fVar181;
        local_71d8[0] = 0.008333452;
        local_71d8[1] = 0.008333452;
        afStack_71d0[0] = 0.008333452;
        afStack_71d0[1] = 0.008333452;
        local_74a8 = CONCAT44(fStack_71c4 + 0.008333452,local_71c8 + 0.008333452);
        uStack_74a0 = CONCAT44(fStack_71bc + 0.008333452,fStack_71c0 + 0.008333452);
        local_7300 = ::_ps_cephes_exp_p3;
        local_72d8 = local_74a8;
        uStack_72d0 = uStack_74a0;
        local_72e8 = local_7448;
        uStack_72e0 = uStack_7440;
        local_71a8 = (local_71c8 + 0.008333452) * fVar170;
        fStack_71a4 = (fStack_71c4 + 0.008333452) * fVar171;
        fStack_71a0 = (fStack_71c0 + 0.008333452) * fVar180;
        fStack_719c = (fStack_71bc + 0.008333452) * fVar181;
        local_71b8[0] = 0.041665796;
        local_71b8[1] = 0.041665796;
        afStack_71b0[0] = 0.041665796;
        afStack_71b0[1] = 0.041665796;
        local_74a8 = CONCAT44(fStack_71a4 + 0.041665796,local_71a8 + 0.041665796);
        uStack_74a0 = CONCAT44(fStack_719c + 0.041665796,fStack_71a0 + 0.041665796);
        local_7340 = ::_ps_cephes_exp_p4;
        local_7318 = local_74a8;
        uStack_7310 = uStack_74a0;
        local_7328 = local_7448;
        uStack_7320 = uStack_7440;
        local_7188 = (local_71a8 + 0.041665796) * fVar170;
        fStack_7184 = (fStack_71a4 + 0.041665796) * fVar171;
        fStack_7180 = (fStack_71a0 + 0.041665796) * fVar180;
        fStack_717c = (fStack_719c + 0.041665796) * fVar181;
        local_7198[0] = 0.16666666;
        local_7198[1] = 0.16666666;
        afStack_7190[0] = 0.16666666;
        afStack_7190[1] = 0.16666666;
        local_74a8 = CONCAT44(fStack_7184 + 0.16666666,local_7188 + 0.16666666);
        uStack_74a0 = CONCAT44(fStack_717c + 0.16666666,fStack_7180 + 0.16666666);
        local_7380 = ::_ps_cephes_exp_p5;
        local_7358 = local_74a8;
        uStack_7350 = uStack_74a0;
        local_7368 = local_7448;
        uStack_7360 = uStack_7440;
        local_7168 = (local_7188 + 0.16666666) * fVar170;
        fStack_7164 = (fStack_7184 + 0.16666666) * fVar171;
        fStack_7160 = (fStack_7180 + 0.16666666) * fVar180;
        fStack_715c = (fStack_717c + 0.16666666) * fVar181;
        local_7178[0] = 0.5;
        local_7178[1] = 0.5;
        afStack_7170[0] = 0.5;
        afStack_7170[1] = 0.5;
        local_74a8 = CONCAT44(fStack_7164 + 0.5,local_7168 + 0.5);
        uStack_74a0 = CONCAT44(fStack_715c + 0.5,fStack_7160 + 0.5);
        local_73b8 = &local_7458;
        local_7398 = local_74a8;
        uStack_7390 = uStack_74a0;
        local_73a8 = local_7458;
        uStack_73a0 = uStack_7450;
        local_7148 = (local_7168 + 0.5) * fVar170 * fVar170;
        fStack_7144 = (fStack_7164 + 0.5) * fVar171 * fVar171;
        fStack_7140 = (fStack_7160 + 0.5) * fVar180 * fVar180;
        fStack_713c = (fStack_715c + 0.5) * fVar181 * fVar181;
        local_7158 = local_7448;
        uStack_7150 = uStack_7440;
        local_74a8 = CONCAT44(fStack_7144 + fVar171,local_7148 + fVar170);
        uStack_74a0 = CONCAT44(fStack_713c + fVar181,fStack_7140 + fVar180);
        local_7128 = local_74a8;
        uStack_7120 = uStack_74a0;
        local_7138 = 0x3f8000003f800000;
        uStack_7130 = 0x3f8000003f800000;
        local_9a78 = local_7148 + fVar170 + 1.0;
        fStack_9a74 = fStack_7144 + fVar171 + 1.0;
        fStack_9a70 = fStack_7140 + fVar180 + 1.0;
        fStack_9a6c = fStack_713c + fVar181 + 1.0;
        local_74a8 = CONCAT44(fStack_9a74,local_9a78);
        uStack_74a0 = CONCAT44(fStack_9a6c,fStack_9a70);
        local_6ad8 = CONCAT44(fStack_7464,local_7468);
        uStack_6ad0 = CONCAT44(fStack_745c,fStack_7460);
        local_5c28 = CONCAT44((int)fStack_7464,(int)local_7468);
        uStack_5c20 = CONCAT44((int)fStack_745c,(int)fStack_7460);
        local_5c38 = 0x7f0000007f;
        uStack_5c30 = 0x7f0000007f;
        iVar203 = (int)local_7468 + 0x7f;
        fStack_7474 = (float)((int)fStack_7464 + 0x7f);
        fStack_7470 = (float)((int)fStack_7460 + 0x7f);
        fStack_746c = (float)((int)fStack_745c + 0x7f);
        local_5aa8 = CONCAT44(fStack_7474,iVar203);
        uStack_5aa0 = CONCAT44(fStack_746c,fStack_7470);
        local_5aac = 0x17;
        local_7478 = (float)(iVar203 * 0x800000);
        local_74b8 = CONCAT44(fStack_7474,local_7478);
        uStack_74b0 = CONCAT44(fStack_746c,fStack_7470);
        local_7418 = local_74a8;
        uStack_7410 = uStack_74a0;
        local_9a78 = local_9a78 * local_7478;
        fStack_9a74 = fStack_9a74 * fStack_7474;
        fStack_9a70 = fStack_9a70 * fStack_7470;
        fStack_9a6c = fStack_9a6c * fStack_746c;
        local_74a8 = CONCAT44(fStack_9a74,local_9a78);
        uStack_74a0 = CONCAT44(fStack_9a6c,fStack_9a70);
        local_9d18 = local_74a8;
        uStack_9d10 = uStack_74a0;
        local_9a78 = local_9a78 + 1.0;
        fStack_9a74 = fStack_9a74 + 1.0;
        fStack_9a70 = fStack_9a70 + 1.0;
        fStack_9a6c = fStack_9a6c + 1.0;
        auVar63._8_8_ = 0x3f8000003f800000;
        auVar63._0_8_ = 0x3f8000003f800000;
        auVar62._4_4_ = fStack_9a74;
        auVar62._0_4_ = local_9a78;
        auVar62._8_4_ = fStack_9a70;
        auVar62._12_4_ = fStack_9a6c;
        _local_b788 = divps(auVar63,auVar62);
        local_9d08 = local_a828;
        uStack_9d00 = uStack_a820;
        local_9a68 = local_a828;
        uStack_9a60 = uStack_a820;
        local_7428 = local_74b8;
        uStack_7420 = uStack_74b0;
        local_73d8 = uVar5;
        uStack_73d0 = uVar6;
        local_7378 = local_73c0;
        local_7370 = local_73b0;
        local_7338 = local_73c0;
        local_7330 = local_73b0;
        local_72f8 = local_73c0;
        local_72f0 = local_73b0;
        local_72b8 = local_73c0;
        local_72b0 = local_73b0;
        local_7278 = local_73c0;
        local_7270 = local_73b0;
        local_6d18 = local_7498;
        uStack_6d10 = uStack_7490;
        local_6490 = local_73c0;
        local_6430 = local_73c0;
        local_6420 = local_6480;
        local_5948 = local_74b8;
        uStack_5940 = uStack_74b0;
        break;
      case 5:
        local_a648 = local_c048;
        uStack_a640 = uStack_c040;
        local_88a8 = 0;
        uStack_88a0 = 0;
        local_8b08 = 0x3f8000003f800000;
        uStack_8b00 = 0x3f8000003f800000;
        local_8888 = local_c048;
        uStack_8880 = uStack_c040;
        local_8898 = 0x42b0c0a542b0c0a5;
        uStack_8890 = 0x42b0c0a542b0c0a5;
        auVar80._8_8_ = uStack_c040;
        auVar80._0_8_ = local_c048;
        auVar79._8_8_ = 0x42b0c0a542b0c0a5;
        auVar79._0_8_ = 0x42b0c0a542b0c0a5;
        auVar177 = minps(auVar80,auVar79);
        local_8ac8 = auVar177._0_8_;
        uStack_8ac0 = auVar177._8_8_;
        local_88b8 = local_8ac8;
        uStack_88b0 = uStack_8ac0;
        local_88c8 = 0xc2b0c0a5c2b0c0a5;
        uStack_88c0 = 0xc2b0c0a5c2b0c0a5;
        auVar78._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar78._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar177 = maxps(auVar177,auVar78);
        local_8ac8 = auVar177._0_8_;
        uStack_8ac0 = auVar177._8_8_;
        local_8a58 = local_8ac8;
        uVar5 = local_8a58;
        uStack_8a50 = uStack_8ac0;
        uVar6 = uStack_8a50;
        local_8a68 = 0x3fb8aa3b3fb8aa3b;
        uStack_8a60 = 0x3fb8aa3b3fb8aa3b;
        local_8a58._0_4_ = auVar177._0_4_;
        local_8a58._4_4_ = auVar177._4_4_;
        uStack_8a50._0_4_ = auVar177._8_4_;
        uStack_8a50._4_4_ = auVar177._12_4_;
        local_8788 = CONCAT44(local_8a58._4_4_ * 1.442695,(float)local_8a58 * 1.442695);
        uStack_8780 = CONCAT44(uStack_8a50._4_4_ * 1.442695,(float)uStack_8a50 * 1.442695);
        local_8798 = 0x3f0000003f000000;
        uStack_8790 = 0x3f0000003f000000;
        fVar170 = (float)local_8a58 * 1.442695 + 0.5;
        fVar180 = local_8a58._4_4_ * 1.442695 + 0.5;
        fVar188 = (float)uStack_8a50 * 1.442695 + 0.5;
        fVar196 = uStack_8a50._4_4_ * 1.442695 + 0.5;
        local_6a08 = CONCAT44(fVar180,fVar170);
        uStack_6a00 = CONCAT44(fVar196,fVar188);
        local_8ab8 = CONCAT44((int)fVar180,(int)fVar170);
        uStack_8ab0 = CONCAT44((int)fVar196,(int)fVar188);
        local_8ae8 = (float)(int)fVar170;
        fStack_8ae4 = (float)(int)fVar180;
        fStack_8ae0 = (float)(int)fVar188;
        fStack_8adc = (float)(int)fVar196;
        local_8ad8 = CONCAT44(fStack_8ae4,local_8ae8);
        uStack_8ad0 = CONCAT44(fStack_8adc,fStack_8ae0);
        local_6838 = CONCAT44(fVar180,fVar170);
        uStack_6830 = CONCAT44(fVar196,fVar188);
        local_6828 = local_8ad8;
        uStack_6820 = uStack_8ad0;
        local_8b18 = CONCAT44(-(uint)(fVar180 < fStack_8ae4),-(uint)(fVar170 < local_8ae8));
        uStack_8b10 = CONCAT44(-(uint)(fVar196 < fStack_8adc),-(uint)(fVar188 < fStack_8ae0));
        local_66a8 = local_8b18;
        uStack_66a0 = uStack_8b10;
        local_66b8 = 0x3f8000003f800000;
        uStack_66b0 = 0x3f8000003f800000;
        local_8b18 = local_8b18 & 0x3f8000003f800000;
        uStack_8b10 = uStack_8b10 & 0x3f8000003f800000;
        local_6c48 = local_8ad8;
        uStack_6c40 = uStack_8ad0;
        local_6c58._0_4_ = (float)local_8b18;
        local_6c58._4_4_ = (float)(local_8b18 >> 0x20);
        uStack_6c50._0_4_ = (float)uStack_8b10;
        uStack_6c50._4_4_ = (float)(uStack_8b10 >> 0x20);
        local_8ae8 = local_8ae8 - (float)local_6c58;
        fStack_8ae4 = fStack_8ae4 - local_6c58._4_4_;
        fStack_8ae0 = fStack_8ae0 - (float)uStack_6c50;
        fStack_8adc = fStack_8adc - uStack_6c50._4_4_;
        local_6000 = &local_8ae8;
        local_5fa8 = ::_ps_cephes_exp_C1;
        local_8a40 = &local_8ac8;
        local_5f68 = local_8ac8;
        uStack_5f60 = uStack_8ac0;
        local_5f88 = CONCAT44(fStack_8ae4,local_8ae8);
        uStack_5f80 = CONCAT44(fStack_8adc,fStack_8ae0);
        local_5f98[0] = 0.6933594;
        local_5f98[1] = 0.6933594;
        afStack_5f90[0] = 0.6933594;
        afStack_5f90[1] = 0.6933594;
        local_5f78 = local_8ae8 * 0.6933594;
        fStack_5f74 = fStack_8ae4 * 0.6933594;
        fStack_5f70 = fStack_8ae0 * 0.6933594;
        fStack_5f6c = fStack_8adc * 0.6933594;
        local_8ac8 = CONCAT44(local_8a58._4_4_ - fStack_5f74,(float)local_8a58 - local_5f78);
        uStack_8ac0._0_4_ = (float)uStack_8a50 - fStack_5f70;
        uStack_8ac0._4_4_ = uStack_8a50._4_4_ - fStack_5f6c;
        local_6008 = ::_ps_cephes_exp_C2;
        local_5fc8 = local_8ac8;
        uStack_5fc0 = uStack_8ac0;
        local_5fe8 = CONCAT44(fStack_8ae4,local_8ae8);
        uStack_5fe0 = CONCAT44(fStack_8adc,fStack_8ae0);
        local_5ff8[0] = -0.00021219444;
        local_5ff8[1] = -0.00021219444;
        afStack_5ff0[0] = -0.00021219444;
        afStack_5ff0[1] = -0.00021219444;
        local_5fd8 = local_8ae8 * -0.00021219444;
        fStack_5fd4 = fStack_8ae4 * -0.00021219444;
        fStack_5fd0 = fStack_8ae0 * -0.00021219444;
        fStack_5fcc = fStack_8adc * -0.00021219444;
        fVar170 = ((float)local_8a58 - local_5f78) - local_5fd8;
        fVar180 = (local_8a58._4_4_ - fStack_5f74) - fStack_5fd4;
        fVar188 = ((float)uStack_8a50 - fStack_5f70) - fStack_5fd0;
        fVar196 = (uStack_8a50._4_4_ - fStack_5f6c) - fStack_5fcc;
        local_8ac8 = CONCAT44(fVar180,fVar170);
        uStack_8ac0._0_4_ = fVar188;
        uStack_8ac0._4_4_ = fVar196;
        local_8a78 = local_8ac8;
        uStack_8a70 = uStack_8ac0;
        local_8a88 = local_8ac8;
        uStack_8a80 = uStack_8ac0;
        local_8ad8 = CONCAT44(fVar180 * fVar180,fVar170 * fVar170);
        uStack_8ad0 = CONCAT44(fVar196 * fVar196,fVar188 * fVar188);
        local_8a30 = &local_8b28;
        local_8900 = ::_ps_cephes_exp_p1;
        local_88d8 = 0x3950696739506967;
        uStack_88d0 = 0x3950696739506967;
        local_88e8 = local_8ac8;
        uStack_88e0 = uStack_8ac0;
        local_8868 = fVar170 * 0.00019875691;
        fStack_8864 = fVar180 * 0.00019875691;
        fStack_8860 = fVar188 * 0.00019875691;
        fStack_885c = fVar196 * 0.00019875691;
        local_8878[0] = 0.0013981999;
        local_8878[1] = 0.0013981999;
        afStack_8870[0] = 0.0013981999;
        afStack_8870[1] = 0.0013981999;
        local_8b28 = CONCAT44(fStack_8864 + 0.0013981999,local_8868 + 0.0013981999);
        uStack_8b20 = CONCAT44(fStack_885c + 0.0013981999,fStack_8860 + 0.0013981999);
        local_8940 = ::_ps_cephes_exp_p2;
        local_8918 = local_8b28;
        uStack_8910 = uStack_8b20;
        local_8928 = local_8ac8;
        uStack_8920 = uStack_8ac0;
        local_8848 = (local_8868 + 0.0013981999) * fVar170;
        fStack_8844 = (fStack_8864 + 0.0013981999) * fVar180;
        fStack_8840 = (fStack_8860 + 0.0013981999) * fVar188;
        fStack_883c = (fStack_885c + 0.0013981999) * fVar196;
        local_8858[0] = 0.008333452;
        local_8858[1] = 0.008333452;
        afStack_8850[0] = 0.008333452;
        afStack_8850[1] = 0.008333452;
        local_8b28 = CONCAT44(fStack_8844 + 0.008333452,local_8848 + 0.008333452);
        uStack_8b20 = CONCAT44(fStack_883c + 0.008333452,fStack_8840 + 0.008333452);
        local_8980 = ::_ps_cephes_exp_p3;
        local_8958 = local_8b28;
        uStack_8950 = uStack_8b20;
        local_8968 = local_8ac8;
        uStack_8960 = uStack_8ac0;
        local_8828 = (local_8848 + 0.008333452) * fVar170;
        fStack_8824 = (fStack_8844 + 0.008333452) * fVar180;
        fStack_8820 = (fStack_8840 + 0.008333452) * fVar188;
        fStack_881c = (fStack_883c + 0.008333452) * fVar196;
        local_8838[0] = 0.041665796;
        local_8838[1] = 0.041665796;
        afStack_8830[0] = 0.041665796;
        afStack_8830[1] = 0.041665796;
        local_8b28 = CONCAT44(fStack_8824 + 0.041665796,local_8828 + 0.041665796);
        uStack_8b20 = CONCAT44(fStack_881c + 0.041665796,fStack_8820 + 0.041665796);
        local_89c0 = ::_ps_cephes_exp_p4;
        local_8998 = local_8b28;
        uStack_8990 = uStack_8b20;
        local_89a8 = local_8ac8;
        uStack_89a0 = uStack_8ac0;
        local_8808 = (local_8828 + 0.041665796) * fVar170;
        fStack_8804 = (fStack_8824 + 0.041665796) * fVar180;
        fStack_8800 = (fStack_8820 + 0.041665796) * fVar188;
        fStack_87fc = (fStack_881c + 0.041665796) * fVar196;
        local_8818[0] = 0.16666666;
        local_8818[1] = 0.16666666;
        afStack_8810[0] = 0.16666666;
        afStack_8810[1] = 0.16666666;
        local_8b28 = CONCAT44(fStack_8804 + 0.16666666,local_8808 + 0.16666666);
        uStack_8b20 = CONCAT44(fStack_87fc + 0.16666666,fStack_8800 + 0.16666666);
        local_8a00 = ::_ps_cephes_exp_p5;
        local_89d8 = local_8b28;
        uStack_89d0 = uStack_8b20;
        local_89e8 = local_8ac8;
        uStack_89e0 = uStack_8ac0;
        local_87e8 = (local_8808 + 0.16666666) * fVar170;
        fStack_87e4 = (fStack_8804 + 0.16666666) * fVar180;
        fStack_87e0 = (fStack_8800 + 0.16666666) * fVar188;
        fStack_87dc = (fStack_87fc + 0.16666666) * fVar196;
        local_87f8[0] = 0.5;
        local_87f8[1] = 0.5;
        afStack_87f0[0] = 0.5;
        afStack_87f0[1] = 0.5;
        local_8b28 = CONCAT44(fStack_87e4 + 0.5,local_87e8 + 0.5);
        uStack_8b20 = CONCAT44(fStack_87dc + 0.5,fStack_87e0 + 0.5);
        local_8a38 = &local_8ad8;
        local_8a18 = local_8b28;
        uStack_8a10 = uStack_8b20;
        local_8a28 = local_8ad8;
        uStack_8a20 = uStack_8ad0;
        local_87c8 = (local_87e8 + 0.5) * fVar170 * fVar170;
        fStack_87c4 = (fStack_87e4 + 0.5) * fVar180 * fVar180;
        fStack_87c0 = (fStack_87e0 + 0.5) * fVar188 * fVar188;
        fStack_87bc = (fStack_87dc + 0.5) * fVar196 * fVar196;
        local_87d8 = local_8ac8;
        uStack_87d0 = uStack_8ac0;
        local_8b28 = CONCAT44(fStack_87c4 + fVar180,local_87c8 + fVar170);
        uStack_8b20 = CONCAT44(fStack_87bc + fVar196,fStack_87c0 + fVar188);
        local_87a8 = local_8b28;
        uStack_87a0 = uStack_8b20;
        local_87b8 = 0x3f8000003f800000;
        uStack_87b0 = 0x3f8000003f800000;
        fVar170 = local_87c8 + fVar170 + 1.0;
        fVar180 = fStack_87c4 + fVar180 + 1.0;
        fVar188 = fStack_87c0 + fVar188 + 1.0;
        fVar196 = fStack_87bc + fVar196 + 1.0;
        local_8b28 = CONCAT44(fVar180,fVar170);
        uStack_8b20 = CONCAT44(fVar196,fVar188);
        local_6a18 = CONCAT44(fStack_8ae4,local_8ae8);
        uStack_6a10 = CONCAT44(fStack_8adc,fStack_8ae0);
        local_5b68 = CONCAT44((int)fStack_8ae4,(int)local_8ae8);
        uStack_5b60 = CONCAT44((int)fStack_8adc,(int)fStack_8ae0);
        local_5b78 = 0x7f0000007f;
        uStack_5b70 = 0x7f0000007f;
        iVar203 = (int)local_8ae8 + 0x7f;
        fStack_8af4 = (float)((int)fStack_8ae4 + 0x7f);
        fStack_8af0 = (float)((int)fStack_8ae0 + 0x7f);
        fStack_8aec = (float)((int)fStack_8adc + 0x7f);
        local_59e8 = CONCAT44(fStack_8af4,iVar203);
        uStack_59e0 = CONCAT44(fStack_8aec,fStack_8af0);
        local_59ec = 0x17;
        local_8af8 = (float)(iVar203 * 0x800000);
        local_8b38 = CONCAT44(fStack_8af4,local_8af8);
        uStack_8b30 = CONCAT44(fStack_8aec,fStack_8af0);
        local_8a98 = local_8b28;
        uStack_8a90 = uStack_8b20;
        fVar170 = fVar170 * local_8af8;
        fVar180 = fVar180 * fStack_8af4;
        fVar188 = fVar188 * fStack_8af0;
        fVar196 = fVar196 * fStack_8aec;
        local_8b28 = CONCAT44(fVar180,fVar170);
        uStack_8b20 = CONCAT44(fVar196,fVar188);
        local_a61c = 0x3f800000;
        local_a638 = 0x3f800000;
        uStack_a634 = 0x3f800000;
        uStack_a630 = 0x3f800000;
        uStack_a62c = 0x3f800000;
        local_9dd8 = 0x3f8000003f800000;
        uStack_9dd0 = 0x3f8000003f800000;
        local_9dc8 = local_8b28;
        uStack_9dc0 = uStack_8b20;
        fVar170 = fVar170 + 1.0;
        fVar180 = fVar180 + 1.0;
        fVar188 = fVar188 + 1.0;
        fVar196 = fVar196 + 1.0;
        local_15b8 = CONCAT44(fVar180,fVar170);
        uStack_15b0._0_4_ = fVar188;
        uStack_15b0._4_4_ = fVar196;
        local_15d8 = 0x3f8000003f800000;
        uStack_15d0 = 0x3f8000003f800000;
        local_1298 = 0;
        uStack_1290 = 0;
        local_968 = local_15b8;
        uStack_960 = uStack_15b0;
        local_978 = 0;
        uStack_970 = 0;
        local_15e8 = -(uint)(fVar170 <= 0.0);
        iStack_15e4 = -(uint)(fVar180 <= 0.0);
        iStack_15e0 = -(uint)(fVar188 <= 0.0);
        iStack_15dc = -(uint)(fVar196 <= 0.0);
        local_12a8 = local_15b8;
        uStack_12a0 = uStack_15b0;
        local_12b8 = 0x80000000800000;
        uStack_12b0 = 0x80000000800000;
        auVar141._8_8_ = uStack_15b0;
        auVar141._0_8_ = local_15b8;
        auVar140._8_8_ = 0x80000000800000;
        auVar140._0_8_ = 0x80000000800000;
        auVar177 = maxps(auVar141,auVar140);
        local_15b8 = auVar177._0_8_;
        uStack_15b0 = auVar177._8_8_;
        local_808 = local_15b8;
        uStack_800 = uStack_15b0;
        local_8a8 = local_15b8;
        uVar166 = local_8a8;
        uStack_8a0 = uStack_15b0;
        uVar167 = uStack_8a0;
        local_8ac = 0x17;
        local_8a8._0_4_ = auVar177._0_4_;
        local_8a8._4_4_ = auVar177._4_4_;
        uStack_8a0._0_4_ = auVar177._8_4_;
        uStack_8a0._4_4_ = auVar177._12_4_;
        local_1058 = local_15b8;
        uStack_1050 = uStack_15b0;
        local_1068 = 0x807fffff807fffff;
        uStack_1060 = 0x807fffff807fffff;
        local_748 = local_15b8 & 0x807fffff807fffff;
        uStack_740 = uStack_15b0 & 0x807fffff807fffff;
        local_758 = 0x3f0000003f000000;
        uStack_750 = 0x3f0000003f000000;
        local_10b8 = local_748 | 0x3f0000003f000000;
        uStack_10b0 = uStack_740 | 0x3f0000003f000000;
        local_548 = CONCAT44(local_8a8._4_4_ >> 0x17,(uint)local_8a8 >> 0x17);
        uStack_540 = CONCAT44(uStack_8a0._4_4_ >> 0x17,(uint)uStack_8a0 >> 0x17);
        local_558 = 0x7f0000007f;
        uStack_550 = 0x7f0000007f;
        local_15c8 = ((uint)local_8a8 >> 0x17) - 0x7f;
        iStack_15c4 = (local_8a8._4_4_ >> 0x17) - 0x7f;
        iStack_15c0 = ((uint)uStack_8a0 >> 0x17) - 0x7f;
        iStack_15bc = (uStack_8a0._4_4_ >> 0x17) - 0x7f;
        local_15a8 = CONCAT44(iStack_15c4,local_15c8);
        uStack_15a0 = CONCAT44(iStack_15bc,iStack_15c0);
        local_10f8 = CONCAT44((float)iStack_15c4,(float)local_15c8);
        uStack_10f0 = CONCAT44((float)iStack_15bc,(float)iStack_15c0);
        local_1108 = 0x3f8000003f800000;
        uStack_1100 = 0x3f8000003f800000;
        local_15f8 = (float)local_15c8 + 1.0;
        fStack_15f4 = (float)iStack_15c4 + 1.0;
        fStack_15f0 = (float)iStack_15c0 + 1.0;
        fStack_15ec = (float)iStack_15bc + 1.0;
        local_498 = 0x3f3504f33f3504f3;
        uStack_490 = 0x3f3504f33f3504f3;
        local_488._0_4_ = (float)local_10b8;
        local_488._4_4_ = (float)(local_10b8 >> 0x20);
        uStack_480._0_4_ = (float)uStack_10b0;
        uStack_480._4_4_ = (float)(uStack_10b0 >> 0x20);
        local_1608 = -(uint)((float)local_488 < 0.70710677);
        iStack_1604 = -(uint)(local_488._4_4_ < 0.70710677);
        iStack_1600 = -(uint)((float)uStack_480 < 0.70710677);
        iStack_15fc = -(uint)(uStack_480._4_4_ < 0.70710677);
        local_1088 = CONCAT44(iStack_1604,local_1608);
        uStack_1080 = CONCAT44(iStack_15fc,iStack_1600);
        local_1618 = local_10b8 & local_1088;
        uStack_1610 = uStack_10b0 & uStack_1080;
        local_10c8 = 0x3f8000003f800000;
        uStack_10c0 = 0x3f8000003f800000;
        local_15b8 = CONCAT44(local_488._4_4_ - 1.0,(float)local_488 - 1.0);
        uStack_15b0._0_4_ = (float)uStack_480 - 1.0;
        uStack_15b0._4_4_ = uStack_480._4_4_ - 1.0;
        local_10d8 = CONCAT44(fStack_15f4,local_15f8);
        uStack_10d0 = CONCAT44(fStack_15ec,fStack_15f0);
        local_10a8 = CONCAT44(iStack_1604,local_1608);
        uStack_10a0 = CONCAT44(iStack_15fc,iStack_1600);
        local_1098 = 0x3f8000003f800000;
        uStack_1090 = 0x3f8000003f800000;
        uVar204 = local_10a8 & 0x3f8000003f800000;
        uVar205 = uStack_10a0 & 0x3f8000003f800000;
        local_10e8._0_4_ = (float)uVar204;
        local_10e8._4_4_ = (float)(uVar204 >> 0x20);
        uStack_10e0._0_4_ = (float)uVar205;
        uStack_10e0._4_4_ = (float)(uVar205 >> 0x20);
        local_15f8 = local_15f8 - (float)local_10e8;
        fStack_15f4 = fStack_15f4 - local_10e8._4_4_;
        fStack_15f0 = fStack_15f0 - (float)uStack_10e0;
        fStack_15ec = fStack_15ec - uStack_10e0._4_4_;
        local_1118 = local_15b8;
        uStack_1110 = uStack_15b0;
        local_1128._0_4_ = (float)local_1618;
        local_1128._4_4_ = (float)(local_1618 >> 0x20);
        uStack_1120._0_4_ = (float)uStack_1610;
        uStack_1120._4_4_ = (float)(uStack_1610 >> 0x20);
        local_1128._0_4_ = ((float)local_488 - 1.0) + (float)local_1128;
        local_1128._4_4_ = (local_488._4_4_ - 1.0) + local_1128._4_4_;
        uStack_1120._0_4_ = ((float)uStack_480 - 1.0) + (float)uStack_1120;
        uStack_1120._4_4_ = (uStack_480._4_4_ - 1.0) + uStack_1120._4_4_;
        local_15b8 = CONCAT44(local_1128._4_4_,(float)local_1128);
        uStack_15b0._0_4_ = (float)uStack_1120;
        uStack_15b0._4_4_ = uStack_1120._4_4_;
        local_1548 = local_15b8;
        uStack_1540 = uStack_15b0;
        local_1558 = local_15b8;
        uStack_1550 = uStack_15b0;
        local_1628 = (float)local_1128 * (float)local_1128;
        fStack_1624 = local_1128._4_4_ * local_1128._4_4_;
        fStack_1620 = (float)uStack_1120 * (float)uStack_1120;
        fStack_161c = uStack_1120._4_4_ * uStack_1120._4_4_;
        local_14f0 = &local_1638;
        local_1530 = &local_15b8;
        local_12f0 = ::_ps_cephes_log_p1;
        local_12c8 = 0x3d9021bb3d9021bb;
        uStack_12c0 = 0x3d9021bb3d9021bb;
        local_12d8 = local_15b8;
        uStack_12d0 = uStack_15b0;
        local_1278 = (float)local_1128 * 0.070376836;
        fStack_1274 = local_1128._4_4_ * 0.070376836;
        fStack_1270 = (float)uStack_1120 * 0.070376836;
        fStack_126c = uStack_1120._4_4_ * 0.070376836;
        local_1288[0] = -0.1151461;
        local_1288[1] = -0.1151461;
        afStack_1280[0] = -0.1151461;
        afStack_1280[1] = -0.1151461;
        local_1638 = CONCAT44(fStack_1274 + -0.1151461,local_1278 + -0.1151461);
        uStack_1630 = CONCAT44(fStack_126c + -0.1151461,fStack_1270 + -0.1151461);
        local_1330 = ::_ps_cephes_log_p2;
        local_1308 = local_1638;
        uStack_1300 = uStack_1630;
        local_1318 = local_15b8;
        uStack_1310 = uStack_15b0;
        local_1258 = (local_1278 + -0.1151461) * (float)local_1128;
        fStack_1254 = (fStack_1274 + -0.1151461) * local_1128._4_4_;
        fStack_1250 = (fStack_1270 + -0.1151461) * (float)uStack_1120;
        fStack_124c = (fStack_126c + -0.1151461) * uStack_1120._4_4_;
        local_1268[0] = 0.116769984;
        local_1268[1] = 0.116769984;
        afStack_1260[0] = 0.116769984;
        afStack_1260[1] = 0.116769984;
        local_1638 = CONCAT44(fStack_1254 + 0.116769984,local_1258 + 0.116769984);
        uStack_1630 = CONCAT44(fStack_124c + 0.116769984,fStack_1250 + 0.116769984);
        local_1370 = ::_ps_cephes_log_p3;
        local_1348 = local_1638;
        uStack_1340 = uStack_1630;
        local_1358 = local_15b8;
        uStack_1350 = uStack_15b0;
        local_1238 = (local_1258 + 0.116769984) * (float)local_1128;
        fStack_1234 = (fStack_1254 + 0.116769984) * local_1128._4_4_;
        fStack_1230 = (fStack_1250 + 0.116769984) * (float)uStack_1120;
        fStack_122c = (fStack_124c + 0.116769984) * uStack_1120._4_4_;
        local_1248[0] = -0.12420141;
        local_1248[1] = -0.12420141;
        afStack_1240[0] = -0.12420141;
        afStack_1240[1] = -0.12420141;
        local_1638 = CONCAT44(fStack_1234 + -0.12420141,local_1238 + -0.12420141);
        uStack_1630 = CONCAT44(fStack_122c + -0.12420141,fStack_1230 + -0.12420141);
        local_13b0 = ::_ps_cephes_log_p4;
        local_1388 = local_1638;
        uStack_1380 = uStack_1630;
        local_1398 = local_15b8;
        uStack_1390 = uStack_15b0;
        local_1218 = (local_1238 + -0.12420141) * (float)local_1128;
        fStack_1214 = (fStack_1234 + -0.12420141) * local_1128._4_4_;
        fStack_1210 = (fStack_1230 + -0.12420141) * (float)uStack_1120;
        fStack_120c = (fStack_122c + -0.12420141) * uStack_1120._4_4_;
        local_1228[0] = 0.14249323;
        local_1228[1] = 0.14249323;
        afStack_1220[0] = 0.14249323;
        afStack_1220[1] = 0.14249323;
        local_1638 = CONCAT44(fStack_1214 + 0.14249323,local_1218 + 0.14249323);
        uStack_1630 = CONCAT44(fStack_120c + 0.14249323,fStack_1210 + 0.14249323);
        local_13f0 = ::_ps_cephes_log_p5;
        local_13c8 = local_1638;
        uStack_13c0 = uStack_1630;
        local_13d8 = local_15b8;
        uStack_13d0 = uStack_15b0;
        local_11f8 = (local_1218 + 0.14249323) * (float)local_1128;
        fStack_11f4 = (fStack_1214 + 0.14249323) * local_1128._4_4_;
        fStack_11f0 = (fStack_1210 + 0.14249323) * (float)uStack_1120;
        fStack_11ec = (fStack_120c + 0.14249323) * uStack_1120._4_4_;
        local_1208[0] = -0.16668057;
        local_1208[1] = -0.16668057;
        afStack_1200[0] = -0.16668057;
        afStack_1200[1] = -0.16668057;
        local_1638 = CONCAT44(fStack_11f4 + -0.16668057,local_11f8 + -0.16668057);
        uStack_1630 = CONCAT44(fStack_11ec + -0.16668057,fStack_11f0 + -0.16668057);
        local_1430 = ::_ps_cephes_log_p6;
        local_1408 = local_1638;
        uStack_1400 = uStack_1630;
        local_1418 = local_15b8;
        uStack_1410 = uStack_15b0;
        local_11d8 = (local_11f8 + -0.16668057) * (float)local_1128;
        fStack_11d4 = (fStack_11f4 + -0.16668057) * local_1128._4_4_;
        fStack_11d0 = (fStack_11f0 + -0.16668057) * (float)uStack_1120;
        fStack_11cc = (fStack_11ec + -0.16668057) * uStack_1120._4_4_;
        local_11e8[0] = 0.20000714;
        local_11e8[1] = 0.20000714;
        afStack_11e0[0] = 0.20000714;
        afStack_11e0[1] = 0.20000714;
        local_1638 = CONCAT44(fStack_11d4 + 0.20000714,local_11d8 + 0.20000714);
        uStack_1630 = CONCAT44(fStack_11cc + 0.20000714,fStack_11d0 + 0.20000714);
        local_1470 = ::_ps_cephes_log_p7;
        local_1448 = local_1638;
        uStack_1440 = uStack_1630;
        local_1458 = local_15b8;
        uStack_1450 = uStack_15b0;
        local_11b8 = (local_11d8 + 0.20000714) * (float)local_1128;
        fStack_11b4 = (fStack_11d4 + 0.20000714) * local_1128._4_4_;
        fStack_11b0 = (fStack_11d0 + 0.20000714) * (float)uStack_1120;
        fStack_11ac = (fStack_11cc + 0.20000714) * uStack_1120._4_4_;
        local_11c8[0] = -0.24999994;
        local_11c8[1] = -0.24999994;
        afStack_11c0[0] = -0.24999994;
        afStack_11c0[1] = -0.24999994;
        local_1638 = CONCAT44(fStack_11b4 + -0.24999994,local_11b8 + -0.24999994);
        uStack_1630 = CONCAT44(fStack_11ac + -0.24999994,fStack_11b0 + -0.24999994);
        local_14b0 = ::_ps_cephes_log_p8;
        local_1488 = local_1638;
        uStack_1480 = uStack_1630;
        local_1498 = local_15b8;
        uStack_1490 = uStack_15b0;
        local_1198 = (local_11b8 + -0.24999994) * (float)local_1128;
        fStack_1194 = (fStack_11b4 + -0.24999994) * local_1128._4_4_;
        fStack_1190 = (fStack_11b0 + -0.24999994) * (float)uStack_1120;
        fStack_118c = (fStack_11ac + -0.24999994) * uStack_1120._4_4_;
        local_11a8[0] = 0.3333333;
        local_11a8[1] = 0.3333333;
        afStack_11a0[0] = 0.3333333;
        afStack_11a0[1] = 0.3333333;
        local_1638 = CONCAT44(fStack_1194 + 0.3333333,local_1198 + 0.3333333);
        uStack_1630 = CONCAT44(fStack_118c + 0.3333333,fStack_1190 + 0.3333333);
        local_1568 = local_1638;
        uStack_1560 = uStack_1630;
        local_1578 = local_15b8;
        uStack_1570 = uStack_15b0;
        fVar170 = (local_1198 + 0.3333333) * (float)local_1128;
        fVar180 = (fStack_1194 + 0.3333333) * local_1128._4_4_;
        fVar188 = (fStack_1190 + 0.3333333) * (float)uStack_1120;
        fVar196 = (fStack_118c + 0.3333333) * uStack_1120._4_4_;
        local_1638 = CONCAT44(fVar180,fVar170);
        uStack_1630 = CONCAT44(fVar196,fVar188);
        local_1598 = CONCAT44(fStack_1624,local_1628);
        uStack_1590 = CONCAT44(fStack_161c,fStack_1620);
        local_1588 = local_1638;
        uStack_1580 = uStack_1630;
        fVar170 = fVar170 * local_1628;
        fVar180 = fVar180 * fStack_1624;
        fVar188 = fVar188 * fStack_1620;
        fVar196 = fVar196 * fStack_161c;
        local_1638 = CONCAT44(fVar180,fVar170);
        uStack_1630 = CONCAT44(fVar196,fVar188);
        local_1520 = &local_15f8;
        local_14e8 = ::_ps_cephes_log_q1;
        local_14c8 = CONCAT44(fStack_15f4,local_15f8);
        uStack_14c0 = CONCAT44(fStack_15ec,fStack_15f0);
        local_14d8[0] = -0.00021219444;
        local_14d8[1] = -0.00021219444;
        afStack_14d0[0] = -0.00021219444;
        afStack_14d0[1] = -0.00021219444;
        local_1178 = local_15f8 * -0.00021219444;
        fStack_1174 = fStack_15f4 * -0.00021219444;
        fStack_1170 = fStack_15f0 * -0.00021219444;
        fStack_116c = fStack_15ec * -0.00021219444;
        local_1188 = local_1638;
        uStack_1180 = uStack_1630;
        fVar170 = local_1178 + fVar170;
        fVar180 = fStack_1174 + fVar180;
        fVar188 = fStack_1170 + fVar188;
        fVar196 = fStack_116c + fVar196;
        local_1638 = CONCAT44(fVar180,fVar170);
        uStack_1630 = CONCAT44(fVar196,fVar188);
        local_1030 = &local_1628;
        local_1038 = ::_ps_0p5;
        local_ff8 = local_1638;
        uStack_ff0 = uStack_1630;
        local_1018 = CONCAT44(fStack_1624,local_1628);
        uStack_1010 = CONCAT44(fStack_161c,fStack_1620);
        local_1028[0] = 0.5;
        local_1028[1] = 0.5;
        afStack_1020[0] = 0.5;
        afStack_1020[1] = 0.5;
        local_1008 = local_1628 * 0.5;
        fStack_1004 = fStack_1624 * 0.5;
        fStack_1000 = fStack_1620 * 0.5;
        fStack_ffc = fStack_161c * 0.5;
        fVar170 = fVar170 - local_1008;
        fVar180 = fVar180 - fStack_1004;
        fVar188 = fVar188 - fStack_1000;
        fVar196 = fVar196 - fStack_ffc;
        local_1638 = CONCAT44(fVar180,fVar170);
        uStack_1630 = CONCAT44(fVar196,fVar188);
        local_1138 = local_15b8;
        uStack_1130 = uStack_15b0;
        local_1148 = local_1638;
        uStack_1140 = uStack_1630;
        local_1128._0_4_ = (float)local_1128 + fVar170;
        local_1128._4_4_ = local_1128._4_4_ + fVar180;
        uStack_1120._0_4_ = (float)uStack_1120 + fVar188;
        uStack_1120._4_4_ = uStack_1120._4_4_ + fVar196;
        local_15b8 = CONCAT44(local_1128._4_4_,(float)local_1128);
        uStack_15b0._0_4_ = (float)uStack_1120;
        uStack_15b0._4_4_ = uStack_1120._4_4_;
        local_1528 = ::_ps_cephes_log_q2;
        local_1508 = CONCAT44(fStack_15f4,local_15f8);
        uStack_1500 = CONCAT44(fStack_15ec,fStack_15f0);
        local_1518[0] = 0.6933594;
        local_1518[1] = 0.6933594;
        afStack_1510[0] = 0.6933594;
        afStack_1510[1] = 0.6933594;
        local_1158 = local_15f8 * 0.6933594;
        fStack_1154 = fStack_15f4 * 0.6933594;
        fStack_1150 = fStack_15f0 * 0.6933594;
        fStack_114c = fStack_15ec * 0.6933594;
        local_1168 = local_15b8;
        uStack_1160 = uStack_15b0;
        local_15b8 = CONCAT44(fStack_1154 + local_1128._4_4_,local_1158 + (float)local_1128);
        uStack_15b0._0_4_ = fStack_1150 + (float)uStack_1120;
        uStack_15b0._4_4_ = fStack_114c + uStack_1120._4_4_;
        local_778 = CONCAT44(iStack_15e4,local_15e8);
        uStack_770 = CONCAT44(iStack_15dc,iStack_15e0);
        local_768 = local_15b8;
        uStack_760 = uStack_15b0;
        local_3cf8 = local_15b8 | local_778;
        uStack_3cf0 = uStack_15b0 | uStack_770;
        uStack_15b0 = uStack_3cf0;
        local_15b8 = local_3cf8;
        local_3cac = 0x3f800000;
        local_3cc8 = 0x3f800000;
        uStack_3cc4 = 0x3f800000;
        uStack_3cc0 = 0x3f800000;
        uStack_3cbc = 0x3f800000;
        local_3d08 = 0x3f8000003f800000;
        uStack_3d00 = 0x3f8000003f800000;
        local_3ccc = 0x40000000;
        local_3ce8 = 0x40000000;
        uStack_3ce4 = 0x40000000;
        uStack_3ce0 = 0x40000000;
        uStack_3cdc = 0x40000000;
        local_3d18 = 0x4000000040000000;
        uStack_3d10 = 0x4000000040000000;
        local_3c78._0_4_ = (float)local_3cf8;
        local_3c78._4_4_ = (float)(local_3cf8 >> 0x20);
        uStack_3c70._0_4_ = (float)uStack_3cf0;
        uStack_3c70._4_4_ = (float)(uStack_3cf0 >> 0x20);
        local_3c58 = (float)local_3c78 * 2.0;
        fStack_3c54 = local_3c78._4_4_ * 2.0;
        fStack_3c50 = (float)uStack_3c70 * 2.0;
        fStack_3c4c = uStack_3c70._4_4_ * 2.0;
        local_3c2c = 0x3f800000;
        local_3c48 = 0x3f800000;
        uStack_3c44 = 0x3f800000;
        uStack_3c40 = 0x3f800000;
        uStack_3c3c = 0x3f800000;
        local_3c68 = 0x3f8000003f800000;
        uStack_3c60 = 0x3f8000003f800000;
        local_3c28 = 0;
        uStack_3c20 = 0;
        local_37f8 = CONCAT44(fStack_3c54,local_3c58);
        uStack_37f0 = CONCAT44(fStack_3c4c,fStack_3c50);
        local_37e8 = 0;
        uStack_37e0 = 0;
        local_3b68 = CONCAT44(0.0 - fStack_3c54,0.0 - local_3c58);
        uStack_3b60._0_4_ = 0.0 - fStack_3c50;
        uStack_3b60._4_4_ = 0.0 - fStack_3c4c;
        local_3948 = 0;
        uStack_3940 = 0;
        local_3ba8 = 0x3f8000003f800000;
        uStack_3ba0 = 0x3f8000003f800000;
        local_3928 = local_3b68;
        uStack_3920 = uStack_3b60;
        local_3938 = 0x42b0c0a542b0c0a5;
        uStack_3930 = 0x42b0c0a542b0c0a5;
        auVar126._8_8_ = uStack_3b60;
        auVar126._0_8_ = local_3b68;
        auVar125._8_8_ = 0x42b0c0a542b0c0a5;
        auVar125._0_8_ = 0x42b0c0a542b0c0a5;
        auVar177 = minps(auVar126,auVar125);
        local_3b68 = auVar177._0_8_;
        uStack_3b60 = auVar177._8_8_;
        local_3958 = local_3b68;
        uStack_3950 = uStack_3b60;
        local_3968 = 0xc2b0c0a5c2b0c0a5;
        uStack_3960 = 0xc2b0c0a5c2b0c0a5;
        auVar124._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar124._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar177 = maxps(auVar177,auVar124);
        local_3b68 = auVar177._0_8_;
        uStack_3b60 = auVar177._8_8_;
        local_3af8 = local_3b68;
        uVar161 = local_3af8;
        uStack_3af0 = uStack_3b60;
        uVar164 = uStack_3af0;
        local_3b08 = 0x3fb8aa3b3fb8aa3b;
        uStack_3b00 = 0x3fb8aa3b3fb8aa3b;
        local_3af8._0_4_ = auVar177._0_4_;
        local_3af8._4_4_ = auVar177._4_4_;
        uStack_3af0._0_4_ = auVar177._8_4_;
        uStack_3af0._4_4_ = auVar177._12_4_;
        local_3828 = CONCAT44(local_3af8._4_4_ * 1.442695,(float)local_3af8 * 1.442695);
        uStack_3820 = CONCAT44(uStack_3af0._4_4_ * 1.442695,(float)uStack_3af0 * 1.442695);
        local_3838 = 0x3f0000003f000000;
        uStack_3830 = 0x3f0000003f000000;
        fVar170 = (float)local_3af8 * 1.442695 + 0.5;
        fVar180 = local_3af8._4_4_ * 1.442695 + 0.5;
        fVar188 = (float)uStack_3af0 * 1.442695 + 0.5;
        fVar196 = uStack_3af0._4_4_ * 1.442695 + 0.5;
        local_37a8 = CONCAT44(fVar180,fVar170);
        uStack_37a0 = CONCAT44(fVar196,fVar188);
        local_3b58 = CONCAT44((int)fVar180,(int)fVar170);
        uStack_3b50 = CONCAT44((int)fVar196,(int)fVar188);
        local_3b88 = (float)(int)fVar170;
        fStack_3b84 = (float)(int)fVar180;
        fStack_3b80 = (float)(int)fVar188;
        fStack_3b7c = (float)(int)fVar196;
        local_3788 = CONCAT44(fStack_3b84,local_3b88);
        uStack_3780 = CONCAT44(fStack_3b7c,fStack_3b80);
        local_3798 = CONCAT44(fVar180,fVar170);
        uStack_3790 = CONCAT44(fVar196,fVar188);
        local_3bb8 = CONCAT44(-(uint)(fVar180 < fStack_3b84),-(uint)(fVar170 < local_3b88));
        uStack_3bb0 = CONCAT44(-(uint)(fVar196 < fStack_3b7c),-(uint)(fVar188 < fStack_3b80));
        local_3768 = local_3bb8;
        uStack_3760 = uStack_3bb0;
        local_3778 = 0x3f8000003f800000;
        uStack_3770 = 0x3f8000003f800000;
        local_3bb8 = local_3bb8 & 0x3f8000003f800000;
        uStack_3bb0 = uStack_3bb0 & 0x3f8000003f800000;
        local_3808 = CONCAT44(fStack_3b84,local_3b88);
        uStack_3800 = CONCAT44(fStack_3b7c,fStack_3b80);
        local_3818._0_4_ = (float)local_3bb8;
        local_3818._4_4_ = (float)(local_3bb8 >> 0x20);
        uStack_3810._0_4_ = (float)uStack_3bb0;
        uStack_3810._4_4_ = (float)(uStack_3bb0 >> 0x20);
        local_3b88 = local_3b88 - (float)local_3818;
        fStack_3b84 = fStack_3b84 - local_3818._4_4_;
        fStack_3b80 = fStack_3b80 - (float)uStack_3810;
        fStack_3b7c = fStack_3b7c - uStack_3810._4_4_;
        local_3740 = &local_3b88;
        local_36e8 = ::_ps_cephes_exp_C1;
        local_3ae0 = &local_3b68;
        local_36a8 = local_3b68;
        uStack_36a0 = uStack_3b60;
        local_36c8 = CONCAT44(fStack_3b84,local_3b88);
        uStack_36c0 = CONCAT44(fStack_3b7c,fStack_3b80);
        local_36d8[0] = 0.6933594;
        local_36d8[1] = 0.6933594;
        afStack_36d0[0] = 0.6933594;
        afStack_36d0[1] = 0.6933594;
        local_36b8 = local_3b88 * 0.6933594;
        fStack_36b4 = fStack_3b84 * 0.6933594;
        fStack_36b0 = fStack_3b80 * 0.6933594;
        fStack_36ac = fStack_3b7c * 0.6933594;
        local_3b68 = CONCAT44(local_3af8._4_4_ - fStack_36b4,(float)local_3af8 - local_36b8);
        uStack_3b60._0_4_ = (float)uStack_3af0 - fStack_36b0;
        uStack_3b60._4_4_ = uStack_3af0._4_4_ - fStack_36ac;
        local_3748 = ::_ps_cephes_exp_C2;
        local_3708 = local_3b68;
        uStack_3700 = uStack_3b60;
        local_3728 = CONCAT44(fStack_3b84,local_3b88);
        uStack_3720 = CONCAT44(fStack_3b7c,fStack_3b80);
        local_3738[0] = -0.00021219444;
        local_3738[1] = -0.00021219444;
        afStack_3730[0] = -0.00021219444;
        afStack_3730[1] = -0.00021219444;
        local_3718 = local_3b88 * -0.00021219444;
        fStack_3714 = fStack_3b84 * -0.00021219444;
        fStack_3710 = fStack_3b80 * -0.00021219444;
        fStack_370c = fStack_3b7c * -0.00021219444;
        fVar170 = ((float)local_3af8 - local_36b8) - local_3718;
        fVar180 = (local_3af8._4_4_ - fStack_36b4) - fStack_3714;
        fVar188 = ((float)uStack_3af0 - fStack_36b0) - fStack_3710;
        fVar196 = (uStack_3af0._4_4_ - fStack_36ac) - fStack_370c;
        local_3b68 = CONCAT44(fVar180,fVar170);
        uStack_3b60._0_4_ = fVar188;
        uStack_3b60._4_4_ = fVar196;
        local_3b18 = local_3b68;
        uStack_3b10 = uStack_3b60;
        local_3b28 = local_3b68;
        uStack_3b20 = uStack_3b60;
        local_3b78 = fVar170 * fVar170;
        fStack_3b74 = fVar180 * fVar180;
        fStack_3b70 = fVar188 * fVar188;
        fStack_3b6c = fVar196 * fVar196;
        local_3ad0 = &local_3bc8;
        local_39a0 = ::_ps_cephes_exp_p1;
        local_3978 = 0x3950696739506967;
        uStack_3970 = 0x3950696739506967;
        local_3988 = local_3b68;
        uStack_3980 = uStack_3b60;
        local_3908 = fVar170 * 0.00019875691;
        fStack_3904 = fVar180 * 0.00019875691;
        fStack_3900 = fVar188 * 0.00019875691;
        fStack_38fc = fVar196 * 0.00019875691;
        local_3918[0] = 0.0013981999;
        local_3918[1] = 0.0013981999;
        afStack_3910[0] = 0.0013981999;
        afStack_3910[1] = 0.0013981999;
        local_3bc8 = CONCAT44(fStack_3904 + 0.0013981999,local_3908 + 0.0013981999);
        uStack_3bc0 = CONCAT44(fStack_38fc + 0.0013981999,fStack_3900 + 0.0013981999);
        local_39e0 = ::_ps_cephes_exp_p2;
        local_39b8 = local_3bc8;
        uStack_39b0 = uStack_3bc0;
        local_39c8 = local_3b68;
        uStack_39c0 = uStack_3b60;
        local_38e8 = (local_3908 + 0.0013981999) * fVar170;
        fStack_38e4 = (fStack_3904 + 0.0013981999) * fVar180;
        fStack_38e0 = (fStack_3900 + 0.0013981999) * fVar188;
        fStack_38dc = (fStack_38fc + 0.0013981999) * fVar196;
        local_38f8[0] = 0.008333452;
        local_38f8[1] = 0.008333452;
        afStack_38f0[0] = 0.008333452;
        afStack_38f0[1] = 0.008333452;
        local_3bc8 = CONCAT44(fStack_38e4 + 0.008333452,local_38e8 + 0.008333452);
        uStack_3bc0 = CONCAT44(fStack_38dc + 0.008333452,fStack_38e0 + 0.008333452);
        local_3a20 = ::_ps_cephes_exp_p3;
        local_39f8 = local_3bc8;
        uStack_39f0 = uStack_3bc0;
        local_3a08 = local_3b68;
        uStack_3a00 = uStack_3b60;
        local_38c8 = (local_38e8 + 0.008333452) * fVar170;
        fStack_38c4 = (fStack_38e4 + 0.008333452) * fVar180;
        fStack_38c0 = (fStack_38e0 + 0.008333452) * fVar188;
        fStack_38bc = (fStack_38dc + 0.008333452) * fVar196;
        local_38d8[0] = 0.041665796;
        local_38d8[1] = 0.041665796;
        afStack_38d0[0] = 0.041665796;
        afStack_38d0[1] = 0.041665796;
        local_3bc8 = CONCAT44(fStack_38c4 + 0.041665796,local_38c8 + 0.041665796);
        uStack_3bc0 = CONCAT44(fStack_38bc + 0.041665796,fStack_38c0 + 0.041665796);
        local_3a60 = ::_ps_cephes_exp_p4;
        local_3a38 = local_3bc8;
        uStack_3a30 = uStack_3bc0;
        local_3a48 = local_3b68;
        uStack_3a40 = uStack_3b60;
        local_38a8 = (local_38c8 + 0.041665796) * fVar170;
        fStack_38a4 = (fStack_38c4 + 0.041665796) * fVar180;
        fStack_38a0 = (fStack_38c0 + 0.041665796) * fVar188;
        fStack_389c = (fStack_38bc + 0.041665796) * fVar196;
        local_38b8[0] = 0.16666666;
        local_38b8[1] = 0.16666666;
        afStack_38b0[0] = 0.16666666;
        afStack_38b0[1] = 0.16666666;
        local_3bc8 = CONCAT44(fStack_38a4 + 0.16666666,local_38a8 + 0.16666666);
        uStack_3bc0 = CONCAT44(fStack_389c + 0.16666666,fStack_38a0 + 0.16666666);
        local_3aa0 = ::_ps_cephes_exp_p5;
        local_3a78 = local_3bc8;
        uStack_3a70 = uStack_3bc0;
        local_3a88 = local_3b68;
        uStack_3a80 = uStack_3b60;
        local_3888 = (local_38a8 + 0.16666666) * fVar170;
        fStack_3884 = (fStack_38a4 + 0.16666666) * fVar180;
        fStack_3880 = (fStack_38a0 + 0.16666666) * fVar188;
        fStack_387c = (fStack_389c + 0.16666666) * fVar196;
        local_3898[0] = 0.5;
        local_3898[1] = 0.5;
        afStack_3890[0] = 0.5;
        afStack_3890[1] = 0.5;
        local_3bc8 = CONCAT44(fStack_3884 + 0.5,local_3888 + 0.5);
        uStack_3bc0 = CONCAT44(fStack_387c + 0.5,fStack_3880 + 0.5);
        local_3ad8 = &local_3b78;
        local_3ab8 = local_3bc8;
        uStack_3ab0 = uStack_3bc0;
        local_3ac8 = CONCAT44(fStack_3b74,local_3b78);
        uStack_3ac0 = CONCAT44(fStack_3b6c,fStack_3b70);
        local_3868 = (local_3888 + 0.5) * local_3b78;
        fStack_3864 = (fStack_3884 + 0.5) * fStack_3b74;
        fStack_3860 = (fStack_3880 + 0.5) * fStack_3b70;
        fStack_385c = (fStack_387c + 0.5) * fStack_3b6c;
        local_3878 = local_3b68;
        uStack_3870 = uStack_3b60;
        local_3bc8 = CONCAT44(fStack_3864 + fVar180,local_3868 + fVar170);
        uStack_3bc0 = CONCAT44(fStack_385c + fVar196,fStack_3860 + fVar188);
        local_3848 = local_3bc8;
        uStack_3840 = uStack_3bc0;
        local_3858 = 0x3f8000003f800000;
        uStack_3850 = 0x3f8000003f800000;
        local_3bf8 = local_3868 + fVar170 + 1.0;
        fStack_3bf4 = fStack_3864 + fVar180 + 1.0;
        fStack_3bf0 = fStack_3860 + fVar188 + 1.0;
        fStack_3bec = fStack_385c + fVar196 + 1.0;
        local_3bc8 = CONCAT44(fStack_3bf4,local_3bf8);
        uStack_3bc0 = CONCAT44(fStack_3bec,fStack_3bf0);
        local_37b8 = CONCAT44(fStack_3b84,local_3b88);
        uStack_37b0 = CONCAT44(fStack_3b7c,fStack_3b80);
        local_3688 = CONCAT44((int)fStack_3b84,(int)local_3b88);
        uStack_3680 = CONCAT44((int)fStack_3b7c,(int)fStack_3b80);
        local_3698 = 0x7f0000007f;
        uStack_3690 = 0x7f0000007f;
        iVar203 = (int)local_3b88 + 0x7f;
        fStack_3b94 = (float)((int)fStack_3b84 + 0x7f);
        fStack_3b90 = (float)((int)fStack_3b80 + 0x7f);
        fStack_3b8c = (float)((int)fStack_3b7c + 0x7f);
        local_3668 = CONCAT44(fStack_3b94,iVar203);
        uStack_3660 = CONCAT44(fStack_3b8c,fStack_3b90);
        local_366c = 0x17;
        local_3b98 = (float)(iVar203 * 0x800000);
        local_3bd8 = CONCAT44(fStack_3b94,local_3b98);
        uStack_3bd0 = CONCAT44(fStack_3b8c,fStack_3b90);
        local_3b38 = local_3bc8;
        uStack_3b30 = uStack_3bc0;
        local_3bf8 = local_3bf8 * local_3b98;
        fStack_3bf4 = fStack_3bf4 * fStack_3b94;
        fStack_3bf0 = fStack_3bf0 * fStack_3b90;
        fStack_3bec = fStack_3bec * fStack_3b8c;
        local_3bc8 = CONCAT44(fStack_3bf4,local_3bf8);
        uStack_3bc0 = CONCAT44(fStack_3bec,fStack_3bf0);
        local_3c18 = local_3bc8;
        uStack_3c10 = uStack_3bc0;
        local_3bf8 = local_3bf8 + 1.0;
        fStack_3bf4 = fStack_3bf4 + 1.0;
        fStack_3bf0 = fStack_3bf0 + 1.0;
        fStack_3bec = fStack_3bec + 1.0;
        auVar123._8_8_ = 0x3f8000003f800000;
        auVar123._0_8_ = 0x3f8000003f800000;
        auVar122._4_4_ = fStack_3bf4;
        auVar122._0_4_ = local_3bf8;
        auVar122._8_4_ = fStack_3bf0;
        auVar122._12_4_ = fStack_3bec;
        _local_3c98 = divps(auVar123,auVar122);
        local_37c8 = (float)local_3c98._0_4_ * 2.0;
        fStack_37c4 = (float)local_3c98._4_4_ * 2.0;
        fStack_37c0 = fStack_3c90 * 2.0;
        fStack_37bc = fStack_3c8c * 2.0;
        local_a618 = local_37c8 - 1.0;
        fStack_a614 = fStack_37c4 - 1.0;
        fStack_a610 = fStack_37c0 - 1.0;
        fStack_a60c = fStack_37bc - 1.0;
        local_a608 = local_c048;
        uStack_a600 = uStack_c040;
        local_b788._4_4_ = fVar181 * fStack_a614;
        local_b788._0_4_ = fVar171 * local_a618;
        uStack_b780._0_4_ = fVar189 * fStack_a610;
        uStack_b780._4_4_ = fVar197 * fStack_a60c;
        local_8aa8 = local_8b38;
        uStack_8aa0 = uStack_8b30;
        local_8a58 = uVar5;
        uStack_8a50 = uVar6;
        local_89f8 = local_8a40;
        local_89f0 = local_8a30;
        local_89b8 = local_8a40;
        local_89b0 = local_8a30;
        local_8978 = local_8a40;
        local_8970 = local_8a30;
        local_8938 = local_8a40;
        local_8930 = local_8a30;
        local_88f8 = local_8a40;
        local_88f0 = local_8a30;
        local_6c58 = local_8b18;
        uStack_6c50 = uStack_8b10;
        local_6010 = local_8a40;
        local_5fb0 = local_8a40;
        local_5fa0 = local_6000;
        local_58e8 = local_8b38;
        uStack_58e0 = uStack_8b30;
        local_3ca8 = local_3d18;
        uStack_3ca0 = uStack_3d10;
        local_3c88 = local_3d18;
        uStack_3c80 = uStack_3d10;
        local_3c78 = local_3cf8;
        uStack_3c70 = uStack_3cf0;
        local_3c08 = local_3c68;
        uStack_3c00 = uStack_3c60;
        local_3be8 = local_3c68;
        uStack_3be0 = uStack_3c60;
        local_3b48 = local_3bd8;
        uStack_3b40 = uStack_3bd0;
        local_3af8 = uVar161;
        uStack_3af0 = uVar164;
        local_3a98 = local_3ae0;
        local_3a90 = local_3ad0;
        local_3a58 = local_3ae0;
        local_3a50 = local_3ad0;
        local_3a18 = local_3ae0;
        local_3a10 = local_3ad0;
        local_39d8 = local_3ae0;
        local_39d0 = local_3ad0;
        local_3998 = local_3ae0;
        local_3990 = local_3ad0;
        local_3818 = local_3bb8;
        uStack_3810 = uStack_3bb0;
        local_37d8 = local_3d08;
        uStack_37d0 = uStack_3d00;
        local_3750 = local_3ae0;
        local_36f0 = local_3ae0;
        local_36e0 = local_3740;
        local_3658 = local_3bd8;
        uStack_3650 = uStack_3bd0;
        local_14e0 = local_1520;
        local_14a8 = local_1530;
        local_14a0 = local_14f0;
        local_1468 = local_1530;
        local_1460 = local_14f0;
        local_1428 = local_1530;
        local_1420 = local_14f0;
        local_13e8 = local_1530;
        local_13e0 = local_14f0;
        local_13a8 = local_1530;
        local_13a0 = local_14f0;
        local_1368 = local_1530;
        local_1360 = local_14f0;
        local_1328 = local_1530;
        local_1320 = local_14f0;
        local_12e8 = local_1530;
        local_12e0 = local_14f0;
        local_1128 = local_1618;
        uStack_1120 = uStack_1610;
        local_10e8 = uVar204;
        uStack_10e0 = uVar205;
        local_1078 = local_10b8;
        uStack_1070 = uStack_10b0;
        local_1040 = local_14f0;
        local_8a8 = uVar166;
        uStack_8a0 = uVar167;
        local_488 = local_10b8;
        uStack_480 = uStack_10b0;
        break;
      case 6:
        local_b768 = 0;
        local_b708 = *(float *)*in_stack_00000008;
        local_b7d8 = CONCAT44(local_b708,local_b708);
        uStack_b7d0 = CONCAT44(local_b708,local_b708);
        local_b778 = 1;
        local_b728 = *(float *)(*in_stack_00000008 + 4);
        local_b7e8 = CONCAT44(local_b728,local_b728);
        uStack_b7e0 = CONCAT44(local_b728,local_b728);
        local_a398 = local_c048;
        uStack_a390 = uStack_c040;
        local_a36c = 0x3f800000;
        local_a388 = 0x3f800000;
        uStack_a384 = 0x3f800000;
        uStack_a380 = 0x3f800000;
        uStack_a37c = 0x3f800000;
        local_a3c8 = 0x3f8000003f800000;
        uStack_a3c0 = 0x3f8000003f800000;
        local_a338 = local_c048;
        uStack_a330 = uStack_c040;
        local_9e88 = fVar171 * local_b708;
        fStack_9e84 = fVar181 * local_b708;
        fStack_9e80 = fVar189 * local_b708;
        fStack_9e7c = fVar197 * local_b708;
        local_a3b8._4_4_ = fStack_9e84 + local_b728;
        local_a3b8._0_4_ = local_9e88 + local_b728;
        uStack_a3b0._0_4_ = fStack_9e80 + local_b728;
        uStack_a3b0._4_4_ = fStack_9e7c + local_b728;
        local_a308 = 0;
        uStack_a300 = 0;
        local_a318 = local_a3b8;
        uStack_a310 = uStack_a3b0;
        local_a328 = 0;
        uStack_a320 = 0;
        auVar45._8_8_ = uStack_a3b0;
        auVar45._0_8_ = local_a3b8;
        auVar177 = maxps(auVar45,ZEXT816(0));
        local_a3b8 = auVar177._0_8_;
        uStack_a3b0 = auVar177._8_8_;
        local_a2e8 = local_a3b8;
        uStack_a2e0 = uStack_a3b0;
        auVar46._8_8_ = 0x3f8000003f800000;
        auVar46._0_8_ = 0x3f8000003f800000;
        _local_a3b8 = minps(auVar177,auVar46);
        local_a358 = local_a3b8;
        uVar5 = local_a358;
        uStack_a350 = uStack_a3b0;
        uVar6 = uStack_a350;
        local_a368 = local_c048;
        uStack_a360 = uStack_c040;
        local_a358._0_4_ = local_a3b8._0_4_;
        local_a358._4_4_ = local_a3b8._4_4_;
        uStack_a350._0_4_ = local_a3b8._8_4_;
        uStack_a350._4_4_ = local_a3b8._12_4_;
        local_b788._4_4_ = local_a358._4_4_ * fVar181;
        local_b788._0_4_ = (float)local_a358 * fVar171;
        uStack_b780._0_4_ = (float)uStack_a350 * fVar189;
        uStack_b780._4_4_ = uStack_a350._4_4_ * fVar197;
        fStack_b724 = local_b728;
        fStack_b720 = local_b728;
        fStack_b71c = local_b728;
        local_b70c = local_b728;
        fStack_b704 = local_b708;
        fStack_b700 = local_b708;
        fStack_b6fc = local_b708;
        local_b6ec = local_b708;
        local_a3a8 = local_b7d8;
        uStack_a3a0 = uStack_b7d0;
        local_a358 = uVar5;
        uStack_a350 = uVar6;
        local_a348 = local_b7d8;
        uStack_a340 = uStack_b7d0;
        local_a2f8 = local_a3c8;
        uStack_a2f0 = uStack_a3c0;
        local_9e98 = local_b7e8;
        uStack_9e90 = uStack_b7e0;
        break;
      default:
        uStack_b780 = uStack_c040;
        local_b788 = (undefined1  [8])local_c048;
      }
      local_bd48 = local_c008;
      uStack_bd40 = uStack_c000;
      local_bd38._0_4_ = local_b648._0_4_;
      local_bd38._4_4_ = local_b648._4_4_;
      uStack_bd30._0_4_ = local_b648._8_4_;
      uStack_bd30._4_4_ = local_b648._12_4_;
      local_bd38._0_4_ = (float)local_bd38 * fVar175;
      local_bd38._4_4_ = local_bd38._4_4_ * fVar185;
      uStack_bd30._0_4_ = (float)uStack_bd30 * fVar193;
      uStack_bd30._4_4_ = uStack_bd30._4_4_ * fVar201;
      local_c038 = CONCAT44(local_bd38._4_4_,(float)local_bd38);
      uStack_c030 = CONCAT44(uStack_bd30._4_4_,(float)uStack_bd30);
      local_bd68 = local_c018;
      uStack_bd60 = uStack_c010;
      local_bd58._0_4_ = local_b788._0_4_;
      local_bd58._4_4_ = local_b788._4_4_;
      uStack_bd50._0_4_ = local_b788._8_4_;
      uStack_bd50._4_4_ = local_b788._12_4_;
      local_c048 = CONCAT44(local_bd58._4_4_ * fVar183,(float)local_bd58 * fVar173);
      uStack_c040 = CONCAT44(uStack_bd50._4_4_ * fVar199,(float)uStack_bd50 * fVar191);
      local_b3b0 = &local_c038;
      local_b3b8 = &local_c048;
      local_b38c = 0x3f000000;
      local_b3a8 = 0x3f000000;
      local_b3c8 = 0x3f0000003f000000;
      uStack_b3c0 = 0x3f0000003f000000;
      local_3f0 = 0x80000000;
      local_168 = 0x80000000;
      local_b3d8 = 0x8000000080000000;
      uStack_b3d0 = 0x8000000080000000;
      local_65a8 = local_c038;
      uStack_65a0 = uStack_c030;
      local_b3e8 = local_c038 & 0x8000000080000000;
      uStack_b3e0 = uStack_c030 & 0x8000000080000000;
      local_65c8 = local_c048;
      uStack_65c0 = uStack_c040;
      local_b3f8 = local_c048 & 0x8000000080000000;
      uStack_b3f0 = uStack_c040 & 0x8000000080000000;
      local_b408 = local_b3e8 | 0x3f0000003f000000;
      uStack_b400 = uStack_b3e0 | 0x3f0000003f000000;
      local_b418 = local_b3f8 | 0x3f0000003f000000;
      uStack_b410 = uStack_b3f0 | 0x3f0000003f000000;
      local_9b48 = local_c038;
      uStack_9b40 = uStack_c030;
      local_9b58._0_4_ = (float)local_b408;
      local_9b58._4_4_ = (float)(local_b408 >> 0x20);
      uStack_9b50._0_4_ = (float)uStack_b400;
      uStack_9b50._4_4_ = (float)(uStack_b400 >> 0x20);
      local_b428 = (float)local_bd38 + (float)local_9b58;
      fStack_b424 = local_bd38._4_4_ + local_9b58._4_4_;
      fStack_b420 = (float)uStack_bd30 + (float)uStack_9b50;
      fStack_b41c = uStack_bd30._4_4_ + uStack_9b50._4_4_;
      local_9b68 = local_c048;
      uStack_9b60 = uStack_c040;
      local_9b78._0_4_ = (float)local_b418;
      local_9b78._4_4_ = (float)(local_b418 >> 0x20);
      uStack_9b70._0_4_ = (float)uStack_b410;
      uStack_9b70._4_4_ = (float)(uStack_b410 >> 0x20);
      local_b438 = (float)local_bd58 * fVar173 + (float)local_9b78;
      fStack_b434 = local_bd58._4_4_ * fVar183 + local_9b78._4_4_;
      fStack_b430 = (float)uStack_bd50 * fVar191 + (float)uStack_9b70;
      fStack_b42c = uStack_bd50._4_4_ * fVar199 + uStack_9b70._4_4_;
      local_6948 = CONCAT44(fStack_b424,local_b428);
      uStack_6940 = CONCAT44(fStack_b41c,fStack_b420);
      local_b448 = (int)local_b428;
      iStack_b444 = (int)fStack_b424;
      iStack_b440 = (int)fStack_b420;
      iStack_b43c = (int)fStack_b41c;
      local_6958 = CONCAT44(fStack_b434,local_b438);
      uStack_6950 = CONCAT44(fStack_b42c,fStack_b430);
      local_b458 = (int)local_b438;
      iStack_b454 = (int)fStack_b434;
      iStack_b450 = (int)fStack_b430;
      iStack_b44c = (int)fStack_b42c;
      local_398 = CONCAT44(iStack_b444,local_b448);
      uStack_390 = CONCAT44(iStack_b43c,iStack_b440);
      local_3a8 = CONCAT44(iStack_b454,local_b458);
      uStack_3a0 = CONCAT44(iStack_b44c,iStack_b450);
      auVar149._8_8_ = uStack_390;
      auVar149._0_8_ = local_398;
      auVar148._8_8_ = uStack_3a0;
      auVar148._0_8_ = local_3a8;
      auVar177 = packssdw(auVar149,auVar148);
      local_b468 = auVar177._0_8_;
      uVar5 = local_b468;
      uStack_b460 = auVar177._8_8_;
      uVar6 = uStack_b460;
      local_2de = 0x7f;
      local_c8 = 0x7f;
      local_328 = 0x7f007f007f007f;
      uStack_320 = 0x7f007f007f007f;
      local_318._0_2_ = auVar177._0_2_;
      local_318._2_2_ = auVar177._2_2_;
      local_318._4_2_ = auVar177._4_2_;
      local_318._6_2_ = auVar177._6_2_;
      uStack_310._0_2_ = auVar177._8_2_;
      uStack_310._2_2_ = auVar177._10_2_;
      uStack_310._4_2_ = auVar177._12_2_;
      uStack_310._6_2_ = auVar177._14_2_;
      uVar169 = (ushort)(0x7f < (short)local_318) * 0x7f |
                (ushort)(0x7f >= (short)local_318) * (short)local_318;
      uVar178 = (ushort)(0x7f < local_318._2_2_) * 0x7f |
                (ushort)(0x7f >= local_318._2_2_) * local_318._2_2_;
      uVar179 = (ushort)(0x7f < local_318._4_2_) * 0x7f |
                (ushort)(0x7f >= local_318._4_2_) * local_318._4_2_;
      uVar186 = (ushort)(0x7f < local_318._6_2_) * 0x7f |
                (ushort)(0x7f >= local_318._6_2_) * local_318._6_2_;
      uVar187 = (ushort)(0x7f < (short)uStack_310) * 0x7f |
                (ushort)(0x7f >= (short)uStack_310) * (short)uStack_310;
      uVar194 = (ushort)(0x7f < uStack_310._2_2_) * 0x7f |
                (ushort)(0x7f >= uStack_310._2_2_) * uStack_310._2_2_;
      uVar195 = (ushort)(0x7f < uStack_310._4_2_) * 0x7f |
                (ushort)(0x7f >= uStack_310._4_2_) * uStack_310._4_2_;
      uVar202 = (ushort)(0x7f < uStack_310._6_2_) * 0x7f |
                (ushort)(0x7f >= uStack_310._6_2_) * uStack_310._6_2_;
      local_b468._0_4_ = CONCAT22(uVar178,uVar169);
      local_b468._0_6_ = CONCAT24(uVar179,(undefined4)local_b468);
      local_b468 = CONCAT26(uVar186,(undefined6)local_b468);
      uStack_b460._0_2_ = uVar187;
      uStack_b460._2_2_ = uVar194;
      uStack_b460._4_2_ = uVar195;
      uStack_b460._6_2_ = uVar202;
      local_288 = local_b468;
      uStack_280 = uStack_b460;
      local_2e0 = 0xff81;
      local_a8 = 0xff81;
      local_298 = 0xff81ff81ff81ff81;
      uStack_290 = 0xff81ff81ff81ff81;
      local_b468._0_4_ =
           CONCAT22((ushort)((short)uVar178 < -0x7f) * -0x7f | ((short)uVar178 >= -0x7f) * uVar178,
                    (ushort)((short)uVar169 < -0x7f) * -0x7f | ((short)uVar169 >= -0x7f) * uVar169);
      local_b468._0_6_ =
           CONCAT24((ushort)((short)uVar179 < -0x7f) * -0x7f | ((short)uVar179 >= -0x7f) * uVar179,
                    (undefined4)local_b468);
      local_b468 = CONCAT26((ushort)((short)uVar186 < -0x7f) * -0x7f |
                            ((short)uVar186 >= -0x7f) * uVar186,(undefined6)local_b468);
      uStack_b460._0_2_ =
           (ushort)((short)uVar187 < -0x7f) * -0x7f | ((short)uVar187 >= -0x7f) * uVar187;
      uStack_b460._2_2_ =
           (ushort)((short)uVar194 < -0x7f) * -0x7f | ((short)uVar194 >= -0x7f) * uVar194;
      uStack_b460._4_2_ =
           (ushort)((short)uVar195 < -0x7f) * -0x7f | ((short)uVar195 >= -0x7f) * uVar195;
      uStack_b460._6_2_ =
           (ushort)((short)uVar202 < -0x7f) * -0x7f | ((short)uVar202 >= -0x7f) * uVar202;
      local_218 = local_b468;
      uStack_210 = uStack_b460;
      auVar157._8_8_ = uStack_b460;
      auVar157._0_8_ = local_b468;
      auVar156._8_8_ = uStack_b460;
      auVar156._0_8_ = local_b468;
      local_b478 = packsswb(auVar157,auVar156);
      local_1b8 = local_b478._0_8_;
      uStack_1b0 = local_b478._8_8_;
      *local_bf98 = local_b478._0_8_;
      local_bf90 = local_bf90 + 8;
      local_bf98 = local_bf98 + 1;
      local_be58 = uVar3;
      uStack_be50 = uVar4;
      local_be48 = uVar1;
      uStack_be40 = uVar2;
      local_bd58 = local_b788;
      uStack_bd50 = uStack_b780;
      local_bd38 = local_b648;
      uStack_bd30 = uStack_b640;
      uStack_b3a4 = local_b3a8;
      uStack_b3a0 = local_b3a8;
      uStack_b39c = local_b3a8;
      local_9b78 = local_b418;
      uStack_9b70 = uStack_b410;
      local_9b58 = local_b408;
      uStack_9b50 = uStack_b400;
      local_65d8 = local_b3d8;
      uStack_65d0 = uStack_b3d0;
      local_65b8 = local_b3d8;
      uStack_65b0 = uStack_b3d0;
      local_5878 = local_b3d8;
      uStack_5870 = uStack_b3d0;
      local_5f8 = local_b3f8;
      uStack_5f0 = uStack_b3f0;
      local_5e8 = local_b3c8;
      uStack_5e0 = uStack_b3c0;
      local_5d8 = local_b3e8;
      uStack_5d0 = uStack_b3e0;
      local_5c8 = local_b3c8;
      uStack_5c0 = uStack_b3c0;
      local_318 = uVar5;
      uStack_310 = uVar6;
      local_208 = local_218;
      uStack_200 = uStack_210;
      local_178 = local_b3d8;
      uStack_170 = uStack_b3d0;
      local_164 = local_168;
      local_160 = local_168;
      local_15c = local_168;
      local_d8 = local_328;
      uStack_d0 = uStack_320;
      local_c6 = local_c8;
      local_c4 = local_c8;
      local_c2 = local_c8;
      local_c0 = local_c8;
      local_be = local_c8;
      local_bc = local_c8;
      local_ba = local_c8;
      local_b8 = local_298;
      uStack_b0 = uStack_290;
      local_a6 = local_a8;
      local_a4 = local_a8;
      local_a2 = local_a8;
      local_a0 = local_a8;
      local_9e = local_a8;
      local_9c = local_a8;
      local_9a = local_a8;
    }
    for (; local_c01c + 3 < local_bfc4; local_c01c = local_c01c + 4) {
      local_be20 = local_bf90;
      uVar1 = *(undefined8 *)local_bf90;
      uVar2 = *(undefined8 *)(local_bf90 + 2);
      local_be68._0_4_ = (int)uVar1;
      local_be68._4_4_ = (int)((ulong)uVar1 >> 0x20);
      uStack_be60._0_4_ = (int)uVar2;
      uStack_be60._4_4_ = (int)((ulong)uVar2 >> 0x20);
      local_c058 = CONCAT44((float)local_be68._4_4_,(float)(int)local_be68);
      uStack_c050 = CONCAT44((float)uStack_be60._4_4_,(float)(int)uStack_be60);
      local_bd78 = local_c058;
      uStack_bd70 = uStack_c050;
      local_bd88 = local_bfd8;
      uStack_bd80 = uStack_bfd0;
      fVar173 = (float)(int)local_be68 * fVar160;
      fVar183 = (float)local_be68._4_4_ * fVar162;
      fVar191 = (float)(int)uStack_be60 * fVar163;
      fVar199 = (float)uStack_be60._4_4_ * fVar165;
      local_c058 = CONCAT44(fVar183,fVar173);
      uStack_c050 = CONCAT44(fVar199,fVar191);
      local_b8d8 = local_c058;
      uStack_b8d0 = uStack_c050;
      switch(in_R9D) {
      case 1:
        local_aeb8 = 0;
        uStack_aeb0 = 0;
        local_afc8 = local_c058;
        uStack_afc0 = uStack_c050;
        local_afd8 = 0;
        uStack_afd0 = 0;
        auVar13._8_8_ = uStack_c050;
        auVar13._0_8_ = local_c058;
        _local_b8c8 = maxps(auVar13,ZEXT816(0));
        break;
      case 2:
        local_b878 = 0;
        local_accc = *(float *)*in_stack_00000008;
        local_acc8 = local_c058;
        uStack_acc0 = uStack_c050;
        local_ac48 = 0;
        uStack_ac40 = 0;
        local_ac68 = 0;
        uStack_ac60 = 0;
        local_ac78 = local_c058;
        uStack_ac70 = uStack_c050;
        auVar27._8_8_ = uStack_c050;
        auVar27._0_8_ = local_c058;
        local_ace8 = maxps(ZEXT816(0),auVar27);
        local_ac58 = 0;
        uStack_ac50 = 0;
        local_a988 = 0;
        uStack_a980 = 0;
        local_a998 = local_c058;
        uStack_a990 = uStack_c050;
        auVar34._8_8_ = uStack_c050;
        auVar34._0_8_ = local_c058;
        local_acf8 = minps(ZEXT816(0),auVar34);
        local_ac88 = CONCAT44(local_accc,local_accc);
        uStack_ac80 = CONCAT44(local_accc,local_accc);
        local_ac98 = local_acf8._0_8_;
        uVar3 = local_ac98;
        uStack_ac90 = local_acf8._8_8_;
        uVar4 = uStack_ac90;
        local_ac98._0_4_ = local_acf8._0_4_;
        local_ac98._4_4_ = local_acf8._4_4_;
        uStack_ac90._0_4_ = local_acf8._8_4_;
        uStack_ac90._4_4_ = local_acf8._12_4_;
        local_9c78 = local_accc * (float)local_ac98;
        fStack_9c74 = local_accc * local_ac98._4_4_;
        fStack_9c70 = local_accc * (float)uStack_ac90;
        fStack_9c6c = local_accc * uStack_ac90._4_4_;
        local_9c68 = local_ace8._0_8_;
        uVar5 = local_9c68;
        uStack_9c60 = local_ace8._8_8_;
        uVar6 = uStack_9c60;
        local_9c68._0_4_ = local_ace8._0_4_;
        local_9c68._4_4_ = local_ace8._4_4_;
        uStack_9c60._0_4_ = local_ace8._8_4_;
        uStack_9c60._4_4_ = local_ace8._12_4_;
        local_b8c8._4_4_ = local_9c68._4_4_ + fStack_9c74;
        local_b8c8._0_4_ = (float)local_9c68 + local_9c78;
        uStack_b8c0._0_4_ = (float)uStack_9c60 + fStack_9c70;
        uStack_b8c0._4_4_ = uStack_9c60._4_4_ + fStack_9c6c;
        local_acb8 = local_accc;
        fStack_acb4 = local_accc;
        fStack_acb0 = local_accc;
        fStack_acac = local_accc;
        local_aca8 = local_accc;
        local_ac98 = uVar3;
        uStack_ac90 = uVar4;
        local_9c68 = uVar5;
        uStack_9c60 = uVar6;
        break;
      case 3:
        local_b888 = 0;
        local_b808 = *(undefined4 *)*in_stack_00000008;
        local_b8f8 = CONCAT44(local_b808,local_b808);
        uStack_b8f0 = CONCAT44(local_b808,local_b808);
        local_b898 = 1;
        local_b828 = *(undefined4 *)(*in_stack_00000008 + 4);
        local_b908 = CONCAT44(local_b828,local_b828);
        uStack_b900 = CONCAT44(local_b828,local_b828);
        local_afa8 = local_c058;
        uStack_afa0 = uStack_c050;
        auVar15._8_8_ = uStack_c050;
        auVar15._0_8_ = local_c058;
        auVar14._8_8_ = uStack_b8f0;
        auVar14._0_8_ = local_b8f8;
        local_a8e8 = maxps(auVar15,auVar14);
        auVar39._8_8_ = uStack_b900;
        auVar39._0_8_ = local_b908;
        _local_b8c8 = minps(local_a8e8,auVar39);
        uStack_b824 = local_b828;
        uStack_b820 = local_b828;
        uStack_b81c = local_b828;
        local_b818 = local_b828;
        uStack_b804 = local_b808;
        uStack_b800 = local_b808;
        uStack_b7fc = local_b808;
        local_b7ec = local_b808;
        local_afb8 = local_b8f8;
        uStack_afb0 = uStack_b8f0;
        local_a8f8 = local_b908;
        uStack_a8f0 = uStack_b900;
        break;
      case 4:
        local_a7c8 = local_c058;
        uStack_a7c0 = uStack_c050;
        local_a79c = 0x3f800000;
        local_a7b8 = 0x3f800000;
        uStack_a7b4 = 0x3f800000;
        uStack_a7b0 = 0x3f800000;
        uStack_a7ac = 0x3f800000;
        local_a7d8 = 0x3f8000003f800000;
        uStack_a7d0 = 0x3f8000003f800000;
        local_a798 = 0;
        uStack_a790 = 0;
        local_6b48 = 0;
        uStack_6b40 = 0;
        local_6b58 = local_c058;
        uStack_6b50 = uStack_c050;
        local_7808 = CONCAT44(0.0 - fVar183,0.0 - fVar173);
        uStack_7800._0_4_ = 0.0 - fVar191;
        uStack_7800._4_4_ = 0.0 - fVar199;
        local_75e8 = 0;
        uStack_75e0 = 0;
        local_7848 = 0x3f8000003f800000;
        uStack_7840 = 0x3f8000003f800000;
        local_75c8 = local_7808;
        uStack_75c0 = uStack_7800;
        local_75d8 = 0x42b0c0a542b0c0a5;
        uStack_75d0 = 0x42b0c0a542b0c0a5;
        auVar95._8_8_ = uStack_7800;
        auVar95._0_8_ = local_7808;
        auVar94._8_8_ = 0x42b0c0a542b0c0a5;
        auVar94._0_8_ = 0x42b0c0a542b0c0a5;
        auVar177 = minps(auVar95,auVar94);
        local_7808 = auVar177._0_8_;
        uStack_7800 = auVar177._8_8_;
        local_75f8 = local_7808;
        uStack_75f0 = uStack_7800;
        local_7608 = 0xc2b0c0a5c2b0c0a5;
        uStack_7600 = 0xc2b0c0a5c2b0c0a5;
        auVar93._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar93._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar177 = maxps(auVar177,auVar93);
        local_7808 = auVar177._0_8_;
        uStack_7800 = auVar177._8_8_;
        local_7798 = local_7808;
        uVar3 = local_7798;
        uStack_7790 = uStack_7800;
        uVar4 = uStack_7790;
        local_77a8 = 0x3fb8aa3b3fb8aa3b;
        uStack_77a0 = 0x3fb8aa3b3fb8aa3b;
        local_7798._0_4_ = auVar177._0_4_;
        local_7798._4_4_ = auVar177._4_4_;
        uStack_7790._0_4_ = auVar177._8_4_;
        uStack_7790._4_4_ = auVar177._12_4_;
        local_74c8 = CONCAT44(local_7798._4_4_ * 1.442695,(float)local_7798 * 1.442695);
        uStack_74c0 = CONCAT44(uStack_7790._4_4_ * 1.442695,(float)uStack_7790 * 1.442695);
        local_74d8 = 0x3f0000003f000000;
        uStack_74d0 = 0x3f0000003f000000;
        fVar173 = (float)local_7798 * 1.442695 + 0.5;
        fVar183 = local_7798._4_4_ * 1.442695 + 0.5;
        fVar191 = (float)uStack_7790 * 1.442695 + 0.5;
        fVar199 = uStack_7790._4_4_ * 1.442695 + 0.5;
        local_6aa8 = CONCAT44(fVar183,fVar173);
        uStack_6aa0 = CONCAT44(fVar199,fVar191);
        local_77f8 = CONCAT44((int)fVar183,(int)fVar173);
        uStack_77f0 = CONCAT44((int)fVar199,(int)fVar191);
        local_7828 = (float)(int)fVar173;
        fStack_7824 = (float)(int)fVar183;
        fStack_7820 = (float)(int)fVar191;
        fStack_781c = (float)(int)fVar199;
        local_7818 = CONCAT44(fStack_7824,local_7828);
        uStack_7810 = CONCAT44(fStack_781c,fStack_7820);
        local_68d8 = CONCAT44(fVar183,fVar173);
        uStack_68d0 = CONCAT44(fVar199,fVar191);
        local_68c8 = local_7818;
        uStack_68c0 = uStack_7810;
        local_7858 = CONCAT44(-(uint)(fVar183 < fStack_7824),-(uint)(fVar173 < local_7828));
        uStack_7850 = CONCAT44(-(uint)(fVar199 < fStack_781c),-(uint)(fVar191 < fStack_7820));
        local_6748 = local_7858;
        uStack_6740 = uStack_7850;
        local_6758 = 0x3f8000003f800000;
        uStack_6750 = 0x3f8000003f800000;
        local_7858 = local_7858 & 0x3f8000003f800000;
        uStack_7850 = uStack_7850 & 0x3f8000003f800000;
        local_6ce8 = local_7818;
        uStack_6ce0 = uStack_7810;
        local_6cf8._0_4_ = (float)local_7858;
        local_6cf8._4_4_ = (float)(local_7858 >> 0x20);
        uStack_6cf0._0_4_ = (float)uStack_7850;
        uStack_6cf0._4_4_ = (float)(uStack_7850 >> 0x20);
        local_7828 = local_7828 - (float)local_6cf8;
        fStack_7824 = fStack_7824 - local_6cf8._4_4_;
        fStack_7820 = fStack_7820 - (float)uStack_6cf0;
        fStack_781c = fStack_781c - uStack_6cf0._4_4_;
        local_63c0 = &local_7828;
        local_6368 = ::_ps_cephes_exp_C1;
        local_7780 = &local_7808;
        local_6328 = local_7808;
        uStack_6320 = uStack_7800;
        local_6348 = CONCAT44(fStack_7824,local_7828);
        uStack_6340 = CONCAT44(fStack_781c,fStack_7820);
        local_6358[0] = 0.6933594;
        local_6358[1] = 0.6933594;
        afStack_6350[0] = 0.6933594;
        afStack_6350[1] = 0.6933594;
        local_6338 = local_7828 * 0.6933594;
        fStack_6334 = fStack_7824 * 0.6933594;
        fStack_6330 = fStack_7820 * 0.6933594;
        fStack_632c = fStack_781c * 0.6933594;
        local_7808 = CONCAT44(local_7798._4_4_ - fStack_6334,(float)local_7798 - local_6338);
        uStack_7800._0_4_ = (float)uStack_7790 - fStack_6330;
        uStack_7800._4_4_ = uStack_7790._4_4_ - fStack_632c;
        local_63c8 = ::_ps_cephes_exp_C2;
        local_6388 = local_7808;
        uStack_6380 = uStack_7800;
        local_63a8 = CONCAT44(fStack_7824,local_7828);
        uStack_63a0 = CONCAT44(fStack_781c,fStack_7820);
        local_63b8[0] = -0.00021219444;
        local_63b8[1] = -0.00021219444;
        afStack_63b0[0] = -0.00021219444;
        afStack_63b0[1] = -0.00021219444;
        local_6398 = local_7828 * -0.00021219444;
        fStack_6394 = fStack_7824 * -0.00021219444;
        fStack_6390 = fStack_7820 * -0.00021219444;
        fStack_638c = fStack_781c * -0.00021219444;
        fVar173 = ((float)local_7798 - local_6338) - local_6398;
        fVar183 = (local_7798._4_4_ - fStack_6334) - fStack_6394;
        fVar191 = ((float)uStack_7790 - fStack_6330) - fStack_6390;
        fVar199 = (uStack_7790._4_4_ - fStack_632c) - fStack_638c;
        local_7808 = CONCAT44(fVar183,fVar173);
        uStack_7800._0_4_ = fVar191;
        uStack_7800._4_4_ = fVar199;
        local_77b8 = local_7808;
        uStack_77b0 = uStack_7800;
        local_77c8 = local_7808;
        uStack_77c0 = uStack_7800;
        local_7818 = CONCAT44(fVar183 * fVar183,fVar173 * fVar173);
        uStack_7810 = CONCAT44(fVar199 * fVar199,fVar191 * fVar191);
        local_7770 = &local_7868;
        local_7640 = ::_ps_cephes_exp_p1;
        local_7618 = 0x3950696739506967;
        uStack_7610 = 0x3950696739506967;
        local_7628 = local_7808;
        uStack_7620 = uStack_7800;
        local_75a8 = fVar173 * 0.00019875691;
        fStack_75a4 = fVar183 * 0.00019875691;
        fStack_75a0 = fVar191 * 0.00019875691;
        fStack_759c = fVar199 * 0.00019875691;
        local_75b8[0] = 0.0013981999;
        local_75b8[1] = 0.0013981999;
        afStack_75b0[0] = 0.0013981999;
        afStack_75b0[1] = 0.0013981999;
        local_7868 = CONCAT44(fStack_75a4 + 0.0013981999,local_75a8 + 0.0013981999);
        uStack_7860 = CONCAT44(fStack_759c + 0.0013981999,fStack_75a0 + 0.0013981999);
        local_7680 = ::_ps_cephes_exp_p2;
        local_7658 = local_7868;
        uStack_7650 = uStack_7860;
        local_7668 = local_7808;
        uStack_7660 = uStack_7800;
        local_7588 = (local_75a8 + 0.0013981999) * fVar173;
        fStack_7584 = (fStack_75a4 + 0.0013981999) * fVar183;
        fStack_7580 = (fStack_75a0 + 0.0013981999) * fVar191;
        fStack_757c = (fStack_759c + 0.0013981999) * fVar199;
        local_7598[0] = 0.008333452;
        local_7598[1] = 0.008333452;
        afStack_7590[0] = 0.008333452;
        afStack_7590[1] = 0.008333452;
        local_7868 = CONCAT44(fStack_7584 + 0.008333452,local_7588 + 0.008333452);
        uStack_7860 = CONCAT44(fStack_757c + 0.008333452,fStack_7580 + 0.008333452);
        local_76c0 = ::_ps_cephes_exp_p3;
        local_7698 = local_7868;
        uStack_7690 = uStack_7860;
        local_76a8 = local_7808;
        uStack_76a0 = uStack_7800;
        local_7568 = (local_7588 + 0.008333452) * fVar173;
        fStack_7564 = (fStack_7584 + 0.008333452) * fVar183;
        fStack_7560 = (fStack_7580 + 0.008333452) * fVar191;
        fStack_755c = (fStack_757c + 0.008333452) * fVar199;
        local_7578[0] = 0.041665796;
        local_7578[1] = 0.041665796;
        afStack_7570[0] = 0.041665796;
        afStack_7570[1] = 0.041665796;
        local_7868 = CONCAT44(fStack_7564 + 0.041665796,local_7568 + 0.041665796);
        uStack_7860 = CONCAT44(fStack_755c + 0.041665796,fStack_7560 + 0.041665796);
        local_7700 = ::_ps_cephes_exp_p4;
        local_76d8 = local_7868;
        uStack_76d0 = uStack_7860;
        local_76e8 = local_7808;
        uStack_76e0 = uStack_7800;
        local_7548 = (local_7568 + 0.041665796) * fVar173;
        fStack_7544 = (fStack_7564 + 0.041665796) * fVar183;
        fStack_7540 = (fStack_7560 + 0.041665796) * fVar191;
        fStack_753c = (fStack_755c + 0.041665796) * fVar199;
        local_7558[0] = 0.16666666;
        local_7558[1] = 0.16666666;
        afStack_7550[0] = 0.16666666;
        afStack_7550[1] = 0.16666666;
        local_7868 = CONCAT44(fStack_7544 + 0.16666666,local_7548 + 0.16666666);
        uStack_7860 = CONCAT44(fStack_753c + 0.16666666,fStack_7540 + 0.16666666);
        local_7740 = ::_ps_cephes_exp_p5;
        local_7718 = local_7868;
        uStack_7710 = uStack_7860;
        local_7728 = local_7808;
        uStack_7720 = uStack_7800;
        local_7528 = (local_7548 + 0.16666666) * fVar173;
        fStack_7524 = (fStack_7544 + 0.16666666) * fVar183;
        fStack_7520 = (fStack_7540 + 0.16666666) * fVar191;
        fStack_751c = (fStack_753c + 0.16666666) * fVar199;
        local_7538[0] = 0.5;
        local_7538[1] = 0.5;
        afStack_7530[0] = 0.5;
        afStack_7530[1] = 0.5;
        local_7868 = CONCAT44(fStack_7524 + 0.5,local_7528 + 0.5);
        uStack_7860 = CONCAT44(fStack_751c + 0.5,fStack_7520 + 0.5);
        local_7778 = &local_7818;
        local_7758 = local_7868;
        uStack_7750 = uStack_7860;
        local_7768 = local_7818;
        uStack_7760 = uStack_7810;
        local_7508 = (local_7528 + 0.5) * fVar173 * fVar173;
        fStack_7504 = (fStack_7524 + 0.5) * fVar183 * fVar183;
        fStack_7500 = (fStack_7520 + 0.5) * fVar191 * fVar191;
        fStack_74fc = (fStack_751c + 0.5) * fVar199 * fVar199;
        local_7518 = local_7808;
        uStack_7510 = uStack_7800;
        local_7868 = CONCAT44(fStack_7504 + fVar183,local_7508 + fVar173);
        uStack_7860 = CONCAT44(fStack_74fc + fVar199,fStack_7500 + fVar191);
        local_74e8 = local_7868;
        uStack_74e0 = uStack_7860;
        local_74f8 = 0x3f8000003f800000;
        uStack_74f0 = 0x3f8000003f800000;
        local_9a98 = local_7508 + fVar173 + 1.0;
        fStack_9a94 = fStack_7504 + fVar183 + 1.0;
        fStack_9a90 = fStack_7500 + fVar191 + 1.0;
        fStack_9a8c = fStack_74fc + fVar199 + 1.0;
        local_7868 = CONCAT44(fStack_9a94,local_9a98);
        uStack_7860 = CONCAT44(fStack_9a8c,fStack_9a90);
        local_6ab8 = CONCAT44(fStack_7824,local_7828);
        uStack_6ab0 = CONCAT44(fStack_781c,fStack_7820);
        local_5c08 = CONCAT44((int)fStack_7824,(int)local_7828);
        uStack_5c00 = CONCAT44((int)fStack_781c,(int)fStack_7820);
        local_5c18 = 0x7f0000007f;
        uStack_5c10 = 0x7f0000007f;
        iVar203 = (int)local_7828 + 0x7f;
        fStack_7834 = (float)((int)fStack_7824 + 0x7f);
        fStack_7830 = (float)((int)fStack_7820 + 0x7f);
        fStack_782c = (float)((int)fStack_781c + 0x7f);
        local_5a88 = CONCAT44(fStack_7834,iVar203);
        uStack_5a80 = CONCAT44(fStack_782c,fStack_7830);
        local_5a8c = 0x17;
        local_7838 = (float)(iVar203 * 0x800000);
        local_7878 = CONCAT44(fStack_7834,local_7838);
        uStack_7870 = CONCAT44(fStack_782c,fStack_7830);
        local_77d8 = local_7868;
        uStack_77d0 = uStack_7860;
        local_9a98 = local_9a98 * local_7838;
        fStack_9a94 = fStack_9a94 * fStack_7834;
        fStack_9a90 = fStack_9a90 * fStack_7830;
        fStack_9a8c = fStack_9a8c * fStack_782c;
        local_7868 = CONCAT44(fStack_9a94,local_9a98);
        uStack_7860 = CONCAT44(fStack_9a8c,fStack_9a90);
        local_9d38 = local_7868;
        uStack_9d30 = uStack_7860;
        local_9a98 = local_9a98 + 1.0;
        fStack_9a94 = fStack_9a94 + 1.0;
        fStack_9a90 = fStack_9a90 + 1.0;
        fStack_9a8c = fStack_9a8c + 1.0;
        auVar61._8_8_ = 0x3f8000003f800000;
        auVar61._0_8_ = 0x3f8000003f800000;
        auVar60._4_4_ = fStack_9a94;
        auVar60._0_4_ = local_9a98;
        auVar60._8_4_ = fStack_9a90;
        auVar60._12_4_ = fStack_9a8c;
        _local_b8c8 = divps(auVar61,auVar60);
        local_9d28 = local_a7d8;
        uStack_9d20 = uStack_a7d0;
        local_9a88 = local_a7d8;
        uStack_9a80 = uStack_a7d0;
        local_77e8 = local_7878;
        uStack_77e0 = uStack_7870;
        local_7798 = uVar3;
        uStack_7790 = uVar4;
        local_7738 = local_7780;
        local_7730 = local_7770;
        local_76f8 = local_7780;
        local_76f0 = local_7770;
        local_76b8 = local_7780;
        local_76b0 = local_7770;
        local_7678 = local_7780;
        local_7670 = local_7770;
        local_7638 = local_7780;
        local_7630 = local_7770;
        local_6cf8 = local_7858;
        uStack_6cf0 = uStack_7850;
        local_63d0 = local_7780;
        local_6370 = local_7780;
        local_6360 = local_63c0;
        local_5938 = local_7878;
        uStack_5930 = uStack_7870;
        break;
      case 5:
        local_a5f8 = local_c058;
        uStack_a5f0 = uStack_c050;
        local_8c68 = 0;
        uStack_8c60 = 0;
        local_8ec8 = 0x3f8000003f800000;
        uStack_8ec0 = 0x3f8000003f800000;
        local_8c48 = local_c058;
        uStack_8c40 = uStack_c050;
        local_8c58 = 0x42b0c0a542b0c0a5;
        uStack_8c50 = 0x42b0c0a542b0c0a5;
        auVar77._8_8_ = uStack_c050;
        auVar77._0_8_ = local_c058;
        auVar76._8_8_ = 0x42b0c0a542b0c0a5;
        auVar76._0_8_ = 0x42b0c0a542b0c0a5;
        auVar177 = minps(auVar77,auVar76);
        local_8e88 = auVar177._0_8_;
        uStack_8e80 = auVar177._8_8_;
        local_8c78 = local_8e88;
        uStack_8c70 = uStack_8e80;
        local_8c88 = 0xc2b0c0a5c2b0c0a5;
        uStack_8c80 = 0xc2b0c0a5c2b0c0a5;
        auVar75._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar75._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar177 = maxps(auVar177,auVar75);
        local_8e88 = auVar177._0_8_;
        uStack_8e80 = auVar177._8_8_;
        local_8e18 = local_8e88;
        uVar3 = local_8e18;
        uStack_8e10 = uStack_8e80;
        uVar4 = uStack_8e10;
        local_8e28 = 0x3fb8aa3b3fb8aa3b;
        uStack_8e20 = 0x3fb8aa3b3fb8aa3b;
        local_8e18._0_4_ = auVar177._0_4_;
        local_8e18._4_4_ = auVar177._4_4_;
        uStack_8e10._0_4_ = auVar177._8_4_;
        uStack_8e10._4_4_ = auVar177._12_4_;
        local_8b48 = CONCAT44(local_8e18._4_4_ * 1.442695,(float)local_8e18 * 1.442695);
        uStack_8b40 = CONCAT44(uStack_8e10._4_4_ * 1.442695,(float)uStack_8e10 * 1.442695);
        local_8b58 = 0x3f0000003f000000;
        uStack_8b50 = 0x3f0000003f000000;
        fVar174 = (float)local_8e18 * 1.442695 + 0.5;
        fVar184 = local_8e18._4_4_ * 1.442695 + 0.5;
        fVar192 = (float)uStack_8e10 * 1.442695 + 0.5;
        fVar200 = uStack_8e10._4_4_ * 1.442695 + 0.5;
        local_69e8 = CONCAT44(fVar184,fVar174);
        uStack_69e0 = CONCAT44(fVar200,fVar192);
        local_8e78 = CONCAT44((int)fVar184,(int)fVar174);
        uStack_8e70 = CONCAT44((int)fVar200,(int)fVar192);
        local_8ea8 = (float)(int)fVar174;
        fStack_8ea4 = (float)(int)fVar184;
        fStack_8ea0 = (float)(int)fVar192;
        fStack_8e9c = (float)(int)fVar200;
        local_8e98 = CONCAT44(fStack_8ea4,local_8ea8);
        uStack_8e90 = CONCAT44(fStack_8e9c,fStack_8ea0);
        local_6818 = CONCAT44(fVar184,fVar174);
        uStack_6810 = CONCAT44(fVar200,fVar192);
        local_6808 = local_8e98;
        uStack_6800 = uStack_8e90;
        local_8ed8 = CONCAT44(-(uint)(fVar184 < fStack_8ea4),-(uint)(fVar174 < local_8ea8));
        uStack_8ed0 = CONCAT44(-(uint)(fVar200 < fStack_8e9c),-(uint)(fVar192 < fStack_8ea0));
        local_6688 = local_8ed8;
        uStack_6680 = uStack_8ed0;
        local_6698 = 0x3f8000003f800000;
        uStack_6690 = 0x3f8000003f800000;
        local_8ed8 = local_8ed8 & 0x3f8000003f800000;
        uStack_8ed0 = uStack_8ed0 & 0x3f8000003f800000;
        local_6c28 = local_8e98;
        uStack_6c20 = uStack_8e90;
        local_6c38._0_4_ = (float)local_8ed8;
        local_6c38._4_4_ = (float)(local_8ed8 >> 0x20);
        uStack_6c30._0_4_ = (float)uStack_8ed0;
        uStack_6c30._4_4_ = (float)(uStack_8ed0 >> 0x20);
        local_8ea8 = local_8ea8 - (float)local_6c38;
        fStack_8ea4 = fStack_8ea4 - local_6c38._4_4_;
        fStack_8ea0 = fStack_8ea0 - (float)uStack_6c30;
        fStack_8e9c = fStack_8e9c - uStack_6c30._4_4_;
        local_5f40 = &local_8ea8;
        local_5ee8 = ::_ps_cephes_exp_C1;
        local_8e00 = &local_8e88;
        local_5ea8 = local_8e88;
        uStack_5ea0 = uStack_8e80;
        local_5ec8 = CONCAT44(fStack_8ea4,local_8ea8);
        uStack_5ec0 = CONCAT44(fStack_8e9c,fStack_8ea0);
        local_5ed8[0] = 0.6933594;
        local_5ed8[1] = 0.6933594;
        afStack_5ed0[0] = 0.6933594;
        afStack_5ed0[1] = 0.6933594;
        local_5eb8 = local_8ea8 * 0.6933594;
        fStack_5eb4 = fStack_8ea4 * 0.6933594;
        fStack_5eb0 = fStack_8ea0 * 0.6933594;
        fStack_5eac = fStack_8e9c * 0.6933594;
        local_8e88 = CONCAT44(local_8e18._4_4_ - fStack_5eb4,(float)local_8e18 - local_5eb8);
        uStack_8e80._0_4_ = (float)uStack_8e10 - fStack_5eb0;
        uStack_8e80._4_4_ = uStack_8e10._4_4_ - fStack_5eac;
        local_5f48 = ::_ps_cephes_exp_C2;
        local_5f08 = local_8e88;
        uStack_5f00 = uStack_8e80;
        local_5f28 = CONCAT44(fStack_8ea4,local_8ea8);
        uStack_5f20 = CONCAT44(fStack_8e9c,fStack_8ea0);
        local_5f38[0] = -0.00021219444;
        local_5f38[1] = -0.00021219444;
        afStack_5f30[0] = -0.00021219444;
        afStack_5f30[1] = -0.00021219444;
        local_5f18 = local_8ea8 * -0.00021219444;
        fStack_5f14 = fStack_8ea4 * -0.00021219444;
        fStack_5f10 = fStack_8ea0 * -0.00021219444;
        fStack_5f0c = fStack_8e9c * -0.00021219444;
        fVar174 = ((float)local_8e18 - local_5eb8) - local_5f18;
        fVar184 = (local_8e18._4_4_ - fStack_5eb4) - fStack_5f14;
        fVar192 = ((float)uStack_8e10 - fStack_5eb0) - fStack_5f10;
        fVar200 = (uStack_8e10._4_4_ - fStack_5eac) - fStack_5f0c;
        local_8e88 = CONCAT44(fVar184,fVar174);
        uStack_8e80._0_4_ = fVar192;
        uStack_8e80._4_4_ = fVar200;
        local_8e38 = local_8e88;
        uStack_8e30 = uStack_8e80;
        local_8e48 = local_8e88;
        uStack_8e40 = uStack_8e80;
        local_8e98 = CONCAT44(fVar184 * fVar184,fVar174 * fVar174);
        uStack_8e90 = CONCAT44(fVar200 * fVar200,fVar192 * fVar192);
        local_8df0 = &local_8ee8;
        local_8cc0 = ::_ps_cephes_exp_p1;
        local_8c98 = 0x3950696739506967;
        uStack_8c90 = 0x3950696739506967;
        local_8ca8 = local_8e88;
        uStack_8ca0 = uStack_8e80;
        local_8c28 = fVar174 * 0.00019875691;
        fStack_8c24 = fVar184 * 0.00019875691;
        fStack_8c20 = fVar192 * 0.00019875691;
        fStack_8c1c = fVar200 * 0.00019875691;
        local_8c38[0] = 0.0013981999;
        local_8c38[1] = 0.0013981999;
        afStack_8c30[0] = 0.0013981999;
        afStack_8c30[1] = 0.0013981999;
        local_8ee8 = CONCAT44(fStack_8c24 + 0.0013981999,local_8c28 + 0.0013981999);
        uStack_8ee0 = CONCAT44(fStack_8c1c + 0.0013981999,fStack_8c20 + 0.0013981999);
        local_8d00 = ::_ps_cephes_exp_p2;
        local_8cd8 = local_8ee8;
        uStack_8cd0 = uStack_8ee0;
        local_8ce8 = local_8e88;
        uStack_8ce0 = uStack_8e80;
        local_8c08 = (local_8c28 + 0.0013981999) * fVar174;
        fStack_8c04 = (fStack_8c24 + 0.0013981999) * fVar184;
        fStack_8c00 = (fStack_8c20 + 0.0013981999) * fVar192;
        fStack_8bfc = (fStack_8c1c + 0.0013981999) * fVar200;
        local_8c18[0] = 0.008333452;
        local_8c18[1] = 0.008333452;
        afStack_8c10[0] = 0.008333452;
        afStack_8c10[1] = 0.008333452;
        local_8ee8 = CONCAT44(fStack_8c04 + 0.008333452,local_8c08 + 0.008333452);
        uStack_8ee0 = CONCAT44(fStack_8bfc + 0.008333452,fStack_8c00 + 0.008333452);
        local_8d40 = ::_ps_cephes_exp_p3;
        local_8d18 = local_8ee8;
        uStack_8d10 = uStack_8ee0;
        local_8d28 = local_8e88;
        uStack_8d20 = uStack_8e80;
        local_8be8 = (local_8c08 + 0.008333452) * fVar174;
        fStack_8be4 = (fStack_8c04 + 0.008333452) * fVar184;
        fStack_8be0 = (fStack_8c00 + 0.008333452) * fVar192;
        fStack_8bdc = (fStack_8bfc + 0.008333452) * fVar200;
        local_8bf8[0] = 0.041665796;
        local_8bf8[1] = 0.041665796;
        afStack_8bf0[0] = 0.041665796;
        afStack_8bf0[1] = 0.041665796;
        local_8ee8 = CONCAT44(fStack_8be4 + 0.041665796,local_8be8 + 0.041665796);
        uStack_8ee0 = CONCAT44(fStack_8bdc + 0.041665796,fStack_8be0 + 0.041665796);
        local_8d80 = ::_ps_cephes_exp_p4;
        local_8d58 = local_8ee8;
        uStack_8d50 = uStack_8ee0;
        local_8d68 = local_8e88;
        uStack_8d60 = uStack_8e80;
        local_8bc8 = (local_8be8 + 0.041665796) * fVar174;
        fStack_8bc4 = (fStack_8be4 + 0.041665796) * fVar184;
        fStack_8bc0 = (fStack_8be0 + 0.041665796) * fVar192;
        fStack_8bbc = (fStack_8bdc + 0.041665796) * fVar200;
        local_8bd8[0] = 0.16666666;
        local_8bd8[1] = 0.16666666;
        afStack_8bd0[0] = 0.16666666;
        afStack_8bd0[1] = 0.16666666;
        local_8ee8 = CONCAT44(fStack_8bc4 + 0.16666666,local_8bc8 + 0.16666666);
        uStack_8ee0 = CONCAT44(fStack_8bbc + 0.16666666,fStack_8bc0 + 0.16666666);
        local_8dc0 = ::_ps_cephes_exp_p5;
        local_8d98 = local_8ee8;
        uStack_8d90 = uStack_8ee0;
        local_8da8 = local_8e88;
        uStack_8da0 = uStack_8e80;
        local_8ba8 = (local_8bc8 + 0.16666666) * fVar174;
        fStack_8ba4 = (fStack_8bc4 + 0.16666666) * fVar184;
        fStack_8ba0 = (fStack_8bc0 + 0.16666666) * fVar192;
        fStack_8b9c = (fStack_8bbc + 0.16666666) * fVar200;
        local_8bb8[0] = 0.5;
        local_8bb8[1] = 0.5;
        afStack_8bb0[0] = 0.5;
        afStack_8bb0[1] = 0.5;
        local_8ee8 = CONCAT44(fStack_8ba4 + 0.5,local_8ba8 + 0.5);
        uStack_8ee0 = CONCAT44(fStack_8b9c + 0.5,fStack_8ba0 + 0.5);
        local_8df8 = &local_8e98;
        local_8dd8 = local_8ee8;
        uStack_8dd0 = uStack_8ee0;
        local_8de8 = local_8e98;
        uStack_8de0 = uStack_8e90;
        local_8b88 = (local_8ba8 + 0.5) * fVar174 * fVar174;
        fStack_8b84 = (fStack_8ba4 + 0.5) * fVar184 * fVar184;
        fStack_8b80 = (fStack_8ba0 + 0.5) * fVar192 * fVar192;
        fStack_8b7c = (fStack_8b9c + 0.5) * fVar200 * fVar200;
        local_8b98 = local_8e88;
        uStack_8b90 = uStack_8e80;
        local_8ee8 = CONCAT44(fStack_8b84 + fVar184,local_8b88 + fVar174);
        uStack_8ee0 = CONCAT44(fStack_8b7c + fVar200,fStack_8b80 + fVar192);
        local_8b68 = local_8ee8;
        uStack_8b60 = uStack_8ee0;
        local_8b78 = 0x3f8000003f800000;
        uStack_8b70 = 0x3f8000003f800000;
        fVar174 = local_8b88 + fVar174 + 1.0;
        fVar184 = fStack_8b84 + fVar184 + 1.0;
        fVar192 = fStack_8b80 + fVar192 + 1.0;
        fVar200 = fStack_8b7c + fVar200 + 1.0;
        local_8ee8 = CONCAT44(fVar184,fVar174);
        uStack_8ee0 = CONCAT44(fVar200,fVar192);
        local_69f8 = CONCAT44(fStack_8ea4,local_8ea8);
        uStack_69f0 = CONCAT44(fStack_8e9c,fStack_8ea0);
        local_5b48 = CONCAT44((int)fStack_8ea4,(int)local_8ea8);
        uStack_5b40 = CONCAT44((int)fStack_8e9c,(int)fStack_8ea0);
        local_5b58 = 0x7f0000007f;
        uStack_5b50 = 0x7f0000007f;
        iVar203 = (int)local_8ea8 + 0x7f;
        fStack_8eb4 = (float)((int)fStack_8ea4 + 0x7f);
        fStack_8eb0 = (float)((int)fStack_8ea0 + 0x7f);
        fStack_8eac = (float)((int)fStack_8e9c + 0x7f);
        local_59c8 = CONCAT44(fStack_8eb4,iVar203);
        uStack_59c0 = CONCAT44(fStack_8eac,fStack_8eb0);
        local_59cc = 0x17;
        local_8eb8 = (float)(iVar203 * 0x800000);
        local_8ef8 = CONCAT44(fStack_8eb4,local_8eb8);
        uStack_8ef0 = CONCAT44(fStack_8eac,fStack_8eb0);
        local_8e58 = local_8ee8;
        uStack_8e50 = uStack_8ee0;
        fVar174 = fVar174 * local_8eb8;
        fVar184 = fVar184 * fStack_8eb4;
        fVar192 = fVar192 * fStack_8eb0;
        fVar200 = fVar200 * fStack_8eac;
        local_8ee8 = CONCAT44(fVar184,fVar174);
        uStack_8ee0 = CONCAT44(fVar200,fVar192);
        local_a5cc = 0x3f800000;
        local_a5e8 = 0x3f800000;
        uStack_a5e4 = 0x3f800000;
        uStack_a5e0 = 0x3f800000;
        uStack_a5dc = 0x3f800000;
        local_9df8 = 0x3f8000003f800000;
        uStack_9df0 = 0x3f8000003f800000;
        local_9de8 = local_8ee8;
        uStack_9de0 = uStack_8ee0;
        fVar174 = fVar174 + 1.0;
        fVar184 = fVar184 + 1.0;
        fVar192 = fVar192 + 1.0;
        fVar200 = fVar200 + 1.0;
        local_1c08 = CONCAT44(fVar184,fVar174);
        uStack_1c00._0_4_ = fVar192;
        uStack_1c00._4_4_ = fVar200;
        local_1c28 = 0x3f8000003f800000;
        uStack_1c20 = 0x3f8000003f800000;
        local_18e8 = 0;
        uStack_18e0 = 0;
        local_948 = local_1c08;
        uStack_940 = uStack_1c00;
        local_958 = 0;
        uStack_950 = 0;
        local_1c38 = -(uint)(fVar174 <= 0.0);
        iStack_1c34 = -(uint)(fVar184 <= 0.0);
        iStack_1c30 = -(uint)(fVar192 <= 0.0);
        iStack_1c2c = -(uint)(fVar200 <= 0.0);
        local_18f8 = local_1c08;
        uStack_18f0 = uStack_1c00;
        local_1908 = 0x80000000800000;
        uStack_1900 = 0x80000000800000;
        auVar139._8_8_ = uStack_1c00;
        auVar139._0_8_ = local_1c08;
        auVar138._8_8_ = 0x80000000800000;
        auVar138._0_8_ = 0x80000000800000;
        auVar177 = maxps(auVar139,auVar138);
        local_1c08 = auVar177._0_8_;
        uStack_1c00 = auVar177._8_8_;
        local_7f8 = local_1c08;
        uStack_7f0 = uStack_1c00;
        local_888 = local_1c08;
        uVar166 = local_888;
        uStack_880 = uStack_1c00;
        uVar167 = uStack_880;
        local_88c = 0x17;
        local_888._0_4_ = auVar177._0_4_;
        local_888._4_4_ = auVar177._4_4_;
        uStack_880._0_4_ = auVar177._8_4_;
        uStack_880._4_4_ = auVar177._12_4_;
        local_16a8 = local_1c08;
        uStack_16a0 = uStack_1c00;
        local_16b8 = 0x807fffff807fffff;
        uStack_16b0 = 0x807fffff807fffff;
        local_708 = local_1c08 & 0x807fffff807fffff;
        uStack_700 = uStack_1c00 & 0x807fffff807fffff;
        local_718 = 0x3f0000003f000000;
        uStack_710 = 0x3f0000003f000000;
        local_1708 = local_708 | 0x3f0000003f000000;
        uStack_1700 = uStack_700 | 0x3f0000003f000000;
        local_528 = CONCAT44(local_888._4_4_ >> 0x17,(uint)local_888 >> 0x17);
        uStack_520 = CONCAT44(uStack_880._4_4_ >> 0x17,(uint)uStack_880 >> 0x17);
        local_538 = 0x7f0000007f;
        uStack_530 = 0x7f0000007f;
        local_1c18 = ((uint)local_888 >> 0x17) - 0x7f;
        iStack_1c14 = (local_888._4_4_ >> 0x17) - 0x7f;
        iStack_1c10 = ((uint)uStack_880 >> 0x17) - 0x7f;
        iStack_1c0c = (uStack_880._4_4_ >> 0x17) - 0x7f;
        local_1bf8 = CONCAT44(iStack_1c14,local_1c18);
        uStack_1bf0 = CONCAT44(iStack_1c0c,iStack_1c10);
        local_1748 = CONCAT44((float)iStack_1c14,(float)local_1c18);
        uStack_1740 = CONCAT44((float)iStack_1c0c,(float)iStack_1c10);
        local_1758 = 0x3f8000003f800000;
        uStack_1750 = 0x3f8000003f800000;
        local_1c48 = (float)local_1c18 + 1.0;
        fStack_1c44 = (float)iStack_1c14 + 1.0;
        fStack_1c40 = (float)iStack_1c10 + 1.0;
        fStack_1c3c = (float)iStack_1c0c + 1.0;
        local_478 = 0x3f3504f33f3504f3;
        uStack_470 = 0x3f3504f33f3504f3;
        local_468._0_4_ = (float)local_1708;
        local_468._4_4_ = (float)(local_1708 >> 0x20);
        uStack_460._0_4_ = (float)uStack_1700;
        uStack_460._4_4_ = (float)(uStack_1700 >> 0x20);
        local_1c58 = -(uint)((float)local_468 < 0.70710677);
        iStack_1c54 = -(uint)(local_468._4_4_ < 0.70710677);
        iStack_1c50 = -(uint)((float)uStack_460 < 0.70710677);
        iStack_1c4c = -(uint)(uStack_460._4_4_ < 0.70710677);
        local_16d8 = CONCAT44(iStack_1c54,local_1c58);
        uStack_16d0 = CONCAT44(iStack_1c4c,iStack_1c50);
        local_1c68 = local_1708 & local_16d8;
        uStack_1c60 = uStack_1700 & uStack_16d0;
        local_1718 = 0x3f8000003f800000;
        uStack_1710 = 0x3f8000003f800000;
        local_1c08 = CONCAT44(local_468._4_4_ - 1.0,(float)local_468 - 1.0);
        uStack_1c00._0_4_ = (float)uStack_460 - 1.0;
        uStack_1c00._4_4_ = uStack_460._4_4_ - 1.0;
        local_1728 = CONCAT44(fStack_1c44,local_1c48);
        uStack_1720 = CONCAT44(fStack_1c3c,fStack_1c40);
        local_16f8 = CONCAT44(iStack_1c54,local_1c58);
        uStack_16f0 = CONCAT44(iStack_1c4c,iStack_1c50);
        local_16e8 = 0x3f8000003f800000;
        uStack_16e0 = 0x3f8000003f800000;
        uVar204 = local_16f8 & 0x3f8000003f800000;
        uVar205 = uStack_16f0 & 0x3f8000003f800000;
        local_1738._0_4_ = (float)uVar204;
        local_1738._4_4_ = (float)(uVar204 >> 0x20);
        uStack_1730._0_4_ = (float)uVar205;
        uStack_1730._4_4_ = (float)(uVar205 >> 0x20);
        local_1c48 = local_1c48 - (float)local_1738;
        fStack_1c44 = fStack_1c44 - local_1738._4_4_;
        fStack_1c40 = fStack_1c40 - (float)uStack_1730;
        fStack_1c3c = fStack_1c3c - uStack_1730._4_4_;
        local_1768 = local_1c08;
        uStack_1760 = uStack_1c00;
        local_1778._0_4_ = (float)local_1c68;
        local_1778._4_4_ = (float)(local_1c68 >> 0x20);
        uStack_1770._0_4_ = (float)uStack_1c60;
        uStack_1770._4_4_ = (float)(uStack_1c60 >> 0x20);
        local_1778._0_4_ = ((float)local_468 - 1.0) + (float)local_1778;
        local_1778._4_4_ = (local_468._4_4_ - 1.0) + local_1778._4_4_;
        uStack_1770._0_4_ = ((float)uStack_460 - 1.0) + (float)uStack_1770;
        uStack_1770._4_4_ = (uStack_460._4_4_ - 1.0) + uStack_1770._4_4_;
        local_1c08 = CONCAT44(local_1778._4_4_,(float)local_1778);
        uStack_1c00._0_4_ = (float)uStack_1770;
        uStack_1c00._4_4_ = uStack_1770._4_4_;
        local_1b98 = local_1c08;
        uStack_1b90 = uStack_1c00;
        local_1ba8 = local_1c08;
        uStack_1ba0 = uStack_1c00;
        local_1c78 = (float)local_1778 * (float)local_1778;
        fStack_1c74 = local_1778._4_4_ * local_1778._4_4_;
        fStack_1c70 = (float)uStack_1770 * (float)uStack_1770;
        fStack_1c6c = uStack_1770._4_4_ * uStack_1770._4_4_;
        local_1b40 = &local_1c88;
        local_1b80 = &local_1c08;
        local_1940 = ::_ps_cephes_log_p1;
        local_1918 = 0x3d9021bb3d9021bb;
        uStack_1910 = 0x3d9021bb3d9021bb;
        local_1928 = local_1c08;
        uStack_1920 = uStack_1c00;
        local_18c8 = (float)local_1778 * 0.070376836;
        fStack_18c4 = local_1778._4_4_ * 0.070376836;
        fStack_18c0 = (float)uStack_1770 * 0.070376836;
        fStack_18bc = uStack_1770._4_4_ * 0.070376836;
        local_18d8[0] = -0.1151461;
        local_18d8[1] = -0.1151461;
        afStack_18d0[0] = -0.1151461;
        afStack_18d0[1] = -0.1151461;
        local_1c88 = CONCAT44(fStack_18c4 + -0.1151461,local_18c8 + -0.1151461);
        uStack_1c80 = CONCAT44(fStack_18bc + -0.1151461,fStack_18c0 + -0.1151461);
        local_1980 = ::_ps_cephes_log_p2;
        local_1958 = local_1c88;
        uStack_1950 = uStack_1c80;
        local_1968 = local_1c08;
        uStack_1960 = uStack_1c00;
        local_18a8 = (local_18c8 + -0.1151461) * (float)local_1778;
        fStack_18a4 = (fStack_18c4 + -0.1151461) * local_1778._4_4_;
        fStack_18a0 = (fStack_18c0 + -0.1151461) * (float)uStack_1770;
        fStack_189c = (fStack_18bc + -0.1151461) * uStack_1770._4_4_;
        local_18b8[0] = 0.116769984;
        local_18b8[1] = 0.116769984;
        afStack_18b0[0] = 0.116769984;
        afStack_18b0[1] = 0.116769984;
        local_1c88 = CONCAT44(fStack_18a4 + 0.116769984,local_18a8 + 0.116769984);
        uStack_1c80 = CONCAT44(fStack_189c + 0.116769984,fStack_18a0 + 0.116769984);
        local_19c0 = ::_ps_cephes_log_p3;
        local_1998 = local_1c88;
        uStack_1990 = uStack_1c80;
        local_19a8 = local_1c08;
        uStack_19a0 = uStack_1c00;
        local_1888 = (local_18a8 + 0.116769984) * (float)local_1778;
        fStack_1884 = (fStack_18a4 + 0.116769984) * local_1778._4_4_;
        fStack_1880 = (fStack_18a0 + 0.116769984) * (float)uStack_1770;
        fStack_187c = (fStack_189c + 0.116769984) * uStack_1770._4_4_;
        local_1898[0] = -0.12420141;
        local_1898[1] = -0.12420141;
        afStack_1890[0] = -0.12420141;
        afStack_1890[1] = -0.12420141;
        local_1c88 = CONCAT44(fStack_1884 + -0.12420141,local_1888 + -0.12420141);
        uStack_1c80 = CONCAT44(fStack_187c + -0.12420141,fStack_1880 + -0.12420141);
        local_1a00 = ::_ps_cephes_log_p4;
        local_19d8 = local_1c88;
        uStack_19d0 = uStack_1c80;
        local_19e8 = local_1c08;
        uStack_19e0 = uStack_1c00;
        local_1868 = (local_1888 + -0.12420141) * (float)local_1778;
        fStack_1864 = (fStack_1884 + -0.12420141) * local_1778._4_4_;
        fStack_1860 = (fStack_1880 + -0.12420141) * (float)uStack_1770;
        fStack_185c = (fStack_187c + -0.12420141) * uStack_1770._4_4_;
        local_1878[0] = 0.14249323;
        local_1878[1] = 0.14249323;
        afStack_1870[0] = 0.14249323;
        afStack_1870[1] = 0.14249323;
        local_1c88 = CONCAT44(fStack_1864 + 0.14249323,local_1868 + 0.14249323);
        uStack_1c80 = CONCAT44(fStack_185c + 0.14249323,fStack_1860 + 0.14249323);
        local_1a40 = ::_ps_cephes_log_p5;
        local_1a18 = local_1c88;
        uStack_1a10 = uStack_1c80;
        local_1a28 = local_1c08;
        uStack_1a20 = uStack_1c00;
        local_1848 = (local_1868 + 0.14249323) * (float)local_1778;
        fStack_1844 = (fStack_1864 + 0.14249323) * local_1778._4_4_;
        fStack_1840 = (fStack_1860 + 0.14249323) * (float)uStack_1770;
        fStack_183c = (fStack_185c + 0.14249323) * uStack_1770._4_4_;
        local_1858[0] = -0.16668057;
        local_1858[1] = -0.16668057;
        afStack_1850[0] = -0.16668057;
        afStack_1850[1] = -0.16668057;
        local_1c88 = CONCAT44(fStack_1844 + -0.16668057,local_1848 + -0.16668057);
        uStack_1c80 = CONCAT44(fStack_183c + -0.16668057,fStack_1840 + -0.16668057);
        local_1a80 = ::_ps_cephes_log_p6;
        local_1a58 = local_1c88;
        uStack_1a50 = uStack_1c80;
        local_1a68 = local_1c08;
        uStack_1a60 = uStack_1c00;
        local_1828 = (local_1848 + -0.16668057) * (float)local_1778;
        fStack_1824 = (fStack_1844 + -0.16668057) * local_1778._4_4_;
        fStack_1820 = (fStack_1840 + -0.16668057) * (float)uStack_1770;
        fStack_181c = (fStack_183c + -0.16668057) * uStack_1770._4_4_;
        local_1838[0] = 0.20000714;
        local_1838[1] = 0.20000714;
        afStack_1830[0] = 0.20000714;
        afStack_1830[1] = 0.20000714;
        local_1c88 = CONCAT44(fStack_1824 + 0.20000714,local_1828 + 0.20000714);
        uStack_1c80 = CONCAT44(fStack_181c + 0.20000714,fStack_1820 + 0.20000714);
        local_1ac0 = ::_ps_cephes_log_p7;
        local_1a98 = local_1c88;
        uStack_1a90 = uStack_1c80;
        local_1aa8 = local_1c08;
        uStack_1aa0 = uStack_1c00;
        local_1808 = (local_1828 + 0.20000714) * (float)local_1778;
        fStack_1804 = (fStack_1824 + 0.20000714) * local_1778._4_4_;
        fStack_1800 = (fStack_1820 + 0.20000714) * (float)uStack_1770;
        fStack_17fc = (fStack_181c + 0.20000714) * uStack_1770._4_4_;
        local_1818[0] = -0.24999994;
        local_1818[1] = -0.24999994;
        afStack_1810[0] = -0.24999994;
        afStack_1810[1] = -0.24999994;
        local_1c88 = CONCAT44(fStack_1804 + -0.24999994,local_1808 + -0.24999994);
        uStack_1c80 = CONCAT44(fStack_17fc + -0.24999994,fStack_1800 + -0.24999994);
        local_1b00 = ::_ps_cephes_log_p8;
        local_1ad8 = local_1c88;
        uStack_1ad0 = uStack_1c80;
        local_1ae8 = local_1c08;
        uStack_1ae0 = uStack_1c00;
        local_17e8 = (local_1808 + -0.24999994) * (float)local_1778;
        fStack_17e4 = (fStack_1804 + -0.24999994) * local_1778._4_4_;
        fStack_17e0 = (fStack_1800 + -0.24999994) * (float)uStack_1770;
        fStack_17dc = (fStack_17fc + -0.24999994) * uStack_1770._4_4_;
        local_17f8[0] = 0.3333333;
        local_17f8[1] = 0.3333333;
        afStack_17f0[0] = 0.3333333;
        afStack_17f0[1] = 0.3333333;
        local_1c88 = CONCAT44(fStack_17e4 + 0.3333333,local_17e8 + 0.3333333);
        uStack_1c80 = CONCAT44(fStack_17dc + 0.3333333,fStack_17e0 + 0.3333333);
        local_1bb8 = local_1c88;
        uStack_1bb0 = uStack_1c80;
        local_1bc8 = local_1c08;
        uStack_1bc0 = uStack_1c00;
        fVar174 = (local_17e8 + 0.3333333) * (float)local_1778;
        fVar184 = (fStack_17e4 + 0.3333333) * local_1778._4_4_;
        fVar192 = (fStack_17e0 + 0.3333333) * (float)uStack_1770;
        fVar200 = (fStack_17dc + 0.3333333) * uStack_1770._4_4_;
        local_1c88 = CONCAT44(fVar184,fVar174);
        uStack_1c80 = CONCAT44(fVar200,fVar192);
        local_1be8 = CONCAT44(fStack_1c74,local_1c78);
        uStack_1be0 = CONCAT44(fStack_1c6c,fStack_1c70);
        local_1bd8 = local_1c88;
        uStack_1bd0 = uStack_1c80;
        fVar174 = fVar174 * local_1c78;
        fVar184 = fVar184 * fStack_1c74;
        fVar192 = fVar192 * fStack_1c70;
        fVar200 = fVar200 * fStack_1c6c;
        local_1c88 = CONCAT44(fVar184,fVar174);
        uStack_1c80 = CONCAT44(fVar200,fVar192);
        local_1b70 = &local_1c48;
        local_1b38 = ::_ps_cephes_log_q1;
        local_1b18 = CONCAT44(fStack_1c44,local_1c48);
        uStack_1b10 = CONCAT44(fStack_1c3c,fStack_1c40);
        local_1b28[0] = -0.00021219444;
        local_1b28[1] = -0.00021219444;
        afStack_1b20[0] = -0.00021219444;
        afStack_1b20[1] = -0.00021219444;
        local_17c8 = local_1c48 * -0.00021219444;
        fStack_17c4 = fStack_1c44 * -0.00021219444;
        fStack_17c0 = fStack_1c40 * -0.00021219444;
        fStack_17bc = fStack_1c3c * -0.00021219444;
        local_17d8 = local_1c88;
        uStack_17d0 = uStack_1c80;
        fVar174 = local_17c8 + fVar174;
        fVar184 = fStack_17c4 + fVar184;
        fVar192 = fStack_17c0 + fVar192;
        fVar200 = fStack_17bc + fVar200;
        local_1c88 = CONCAT44(fVar184,fVar174);
        uStack_1c80 = CONCAT44(fVar200,fVar192);
        local_1680 = &local_1c78;
        local_1688 = ::_ps_0p5;
        local_1648 = local_1c88;
        uStack_1640 = uStack_1c80;
        local_1668 = CONCAT44(fStack_1c74,local_1c78);
        uStack_1660 = CONCAT44(fStack_1c6c,fStack_1c70);
        local_1678[0] = 0.5;
        local_1678[1] = 0.5;
        afStack_1670[0] = 0.5;
        afStack_1670[1] = 0.5;
        local_1658 = local_1c78 * 0.5;
        fStack_1654 = fStack_1c74 * 0.5;
        fStack_1650 = fStack_1c70 * 0.5;
        fStack_164c = fStack_1c6c * 0.5;
        fVar174 = fVar174 - local_1658;
        fVar184 = fVar184 - fStack_1654;
        fVar192 = fVar192 - fStack_1650;
        fVar200 = fVar200 - fStack_164c;
        local_1c88 = CONCAT44(fVar184,fVar174);
        uStack_1c80 = CONCAT44(fVar200,fVar192);
        local_1788 = local_1c08;
        uStack_1780 = uStack_1c00;
        local_1798 = local_1c88;
        uStack_1790 = uStack_1c80;
        local_1778._0_4_ = (float)local_1778 + fVar174;
        local_1778._4_4_ = local_1778._4_4_ + fVar184;
        uStack_1770._0_4_ = (float)uStack_1770 + fVar192;
        uStack_1770._4_4_ = uStack_1770._4_4_ + fVar200;
        local_1c08 = CONCAT44(local_1778._4_4_,(float)local_1778);
        uStack_1c00._0_4_ = (float)uStack_1770;
        uStack_1c00._4_4_ = uStack_1770._4_4_;
        local_1b78 = ::_ps_cephes_log_q2;
        local_1b58 = CONCAT44(fStack_1c44,local_1c48);
        uStack_1b50 = CONCAT44(fStack_1c3c,fStack_1c40);
        local_1b68[0] = 0.6933594;
        local_1b68[1] = 0.6933594;
        afStack_1b60[0] = 0.6933594;
        afStack_1b60[1] = 0.6933594;
        local_17a8 = local_1c48 * 0.6933594;
        fStack_17a4 = fStack_1c44 * 0.6933594;
        fStack_17a0 = fStack_1c40 * 0.6933594;
        fStack_179c = fStack_1c3c * 0.6933594;
        local_17b8 = local_1c08;
        uStack_17b0 = uStack_1c00;
        local_1c08 = CONCAT44(fStack_17a4 + local_1778._4_4_,local_17a8 + (float)local_1778);
        uStack_1c00._0_4_ = fStack_17a0 + (float)uStack_1770;
        uStack_1c00._4_4_ = fStack_179c + uStack_1770._4_4_;
        local_738 = CONCAT44(iStack_1c34,local_1c38);
        uStack_730 = CONCAT44(iStack_1c2c,iStack_1c30);
        local_728 = local_1c08;
        uStack_720 = uStack_1c00;
        local_43c8 = local_1c08 | local_738;
        uStack_43c0 = uStack_1c00 | uStack_730;
        uStack_1c00 = uStack_43c0;
        local_1c08 = local_43c8;
        local_437c = 0x3f800000;
        local_4398 = 0x3f800000;
        uStack_4394 = 0x3f800000;
        uStack_4390 = 0x3f800000;
        uStack_438c = 0x3f800000;
        local_43d8 = 0x3f8000003f800000;
        uStack_43d0 = 0x3f8000003f800000;
        local_439c = 0x40000000;
        local_43b8 = 0x40000000;
        uStack_43b4 = 0x40000000;
        uStack_43b0 = 0x40000000;
        uStack_43ac = 0x40000000;
        local_43e8 = 0x4000000040000000;
        uStack_43e0 = 0x4000000040000000;
        local_4348._0_4_ = (float)local_43c8;
        local_4348._4_4_ = (float)(local_43c8 >> 0x20);
        uStack_4340._0_4_ = (float)uStack_43c0;
        uStack_4340._4_4_ = (float)(uStack_43c0 >> 0x20);
        local_4328 = (float)local_4348 * 2.0;
        fStack_4324 = local_4348._4_4_ * 2.0;
        fStack_4320 = (float)uStack_4340 * 2.0;
        fStack_431c = uStack_4340._4_4_ * 2.0;
        local_42fc = 0x3f800000;
        local_4318 = 0x3f800000;
        uStack_4314 = 0x3f800000;
        uStack_4310 = 0x3f800000;
        uStack_430c = 0x3f800000;
        local_4338 = 0x3f8000003f800000;
        uStack_4330 = 0x3f8000003f800000;
        local_42f8 = 0;
        uStack_42f0 = 0;
        local_3ec8 = CONCAT44(fStack_4324,local_4328);
        uStack_3ec0 = CONCAT44(fStack_431c,fStack_4320);
        local_3eb8 = 0;
        uStack_3eb0 = 0;
        local_4238 = CONCAT44(0.0 - fStack_4324,0.0 - local_4328);
        uStack_4230._0_4_ = 0.0 - fStack_4320;
        uStack_4230._4_4_ = 0.0 - fStack_431c;
        local_4018 = 0;
        uStack_4010 = 0;
        local_4278 = 0x3f8000003f800000;
        uStack_4270 = 0x3f8000003f800000;
        local_3ff8 = local_4238;
        uStack_3ff0 = uStack_4230;
        local_4008 = 0x42b0c0a542b0c0a5;
        uStack_4000 = 0x42b0c0a542b0c0a5;
        auVar121._8_8_ = uStack_4230;
        auVar121._0_8_ = local_4238;
        auVar120._8_8_ = 0x42b0c0a542b0c0a5;
        auVar120._0_8_ = 0x42b0c0a542b0c0a5;
        auVar177 = minps(auVar121,auVar120);
        local_4238 = auVar177._0_8_;
        uStack_4230 = auVar177._8_8_;
        local_4028 = local_4238;
        uStack_4020 = uStack_4230;
        local_4038 = 0xc2b0c0a5c2b0c0a5;
        uStack_4030 = 0xc2b0c0a5c2b0c0a5;
        auVar119._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar119._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar177 = maxps(auVar177,auVar119);
        local_4238 = auVar177._0_8_;
        uStack_4230 = auVar177._8_8_;
        local_41c8 = local_4238;
        uVar5 = local_41c8;
        uStack_41c0 = uStack_4230;
        uVar6 = uStack_41c0;
        local_41d8 = 0x3fb8aa3b3fb8aa3b;
        uStack_41d0 = 0x3fb8aa3b3fb8aa3b;
        local_41c8._0_4_ = auVar177._0_4_;
        local_41c8._4_4_ = auVar177._4_4_;
        uStack_41c0._0_4_ = auVar177._8_4_;
        uStack_41c0._4_4_ = auVar177._12_4_;
        local_3ef8 = CONCAT44(local_41c8._4_4_ * 1.442695,(float)local_41c8 * 1.442695);
        uStack_3ef0 = CONCAT44(uStack_41c0._4_4_ * 1.442695,(float)uStack_41c0 * 1.442695);
        local_3f08 = 0x3f0000003f000000;
        uStack_3f00 = 0x3f0000003f000000;
        fVar174 = (float)local_41c8 * 1.442695 + 0.5;
        fVar184 = local_41c8._4_4_ * 1.442695 + 0.5;
        fVar192 = (float)uStack_41c0 * 1.442695 + 0.5;
        fVar200 = uStack_41c0._4_4_ * 1.442695 + 0.5;
        local_3e78 = CONCAT44(fVar184,fVar174);
        uStack_3e70 = CONCAT44(fVar200,fVar192);
        local_4228 = CONCAT44((int)fVar184,(int)fVar174);
        uStack_4220 = CONCAT44((int)fVar200,(int)fVar192);
        local_4258 = (float)(int)fVar174;
        fStack_4254 = (float)(int)fVar184;
        fStack_4250 = (float)(int)fVar192;
        fStack_424c = (float)(int)fVar200;
        local_3e58 = CONCAT44(fStack_4254,local_4258);
        uStack_3e50 = CONCAT44(fStack_424c,fStack_4250);
        local_3e68 = CONCAT44(fVar184,fVar174);
        uStack_3e60 = CONCAT44(fVar200,fVar192);
        local_4288 = CONCAT44(-(uint)(fVar184 < fStack_4254),-(uint)(fVar174 < local_4258));
        uStack_4280 = CONCAT44(-(uint)(fVar200 < fStack_424c),-(uint)(fVar192 < fStack_4250));
        local_3e38 = local_4288;
        uStack_3e30 = uStack_4280;
        local_3e48 = 0x3f8000003f800000;
        uStack_3e40 = 0x3f8000003f800000;
        local_4288 = local_4288 & 0x3f8000003f800000;
        uStack_4280 = uStack_4280 & 0x3f8000003f800000;
        local_3ed8 = CONCAT44(fStack_4254,local_4258);
        uStack_3ed0 = CONCAT44(fStack_424c,fStack_4250);
        local_3ee8._0_4_ = (float)local_4288;
        local_3ee8._4_4_ = (float)(local_4288 >> 0x20);
        uStack_3ee0._0_4_ = (float)uStack_4280;
        uStack_3ee0._4_4_ = (float)(uStack_4280 >> 0x20);
        local_4258 = local_4258 - (float)local_3ee8;
        fStack_4254 = fStack_4254 - local_3ee8._4_4_;
        fStack_4250 = fStack_4250 - (float)uStack_3ee0;
        fStack_424c = fStack_424c - uStack_3ee0._4_4_;
        local_3e10 = &local_4258;
        local_3db8 = ::_ps_cephes_exp_C1;
        local_41b0 = &local_4238;
        local_3d78 = local_4238;
        uStack_3d70 = uStack_4230;
        local_3d98 = CONCAT44(fStack_4254,local_4258);
        uStack_3d90 = CONCAT44(fStack_424c,fStack_4250);
        local_3da8[0] = 0.6933594;
        local_3da8[1] = 0.6933594;
        afStack_3da0[0] = 0.6933594;
        afStack_3da0[1] = 0.6933594;
        local_3d88 = local_4258 * 0.6933594;
        fStack_3d84 = fStack_4254 * 0.6933594;
        fStack_3d80 = fStack_4250 * 0.6933594;
        fStack_3d7c = fStack_424c * 0.6933594;
        local_4238 = CONCAT44(local_41c8._4_4_ - fStack_3d84,(float)local_41c8 - local_3d88);
        uStack_4230._0_4_ = (float)uStack_41c0 - fStack_3d80;
        uStack_4230._4_4_ = uStack_41c0._4_4_ - fStack_3d7c;
        local_3e18 = ::_ps_cephes_exp_C2;
        local_3dd8 = local_4238;
        uStack_3dd0 = uStack_4230;
        local_3df8 = CONCAT44(fStack_4254,local_4258);
        uStack_3df0 = CONCAT44(fStack_424c,fStack_4250);
        local_3e08[0] = -0.00021219444;
        local_3e08[1] = -0.00021219444;
        afStack_3e00[0] = -0.00021219444;
        afStack_3e00[1] = -0.00021219444;
        local_3de8 = local_4258 * -0.00021219444;
        fStack_3de4 = fStack_4254 * -0.00021219444;
        fStack_3de0 = fStack_4250 * -0.00021219444;
        fStack_3ddc = fStack_424c * -0.00021219444;
        fVar174 = ((float)local_41c8 - local_3d88) - local_3de8;
        fVar184 = (local_41c8._4_4_ - fStack_3d84) - fStack_3de4;
        fVar192 = ((float)uStack_41c0 - fStack_3d80) - fStack_3de0;
        fVar200 = (uStack_41c0._4_4_ - fStack_3d7c) - fStack_3ddc;
        local_4238 = CONCAT44(fVar184,fVar174);
        uStack_4230._0_4_ = fVar192;
        uStack_4230._4_4_ = fVar200;
        local_41e8 = local_4238;
        uStack_41e0 = uStack_4230;
        local_41f8 = local_4238;
        uStack_41f0 = uStack_4230;
        local_4248 = fVar174 * fVar174;
        fStack_4244 = fVar184 * fVar184;
        fStack_4240 = fVar192 * fVar192;
        fStack_423c = fVar200 * fVar200;
        local_41a0 = &local_4298;
        local_4070 = ::_ps_cephes_exp_p1;
        local_4048 = 0x3950696739506967;
        uStack_4040 = 0x3950696739506967;
        local_4058 = local_4238;
        uStack_4050 = uStack_4230;
        local_3fd8 = fVar174 * 0.00019875691;
        fStack_3fd4 = fVar184 * 0.00019875691;
        fStack_3fd0 = fVar192 * 0.00019875691;
        fStack_3fcc = fVar200 * 0.00019875691;
        local_3fe8[0] = 0.0013981999;
        local_3fe8[1] = 0.0013981999;
        afStack_3fe0[0] = 0.0013981999;
        afStack_3fe0[1] = 0.0013981999;
        local_4298 = CONCAT44(fStack_3fd4 + 0.0013981999,local_3fd8 + 0.0013981999);
        uStack_4290 = CONCAT44(fStack_3fcc + 0.0013981999,fStack_3fd0 + 0.0013981999);
        local_40b0 = ::_ps_cephes_exp_p2;
        local_4088 = local_4298;
        uStack_4080 = uStack_4290;
        local_4098 = local_4238;
        uStack_4090 = uStack_4230;
        local_3fb8 = (local_3fd8 + 0.0013981999) * fVar174;
        fStack_3fb4 = (fStack_3fd4 + 0.0013981999) * fVar184;
        fStack_3fb0 = (fStack_3fd0 + 0.0013981999) * fVar192;
        fStack_3fac = (fStack_3fcc + 0.0013981999) * fVar200;
        local_3fc8[0] = 0.008333452;
        local_3fc8[1] = 0.008333452;
        afStack_3fc0[0] = 0.008333452;
        afStack_3fc0[1] = 0.008333452;
        local_4298 = CONCAT44(fStack_3fb4 + 0.008333452,local_3fb8 + 0.008333452);
        uStack_4290 = CONCAT44(fStack_3fac + 0.008333452,fStack_3fb0 + 0.008333452);
        local_40f0 = ::_ps_cephes_exp_p3;
        local_40c8 = local_4298;
        uStack_40c0 = uStack_4290;
        local_40d8 = local_4238;
        uStack_40d0 = uStack_4230;
        local_3f98 = (local_3fb8 + 0.008333452) * fVar174;
        fStack_3f94 = (fStack_3fb4 + 0.008333452) * fVar184;
        fStack_3f90 = (fStack_3fb0 + 0.008333452) * fVar192;
        fStack_3f8c = (fStack_3fac + 0.008333452) * fVar200;
        local_3fa8[0] = 0.041665796;
        local_3fa8[1] = 0.041665796;
        afStack_3fa0[0] = 0.041665796;
        afStack_3fa0[1] = 0.041665796;
        local_4298 = CONCAT44(fStack_3f94 + 0.041665796,local_3f98 + 0.041665796);
        uStack_4290 = CONCAT44(fStack_3f8c + 0.041665796,fStack_3f90 + 0.041665796);
        local_4130 = ::_ps_cephes_exp_p4;
        local_4108 = local_4298;
        uStack_4100 = uStack_4290;
        local_4118 = local_4238;
        uStack_4110 = uStack_4230;
        local_3f78 = (local_3f98 + 0.041665796) * fVar174;
        fStack_3f74 = (fStack_3f94 + 0.041665796) * fVar184;
        fStack_3f70 = (fStack_3f90 + 0.041665796) * fVar192;
        fStack_3f6c = (fStack_3f8c + 0.041665796) * fVar200;
        local_3f88[0] = 0.16666666;
        local_3f88[1] = 0.16666666;
        afStack_3f80[0] = 0.16666666;
        afStack_3f80[1] = 0.16666666;
        local_4298 = CONCAT44(fStack_3f74 + 0.16666666,local_3f78 + 0.16666666);
        uStack_4290 = CONCAT44(fStack_3f6c + 0.16666666,fStack_3f70 + 0.16666666);
        local_4170 = ::_ps_cephes_exp_p5;
        local_4148 = local_4298;
        uStack_4140 = uStack_4290;
        local_4158 = local_4238;
        uStack_4150 = uStack_4230;
        local_3f58 = (local_3f78 + 0.16666666) * fVar174;
        fStack_3f54 = (fStack_3f74 + 0.16666666) * fVar184;
        fStack_3f50 = (fStack_3f70 + 0.16666666) * fVar192;
        fStack_3f4c = (fStack_3f6c + 0.16666666) * fVar200;
        local_3f68[0] = 0.5;
        local_3f68[1] = 0.5;
        afStack_3f60[0] = 0.5;
        afStack_3f60[1] = 0.5;
        local_4298 = CONCAT44(fStack_3f54 + 0.5,local_3f58 + 0.5);
        uStack_4290 = CONCAT44(fStack_3f4c + 0.5,fStack_3f50 + 0.5);
        local_41a8 = &local_4248;
        local_4188 = local_4298;
        uStack_4180 = uStack_4290;
        local_4198 = CONCAT44(fStack_4244,local_4248);
        uStack_4190 = CONCAT44(fStack_423c,fStack_4240);
        local_3f38 = (local_3f58 + 0.5) * local_4248;
        fStack_3f34 = (fStack_3f54 + 0.5) * fStack_4244;
        fStack_3f30 = (fStack_3f50 + 0.5) * fStack_4240;
        fStack_3f2c = (fStack_3f4c + 0.5) * fStack_423c;
        local_3f48 = local_4238;
        uStack_3f40 = uStack_4230;
        local_4298 = CONCAT44(fStack_3f34 + fVar184,local_3f38 + fVar174);
        uStack_4290 = CONCAT44(fStack_3f2c + fVar200,fStack_3f30 + fVar192);
        local_3f18 = local_4298;
        uStack_3f10 = uStack_4290;
        local_3f28 = 0x3f8000003f800000;
        uStack_3f20 = 0x3f8000003f800000;
        local_42c8 = local_3f38 + fVar174 + 1.0;
        fStack_42c4 = fStack_3f34 + fVar184 + 1.0;
        fStack_42c0 = fStack_3f30 + fVar192 + 1.0;
        fStack_42bc = fStack_3f2c + fVar200 + 1.0;
        local_4298 = CONCAT44(fStack_42c4,local_42c8);
        uStack_4290 = CONCAT44(fStack_42bc,fStack_42c0);
        local_3e88 = CONCAT44(fStack_4254,local_4258);
        uStack_3e80 = CONCAT44(fStack_424c,fStack_4250);
        local_3d58 = CONCAT44((int)fStack_4254,(int)local_4258);
        uStack_3d50 = CONCAT44((int)fStack_424c,(int)fStack_4250);
        local_3d68 = 0x7f0000007f;
        uStack_3d60 = 0x7f0000007f;
        iVar203 = (int)local_4258 + 0x7f;
        fStack_4264 = (float)((int)fStack_4254 + 0x7f);
        fStack_4260 = (float)((int)fStack_4250 + 0x7f);
        fStack_425c = (float)((int)fStack_424c + 0x7f);
        local_3d38 = CONCAT44(fStack_4264,iVar203);
        uStack_3d30 = CONCAT44(fStack_425c,fStack_4260);
        local_3d3c = 0x17;
        local_4268 = (float)(iVar203 * 0x800000);
        local_42a8 = CONCAT44(fStack_4264,local_4268);
        uStack_42a0 = CONCAT44(fStack_425c,fStack_4260);
        local_4208 = local_4298;
        uStack_4200 = uStack_4290;
        local_42c8 = local_42c8 * local_4268;
        fStack_42c4 = fStack_42c4 * fStack_4264;
        fStack_42c0 = fStack_42c0 * fStack_4260;
        fStack_42bc = fStack_42bc * fStack_425c;
        local_4298 = CONCAT44(fStack_42c4,local_42c8);
        uStack_4290 = CONCAT44(fStack_42bc,fStack_42c0);
        local_42e8 = local_4298;
        uStack_42e0 = uStack_4290;
        local_42c8 = local_42c8 + 1.0;
        fStack_42c4 = fStack_42c4 + 1.0;
        fStack_42c0 = fStack_42c0 + 1.0;
        fStack_42bc = fStack_42bc + 1.0;
        auVar118._8_8_ = 0x3f8000003f800000;
        auVar118._0_8_ = 0x3f8000003f800000;
        auVar117._4_4_ = fStack_42c4;
        auVar117._0_4_ = local_42c8;
        auVar117._8_4_ = fStack_42c0;
        auVar117._12_4_ = fStack_42bc;
        _local_4368 = divps(auVar118,auVar117);
        local_3e98 = (float)local_4368._0_4_ * 2.0;
        fStack_3e94 = (float)local_4368._4_4_ * 2.0;
        fStack_3e90 = fStack_4360 * 2.0;
        fStack_3e8c = fStack_435c * 2.0;
        local_a5c8 = local_3e98 - 1.0;
        fStack_a5c4 = fStack_3e94 - 1.0;
        fStack_a5c0 = fStack_3e90 - 1.0;
        fStack_a5bc = fStack_3e8c - 1.0;
        local_a5b8 = local_c058;
        uStack_a5b0 = uStack_c050;
        local_b8c8._4_4_ = fVar183 * fStack_a5c4;
        local_b8c8._0_4_ = fVar173 * local_a5c8;
        uStack_b8c0._0_4_ = fVar191 * fStack_a5c0;
        uStack_b8c0._4_4_ = fVar199 * fStack_a5bc;
        local_8e68 = local_8ef8;
        uStack_8e60 = uStack_8ef0;
        local_8e18 = uVar3;
        uStack_8e10 = uVar4;
        local_8db8 = local_8e00;
        local_8db0 = local_8df0;
        local_8d78 = local_8e00;
        local_8d70 = local_8df0;
        local_8d38 = local_8e00;
        local_8d30 = local_8df0;
        local_8cf8 = local_8e00;
        local_8cf0 = local_8df0;
        local_8cb8 = local_8e00;
        local_8cb0 = local_8df0;
        local_6c38 = local_8ed8;
        uStack_6c30 = uStack_8ed0;
        local_5f50 = local_8e00;
        local_5ef0 = local_8e00;
        local_5ee0 = local_5f40;
        local_58d8 = local_8ef8;
        uStack_58d0 = uStack_8ef0;
        local_4378 = local_43e8;
        uStack_4370 = uStack_43e0;
        local_4358 = local_43e8;
        uStack_4350 = uStack_43e0;
        local_4348 = local_43c8;
        uStack_4340 = uStack_43c0;
        local_42d8 = local_4338;
        uStack_42d0 = uStack_4330;
        local_42b8 = local_4338;
        uStack_42b0 = uStack_4330;
        local_4218 = local_42a8;
        uStack_4210 = uStack_42a0;
        local_41c8 = uVar5;
        uStack_41c0 = uVar6;
        local_4168 = local_41b0;
        local_4160 = local_41a0;
        local_4128 = local_41b0;
        local_4120 = local_41a0;
        local_40e8 = local_41b0;
        local_40e0 = local_41a0;
        local_40a8 = local_41b0;
        local_40a0 = local_41a0;
        local_4068 = local_41b0;
        local_4060 = local_41a0;
        local_3ee8 = local_4288;
        uStack_3ee0 = uStack_4280;
        local_3ea8 = local_43d8;
        uStack_3ea0 = uStack_43d0;
        local_3e20 = local_41b0;
        local_3dc0 = local_41b0;
        local_3db0 = local_3e10;
        local_3d28 = local_42a8;
        uStack_3d20 = uStack_42a0;
        local_1b30 = local_1b70;
        local_1af8 = local_1b80;
        local_1af0 = local_1b40;
        local_1ab8 = local_1b80;
        local_1ab0 = local_1b40;
        local_1a78 = local_1b80;
        local_1a70 = local_1b40;
        local_1a38 = local_1b80;
        local_1a30 = local_1b40;
        local_19f8 = local_1b80;
        local_19f0 = local_1b40;
        local_19b8 = local_1b80;
        local_19b0 = local_1b40;
        local_1978 = local_1b80;
        local_1970 = local_1b40;
        local_1938 = local_1b80;
        local_1930 = local_1b40;
        local_1778 = local_1c68;
        uStack_1770 = uStack_1c60;
        local_1738 = uVar204;
        uStack_1730 = uVar205;
        local_16c8 = local_1708;
        uStack_16c0 = uStack_1700;
        local_1690 = local_1b40;
        local_888 = uVar166;
        uStack_880 = uVar167;
        local_468 = local_1708;
        uStack_460 = uStack_1700;
        break;
      case 6:
        local_b8a8 = 0;
        local_b848 = *(float *)*in_stack_00000008;
        local_b918 = CONCAT44(local_b848,local_b848);
        uStack_b910 = CONCAT44(local_b848,local_b848);
        local_b8b8 = 1;
        local_b868 = *(float *)(*in_stack_00000008 + 4);
        local_b928 = CONCAT44(local_b868,local_b868);
        uStack_b920 = CONCAT44(local_b868,local_b868);
        local_a2a8 = local_c058;
        uStack_a2a0 = uStack_c050;
        local_a27c = 0x3f800000;
        local_a298 = 0x3f800000;
        uStack_a294 = 0x3f800000;
        uStack_a290 = 0x3f800000;
        uStack_a28c = 0x3f800000;
        local_a2d8 = 0x3f8000003f800000;
        uStack_a2d0 = 0x3f8000003f800000;
        local_a248 = local_c058;
        uStack_a240 = uStack_c050;
        local_9ea8 = fVar173 * local_b848;
        fStack_9ea4 = fVar183 * local_b848;
        fStack_9ea0 = fVar191 * local_b848;
        fStack_9e9c = fVar199 * local_b848;
        local_a2c8._4_4_ = fStack_9ea4 + local_b868;
        local_a2c8._0_4_ = local_9ea8 + local_b868;
        uStack_a2c0._0_4_ = fStack_9ea0 + local_b868;
        uStack_a2c0._4_4_ = fStack_9e9c + local_b868;
        local_a218 = 0;
        uStack_a210 = 0;
        local_a228 = local_a2c8;
        uStack_a220 = uStack_a2c0;
        local_a238 = 0;
        uStack_a230 = 0;
        auVar47._8_8_ = uStack_a2c0;
        auVar47._0_8_ = local_a2c8;
        auVar177 = maxps(auVar47,ZEXT816(0));
        local_a2c8 = auVar177._0_8_;
        uStack_a2c0 = auVar177._8_8_;
        local_a1f8 = local_a2c8;
        uStack_a1f0 = uStack_a2c0;
        auVar48._8_8_ = 0x3f8000003f800000;
        auVar48._0_8_ = 0x3f8000003f800000;
        _local_a2c8 = minps(auVar177,auVar48);
        local_a268 = local_a2c8;
        uVar3 = local_a268;
        uStack_a260 = uStack_a2c0;
        uVar4 = uStack_a260;
        local_a278 = local_c058;
        uStack_a270 = uStack_c050;
        local_a268._0_4_ = local_a2c8._0_4_;
        local_a268._4_4_ = local_a2c8._4_4_;
        uStack_a260._0_4_ = local_a2c8._8_4_;
        uStack_a260._4_4_ = local_a2c8._12_4_;
        local_b8c8._4_4_ = local_a268._4_4_ * fVar183;
        local_b8c8._0_4_ = (float)local_a268 * fVar173;
        uStack_b8c0._0_4_ = (float)uStack_a260 * fVar191;
        uStack_b8c0._4_4_ = uStack_a260._4_4_ * fVar199;
        fStack_b864 = local_b868;
        fStack_b860 = local_b868;
        fStack_b85c = local_b868;
        local_b84c = local_b868;
        fStack_b844 = local_b848;
        fStack_b840 = local_b848;
        fStack_b83c = local_b848;
        local_b82c = local_b848;
        local_a2b8 = local_b918;
        uStack_a2b0 = uStack_b910;
        local_a268 = uVar3;
        uStack_a260 = uVar4;
        local_a258 = local_b918;
        uStack_a250 = uStack_b910;
        local_a208 = local_a2d8;
        uStack_a200 = uStack_a2d0;
        local_9eb8 = local_b928;
        uStack_9eb0 = uStack_b920;
        break;
      default:
        uStack_b8c0 = uStack_c050;
        local_b8c8 = (undefined1  [8])local_c058;
      }
      local_bda8 = local_c008;
      uStack_bda0 = uStack_c000;
      local_bd98._0_4_ = local_b8c8._0_4_;
      local_bd98._4_4_ = local_b8c8._4_4_;
      uStack_bd90._0_4_ = local_b8c8._8_4_;
      uStack_bd90._4_4_ = local_b8c8._12_4_;
      local_bd98._0_4_ = (float)local_bd98 * fVar175;
      local_bd98._4_4_ = local_bd98._4_4_ * fVar185;
      uStack_bd90._0_4_ = (float)uStack_bd90 * fVar193;
      uStack_bd90._4_4_ = uStack_bd90._4_4_ * fVar201;
      local_c058 = CONCAT44(local_bd98._4_4_,(float)local_bd98);
      uStack_c050 = CONCAT44(uStack_bd90._4_4_,(float)uStack_bd90);
      local_b250 = &local_c058;
      local_b238 = 0x3f000000;
      local_b248 = 0x3f000000;
      local_b268 = 0x3f0000003f000000;
      uStack_b260 = 0x3f0000003f000000;
      local_3f8 = 0x80000000;
      local_128 = 0x80000000;
      local_b278 = 0x8000000080000000;
      uStack_b270 = 0x8000000080000000;
      local_6608 = local_c058;
      uStack_6600 = uStack_c050;
      local_b288 = local_c058 & 0x8000000080000000;
      uStack_b280 = uStack_c050 & 0x8000000080000000;
      local_b298 = local_b288 | 0x3f0000003f000000;
      uStack_b290 = uStack_b280 | 0x3f0000003f000000;
      local_9ba8 = local_c058;
      uStack_9ba0 = uStack_c050;
      local_9bb8._0_4_ = (float)local_b298;
      local_9bb8._4_4_ = (float)(local_b298 >> 0x20);
      uStack_9bb0._0_4_ = (float)uStack_b290;
      uStack_9bb0._4_4_ = (float)(uStack_b290 >> 0x20);
      local_b2a8 = (float)local_bd98 + (float)local_9bb8;
      fStack_b2a4 = local_bd98._4_4_ + local_9bb8._4_4_;
      fStack_b2a0 = (float)uStack_bd90 + (float)uStack_9bb0;
      fStack_b29c = uStack_bd90._4_4_ + uStack_9bb0._4_4_;
      local_6978 = CONCAT44(fStack_b2a4,local_b2a8);
      uStack_6970 = CONCAT44(fStack_b29c,fStack_b2a0);
      local_b2b8 = (int)local_b2a8;
      iStack_b2b4 = (int)fStack_b2a4;
      iStack_b2b0 = (int)fStack_b2a0;
      iStack_b2ac = (int)fStack_b29c;
      local_3e8 = CONCAT44(iStack_b2b4,local_b2b8);
      uStack_3e0 = CONCAT44(iStack_b2ac,iStack_b2b0);
      auVar145._8_8_ = uStack_3e0;
      auVar145._0_8_ = local_3e8;
      auVar144._8_8_ = uStack_3e0;
      auVar144._0_8_ = local_3e8;
      auVar177 = packssdw(auVar145,auVar144);
      local_b2c8 = auVar177._0_8_;
      uVar3 = local_b2c8;
      uStack_b2c0 = auVar177._8_8_;
      uVar4 = uStack_b2c0;
      local_2e6 = 0x7f;
      local_48 = 0x7f;
      local_368 = 0x7f007f007f007f;
      uStack_360 = 0x7f007f007f007f;
      local_358._0_2_ = auVar177._0_2_;
      local_358._2_2_ = auVar177._2_2_;
      local_358._4_2_ = auVar177._4_2_;
      local_358._6_2_ = auVar177._6_2_;
      uStack_350._0_2_ = auVar177._8_2_;
      uStack_350._2_2_ = auVar177._10_2_;
      uStack_350._4_2_ = auVar177._12_2_;
      uStack_350._6_2_ = auVar177._14_2_;
      uVar169 = (ushort)(0x7f < (short)local_358) * 0x7f |
                (ushort)(0x7f >= (short)local_358) * (short)local_358;
      uVar178 = (ushort)(0x7f < local_358._2_2_) * 0x7f |
                (ushort)(0x7f >= local_358._2_2_) * local_358._2_2_;
      uVar179 = (ushort)(0x7f < local_358._4_2_) * 0x7f |
                (ushort)(0x7f >= local_358._4_2_) * local_358._4_2_;
      uVar186 = (ushort)(0x7f < local_358._6_2_) * 0x7f |
                (ushort)(0x7f >= local_358._6_2_) * local_358._6_2_;
      uVar187 = (ushort)(0x7f < (short)uStack_350) * 0x7f |
                (ushort)(0x7f >= (short)uStack_350) * (short)uStack_350;
      uVar194 = (ushort)(0x7f < uStack_350._2_2_) * 0x7f |
                (ushort)(0x7f >= uStack_350._2_2_) * uStack_350._2_2_;
      uVar195 = (ushort)(0x7f < uStack_350._4_2_) * 0x7f |
                (ushort)(0x7f >= uStack_350._4_2_) * uStack_350._4_2_;
      uVar202 = (ushort)(0x7f < uStack_350._6_2_) * 0x7f |
                (ushort)(0x7f >= uStack_350._6_2_) * uStack_350._6_2_;
      local_b2c8._0_4_ = CONCAT22(uVar178,uVar169);
      local_b2c8._0_6_ = CONCAT24(uVar179,(undefined4)local_b2c8);
      local_b2c8 = CONCAT26(uVar186,(undefined6)local_b2c8);
      uStack_b2c0._0_2_ = uVar187;
      uStack_b2c0._2_2_ = uVar194;
      uStack_b2c0._4_2_ = uVar195;
      uStack_b2c0._6_2_ = uVar202;
      local_2c8 = local_b2c8;
      uStack_2c0 = uStack_b2c0;
      local_2e8 = 0xff81;
      local_20 = 0xff81;
      local_2d8 = 0xff81ff81ff81ff81;
      uStack_2d0 = 0xff81ff81ff81ff81;
      local_b2c8._0_4_ =
           CONCAT22((ushort)((short)uVar178 < -0x7f) * -0x7f | ((short)uVar178 >= -0x7f) * uVar178,
                    (ushort)((short)uVar169 < -0x7f) * -0x7f | ((short)uVar169 >= -0x7f) * uVar169);
      local_b2c8._0_6_ =
           CONCAT24((ushort)((short)uVar179 < -0x7f) * -0x7f | ((short)uVar179 >= -0x7f) * uVar179,
                    (undefined4)local_b2c8);
      local_b2c8 = CONCAT26((ushort)((short)uVar186 < -0x7f) * -0x7f |
                            ((short)uVar186 >= -0x7f) * uVar186,(undefined6)local_b2c8);
      uStack_b2c0._0_2_ =
           (ushort)((short)uVar187 < -0x7f) * -0x7f | ((short)uVar187 >= -0x7f) * uVar187;
      uStack_b2c0._2_2_ =
           (ushort)((short)uVar194 < -0x7f) * -0x7f | ((short)uVar194 >= -0x7f) * uVar194;
      uStack_b2c0._4_2_ =
           (ushort)((short)uVar195 < -0x7f) * -0x7f | ((short)uVar195 >= -0x7f) * uVar195;
      uStack_b2c0._6_2_ =
           (ushort)((short)uVar202 < -0x7f) * -0x7f | ((short)uVar202 >= -0x7f) * uVar202;
      local_258 = local_b2c8;
      uStack_250 = uStack_b2c0;
      auVar153._8_8_ = uStack_b2c0;
      auVar153._0_8_ = local_b2c8;
      auVar152._8_8_ = uStack_b2c0;
      auVar152._0_8_ = local_b2c8;
      local_b2d8 = packsswb(auVar153,auVar152);
      local_1d8 = local_b2d8._0_8_;
      uStack_1d0 = local_b2d8._8_8_;
      local_c05c = local_b2d8._0_4_;
      *(char *)local_bf98 = local_b2d8[0];
      *(char *)((long)local_bf98 + 1) = local_b2d8[1];
      *(char *)((long)local_bf98 + 2) = local_b2d8[2];
      *(char *)((long)local_bf98 + 3) = local_b2d8[3];
      local_bf90 = local_bf90 + 4;
      local_bf98 = (undefined8 *)((long)local_bf98 + 4);
      local_be68 = uVar1;
      uStack_be60 = uVar2;
      local_bd98 = local_b8c8;
      uStack_bd90 = uStack_b8c0;
      uStack_b244 = local_b248;
      uStack_b240 = local_b248;
      uStack_b23c = local_b248;
      local_9bb8 = local_b298;
      uStack_9bb0 = uStack_b290;
      local_6618 = local_b278;
      uStack_6610 = uStack_b270;
      local_5898 = local_b278;
      uStack_5890 = uStack_b270;
      local_638 = local_b288;
      uStack_630 = uStack_b280;
      local_628 = local_b268;
      uStack_620 = uStack_b260;
      local_3d8 = local_3e8;
      uStack_3d0 = uStack_3e0;
      local_358 = uVar3;
      uStack_350 = uVar4;
      local_248 = local_258;
      uStack_240 = uStack_250;
      local_138 = local_b278;
      uStack_130 = uStack_b270;
      local_124 = local_128;
      local_120 = local_128;
      local_11c = local_128;
      local_58 = local_368;
      uStack_50 = uStack_360;
      local_46 = local_48;
      local_44 = local_48;
      local_42 = local_48;
      local_40 = local_48;
      local_3e = local_48;
      local_3c = local_48;
      local_3a = local_48;
      local_38 = local_2d8;
      uStack_30 = uStack_2d0;
      local_1e = local_20;
      local_1c = local_20;
      local_1a = local_20;
      local_18 = local_20;
      local_16 = local_20;
      local_14 = local_20;
      local_12 = local_20;
    }
    local_bfbc = 0;
    for (; local_c01c < local_bfc4; local_c01c = local_c01c + 1) {
      local_c17c = (float)*local_bf90 * local_bfc8;
      local_b180 = local_bfb4;
      local_b17c[0] = local_c17c;
      local_c060 = local_c17c;
      switch(local_bfb4) {
      case 1:
        if (local_c17c <= 0.0) {
          local_b17c[0] = 0.0;
        }
        break;
      case 2:
        local_b138 = 0;
        local_b18c = *(float *)*in_stack_00000008;
        if (local_c17c <= 0.0) {
          local_c17c = local_c17c * local_b18c;
        }
        local_b17c[0] = local_c17c;
        break;
      case 3:
        local_b148 = 0;
        local_b190 = *(float *)*in_stack_00000008;
        local_b158 = 1;
        local_b194 = *(float *)(*in_stack_00000008 + 4);
        if (local_c17c < local_b190) {
          local_b17c[0] = local_b190;
        }
        if (local_b194 < local_b17c[0]) {
          local_b17c[0] = local_b194;
        }
        break;
      case 4:
        local_b198 = 88.37626;
        pfVar168 = std::min<float>(local_b17c,&local_b198);
        local_b17c[0] = *pfVar168;
        local_b19c = -88.37626;
        pfVar168 = std::max<float>(local_b17c,&local_b19c);
        local_b17c[0] = *pfVar168;
        fVar173 = expf(-local_b17c[0]);
        local_b17c[0] = 1.0 / (fVar173 + 1.0);
        break;
      case 5:
        fVar173 = expf(local_c17c);
        fVar173 = logf(fVar173 + 1.0);
        local_b17c[0] = tanhf(fVar173);
        local_b17c[0] = local_c17c * local_b17c[0];
        break;
      case 6:
        local_b168 = 0;
        local_b1a0 = *(float *)*in_stack_00000008;
        local_b17c[1] = 1.4013e-45;
        local_b17c[2] = 0.0;
        local_b1a4 = *(float *)(*in_stack_00000008 + 4);
        local_b1a8 = -local_b1a4 / local_b1a0;
        local_b1ac = 1.0 / local_b1a0 + local_b1a8;
        if (local_b1a8 <= local_c17c) {
          if (local_c17c <= local_b1ac) {
            local_b17c[0] = local_c17c * (local_c17c * local_b1a0 + local_b1a4);
          }
        }
        else {
          local_b17c[0] = 0.0;
        }
      }
      local_c060 = local_b17c[0];
      local_b118 = local_b17c[0] * local_bfec;
      dVar176 = std::round((double)(ulong)(uint)local_b118);
      local_b11c = (int)SUB84(dVar176,0);
      if (local_b11c < 0x80) {
        if (local_b11c < -0x7f) {
          local_b111 = 0x81;
        }
        else {
          local_b111 = (undefined1)local_b11c;
        }
      }
      else {
        local_b111 = 0x7f;
      }
      *(undefined1 *)local_bf98 = local_b111;
      local_bf90 = local_bf90 + 1;
      local_bf98 = (undefined8 *)((long)local_bf98 + 1);
    }
  }
  else {
    local_bf88 = 0;
    local_c064 = *(float *)*in_RCX;
    local_c088 = CONCAT44(local_c064,local_c064);
    uStack_c080 = CONCAT44(local_c064,local_c064);
    local_c078 = local_c088;
    uStack_c070 = uStack_c080;
    if ((1 < local_bfbc) && (in_stack_00000018 == 8)) {
      local_bef0 = (undefined8 *)*in_RCX;
      local_c078 = *local_bef0;
      uStack_c070 = local_bef0[1];
      local_bef8 = (undefined8 *)(*in_RCX + 0x10);
      local_c088 = *local_bef8;
      uStack_c080 = *(undefined8 *)(*in_RCX + 0x18);
    }
    local_c08c = 0;
    while( true ) {
      uVar2 = uStack_9c10;
      uVar1 = local_9c18;
      local_9c18._0_4_ = (float)local_c078;
      local_9c18._4_4_ = (float)((ulong)local_c078 >> 0x20);
      uStack_9c10._0_4_ = (float)uStack_c070;
      uStack_9c10._4_4_ = (float)((ulong)uStack_c070 >> 0x20);
      if (local_bfc4 <= local_c08c + 7) break;
      local_be28 = local_bf90;
      uVar1 = *(undefined8 *)local_bf90;
      uVar2 = *(undefined8 *)(local_bf90 + 2);
      local_be78._0_4_ = (int)uVar1;
      local_be78._4_4_ = (int)((ulong)uVar1 >> 0x20);
      uStack_be70._0_4_ = (int)uVar2;
      uStack_be70._4_4_ = (int)((ulong)uVar2 >> 0x20);
      local_c0a8 = CONCAT44((float)local_be78._4_4_,(float)(int)local_be78);
      uStack_c0a0 = CONCAT44((float)uStack_be70._4_4_,(float)(int)uStack_be70);
      local_be30 = local_bf90 + 4;
      uVar3 = *(undefined8 *)local_be30;
      uVar4 = *(undefined8 *)(local_bf90 + 6);
      local_be88._0_4_ = (int)uVar3;
      local_be88._4_4_ = (int)((ulong)uVar3 >> 0x20);
      uStack_be80._0_4_ = (int)uVar4;
      uStack_be80._4_4_ = (int)((ulong)uVar4 >> 0x20);
      local_c0b8 = CONCAT44((float)local_be88._4_4_,(float)(int)local_be88);
      uStack_c0b0 = CONCAT44((float)uStack_be80._4_4_,(float)(int)uStack_be80);
      local_b080 = &local_c0a8;
      local_b088 = &local_bfd8;
      local_b090 = &local_c078;
      local_b068 = local_c0a8;
      uStack_b060 = uStack_c0a0;
      local_b078 = local_bfd8;
      uStack_b070 = uStack_bfd0;
      local_9c08 = (float)(int)local_be78 * (float)local_bd08;
      fStack_9c04 = (float)local_be78._4_4_ * local_bd08._4_4_;
      fStack_9c00 = (float)(int)uStack_be70 * (float)uStack_bd00;
      fStack_9bfc = (float)uStack_be70._4_4_ * uStack_bd00._4_4_;
      local_9c18._0_4_ = local_9c08 + (float)local_9c18;
      local_9c18._4_4_ = fStack_9c04 + local_9c18._4_4_;
      uStack_9c10._0_4_ = fStack_9c00 + (float)uStack_9c10;
      uStack_9c10._4_4_ = fStack_9bfc + uStack_9c10._4_4_;
      local_c0a8 = CONCAT44(local_9c18._4_4_,(float)local_9c18);
      uStack_c0a0 = CONCAT44(uStack_9c10._4_4_,(float)uStack_9c10);
      local_b0c0 = &local_c0b8;
      local_b0c8 = &local_bfe8;
      local_b0d0 = &local_c088;
      local_b0a8 = local_c0b8;
      uStack_b0a0 = uStack_c0b0;
      local_b0b8 = local_bfe8;
      uStack_b0b0 = uStack_bfe0;
      local_9be8 = (float)(int)local_be88 * (float)local_bd28;
      fStack_9be4 = (float)local_be88._4_4_ * local_bd28._4_4_;
      fStack_9be0 = (float)(int)uStack_be80 * (float)uStack_bd20;
      fStack_9bdc = (float)uStack_be80._4_4_ * uStack_bd20._4_4_;
      local_9bf8._0_4_ = (float)local_c088;
      local_9bf8._4_4_ = (float)((ulong)local_c088 >> 0x20);
      uStack_9bf0._0_4_ = (float)uStack_c080;
      uStack_9bf0._4_4_ = (float)((ulong)uStack_c080 >> 0x20);
      local_9bf8._0_4_ = local_9be8 + (float)local_9bf8;
      local_9bf8._4_4_ = fStack_9be4 + local_9bf8._4_4_;
      uStack_9bf0._0_4_ = fStack_9be0 + (float)uStack_9bf0;
      uStack_9bf0._4_4_ = fStack_9bdc + uStack_9bf0._4_4_;
      local_c0b8 = CONCAT44(local_9bf8._4_4_,(float)local_9bf8);
      uStack_c0b0 = CONCAT44(uStack_9bf0._4_4_,(float)uStack_9bf0);
      local_ba18 = local_c0a8;
      uStack_ba10 = uStack_c0a0;
      switch(in_R9D) {
      case 1:
        local_aea8 = 0;
        uStack_aea0 = 0;
        local_af88 = local_c0a8;
        uStack_af80 = uStack_c0a0;
        local_af98 = 0;
        uStack_af90 = 0;
        auVar16._8_8_ = uStack_c0a0;
        auVar16._0_8_ = local_c0a8;
        _local_ba08 = maxps(auVar16,ZEXT816(0));
        break;
      case 2:
        local_b9b8 = 0;
        local_ac0c = *(float *)*in_stack_00000008;
        local_ac08 = local_c0a8;
        uStack_ac00 = uStack_c0a0;
        local_ab88 = 0;
        uStack_ab80 = 0;
        local_aba8 = 0;
        uStack_aba0 = 0;
        local_abb8 = local_c0a8;
        uStack_abb0 = uStack_c0a0;
        auVar28._8_8_ = uStack_c0a0;
        auVar28._0_8_ = local_c0a8;
        local_ac28 = maxps(ZEXT816(0),auVar28);
        local_ab98 = 0;
        uStack_ab90 = 0;
        local_a9a8 = 0;
        uStack_a9a0 = 0;
        local_a9b8 = local_c0a8;
        uStack_a9b0 = uStack_c0a0;
        auVar33._8_8_ = uStack_c0a0;
        auVar33._0_8_ = local_c0a8;
        local_ac38 = minps(ZEXT816(0),auVar33);
        local_abc8 = CONCAT44(local_ac0c,local_ac0c);
        uStack_abc0 = CONCAT44(local_ac0c,local_ac0c);
        local_abd8 = local_ac38._0_8_;
        uVar5 = local_abd8;
        uStack_abd0 = local_ac38._8_8_;
        uVar6 = uStack_abd0;
        local_abd8._0_4_ = local_ac38._0_4_;
        local_abd8._4_4_ = local_ac38._4_4_;
        uStack_abd0._0_4_ = local_ac38._8_4_;
        uStack_abd0._4_4_ = local_ac38._12_4_;
        local_9c98 = local_ac0c * (float)local_abd8;
        fStack_9c94 = local_ac0c * local_abd8._4_4_;
        fStack_9c90 = local_ac0c * (float)uStack_abd0;
        fStack_9c8c = local_ac0c * uStack_abd0._4_4_;
        local_9c88 = local_ac28._0_8_;
        uVar161 = local_9c88;
        uStack_9c80 = local_ac28._8_8_;
        uVar164 = uStack_9c80;
        local_9c88._0_4_ = local_ac28._0_4_;
        local_9c88._4_4_ = local_ac28._4_4_;
        uStack_9c80._0_4_ = local_ac28._8_4_;
        uStack_9c80._4_4_ = local_ac28._12_4_;
        local_ba08._4_4_ = local_9c88._4_4_ + fStack_9c94;
        local_ba08._0_4_ = (float)local_9c88 + local_9c98;
        uStack_ba00._0_4_ = (float)uStack_9c80 + fStack_9c90;
        uStack_ba00._4_4_ = uStack_9c80._4_4_ + fStack_9c8c;
        local_abf8 = local_ac0c;
        fStack_abf4 = local_ac0c;
        fStack_abf0 = local_ac0c;
        fStack_abec = local_ac0c;
        local_abe8 = local_ac0c;
        local_abd8 = uVar5;
        uStack_abd0 = uVar6;
        local_9c88 = uVar161;
        uStack_9c80 = uVar164;
        break;
      case 3:
        local_b9c8 = 0;
        local_b948 = *(undefined4 *)*in_stack_00000008;
        local_ba38 = CONCAT44(local_b948,local_b948);
        uStack_ba30 = CONCAT44(local_b948,local_b948);
        local_b9d8 = 1;
        local_b968 = *(undefined4 *)(*in_stack_00000008 + 4);
        local_ba48 = CONCAT44(local_b968,local_b968);
        uStack_ba40 = CONCAT44(local_b968,local_b968);
        local_af68 = local_c0a8;
        uStack_af60 = uStack_c0a0;
        auVar18._8_8_ = uStack_c0a0;
        auVar18._0_8_ = local_c0a8;
        auVar17._8_8_ = uStack_ba30;
        auVar17._0_8_ = local_ba38;
        local_a8c8 = maxps(auVar18,auVar17);
        auVar40._8_8_ = uStack_ba40;
        auVar40._0_8_ = local_ba48;
        _local_ba08 = minps(local_a8c8,auVar40);
        uStack_b964 = local_b968;
        uStack_b960 = local_b968;
        uStack_b95c = local_b968;
        local_b958 = local_b968;
        uStack_b944 = local_b948;
        uStack_b940 = local_b948;
        uStack_b93c = local_b948;
        local_b92c = local_b948;
        local_af78 = local_ba38;
        uStack_af70 = uStack_ba30;
        local_a8d8 = local_ba48;
        uStack_a8d0 = uStack_ba40;
        break;
      case 4:
        local_a778 = local_c0a8;
        uStack_a770 = uStack_c0a0;
        local_a74c = 0x3f800000;
        local_a768 = 0x3f800000;
        uStack_a764 = 0x3f800000;
        uStack_a760 = 0x3f800000;
        uStack_a75c = 0x3f800000;
        local_a788 = 0x3f8000003f800000;
        uStack_a780 = 0x3f8000003f800000;
        local_a748 = 0;
        uStack_a740 = 0;
        local_6b68 = 0;
        uStack_6b60 = 0;
        local_6b78 = local_c0a8;
        uStack_6b70 = uStack_c0a0;
        local_7bc8 = CONCAT44(0.0 - local_9c18._4_4_,0.0 - (float)local_9c18);
        uStack_7bc0._0_4_ = 0.0 - (float)uStack_9c10;
        uStack_7bc0._4_4_ = 0.0 - uStack_9c10._4_4_;
        local_79a8 = 0;
        uStack_79a0 = 0;
        local_7c08 = 0x3f8000003f800000;
        uStack_7c00 = 0x3f8000003f800000;
        local_7988 = local_7bc8;
        uStack_7980 = uStack_7bc0;
        local_7998 = 0x42b0c0a542b0c0a5;
        uStack_7990 = 0x42b0c0a542b0c0a5;
        auVar92._8_8_ = uStack_7bc0;
        auVar92._0_8_ = local_7bc8;
        auVar91._8_8_ = 0x42b0c0a542b0c0a5;
        auVar91._0_8_ = 0x42b0c0a542b0c0a5;
        auVar177 = minps(auVar92,auVar91);
        local_7bc8 = auVar177._0_8_;
        uStack_7bc0 = auVar177._8_8_;
        local_79b8 = local_7bc8;
        uStack_79b0 = uStack_7bc0;
        local_79c8 = 0xc2b0c0a5c2b0c0a5;
        uStack_79c0 = 0xc2b0c0a5c2b0c0a5;
        auVar90._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar90._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar177 = maxps(auVar177,auVar90);
        local_7bc8 = auVar177._0_8_;
        uStack_7bc0 = auVar177._8_8_;
        local_7b58 = local_7bc8;
        uVar5 = local_7b58;
        uStack_7b50 = uStack_7bc0;
        uVar6 = uStack_7b50;
        local_7b68 = 0x3fb8aa3b3fb8aa3b;
        uStack_7b60 = 0x3fb8aa3b3fb8aa3b;
        local_7b58._0_4_ = auVar177._0_4_;
        local_7b58._4_4_ = auVar177._4_4_;
        uStack_7b50._0_4_ = auVar177._8_4_;
        uStack_7b50._4_4_ = auVar177._12_4_;
        local_7888 = CONCAT44(local_7b58._4_4_ * 1.442695,(float)local_7b58 * 1.442695);
        uStack_7880 = CONCAT44(uStack_7b50._4_4_ * 1.442695,(float)uStack_7b50 * 1.442695);
        local_7898 = 0x3f0000003f000000;
        uStack_7890 = 0x3f0000003f000000;
        fVar173 = (float)local_7b58 * 1.442695 + 0.5;
        fVar183 = local_7b58._4_4_ * 1.442695 + 0.5;
        fVar191 = (float)uStack_7b50 * 1.442695 + 0.5;
        fVar199 = uStack_7b50._4_4_ * 1.442695 + 0.5;
        local_6a88 = CONCAT44(fVar183,fVar173);
        uStack_6a80 = CONCAT44(fVar199,fVar191);
        local_7bb8 = CONCAT44((int)fVar183,(int)fVar173);
        uStack_7bb0 = CONCAT44((int)fVar199,(int)fVar191);
        local_7be8 = (float)(int)fVar173;
        fStack_7be4 = (float)(int)fVar183;
        fStack_7be0 = (float)(int)fVar191;
        fStack_7bdc = (float)(int)fVar199;
        local_7bd8 = CONCAT44(fStack_7be4,local_7be8);
        uStack_7bd0 = CONCAT44(fStack_7bdc,fStack_7be0);
        local_68b8 = CONCAT44(fVar183,fVar173);
        uStack_68b0 = CONCAT44(fVar199,fVar191);
        local_68a8 = local_7bd8;
        uStack_68a0 = uStack_7bd0;
        local_7c18 = CONCAT44(-(uint)(fVar183 < fStack_7be4),-(uint)(fVar173 < local_7be8));
        uStack_7c10 = CONCAT44(-(uint)(fVar199 < fStack_7bdc),-(uint)(fVar191 < fStack_7be0));
        local_6728 = local_7c18;
        uStack_6720 = uStack_7c10;
        local_6738 = 0x3f8000003f800000;
        uStack_6730 = 0x3f8000003f800000;
        local_7c18 = local_7c18 & 0x3f8000003f800000;
        uStack_7c10 = uStack_7c10 & 0x3f8000003f800000;
        local_6cc8 = local_7bd8;
        uStack_6cc0 = uStack_7bd0;
        local_6cd8._0_4_ = (float)local_7c18;
        local_6cd8._4_4_ = (float)(local_7c18 >> 0x20);
        uStack_6cd0._0_4_ = (float)uStack_7c10;
        uStack_6cd0._4_4_ = (float)(uStack_7c10 >> 0x20);
        local_7be8 = local_7be8 - (float)local_6cd8;
        fStack_7be4 = fStack_7be4 - local_6cd8._4_4_;
        fStack_7be0 = fStack_7be0 - (float)uStack_6cd0;
        fStack_7bdc = fStack_7bdc - uStack_6cd0._4_4_;
        local_6300 = &local_7be8;
        local_62a8 = ::_ps_cephes_exp_C1;
        local_7b40 = &local_7bc8;
        local_6268 = local_7bc8;
        uStack_6260 = uStack_7bc0;
        local_6288 = CONCAT44(fStack_7be4,local_7be8);
        uStack_6280 = CONCAT44(fStack_7bdc,fStack_7be0);
        local_6298[0] = 0.6933594;
        local_6298[1] = 0.6933594;
        afStack_6290[0] = 0.6933594;
        afStack_6290[1] = 0.6933594;
        local_6278 = local_7be8 * 0.6933594;
        fStack_6274 = fStack_7be4 * 0.6933594;
        fStack_6270 = fStack_7be0 * 0.6933594;
        fStack_626c = fStack_7bdc * 0.6933594;
        local_7bc8 = CONCAT44(local_7b58._4_4_ - fStack_6274,(float)local_7b58 - local_6278);
        uStack_7bc0._0_4_ = (float)uStack_7b50 - fStack_6270;
        uStack_7bc0._4_4_ = uStack_7b50._4_4_ - fStack_626c;
        local_6308 = ::_ps_cephes_exp_C2;
        local_62c8 = local_7bc8;
        uStack_62c0 = uStack_7bc0;
        local_62e8 = CONCAT44(fStack_7be4,local_7be8);
        uStack_62e0 = CONCAT44(fStack_7bdc,fStack_7be0);
        local_62f8[0] = -0.00021219444;
        local_62f8[1] = -0.00021219444;
        afStack_62f0[0] = -0.00021219444;
        afStack_62f0[1] = -0.00021219444;
        local_62d8 = local_7be8 * -0.00021219444;
        fStack_62d4 = fStack_7be4 * -0.00021219444;
        fStack_62d0 = fStack_7be0 * -0.00021219444;
        fStack_62cc = fStack_7bdc * -0.00021219444;
        fVar173 = ((float)local_7b58 - local_6278) - local_62d8;
        fVar183 = (local_7b58._4_4_ - fStack_6274) - fStack_62d4;
        fVar191 = ((float)uStack_7b50 - fStack_6270) - fStack_62d0;
        fVar199 = (uStack_7b50._4_4_ - fStack_626c) - fStack_62cc;
        local_7bc8 = CONCAT44(fVar183,fVar173);
        uStack_7bc0._0_4_ = fVar191;
        uStack_7bc0._4_4_ = fVar199;
        local_7b78 = local_7bc8;
        uStack_7b70 = uStack_7bc0;
        local_7b88 = local_7bc8;
        uStack_7b80 = uStack_7bc0;
        local_7bd8 = CONCAT44(fVar183 * fVar183,fVar173 * fVar173);
        uStack_7bd0 = CONCAT44(fVar199 * fVar199,fVar191 * fVar191);
        local_7b30 = &local_7c28;
        local_7a00 = ::_ps_cephes_exp_p1;
        local_79d8 = 0x3950696739506967;
        uStack_79d0 = 0x3950696739506967;
        local_79e8 = local_7bc8;
        uStack_79e0 = uStack_7bc0;
        local_7968 = fVar173 * 0.00019875691;
        fStack_7964 = fVar183 * 0.00019875691;
        fStack_7960 = fVar191 * 0.00019875691;
        fStack_795c = fVar199 * 0.00019875691;
        local_7978[0] = 0.0013981999;
        local_7978[1] = 0.0013981999;
        afStack_7970[0] = 0.0013981999;
        afStack_7970[1] = 0.0013981999;
        local_7c28 = CONCAT44(fStack_7964 + 0.0013981999,local_7968 + 0.0013981999);
        uStack_7c20 = CONCAT44(fStack_795c + 0.0013981999,fStack_7960 + 0.0013981999);
        local_7a40 = ::_ps_cephes_exp_p2;
        local_7a18 = local_7c28;
        uStack_7a10 = uStack_7c20;
        local_7a28 = local_7bc8;
        uStack_7a20 = uStack_7bc0;
        local_7948 = (local_7968 + 0.0013981999) * fVar173;
        fStack_7944 = (fStack_7964 + 0.0013981999) * fVar183;
        fStack_7940 = (fStack_7960 + 0.0013981999) * fVar191;
        fStack_793c = (fStack_795c + 0.0013981999) * fVar199;
        local_7958[0] = 0.008333452;
        local_7958[1] = 0.008333452;
        afStack_7950[0] = 0.008333452;
        afStack_7950[1] = 0.008333452;
        local_7c28 = CONCAT44(fStack_7944 + 0.008333452,local_7948 + 0.008333452);
        uStack_7c20 = CONCAT44(fStack_793c + 0.008333452,fStack_7940 + 0.008333452);
        local_7a80 = ::_ps_cephes_exp_p3;
        local_7a58 = local_7c28;
        uStack_7a50 = uStack_7c20;
        local_7a68 = local_7bc8;
        uStack_7a60 = uStack_7bc0;
        local_7928 = (local_7948 + 0.008333452) * fVar173;
        fStack_7924 = (fStack_7944 + 0.008333452) * fVar183;
        fStack_7920 = (fStack_7940 + 0.008333452) * fVar191;
        fStack_791c = (fStack_793c + 0.008333452) * fVar199;
        local_7938[0] = 0.041665796;
        local_7938[1] = 0.041665796;
        afStack_7930[0] = 0.041665796;
        afStack_7930[1] = 0.041665796;
        local_7c28 = CONCAT44(fStack_7924 + 0.041665796,local_7928 + 0.041665796);
        uStack_7c20 = CONCAT44(fStack_791c + 0.041665796,fStack_7920 + 0.041665796);
        local_7ac0 = ::_ps_cephes_exp_p4;
        local_7a98 = local_7c28;
        uStack_7a90 = uStack_7c20;
        local_7aa8 = local_7bc8;
        uStack_7aa0 = uStack_7bc0;
        local_7908 = (local_7928 + 0.041665796) * fVar173;
        fStack_7904 = (fStack_7924 + 0.041665796) * fVar183;
        fStack_7900 = (fStack_7920 + 0.041665796) * fVar191;
        fStack_78fc = (fStack_791c + 0.041665796) * fVar199;
        local_7918[0] = 0.16666666;
        local_7918[1] = 0.16666666;
        afStack_7910[0] = 0.16666666;
        afStack_7910[1] = 0.16666666;
        local_7c28 = CONCAT44(fStack_7904 + 0.16666666,local_7908 + 0.16666666);
        uStack_7c20 = CONCAT44(fStack_78fc + 0.16666666,fStack_7900 + 0.16666666);
        local_7b00 = ::_ps_cephes_exp_p5;
        local_7ad8 = local_7c28;
        uStack_7ad0 = uStack_7c20;
        local_7ae8 = local_7bc8;
        uStack_7ae0 = uStack_7bc0;
        local_78e8 = (local_7908 + 0.16666666) * fVar173;
        fStack_78e4 = (fStack_7904 + 0.16666666) * fVar183;
        fStack_78e0 = (fStack_7900 + 0.16666666) * fVar191;
        fStack_78dc = (fStack_78fc + 0.16666666) * fVar199;
        local_78f8[0] = 0.5;
        local_78f8[1] = 0.5;
        afStack_78f0[0] = 0.5;
        afStack_78f0[1] = 0.5;
        local_7c28 = CONCAT44(fStack_78e4 + 0.5,local_78e8 + 0.5);
        uStack_7c20 = CONCAT44(fStack_78dc + 0.5,fStack_78e0 + 0.5);
        local_7b38 = &local_7bd8;
        local_7b18 = local_7c28;
        uStack_7b10 = uStack_7c20;
        local_7b28 = local_7bd8;
        uStack_7b20 = uStack_7bd0;
        local_78c8 = (local_78e8 + 0.5) * fVar173 * fVar173;
        fStack_78c4 = (fStack_78e4 + 0.5) * fVar183 * fVar183;
        fStack_78c0 = (fStack_78e0 + 0.5) * fVar191 * fVar191;
        fStack_78bc = (fStack_78dc + 0.5) * fVar199 * fVar199;
        local_78d8 = local_7bc8;
        uStack_78d0 = uStack_7bc0;
        local_7c28 = CONCAT44(fStack_78c4 + fVar183,local_78c8 + fVar173);
        uStack_7c20 = CONCAT44(fStack_78bc + fVar199,fStack_78c0 + fVar191);
        local_78a8 = local_7c28;
        uStack_78a0 = uStack_7c20;
        local_78b8 = 0x3f8000003f800000;
        uStack_78b0 = 0x3f8000003f800000;
        local_9ab8 = local_78c8 + fVar173 + 1.0;
        fStack_9ab4 = fStack_78c4 + fVar183 + 1.0;
        fStack_9ab0 = fStack_78c0 + fVar191 + 1.0;
        fStack_9aac = fStack_78bc + fVar199 + 1.0;
        local_7c28 = CONCAT44(fStack_9ab4,local_9ab8);
        uStack_7c20 = CONCAT44(fStack_9aac,fStack_9ab0);
        local_6a98 = CONCAT44(fStack_7be4,local_7be8);
        uStack_6a90 = CONCAT44(fStack_7bdc,fStack_7be0);
        local_5be8 = CONCAT44((int)fStack_7be4,(int)local_7be8);
        uStack_5be0 = CONCAT44((int)fStack_7bdc,(int)fStack_7be0);
        local_5bf8 = 0x7f0000007f;
        uStack_5bf0 = 0x7f0000007f;
        iVar203 = (int)local_7be8 + 0x7f;
        fStack_7bf4 = (float)((int)fStack_7be4 + 0x7f);
        fStack_7bf0 = (float)((int)fStack_7be0 + 0x7f);
        fStack_7bec = (float)((int)fStack_7bdc + 0x7f);
        local_5a68 = CONCAT44(fStack_7bf4,iVar203);
        uStack_5a60 = CONCAT44(fStack_7bec,fStack_7bf0);
        local_5a6c = 0x17;
        local_7bf8 = (float)(iVar203 * 0x800000);
        local_7c38 = CONCAT44(fStack_7bf4,local_7bf8);
        uStack_7c30 = CONCAT44(fStack_7bec,fStack_7bf0);
        local_7b98 = local_7c28;
        uStack_7b90 = uStack_7c20;
        local_9ab8 = local_9ab8 * local_7bf8;
        fStack_9ab4 = fStack_9ab4 * fStack_7bf4;
        fStack_9ab0 = fStack_9ab0 * fStack_7bf0;
        fStack_9aac = fStack_9aac * fStack_7bec;
        local_7c28 = CONCAT44(fStack_9ab4,local_9ab8);
        uStack_7c20 = CONCAT44(fStack_9aac,fStack_9ab0);
        local_9d58 = local_7c28;
        uStack_9d50 = uStack_7c20;
        local_9ab8 = local_9ab8 + 1.0;
        fStack_9ab4 = fStack_9ab4 + 1.0;
        fStack_9ab0 = fStack_9ab0 + 1.0;
        fStack_9aac = fStack_9aac + 1.0;
        auVar59._8_8_ = 0x3f8000003f800000;
        auVar59._0_8_ = 0x3f8000003f800000;
        auVar58._4_4_ = fStack_9ab4;
        auVar58._0_4_ = local_9ab8;
        auVar58._8_4_ = fStack_9ab0;
        auVar58._12_4_ = fStack_9aac;
        _local_ba08 = divps(auVar59,auVar58);
        local_9d48 = local_a788;
        uStack_9d40 = uStack_a780;
        local_9aa8 = local_a788;
        uStack_9aa0 = uStack_a780;
        local_7ba8 = local_7c38;
        uStack_7ba0 = uStack_7c30;
        local_7b58 = uVar5;
        uStack_7b50 = uVar6;
        local_7af8 = local_7b40;
        local_7af0 = local_7b30;
        local_7ab8 = local_7b40;
        local_7ab0 = local_7b30;
        local_7a78 = local_7b40;
        local_7a70 = local_7b30;
        local_7a38 = local_7b40;
        local_7a30 = local_7b30;
        local_79f8 = local_7b40;
        local_79f0 = local_7b30;
        local_6cd8 = local_7c18;
        uStack_6cd0 = uStack_7c10;
        local_6310 = local_7b40;
        local_62b0 = local_7b40;
        local_62a0 = local_6300;
        local_5928 = local_7c38;
        uStack_5920 = uStack_7c30;
        break;
      case 5:
        local_a5a8 = local_c0a8;
        uStack_a5a0 = uStack_c0a0;
        local_9028 = 0;
        uStack_9020 = 0;
        local_9288 = 0x3f8000003f800000;
        uStack_9280 = 0x3f8000003f800000;
        local_9008 = local_c0a8;
        uStack_9000 = uStack_c0a0;
        local_9018 = 0x42b0c0a542b0c0a5;
        uStack_9010 = 0x42b0c0a542b0c0a5;
        auVar74._8_8_ = uStack_c0a0;
        auVar74._0_8_ = local_c0a8;
        auVar73._8_8_ = 0x42b0c0a542b0c0a5;
        auVar73._0_8_ = 0x42b0c0a542b0c0a5;
        auVar177 = minps(auVar74,auVar73);
        local_9248 = auVar177._0_8_;
        uStack_9240 = auVar177._8_8_;
        local_9038 = local_9248;
        uStack_9030 = uStack_9240;
        local_9048 = 0xc2b0c0a5c2b0c0a5;
        uStack_9040 = 0xc2b0c0a5c2b0c0a5;
        auVar72._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar72._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar177 = maxps(auVar177,auVar72);
        local_9248 = auVar177._0_8_;
        uStack_9240 = auVar177._8_8_;
        local_91d8 = local_9248;
        uVar5 = local_91d8;
        uStack_91d0 = uStack_9240;
        uVar6 = uStack_91d0;
        local_91e8 = 0x3fb8aa3b3fb8aa3b;
        uStack_91e0 = 0x3fb8aa3b3fb8aa3b;
        local_91d8._0_4_ = auVar177._0_4_;
        local_91d8._4_4_ = auVar177._4_4_;
        uStack_91d0._0_4_ = auVar177._8_4_;
        uStack_91d0._4_4_ = auVar177._12_4_;
        local_8f08 = CONCAT44(local_91d8._4_4_ * 1.442695,(float)local_91d8 * 1.442695);
        uStack_8f00 = CONCAT44(uStack_91d0._4_4_ * 1.442695,(float)uStack_91d0 * 1.442695);
        local_8f18 = 0x3f0000003f000000;
        uStack_8f10 = 0x3f0000003f000000;
        fVar173 = (float)local_91d8 * 1.442695 + 0.5;
        fVar183 = local_91d8._4_4_ * 1.442695 + 0.5;
        fVar191 = (float)uStack_91d0 * 1.442695 + 0.5;
        fVar199 = uStack_91d0._4_4_ * 1.442695 + 0.5;
        local_69c8 = CONCAT44(fVar183,fVar173);
        uStack_69c0 = CONCAT44(fVar199,fVar191);
        local_9238 = CONCAT44((int)fVar183,(int)fVar173);
        uStack_9230 = CONCAT44((int)fVar199,(int)fVar191);
        local_9268 = (float)(int)fVar173;
        fStack_9264 = (float)(int)fVar183;
        fStack_9260 = (float)(int)fVar191;
        fStack_925c = (float)(int)fVar199;
        local_9258 = CONCAT44(fStack_9264,local_9268);
        uStack_9250 = CONCAT44(fStack_925c,fStack_9260);
        local_67f8 = CONCAT44(fVar183,fVar173);
        uStack_67f0 = CONCAT44(fVar199,fVar191);
        local_67e8 = local_9258;
        uStack_67e0 = uStack_9250;
        local_9298 = CONCAT44(-(uint)(fVar183 < fStack_9264),-(uint)(fVar173 < local_9268));
        uStack_9290 = CONCAT44(-(uint)(fVar199 < fStack_925c),-(uint)(fVar191 < fStack_9260));
        local_6668 = local_9298;
        uStack_6660 = uStack_9290;
        local_6678 = 0x3f8000003f800000;
        uStack_6670 = 0x3f8000003f800000;
        local_9298 = local_9298 & 0x3f8000003f800000;
        uStack_9290 = uStack_9290 & 0x3f8000003f800000;
        local_6c08 = local_9258;
        uStack_6c00 = uStack_9250;
        local_6c18._0_4_ = (float)local_9298;
        local_6c18._4_4_ = (float)(local_9298 >> 0x20);
        uStack_6c10._0_4_ = (float)uStack_9290;
        uStack_6c10._4_4_ = (float)(uStack_9290 >> 0x20);
        local_9268 = local_9268 - (float)local_6c18;
        fStack_9264 = fStack_9264 - local_6c18._4_4_;
        fStack_9260 = fStack_9260 - (float)uStack_6c10;
        fStack_925c = fStack_925c - uStack_6c10._4_4_;
        local_5e80 = &local_9268;
        local_5e28 = ::_ps_cephes_exp_C1;
        local_91c0 = &local_9248;
        local_5de8 = local_9248;
        uStack_5de0 = uStack_9240;
        local_5e08 = CONCAT44(fStack_9264,local_9268);
        uStack_5e00 = CONCAT44(fStack_925c,fStack_9260);
        local_5e18[0] = 0.6933594;
        local_5e18[1] = 0.6933594;
        afStack_5e10[0] = 0.6933594;
        afStack_5e10[1] = 0.6933594;
        local_5df8 = local_9268 * 0.6933594;
        fStack_5df4 = fStack_9264 * 0.6933594;
        fStack_5df0 = fStack_9260 * 0.6933594;
        fStack_5dec = fStack_925c * 0.6933594;
        local_9248 = CONCAT44(local_91d8._4_4_ - fStack_5df4,(float)local_91d8 - local_5df8);
        uStack_9240._0_4_ = (float)uStack_91d0 - fStack_5df0;
        uStack_9240._4_4_ = uStack_91d0._4_4_ - fStack_5dec;
        local_5e88 = ::_ps_cephes_exp_C2;
        local_5e48 = local_9248;
        uStack_5e40 = uStack_9240;
        local_5e68 = CONCAT44(fStack_9264,local_9268);
        uStack_5e60 = CONCAT44(fStack_925c,fStack_9260);
        local_5e78[0] = -0.00021219444;
        local_5e78[1] = -0.00021219444;
        afStack_5e70[0] = -0.00021219444;
        afStack_5e70[1] = -0.00021219444;
        local_5e58 = local_9268 * -0.00021219444;
        fStack_5e54 = fStack_9264 * -0.00021219444;
        fStack_5e50 = fStack_9260 * -0.00021219444;
        fStack_5e4c = fStack_925c * -0.00021219444;
        fVar173 = ((float)local_91d8 - local_5df8) - local_5e58;
        fVar183 = (local_91d8._4_4_ - fStack_5df4) - fStack_5e54;
        fVar191 = ((float)uStack_91d0 - fStack_5df0) - fStack_5e50;
        fVar199 = (uStack_91d0._4_4_ - fStack_5dec) - fStack_5e4c;
        local_9248 = CONCAT44(fVar183,fVar173);
        uStack_9240._0_4_ = fVar191;
        uStack_9240._4_4_ = fVar199;
        local_91f8 = local_9248;
        uStack_91f0 = uStack_9240;
        local_9208 = local_9248;
        uStack_9200 = uStack_9240;
        local_9258 = CONCAT44(fVar183 * fVar183,fVar173 * fVar173);
        uStack_9250 = CONCAT44(fVar199 * fVar199,fVar191 * fVar191);
        local_91b0 = &local_92a8;
        local_9080 = ::_ps_cephes_exp_p1;
        local_9058 = 0x3950696739506967;
        uStack_9050 = 0x3950696739506967;
        local_9068 = local_9248;
        uStack_9060 = uStack_9240;
        local_8fe8 = fVar173 * 0.00019875691;
        fStack_8fe4 = fVar183 * 0.00019875691;
        fStack_8fe0 = fVar191 * 0.00019875691;
        fStack_8fdc = fVar199 * 0.00019875691;
        local_8ff8[0] = 0.0013981999;
        local_8ff8[1] = 0.0013981999;
        afStack_8ff0[0] = 0.0013981999;
        afStack_8ff0[1] = 0.0013981999;
        local_92a8 = CONCAT44(fStack_8fe4 + 0.0013981999,local_8fe8 + 0.0013981999);
        uStack_92a0 = CONCAT44(fStack_8fdc + 0.0013981999,fStack_8fe0 + 0.0013981999);
        local_90c0 = ::_ps_cephes_exp_p2;
        local_9098 = local_92a8;
        uStack_9090 = uStack_92a0;
        local_90a8 = local_9248;
        uStack_90a0 = uStack_9240;
        local_8fc8 = (local_8fe8 + 0.0013981999) * fVar173;
        fStack_8fc4 = (fStack_8fe4 + 0.0013981999) * fVar183;
        fStack_8fc0 = (fStack_8fe0 + 0.0013981999) * fVar191;
        fStack_8fbc = (fStack_8fdc + 0.0013981999) * fVar199;
        local_8fd8[0] = 0.008333452;
        local_8fd8[1] = 0.008333452;
        afStack_8fd0[0] = 0.008333452;
        afStack_8fd0[1] = 0.008333452;
        local_92a8 = CONCAT44(fStack_8fc4 + 0.008333452,local_8fc8 + 0.008333452);
        uStack_92a0 = CONCAT44(fStack_8fbc + 0.008333452,fStack_8fc0 + 0.008333452);
        local_9100 = ::_ps_cephes_exp_p3;
        local_90d8 = local_92a8;
        uStack_90d0 = uStack_92a0;
        local_90e8 = local_9248;
        uStack_90e0 = uStack_9240;
        local_8fa8 = (local_8fc8 + 0.008333452) * fVar173;
        fStack_8fa4 = (fStack_8fc4 + 0.008333452) * fVar183;
        fStack_8fa0 = (fStack_8fc0 + 0.008333452) * fVar191;
        fStack_8f9c = (fStack_8fbc + 0.008333452) * fVar199;
        local_8fb8[0] = 0.041665796;
        local_8fb8[1] = 0.041665796;
        afStack_8fb0[0] = 0.041665796;
        afStack_8fb0[1] = 0.041665796;
        local_92a8 = CONCAT44(fStack_8fa4 + 0.041665796,local_8fa8 + 0.041665796);
        uStack_92a0 = CONCAT44(fStack_8f9c + 0.041665796,fStack_8fa0 + 0.041665796);
        local_9140 = ::_ps_cephes_exp_p4;
        local_9118 = local_92a8;
        uStack_9110 = uStack_92a0;
        local_9128 = local_9248;
        uStack_9120 = uStack_9240;
        local_8f88 = (local_8fa8 + 0.041665796) * fVar173;
        fStack_8f84 = (fStack_8fa4 + 0.041665796) * fVar183;
        fStack_8f80 = (fStack_8fa0 + 0.041665796) * fVar191;
        fStack_8f7c = (fStack_8f9c + 0.041665796) * fVar199;
        local_8f98[0] = 0.16666666;
        local_8f98[1] = 0.16666666;
        afStack_8f90[0] = 0.16666666;
        afStack_8f90[1] = 0.16666666;
        local_92a8 = CONCAT44(fStack_8f84 + 0.16666666,local_8f88 + 0.16666666);
        uStack_92a0 = CONCAT44(fStack_8f7c + 0.16666666,fStack_8f80 + 0.16666666);
        local_9180 = ::_ps_cephes_exp_p5;
        local_9158 = local_92a8;
        uStack_9150 = uStack_92a0;
        local_9168 = local_9248;
        uStack_9160 = uStack_9240;
        local_8f68 = (local_8f88 + 0.16666666) * fVar173;
        fStack_8f64 = (fStack_8f84 + 0.16666666) * fVar183;
        fStack_8f60 = (fStack_8f80 + 0.16666666) * fVar191;
        fStack_8f5c = (fStack_8f7c + 0.16666666) * fVar199;
        local_8f78[0] = 0.5;
        local_8f78[1] = 0.5;
        afStack_8f70[0] = 0.5;
        afStack_8f70[1] = 0.5;
        local_92a8 = CONCAT44(fStack_8f64 + 0.5,local_8f68 + 0.5);
        uStack_92a0 = CONCAT44(fStack_8f5c + 0.5,fStack_8f60 + 0.5);
        local_91b8 = &local_9258;
        local_9198 = local_92a8;
        uStack_9190 = uStack_92a0;
        local_91a8 = local_9258;
        uStack_91a0 = uStack_9250;
        local_8f48 = (local_8f68 + 0.5) * fVar173 * fVar173;
        fStack_8f44 = (fStack_8f64 + 0.5) * fVar183 * fVar183;
        fStack_8f40 = (fStack_8f60 + 0.5) * fVar191 * fVar191;
        fStack_8f3c = (fStack_8f5c + 0.5) * fVar199 * fVar199;
        local_8f58 = local_9248;
        uStack_8f50 = uStack_9240;
        local_92a8 = CONCAT44(fStack_8f44 + fVar183,local_8f48 + fVar173);
        uStack_92a0 = CONCAT44(fStack_8f3c + fVar199,fStack_8f40 + fVar191);
        local_8f28 = local_92a8;
        uStack_8f20 = uStack_92a0;
        local_8f38 = 0x3f8000003f800000;
        uStack_8f30 = 0x3f8000003f800000;
        fVar173 = local_8f48 + fVar173 + 1.0;
        fVar183 = fStack_8f44 + fVar183 + 1.0;
        fVar191 = fStack_8f40 + fVar191 + 1.0;
        fVar199 = fStack_8f3c + fVar199 + 1.0;
        local_92a8 = CONCAT44(fVar183,fVar173);
        uStack_92a0 = CONCAT44(fVar199,fVar191);
        local_69d8 = CONCAT44(fStack_9264,local_9268);
        uStack_69d0 = CONCAT44(fStack_925c,fStack_9260);
        local_5b28 = CONCAT44((int)fStack_9264,(int)local_9268);
        uStack_5b20 = CONCAT44((int)fStack_925c,(int)fStack_9260);
        local_5b38 = 0x7f0000007f;
        uStack_5b30 = 0x7f0000007f;
        iVar203 = (int)local_9268 + 0x7f;
        fStack_9274 = (float)((int)fStack_9264 + 0x7f);
        fStack_9270 = (float)((int)fStack_9260 + 0x7f);
        fStack_926c = (float)((int)fStack_925c + 0x7f);
        local_59a8 = CONCAT44(fStack_9274,iVar203);
        uStack_59a0 = CONCAT44(fStack_926c,fStack_9270);
        local_59ac = 0x17;
        local_9278 = (float)(iVar203 * 0x800000);
        local_92b8 = CONCAT44(fStack_9274,local_9278);
        uStack_92b0 = CONCAT44(fStack_926c,fStack_9270);
        local_9218 = local_92a8;
        uStack_9210 = uStack_92a0;
        fVar173 = fVar173 * local_9278;
        fVar183 = fVar183 * fStack_9274;
        fVar191 = fVar191 * fStack_9270;
        fVar199 = fVar199 * fStack_926c;
        local_92a8 = CONCAT44(fVar183,fVar173);
        uStack_92a0 = CONCAT44(fVar199,fVar191);
        local_a57c = 0x3f800000;
        local_a598 = 0x3f800000;
        uStack_a594 = 0x3f800000;
        uStack_a590 = 0x3f800000;
        uStack_a58c = 0x3f800000;
        local_9e18 = 0x3f8000003f800000;
        uStack_9e10 = 0x3f8000003f800000;
        local_9e08 = local_92a8;
        uStack_9e00 = uStack_92a0;
        fVar173 = fVar173 + 1.0;
        fVar183 = fVar183 + 1.0;
        fVar191 = fVar191 + 1.0;
        fVar199 = fVar199 + 1.0;
        local_2258 = CONCAT44(fVar183,fVar173);
        uStack_2250._0_4_ = fVar191;
        uStack_2250._4_4_ = fVar199;
        local_2278 = 0x3f8000003f800000;
        uStack_2270 = 0x3f8000003f800000;
        local_1f38 = 0;
        uStack_1f30 = 0;
        local_928 = local_2258;
        uStack_920 = uStack_2250;
        local_938 = 0;
        uStack_930 = 0;
        local_2288 = -(uint)(fVar173 <= 0.0);
        iStack_2284 = -(uint)(fVar183 <= 0.0);
        iStack_2280 = -(uint)(fVar191 <= 0.0);
        iStack_227c = -(uint)(fVar199 <= 0.0);
        local_1f48 = local_2258;
        uStack_1f40 = uStack_2250;
        local_1f58 = 0x80000000800000;
        uStack_1f50 = 0x80000000800000;
        auVar137._8_8_ = uStack_2250;
        auVar137._0_8_ = local_2258;
        auVar136._8_8_ = 0x80000000800000;
        auVar136._0_8_ = 0x80000000800000;
        auVar177 = maxps(auVar137,auVar136);
        local_2258 = auVar177._0_8_;
        uStack_2250 = auVar177._8_8_;
        local_7e8 = local_2258;
        uStack_7e0 = uStack_2250;
        local_868 = local_2258;
        uVar166 = local_868;
        uStack_860 = uStack_2250;
        uVar167 = uStack_860;
        local_86c = 0x17;
        local_868._0_4_ = auVar177._0_4_;
        local_868._4_4_ = auVar177._4_4_;
        uStack_860._0_4_ = auVar177._8_4_;
        uStack_860._4_4_ = auVar177._12_4_;
        local_1cf8 = local_2258;
        uStack_1cf0 = uStack_2250;
        local_1d08 = 0x807fffff807fffff;
        uStack_1d00 = 0x807fffff807fffff;
        local_6c8 = local_2258 & 0x807fffff807fffff;
        uStack_6c0 = uStack_2250 & 0x807fffff807fffff;
        local_6d8 = 0x3f0000003f000000;
        uStack_6d0 = 0x3f0000003f000000;
        local_1d58 = local_6c8 | 0x3f0000003f000000;
        uStack_1d50 = uStack_6c0 | 0x3f0000003f000000;
        local_508 = CONCAT44(local_868._4_4_ >> 0x17,(uint)local_868 >> 0x17);
        uStack_500 = CONCAT44(uStack_860._4_4_ >> 0x17,(uint)uStack_860 >> 0x17);
        local_518 = 0x7f0000007f;
        uStack_510 = 0x7f0000007f;
        local_2268 = ((uint)local_868 >> 0x17) - 0x7f;
        iStack_2264 = (local_868._4_4_ >> 0x17) - 0x7f;
        iStack_2260 = ((uint)uStack_860 >> 0x17) - 0x7f;
        iStack_225c = (uStack_860._4_4_ >> 0x17) - 0x7f;
        local_2248 = CONCAT44(iStack_2264,local_2268);
        uStack_2240 = CONCAT44(iStack_225c,iStack_2260);
        local_1d98 = CONCAT44((float)iStack_2264,(float)local_2268);
        uStack_1d90 = CONCAT44((float)iStack_225c,(float)iStack_2260);
        local_1da8 = 0x3f8000003f800000;
        uStack_1da0 = 0x3f8000003f800000;
        local_2298 = (float)local_2268 + 1.0;
        fStack_2294 = (float)iStack_2264 + 1.0;
        fStack_2290 = (float)iStack_2260 + 1.0;
        fStack_228c = (float)iStack_225c + 1.0;
        local_458 = 0x3f3504f33f3504f3;
        uStack_450 = 0x3f3504f33f3504f3;
        local_448._0_4_ = (float)local_1d58;
        local_448._4_4_ = (float)(local_1d58 >> 0x20);
        uStack_440._0_4_ = (float)uStack_1d50;
        uStack_440._4_4_ = (float)(uStack_1d50 >> 0x20);
        local_22a8 = -(uint)((float)local_448 < 0.70710677);
        iStack_22a4 = -(uint)(local_448._4_4_ < 0.70710677);
        iStack_22a0 = -(uint)((float)uStack_440 < 0.70710677);
        iStack_229c = -(uint)(uStack_440._4_4_ < 0.70710677);
        local_1d28 = CONCAT44(iStack_22a4,local_22a8);
        uStack_1d20 = CONCAT44(iStack_229c,iStack_22a0);
        local_22b8 = local_1d58 & local_1d28;
        uStack_22b0 = uStack_1d50 & uStack_1d20;
        local_1d68 = 0x3f8000003f800000;
        uStack_1d60 = 0x3f8000003f800000;
        local_2258 = CONCAT44(local_448._4_4_ - 1.0,(float)local_448 - 1.0);
        uStack_2250._0_4_ = (float)uStack_440 - 1.0;
        uStack_2250._4_4_ = uStack_440._4_4_ - 1.0;
        local_1d78 = CONCAT44(fStack_2294,local_2298);
        uStack_1d70 = CONCAT44(fStack_228c,fStack_2290);
        local_1d48 = CONCAT44(iStack_22a4,local_22a8);
        uStack_1d40 = CONCAT44(iStack_229c,iStack_22a0);
        local_1d38 = 0x3f8000003f800000;
        uStack_1d30 = 0x3f8000003f800000;
        uVar204 = local_1d48 & 0x3f8000003f800000;
        uVar205 = uStack_1d40 & 0x3f8000003f800000;
        local_1d88._0_4_ = (float)uVar204;
        local_1d88._4_4_ = (float)(uVar204 >> 0x20);
        uStack_1d80._0_4_ = (float)uVar205;
        uStack_1d80._4_4_ = (float)(uVar205 >> 0x20);
        local_2298 = local_2298 - (float)local_1d88;
        fStack_2294 = fStack_2294 - local_1d88._4_4_;
        fStack_2290 = fStack_2290 - (float)uStack_1d80;
        fStack_228c = fStack_228c - uStack_1d80._4_4_;
        local_1db8 = local_2258;
        uStack_1db0 = uStack_2250;
        local_1dc8._0_4_ = (float)local_22b8;
        local_1dc8._4_4_ = (float)(local_22b8 >> 0x20);
        uStack_1dc0._0_4_ = (float)uStack_22b0;
        uStack_1dc0._4_4_ = (float)(uStack_22b0 >> 0x20);
        local_1dc8._0_4_ = ((float)local_448 - 1.0) + (float)local_1dc8;
        local_1dc8._4_4_ = (local_448._4_4_ - 1.0) + local_1dc8._4_4_;
        uStack_1dc0._0_4_ = ((float)uStack_440 - 1.0) + (float)uStack_1dc0;
        uStack_1dc0._4_4_ = (uStack_440._4_4_ - 1.0) + uStack_1dc0._4_4_;
        local_2258 = CONCAT44(local_1dc8._4_4_,(float)local_1dc8);
        uStack_2250._0_4_ = (float)uStack_1dc0;
        uStack_2250._4_4_ = uStack_1dc0._4_4_;
        local_21e8 = local_2258;
        uStack_21e0 = uStack_2250;
        local_21f8 = local_2258;
        uStack_21f0 = uStack_2250;
        local_22c8 = (float)local_1dc8 * (float)local_1dc8;
        fStack_22c4 = local_1dc8._4_4_ * local_1dc8._4_4_;
        fStack_22c0 = (float)uStack_1dc0 * (float)uStack_1dc0;
        fStack_22bc = uStack_1dc0._4_4_ * uStack_1dc0._4_4_;
        local_2190 = &local_22d8;
        local_21d0 = &local_2258;
        local_1f90 = ::_ps_cephes_log_p1;
        local_1f68 = 0x3d9021bb3d9021bb;
        uStack_1f60 = 0x3d9021bb3d9021bb;
        local_1f78 = local_2258;
        uStack_1f70 = uStack_2250;
        local_1f18 = (float)local_1dc8 * 0.070376836;
        fStack_1f14 = local_1dc8._4_4_ * 0.070376836;
        fStack_1f10 = (float)uStack_1dc0 * 0.070376836;
        fStack_1f0c = uStack_1dc0._4_4_ * 0.070376836;
        local_1f28[0] = -0.1151461;
        local_1f28[1] = -0.1151461;
        afStack_1f20[0] = -0.1151461;
        afStack_1f20[1] = -0.1151461;
        local_22d8 = CONCAT44(fStack_1f14 + -0.1151461,local_1f18 + -0.1151461);
        uStack_22d0 = CONCAT44(fStack_1f0c + -0.1151461,fStack_1f10 + -0.1151461);
        local_1fd0 = ::_ps_cephes_log_p2;
        local_1fa8 = local_22d8;
        uStack_1fa0 = uStack_22d0;
        local_1fb8 = local_2258;
        uStack_1fb0 = uStack_2250;
        local_1ef8 = (local_1f18 + -0.1151461) * (float)local_1dc8;
        fStack_1ef4 = (fStack_1f14 + -0.1151461) * local_1dc8._4_4_;
        fStack_1ef0 = (fStack_1f10 + -0.1151461) * (float)uStack_1dc0;
        fStack_1eec = (fStack_1f0c + -0.1151461) * uStack_1dc0._4_4_;
        local_1f08[0] = 0.116769984;
        local_1f08[1] = 0.116769984;
        afStack_1f00[0] = 0.116769984;
        afStack_1f00[1] = 0.116769984;
        local_22d8 = CONCAT44(fStack_1ef4 + 0.116769984,local_1ef8 + 0.116769984);
        uStack_22d0 = CONCAT44(fStack_1eec + 0.116769984,fStack_1ef0 + 0.116769984);
        local_2010 = ::_ps_cephes_log_p3;
        local_1fe8 = local_22d8;
        uStack_1fe0 = uStack_22d0;
        local_1ff8 = local_2258;
        uStack_1ff0 = uStack_2250;
        local_1ed8 = (local_1ef8 + 0.116769984) * (float)local_1dc8;
        fStack_1ed4 = (fStack_1ef4 + 0.116769984) * local_1dc8._4_4_;
        fStack_1ed0 = (fStack_1ef0 + 0.116769984) * (float)uStack_1dc0;
        fStack_1ecc = (fStack_1eec + 0.116769984) * uStack_1dc0._4_4_;
        local_1ee8[0] = -0.12420141;
        local_1ee8[1] = -0.12420141;
        afStack_1ee0[0] = -0.12420141;
        afStack_1ee0[1] = -0.12420141;
        local_22d8 = CONCAT44(fStack_1ed4 + -0.12420141,local_1ed8 + -0.12420141);
        uStack_22d0 = CONCAT44(fStack_1ecc + -0.12420141,fStack_1ed0 + -0.12420141);
        local_2050 = ::_ps_cephes_log_p4;
        local_2028 = local_22d8;
        uStack_2020 = uStack_22d0;
        local_2038 = local_2258;
        uStack_2030 = uStack_2250;
        local_1eb8 = (local_1ed8 + -0.12420141) * (float)local_1dc8;
        fStack_1eb4 = (fStack_1ed4 + -0.12420141) * local_1dc8._4_4_;
        fStack_1eb0 = (fStack_1ed0 + -0.12420141) * (float)uStack_1dc0;
        fStack_1eac = (fStack_1ecc + -0.12420141) * uStack_1dc0._4_4_;
        local_1ec8[0] = 0.14249323;
        local_1ec8[1] = 0.14249323;
        afStack_1ec0[0] = 0.14249323;
        afStack_1ec0[1] = 0.14249323;
        local_22d8 = CONCAT44(fStack_1eb4 + 0.14249323,local_1eb8 + 0.14249323);
        uStack_22d0 = CONCAT44(fStack_1eac + 0.14249323,fStack_1eb0 + 0.14249323);
        local_2090 = ::_ps_cephes_log_p5;
        local_2068 = local_22d8;
        uStack_2060 = uStack_22d0;
        local_2078 = local_2258;
        uStack_2070 = uStack_2250;
        local_1e98 = (local_1eb8 + 0.14249323) * (float)local_1dc8;
        fStack_1e94 = (fStack_1eb4 + 0.14249323) * local_1dc8._4_4_;
        fStack_1e90 = (fStack_1eb0 + 0.14249323) * (float)uStack_1dc0;
        fStack_1e8c = (fStack_1eac + 0.14249323) * uStack_1dc0._4_4_;
        local_1ea8[0] = -0.16668057;
        local_1ea8[1] = -0.16668057;
        afStack_1ea0[0] = -0.16668057;
        afStack_1ea0[1] = -0.16668057;
        local_22d8 = CONCAT44(fStack_1e94 + -0.16668057,local_1e98 + -0.16668057);
        uStack_22d0 = CONCAT44(fStack_1e8c + -0.16668057,fStack_1e90 + -0.16668057);
        local_20d0 = ::_ps_cephes_log_p6;
        local_20a8 = local_22d8;
        uStack_20a0 = uStack_22d0;
        local_20b8 = local_2258;
        uStack_20b0 = uStack_2250;
        local_1e78 = (local_1e98 + -0.16668057) * (float)local_1dc8;
        fStack_1e74 = (fStack_1e94 + -0.16668057) * local_1dc8._4_4_;
        fStack_1e70 = (fStack_1e90 + -0.16668057) * (float)uStack_1dc0;
        fStack_1e6c = (fStack_1e8c + -0.16668057) * uStack_1dc0._4_4_;
        local_1e88[0] = 0.20000714;
        local_1e88[1] = 0.20000714;
        afStack_1e80[0] = 0.20000714;
        afStack_1e80[1] = 0.20000714;
        local_22d8 = CONCAT44(fStack_1e74 + 0.20000714,local_1e78 + 0.20000714);
        uStack_22d0 = CONCAT44(fStack_1e6c + 0.20000714,fStack_1e70 + 0.20000714);
        local_2110 = ::_ps_cephes_log_p7;
        local_20e8 = local_22d8;
        uStack_20e0 = uStack_22d0;
        local_20f8 = local_2258;
        uStack_20f0 = uStack_2250;
        local_1e58 = (local_1e78 + 0.20000714) * (float)local_1dc8;
        fStack_1e54 = (fStack_1e74 + 0.20000714) * local_1dc8._4_4_;
        fStack_1e50 = (fStack_1e70 + 0.20000714) * (float)uStack_1dc0;
        fStack_1e4c = (fStack_1e6c + 0.20000714) * uStack_1dc0._4_4_;
        local_1e68[0] = -0.24999994;
        local_1e68[1] = -0.24999994;
        afStack_1e60[0] = -0.24999994;
        afStack_1e60[1] = -0.24999994;
        local_22d8 = CONCAT44(fStack_1e54 + -0.24999994,local_1e58 + -0.24999994);
        uStack_22d0 = CONCAT44(fStack_1e4c + -0.24999994,fStack_1e50 + -0.24999994);
        local_2150 = ::_ps_cephes_log_p8;
        local_2128 = local_22d8;
        uStack_2120 = uStack_22d0;
        local_2138 = local_2258;
        uStack_2130 = uStack_2250;
        local_1e38 = (local_1e58 + -0.24999994) * (float)local_1dc8;
        fStack_1e34 = (fStack_1e54 + -0.24999994) * local_1dc8._4_4_;
        fStack_1e30 = (fStack_1e50 + -0.24999994) * (float)uStack_1dc0;
        fStack_1e2c = (fStack_1e4c + -0.24999994) * uStack_1dc0._4_4_;
        local_1e48[0] = 0.3333333;
        local_1e48[1] = 0.3333333;
        afStack_1e40[0] = 0.3333333;
        afStack_1e40[1] = 0.3333333;
        local_22d8 = CONCAT44(fStack_1e34 + 0.3333333,local_1e38 + 0.3333333);
        uStack_22d0 = CONCAT44(fStack_1e2c + 0.3333333,fStack_1e30 + 0.3333333);
        local_2208 = local_22d8;
        uStack_2200 = uStack_22d0;
        local_2218 = local_2258;
        uStack_2210 = uStack_2250;
        fVar173 = (local_1e38 + 0.3333333) * (float)local_1dc8;
        fVar183 = (fStack_1e34 + 0.3333333) * local_1dc8._4_4_;
        fVar191 = (fStack_1e30 + 0.3333333) * (float)uStack_1dc0;
        fVar199 = (fStack_1e2c + 0.3333333) * uStack_1dc0._4_4_;
        local_22d8 = CONCAT44(fVar183,fVar173);
        uStack_22d0 = CONCAT44(fVar199,fVar191);
        local_2238 = CONCAT44(fStack_22c4,local_22c8);
        uStack_2230 = CONCAT44(fStack_22bc,fStack_22c0);
        local_2228 = local_22d8;
        uStack_2220 = uStack_22d0;
        fVar173 = fVar173 * local_22c8;
        fVar183 = fVar183 * fStack_22c4;
        fVar191 = fVar191 * fStack_22c0;
        fVar199 = fVar199 * fStack_22bc;
        local_22d8 = CONCAT44(fVar183,fVar173);
        uStack_22d0 = CONCAT44(fVar199,fVar191);
        local_21c0 = &local_2298;
        local_2188 = ::_ps_cephes_log_q1;
        local_2168 = CONCAT44(fStack_2294,local_2298);
        uStack_2160 = CONCAT44(fStack_228c,fStack_2290);
        local_2178[0] = -0.00021219444;
        local_2178[1] = -0.00021219444;
        afStack_2170[0] = -0.00021219444;
        afStack_2170[1] = -0.00021219444;
        local_1e18 = local_2298 * -0.00021219444;
        fStack_1e14 = fStack_2294 * -0.00021219444;
        fStack_1e10 = fStack_2290 * -0.00021219444;
        fStack_1e0c = fStack_228c * -0.00021219444;
        local_1e28 = local_22d8;
        uStack_1e20 = uStack_22d0;
        fVar173 = local_1e18 + fVar173;
        fVar183 = fStack_1e14 + fVar183;
        fVar191 = fStack_1e10 + fVar191;
        fVar199 = fStack_1e0c + fVar199;
        local_22d8 = CONCAT44(fVar183,fVar173);
        uStack_22d0 = CONCAT44(fVar199,fVar191);
        local_1cd0 = &local_22c8;
        local_1cd8 = ::_ps_0p5;
        local_1c98 = local_22d8;
        uStack_1c90 = uStack_22d0;
        local_1cb8 = CONCAT44(fStack_22c4,local_22c8);
        uStack_1cb0 = CONCAT44(fStack_22bc,fStack_22c0);
        local_1cc8[0] = 0.5;
        local_1cc8[1] = 0.5;
        afStack_1cc0[0] = 0.5;
        afStack_1cc0[1] = 0.5;
        local_1ca8 = local_22c8 * 0.5;
        fStack_1ca4 = fStack_22c4 * 0.5;
        fStack_1ca0 = fStack_22c0 * 0.5;
        fStack_1c9c = fStack_22bc * 0.5;
        fVar173 = fVar173 - local_1ca8;
        fVar183 = fVar183 - fStack_1ca4;
        fVar191 = fVar191 - fStack_1ca0;
        fVar199 = fVar199 - fStack_1c9c;
        local_22d8 = CONCAT44(fVar183,fVar173);
        uStack_22d0 = CONCAT44(fVar199,fVar191);
        local_1dd8 = local_2258;
        uStack_1dd0 = uStack_2250;
        local_1de8 = local_22d8;
        uStack_1de0 = uStack_22d0;
        local_1dc8._0_4_ = (float)local_1dc8 + fVar173;
        local_1dc8._4_4_ = local_1dc8._4_4_ + fVar183;
        uStack_1dc0._0_4_ = (float)uStack_1dc0 + fVar191;
        uStack_1dc0._4_4_ = uStack_1dc0._4_4_ + fVar199;
        local_2258 = CONCAT44(local_1dc8._4_4_,(float)local_1dc8);
        uStack_2250._0_4_ = (float)uStack_1dc0;
        uStack_2250._4_4_ = uStack_1dc0._4_4_;
        local_21c8 = ::_ps_cephes_log_q2;
        local_21a8 = CONCAT44(fStack_2294,local_2298);
        uStack_21a0 = CONCAT44(fStack_228c,fStack_2290);
        local_21b8[0] = 0.6933594;
        local_21b8[1] = 0.6933594;
        afStack_21b0[0] = 0.6933594;
        afStack_21b0[1] = 0.6933594;
        local_1df8 = local_2298 * 0.6933594;
        fStack_1df4 = fStack_2294 * 0.6933594;
        fStack_1df0 = fStack_2290 * 0.6933594;
        fStack_1dec = fStack_228c * 0.6933594;
        local_1e08 = local_2258;
        uStack_1e00 = uStack_2250;
        local_2258 = CONCAT44(fStack_1df4 + local_1dc8._4_4_,local_1df8 + (float)local_1dc8);
        uStack_2250._0_4_ = fStack_1df0 + (float)uStack_1dc0;
        uStack_2250._4_4_ = fStack_1dec + uStack_1dc0._4_4_;
        local_6f8 = CONCAT44(iStack_2284,local_2288);
        uStack_6f0 = CONCAT44(iStack_227c,iStack_2280);
        local_6e8 = local_2258;
        uStack_6e0 = uStack_2250;
        local_4a98 = local_2258 | local_6f8;
        uStack_4a90 = uStack_2250 | uStack_6f0;
        uStack_2250 = uStack_4a90;
        local_2258 = local_4a98;
        local_4a4c = 0x3f800000;
        local_4a68 = 0x3f800000;
        uStack_4a64 = 0x3f800000;
        uStack_4a60 = 0x3f800000;
        uStack_4a5c = 0x3f800000;
        local_4aa8 = 0x3f8000003f800000;
        uStack_4aa0 = 0x3f8000003f800000;
        local_4a6c = 0x40000000;
        local_4a88 = 0x40000000;
        uStack_4a84 = 0x40000000;
        uStack_4a80 = 0x40000000;
        uStack_4a7c = 0x40000000;
        local_4ab8 = 0x4000000040000000;
        uStack_4ab0 = 0x4000000040000000;
        local_4a18._0_4_ = (float)local_4a98;
        local_4a18._4_4_ = (float)(local_4a98 >> 0x20);
        uStack_4a10._0_4_ = (float)uStack_4a90;
        uStack_4a10._4_4_ = (float)(uStack_4a90 >> 0x20);
        local_49f8 = (float)local_4a18 * 2.0;
        fStack_49f4 = local_4a18._4_4_ * 2.0;
        fStack_49f0 = (float)uStack_4a10 * 2.0;
        fStack_49ec = uStack_4a10._4_4_ * 2.0;
        local_49cc = 0x3f800000;
        local_49e8 = 0x3f800000;
        uStack_49e4 = 0x3f800000;
        uStack_49e0 = 0x3f800000;
        uStack_49dc = 0x3f800000;
        local_4a08 = 0x3f8000003f800000;
        uStack_4a00 = 0x3f8000003f800000;
        local_49c8 = 0;
        uStack_49c0 = 0;
        local_4598 = CONCAT44(fStack_49f4,local_49f8);
        uStack_4590 = CONCAT44(fStack_49ec,fStack_49f0);
        local_4588 = 0;
        uStack_4580 = 0;
        local_4908 = CONCAT44(0.0 - fStack_49f4,0.0 - local_49f8);
        uStack_4900._0_4_ = 0.0 - fStack_49f0;
        uStack_4900._4_4_ = 0.0 - fStack_49ec;
        local_46e8 = 0;
        uStack_46e0 = 0;
        local_4948 = 0x3f8000003f800000;
        uStack_4940 = 0x3f8000003f800000;
        local_46c8 = local_4908;
        uStack_46c0 = uStack_4900;
        local_46d8 = 0x42b0c0a542b0c0a5;
        uStack_46d0 = 0x42b0c0a542b0c0a5;
        auVar116._8_8_ = uStack_4900;
        auVar116._0_8_ = local_4908;
        auVar115._8_8_ = 0x42b0c0a542b0c0a5;
        auVar115._0_8_ = 0x42b0c0a542b0c0a5;
        auVar177 = minps(auVar116,auVar115);
        local_4908 = auVar177._0_8_;
        uStack_4900 = auVar177._8_8_;
        local_46f8 = local_4908;
        uStack_46f0 = uStack_4900;
        local_4708 = 0xc2b0c0a5c2b0c0a5;
        uStack_4700 = 0xc2b0c0a5c2b0c0a5;
        auVar114._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar114._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar177 = maxps(auVar177,auVar114);
        local_4908 = auVar177._0_8_;
        uStack_4900 = auVar177._8_8_;
        local_4898 = local_4908;
        uVar161 = local_4898;
        uStack_4890 = uStack_4900;
        uVar164 = uStack_4890;
        local_48a8 = 0x3fb8aa3b3fb8aa3b;
        uStack_48a0 = 0x3fb8aa3b3fb8aa3b;
        local_4898._0_4_ = auVar177._0_4_;
        local_4898._4_4_ = auVar177._4_4_;
        uStack_4890._0_4_ = auVar177._8_4_;
        uStack_4890._4_4_ = auVar177._12_4_;
        local_45c8 = CONCAT44(local_4898._4_4_ * 1.442695,(float)local_4898 * 1.442695);
        uStack_45c0 = CONCAT44(uStack_4890._4_4_ * 1.442695,(float)uStack_4890 * 1.442695);
        local_45d8 = 0x3f0000003f000000;
        uStack_45d0 = 0x3f0000003f000000;
        fVar173 = (float)local_4898 * 1.442695 + 0.5;
        fVar183 = local_4898._4_4_ * 1.442695 + 0.5;
        fVar191 = (float)uStack_4890 * 1.442695 + 0.5;
        fVar199 = uStack_4890._4_4_ * 1.442695 + 0.5;
        local_4548 = CONCAT44(fVar183,fVar173);
        uStack_4540 = CONCAT44(fVar199,fVar191);
        local_48f8 = CONCAT44((int)fVar183,(int)fVar173);
        uStack_48f0 = CONCAT44((int)fVar199,(int)fVar191);
        local_4928 = (float)(int)fVar173;
        fStack_4924 = (float)(int)fVar183;
        fStack_4920 = (float)(int)fVar191;
        fStack_491c = (float)(int)fVar199;
        local_4528 = CONCAT44(fStack_4924,local_4928);
        uStack_4520 = CONCAT44(fStack_491c,fStack_4920);
        local_4538 = CONCAT44(fVar183,fVar173);
        uStack_4530 = CONCAT44(fVar199,fVar191);
        local_4958 = CONCAT44(-(uint)(fVar183 < fStack_4924),-(uint)(fVar173 < local_4928));
        uStack_4950 = CONCAT44(-(uint)(fVar199 < fStack_491c),-(uint)(fVar191 < fStack_4920));
        local_4508 = local_4958;
        uStack_4500 = uStack_4950;
        local_4518 = 0x3f8000003f800000;
        uStack_4510 = 0x3f8000003f800000;
        local_4958 = local_4958 & 0x3f8000003f800000;
        uStack_4950 = uStack_4950 & 0x3f8000003f800000;
        local_45a8 = CONCAT44(fStack_4924,local_4928);
        uStack_45a0 = CONCAT44(fStack_491c,fStack_4920);
        local_45b8._0_4_ = (float)local_4958;
        local_45b8._4_4_ = (float)(local_4958 >> 0x20);
        uStack_45b0._0_4_ = (float)uStack_4950;
        uStack_45b0._4_4_ = (float)(uStack_4950 >> 0x20);
        local_4928 = local_4928 - (float)local_45b8;
        fStack_4924 = fStack_4924 - local_45b8._4_4_;
        fStack_4920 = fStack_4920 - (float)uStack_45b0;
        fStack_491c = fStack_491c - uStack_45b0._4_4_;
        local_44e0 = &local_4928;
        local_4488 = ::_ps_cephes_exp_C1;
        local_4880 = &local_4908;
        local_4448 = local_4908;
        uStack_4440 = uStack_4900;
        local_4468 = CONCAT44(fStack_4924,local_4928);
        uStack_4460 = CONCAT44(fStack_491c,fStack_4920);
        local_4478[0] = 0.6933594;
        local_4478[1] = 0.6933594;
        afStack_4470[0] = 0.6933594;
        afStack_4470[1] = 0.6933594;
        local_4458 = local_4928 * 0.6933594;
        fStack_4454 = fStack_4924 * 0.6933594;
        fStack_4450 = fStack_4920 * 0.6933594;
        fStack_444c = fStack_491c * 0.6933594;
        local_4908 = CONCAT44(local_4898._4_4_ - fStack_4454,(float)local_4898 - local_4458);
        uStack_4900._0_4_ = (float)uStack_4890 - fStack_4450;
        uStack_4900._4_4_ = uStack_4890._4_4_ - fStack_444c;
        local_44e8 = ::_ps_cephes_exp_C2;
        local_44a8 = local_4908;
        uStack_44a0 = uStack_4900;
        local_44c8 = CONCAT44(fStack_4924,local_4928);
        uStack_44c0 = CONCAT44(fStack_491c,fStack_4920);
        local_44d8[0] = -0.00021219444;
        local_44d8[1] = -0.00021219444;
        afStack_44d0[0] = -0.00021219444;
        afStack_44d0[1] = -0.00021219444;
        local_44b8 = local_4928 * -0.00021219444;
        fStack_44b4 = fStack_4924 * -0.00021219444;
        fStack_44b0 = fStack_4920 * -0.00021219444;
        fStack_44ac = fStack_491c * -0.00021219444;
        fVar173 = ((float)local_4898 - local_4458) - local_44b8;
        fVar183 = (local_4898._4_4_ - fStack_4454) - fStack_44b4;
        fVar191 = ((float)uStack_4890 - fStack_4450) - fStack_44b0;
        fVar199 = (uStack_4890._4_4_ - fStack_444c) - fStack_44ac;
        local_4908 = CONCAT44(fVar183,fVar173);
        uStack_4900._0_4_ = fVar191;
        uStack_4900._4_4_ = fVar199;
        local_48b8 = local_4908;
        uStack_48b0 = uStack_4900;
        local_48c8 = local_4908;
        uStack_48c0 = uStack_4900;
        local_4918 = fVar173 * fVar173;
        fStack_4914 = fVar183 * fVar183;
        fStack_4910 = fVar191 * fVar191;
        fStack_490c = fVar199 * fVar199;
        local_4870 = &local_4968;
        local_4740 = ::_ps_cephes_exp_p1;
        local_4718 = 0x3950696739506967;
        uStack_4710 = 0x3950696739506967;
        local_4728 = local_4908;
        uStack_4720 = uStack_4900;
        local_46a8 = fVar173 * 0.00019875691;
        fStack_46a4 = fVar183 * 0.00019875691;
        fStack_46a0 = fVar191 * 0.00019875691;
        fStack_469c = fVar199 * 0.00019875691;
        local_46b8[0] = 0.0013981999;
        local_46b8[1] = 0.0013981999;
        afStack_46b0[0] = 0.0013981999;
        afStack_46b0[1] = 0.0013981999;
        local_4968 = CONCAT44(fStack_46a4 + 0.0013981999,local_46a8 + 0.0013981999);
        uStack_4960 = CONCAT44(fStack_469c + 0.0013981999,fStack_46a0 + 0.0013981999);
        local_4780 = ::_ps_cephes_exp_p2;
        local_4758 = local_4968;
        uStack_4750 = uStack_4960;
        local_4768 = local_4908;
        uStack_4760 = uStack_4900;
        local_4688 = (local_46a8 + 0.0013981999) * fVar173;
        fStack_4684 = (fStack_46a4 + 0.0013981999) * fVar183;
        fStack_4680 = (fStack_46a0 + 0.0013981999) * fVar191;
        fStack_467c = (fStack_469c + 0.0013981999) * fVar199;
        local_4698[0] = 0.008333452;
        local_4698[1] = 0.008333452;
        afStack_4690[0] = 0.008333452;
        afStack_4690[1] = 0.008333452;
        local_4968 = CONCAT44(fStack_4684 + 0.008333452,local_4688 + 0.008333452);
        uStack_4960 = CONCAT44(fStack_467c + 0.008333452,fStack_4680 + 0.008333452);
        local_47c0 = ::_ps_cephes_exp_p3;
        local_4798 = local_4968;
        uStack_4790 = uStack_4960;
        local_47a8 = local_4908;
        uStack_47a0 = uStack_4900;
        local_4668 = (local_4688 + 0.008333452) * fVar173;
        fStack_4664 = (fStack_4684 + 0.008333452) * fVar183;
        fStack_4660 = (fStack_4680 + 0.008333452) * fVar191;
        fStack_465c = (fStack_467c + 0.008333452) * fVar199;
        local_4678[0] = 0.041665796;
        local_4678[1] = 0.041665796;
        afStack_4670[0] = 0.041665796;
        afStack_4670[1] = 0.041665796;
        local_4968 = CONCAT44(fStack_4664 + 0.041665796,local_4668 + 0.041665796);
        uStack_4960 = CONCAT44(fStack_465c + 0.041665796,fStack_4660 + 0.041665796);
        local_4800 = ::_ps_cephes_exp_p4;
        local_47d8 = local_4968;
        uStack_47d0 = uStack_4960;
        local_47e8 = local_4908;
        uStack_47e0 = uStack_4900;
        local_4648 = (local_4668 + 0.041665796) * fVar173;
        fStack_4644 = (fStack_4664 + 0.041665796) * fVar183;
        fStack_4640 = (fStack_4660 + 0.041665796) * fVar191;
        fStack_463c = (fStack_465c + 0.041665796) * fVar199;
        local_4658[0] = 0.16666666;
        local_4658[1] = 0.16666666;
        afStack_4650[0] = 0.16666666;
        afStack_4650[1] = 0.16666666;
        local_4968 = CONCAT44(fStack_4644 + 0.16666666,local_4648 + 0.16666666);
        uStack_4960 = CONCAT44(fStack_463c + 0.16666666,fStack_4640 + 0.16666666);
        local_4840 = ::_ps_cephes_exp_p5;
        local_4818 = local_4968;
        uStack_4810 = uStack_4960;
        local_4828 = local_4908;
        uStack_4820 = uStack_4900;
        local_4628 = (local_4648 + 0.16666666) * fVar173;
        fStack_4624 = (fStack_4644 + 0.16666666) * fVar183;
        fStack_4620 = (fStack_4640 + 0.16666666) * fVar191;
        fStack_461c = (fStack_463c + 0.16666666) * fVar199;
        local_4638[0] = 0.5;
        local_4638[1] = 0.5;
        afStack_4630[0] = 0.5;
        afStack_4630[1] = 0.5;
        local_4968 = CONCAT44(fStack_4624 + 0.5,local_4628 + 0.5);
        uStack_4960 = CONCAT44(fStack_461c + 0.5,fStack_4620 + 0.5);
        local_4878 = &local_4918;
        local_4858 = local_4968;
        uStack_4850 = uStack_4960;
        local_4868 = CONCAT44(fStack_4914,local_4918);
        uStack_4860 = CONCAT44(fStack_490c,fStack_4910);
        local_4608 = (local_4628 + 0.5) * local_4918;
        fStack_4604 = (fStack_4624 + 0.5) * fStack_4914;
        fStack_4600 = (fStack_4620 + 0.5) * fStack_4910;
        fStack_45fc = (fStack_461c + 0.5) * fStack_490c;
        local_4618 = local_4908;
        uStack_4610 = uStack_4900;
        local_4968 = CONCAT44(fStack_4604 + fVar183,local_4608 + fVar173);
        uStack_4960 = CONCAT44(fStack_45fc + fVar199,fStack_4600 + fVar191);
        local_45e8 = local_4968;
        uStack_45e0 = uStack_4960;
        local_45f8 = 0x3f8000003f800000;
        uStack_45f0 = 0x3f8000003f800000;
        local_4998 = local_4608 + fVar173 + 1.0;
        fStack_4994 = fStack_4604 + fVar183 + 1.0;
        fStack_4990 = fStack_4600 + fVar191 + 1.0;
        fStack_498c = fStack_45fc + fVar199 + 1.0;
        local_4968 = CONCAT44(fStack_4994,local_4998);
        uStack_4960 = CONCAT44(fStack_498c,fStack_4990);
        local_4558 = CONCAT44(fStack_4924,local_4928);
        uStack_4550 = CONCAT44(fStack_491c,fStack_4920);
        local_4428 = CONCAT44((int)fStack_4924,(int)local_4928);
        uStack_4420 = CONCAT44((int)fStack_491c,(int)fStack_4920);
        local_4438 = 0x7f0000007f;
        uStack_4430 = 0x7f0000007f;
        iVar203 = (int)local_4928 + 0x7f;
        fStack_4934 = (float)((int)fStack_4924 + 0x7f);
        fStack_4930 = (float)((int)fStack_4920 + 0x7f);
        fStack_492c = (float)((int)fStack_491c + 0x7f);
        local_4408 = CONCAT44(fStack_4934,iVar203);
        uStack_4400 = CONCAT44(fStack_492c,fStack_4930);
        local_440c = 0x17;
        local_4938 = (float)(iVar203 * 0x800000);
        local_4978 = CONCAT44(fStack_4934,local_4938);
        uStack_4970 = CONCAT44(fStack_492c,fStack_4930);
        local_48d8 = local_4968;
        uStack_48d0 = uStack_4960;
        local_4998 = local_4998 * local_4938;
        fStack_4994 = fStack_4994 * fStack_4934;
        fStack_4990 = fStack_4990 * fStack_4930;
        fStack_498c = fStack_498c * fStack_492c;
        local_4968 = CONCAT44(fStack_4994,local_4998);
        uStack_4960 = CONCAT44(fStack_498c,fStack_4990);
        local_49b8 = local_4968;
        uStack_49b0 = uStack_4960;
        local_4998 = local_4998 + 1.0;
        fStack_4994 = fStack_4994 + 1.0;
        fStack_4990 = fStack_4990 + 1.0;
        fStack_498c = fStack_498c + 1.0;
        auVar113._8_8_ = 0x3f8000003f800000;
        auVar113._0_8_ = 0x3f8000003f800000;
        auVar112._4_4_ = fStack_4994;
        auVar112._0_4_ = local_4998;
        auVar112._8_4_ = fStack_4990;
        auVar112._12_4_ = fStack_498c;
        _local_4a38 = divps(auVar113,auVar112);
        local_4568 = (float)local_4a38._0_4_ * 2.0;
        fStack_4564 = (float)local_4a38._4_4_ * 2.0;
        fStack_4560 = fStack_4a30 * 2.0;
        fStack_455c = fStack_4a2c * 2.0;
        local_a578 = local_4568 - 1.0;
        fStack_a574 = fStack_4564 - 1.0;
        fStack_a570 = fStack_4560 - 1.0;
        fStack_a56c = fStack_455c - 1.0;
        local_a568 = local_c0a8;
        uStack_a560 = uStack_c0a0;
        local_ba08._4_4_ = local_9c18._4_4_ * fStack_a574;
        local_ba08._0_4_ = (float)local_9c18 * local_a578;
        uStack_ba00._0_4_ = (float)uStack_9c10 * fStack_a570;
        uStack_ba00._4_4_ = uStack_9c10._4_4_ * fStack_a56c;
        local_9228 = local_92b8;
        uStack_9220 = uStack_92b0;
        local_91d8 = uVar5;
        uStack_91d0 = uVar6;
        local_9178 = local_91c0;
        local_9170 = local_91b0;
        local_9138 = local_91c0;
        local_9130 = local_91b0;
        local_90f8 = local_91c0;
        local_90f0 = local_91b0;
        local_90b8 = local_91c0;
        local_90b0 = local_91b0;
        local_9078 = local_91c0;
        local_9070 = local_91b0;
        local_6c18 = local_9298;
        uStack_6c10 = uStack_9290;
        local_5e90 = local_91c0;
        local_5e30 = local_91c0;
        local_5e20 = local_5e80;
        local_58c8 = local_92b8;
        uStack_58c0 = uStack_92b0;
        local_4a48 = local_4ab8;
        uStack_4a40 = uStack_4ab0;
        local_4a28 = local_4ab8;
        uStack_4a20 = uStack_4ab0;
        local_4a18 = local_4a98;
        uStack_4a10 = uStack_4a90;
        local_49a8 = local_4a08;
        uStack_49a0 = uStack_4a00;
        local_4988 = local_4a08;
        uStack_4980 = uStack_4a00;
        local_48e8 = local_4978;
        uStack_48e0 = uStack_4970;
        local_4898 = uVar161;
        uStack_4890 = uVar164;
        local_4838 = local_4880;
        local_4830 = local_4870;
        local_47f8 = local_4880;
        local_47f0 = local_4870;
        local_47b8 = local_4880;
        local_47b0 = local_4870;
        local_4778 = local_4880;
        local_4770 = local_4870;
        local_4738 = local_4880;
        local_4730 = local_4870;
        local_45b8 = local_4958;
        uStack_45b0 = uStack_4950;
        local_4578 = local_4aa8;
        uStack_4570 = uStack_4aa0;
        local_44f0 = local_4880;
        local_4490 = local_4880;
        local_4480 = local_44e0;
        local_43f8 = local_4978;
        uStack_43f0 = uStack_4970;
        local_2180 = local_21c0;
        local_2148 = local_21d0;
        local_2140 = local_2190;
        local_2108 = local_21d0;
        local_2100 = local_2190;
        local_20c8 = local_21d0;
        local_20c0 = local_2190;
        local_2088 = local_21d0;
        local_2080 = local_2190;
        local_2048 = local_21d0;
        local_2040 = local_2190;
        local_2008 = local_21d0;
        local_2000 = local_2190;
        local_1fc8 = local_21d0;
        local_1fc0 = local_2190;
        local_1f88 = local_21d0;
        local_1f80 = local_2190;
        local_1dc8 = local_22b8;
        uStack_1dc0 = uStack_22b0;
        local_1d88 = uVar204;
        uStack_1d80 = uVar205;
        local_1d18 = local_1d58;
        uStack_1d10 = uStack_1d50;
        local_1ce0 = local_2190;
        local_868 = uVar166;
        uStack_860 = uVar167;
        local_448 = local_1d58;
        uStack_440 = uStack_1d50;
        break;
      case 6:
        local_b9e8 = 0;
        local_b988 = *(float *)*in_stack_00000008;
        local_ba58 = CONCAT44(local_b988,local_b988);
        uStack_ba50 = CONCAT44(local_b988,local_b988);
        local_b9f8 = 1;
        local_b9a8 = *(float *)(*in_stack_00000008 + 4);
        local_ba68 = CONCAT44(local_b9a8,local_b9a8);
        uStack_ba60 = CONCAT44(local_b9a8,local_b9a8);
        local_a1b8 = local_c0a8;
        uStack_a1b0 = uStack_c0a0;
        local_a18c = 0x3f800000;
        local_a1a8 = 0x3f800000;
        uStack_a1a4 = 0x3f800000;
        uStack_a1a0 = 0x3f800000;
        uStack_a19c = 0x3f800000;
        local_a1e8 = 0x3f8000003f800000;
        uStack_a1e0 = 0x3f8000003f800000;
        local_a158 = local_c0a8;
        uStack_a150 = uStack_c0a0;
        local_9ec8 = (float)local_9c18 * local_b988;
        fStack_9ec4 = local_9c18._4_4_ * local_b988;
        fStack_9ec0 = (float)uStack_9c10 * local_b988;
        fStack_9ebc = uStack_9c10._4_4_ * local_b988;
        local_a1d8._4_4_ = fStack_9ec4 + local_b9a8;
        local_a1d8._0_4_ = local_9ec8 + local_b9a8;
        uStack_a1d0._0_4_ = fStack_9ec0 + local_b9a8;
        uStack_a1d0._4_4_ = fStack_9ebc + local_b9a8;
        local_a128 = 0;
        uStack_a120 = 0;
        local_a138 = local_a1d8;
        uStack_a130 = uStack_a1d0;
        local_a148 = 0;
        uStack_a140 = 0;
        auVar177._8_8_ = uStack_a1d0;
        auVar177._0_8_ = local_a1d8;
        auVar177 = maxps(auVar177,ZEXT816(0));
        local_a1d8 = auVar177._0_8_;
        uStack_a1d0 = auVar177._8_8_;
        local_a108 = local_a1d8;
        uStack_a100 = uStack_a1d0;
        auVar49._8_8_ = 0x3f8000003f800000;
        auVar49._0_8_ = 0x3f8000003f800000;
        _local_a1d8 = minps(auVar177,auVar49);
        local_a178 = local_a1d8;
        uVar5 = local_a178;
        uStack_a170 = uStack_a1d0;
        uVar6 = uStack_a170;
        local_a188 = local_c0a8;
        uStack_a180 = uStack_c0a0;
        local_a178._0_4_ = local_a1d8._0_4_;
        local_a178._4_4_ = local_a1d8._4_4_;
        uStack_a170._0_4_ = local_a1d8._8_4_;
        uStack_a170._4_4_ = local_a1d8._12_4_;
        local_ba08._4_4_ = local_a178._4_4_ * local_9c18._4_4_;
        local_ba08._0_4_ = (float)local_a178 * (float)local_9c18;
        uStack_ba00._0_4_ = (float)uStack_a170 * (float)uStack_9c10;
        uStack_ba00._4_4_ = uStack_a170._4_4_ * uStack_9c10._4_4_;
        fStack_b9a4 = local_b9a8;
        fStack_b9a0 = local_b9a8;
        fStack_b99c = local_b9a8;
        local_b98c = local_b9a8;
        fStack_b984 = local_b988;
        fStack_b980 = local_b988;
        fStack_b97c = local_b988;
        local_b96c = local_b988;
        local_a1c8 = local_ba58;
        uStack_a1c0 = uStack_ba50;
        local_a178 = uVar5;
        uStack_a170 = uVar6;
        local_a168 = local_ba58;
        uStack_a160 = uStack_ba50;
        local_a118 = local_a1e8;
        uStack_a110 = uStack_a1e0;
        local_9ed8 = local_ba68;
        uStack_9ed0 = uStack_ba60;
        break;
      default:
        uStack_ba00 = uStack_c0a0;
        local_ba08 = (undefined1  [8])local_c0a8;
      }
      local_bb58 = local_c0b8;
      uStack_bb50 = uStack_c0b0;
      switch(in_R9D) {
      case 1:
        local_ae98 = 0;
        uStack_ae90 = 0;
        local_af48 = local_c0b8;
        uStack_af40 = uStack_c0b0;
        local_af58 = 0;
        uStack_af50 = 0;
        auVar19._8_8_ = uStack_c0b0;
        auVar19._0_8_ = local_c0b8;
        _local_bb48 = maxps(auVar19,ZEXT816(0));
        break;
      case 2:
        local_baf8 = 0;
        local_ab4c = *(float *)*in_stack_00000008;
        local_ab48 = local_c0b8;
        uStack_ab40 = uStack_c0b0;
        local_aac8 = 0;
        uStack_aac0 = 0;
        local_aae8 = 0;
        uStack_aae0 = 0;
        local_aaf8 = local_c0b8;
        uStack_aaf0 = uStack_c0b0;
        auVar29._8_8_ = uStack_c0b0;
        auVar29._0_8_ = local_c0b8;
        local_ab68 = maxps(ZEXT816(0),auVar29);
        local_aad8 = 0;
        uStack_aad0 = 0;
        local_a9c8 = 0;
        uStack_a9c0 = 0;
        local_a9d8 = local_c0b8;
        uStack_a9d0 = uStack_c0b0;
        auVar32._8_8_ = uStack_c0b0;
        auVar32._0_8_ = local_c0b8;
        local_ab78 = minps(ZEXT816(0),auVar32);
        local_ab08 = CONCAT44(local_ab4c,local_ab4c);
        uStack_ab00 = CONCAT44(local_ab4c,local_ab4c);
        local_ab18 = local_ab78._0_8_;
        uVar5 = local_ab18;
        uStack_ab10 = local_ab78._8_8_;
        uVar6 = uStack_ab10;
        local_ab18._0_4_ = local_ab78._0_4_;
        local_ab18._4_4_ = local_ab78._4_4_;
        uStack_ab10._0_4_ = local_ab78._8_4_;
        uStack_ab10._4_4_ = local_ab78._12_4_;
        local_9cb8 = local_ab4c * (float)local_ab18;
        fStack_9cb4 = local_ab4c * local_ab18._4_4_;
        fStack_9cb0 = local_ab4c * (float)uStack_ab10;
        fStack_9cac = local_ab4c * uStack_ab10._4_4_;
        local_9ca8 = local_ab68._0_8_;
        uVar161 = local_9ca8;
        uStack_9ca0 = local_ab68._8_8_;
        uVar164 = uStack_9ca0;
        local_9ca8._0_4_ = local_ab68._0_4_;
        local_9ca8._4_4_ = local_ab68._4_4_;
        uStack_9ca0._0_4_ = local_ab68._8_4_;
        uStack_9ca0._4_4_ = local_ab68._12_4_;
        local_bb48._4_4_ = local_9ca8._4_4_ + fStack_9cb4;
        local_bb48._0_4_ = (float)local_9ca8 + local_9cb8;
        uStack_bb40._0_4_ = (float)uStack_9ca0 + fStack_9cb0;
        uStack_bb40._4_4_ = uStack_9ca0._4_4_ + fStack_9cac;
        local_ab38 = local_ab4c;
        fStack_ab34 = local_ab4c;
        fStack_ab30 = local_ab4c;
        fStack_ab2c = local_ab4c;
        local_ab28 = local_ab4c;
        local_ab18 = uVar5;
        uStack_ab10 = uVar6;
        local_9ca8 = uVar161;
        uStack_9ca0 = uVar164;
        break;
      case 3:
        local_bb08 = 0;
        local_ba88 = *(undefined4 *)*in_stack_00000008;
        local_bb78 = CONCAT44(local_ba88,local_ba88);
        uStack_bb70 = CONCAT44(local_ba88,local_ba88);
        local_bb18 = 1;
        local_baa8 = *(undefined4 *)(*in_stack_00000008 + 4);
        local_bb88 = CONCAT44(local_baa8,local_baa8);
        uStack_bb80 = CONCAT44(local_baa8,local_baa8);
        local_af28 = local_c0b8;
        uStack_af20 = uStack_c0b0;
        auVar21._8_8_ = uStack_c0b0;
        auVar21._0_8_ = local_c0b8;
        auVar20._8_8_ = uStack_bb70;
        auVar20._0_8_ = local_bb78;
        local_a8a8 = maxps(auVar21,auVar20);
        auVar41._8_8_ = uStack_bb80;
        auVar41._0_8_ = local_bb88;
        _local_bb48 = minps(local_a8a8,auVar41);
        uStack_baa4 = local_baa8;
        uStack_baa0 = local_baa8;
        uStack_ba9c = local_baa8;
        local_ba98 = local_baa8;
        uStack_ba84 = local_ba88;
        uStack_ba80 = local_ba88;
        uStack_ba7c = local_ba88;
        local_ba6c = local_ba88;
        local_af38 = local_bb78;
        uStack_af30 = uStack_bb70;
        local_a8b8 = local_bb88;
        uStack_a8b0 = uStack_bb80;
        break;
      case 4:
        local_a728 = local_c0b8;
        uStack_a720 = uStack_c0b0;
        local_a6fc = 0x3f800000;
        local_a718 = 0x3f800000;
        uStack_a714 = 0x3f800000;
        uStack_a710 = 0x3f800000;
        uStack_a70c = 0x3f800000;
        local_a738 = 0x3f8000003f800000;
        uStack_a730 = 0x3f8000003f800000;
        local_a6f8 = 0;
        uStack_a6f0 = 0;
        local_6b88 = 0;
        uStack_6b80 = 0;
        local_6b98 = local_c0b8;
        uStack_6b90 = uStack_c0b0;
        local_7f88 = CONCAT44(0.0 - local_9bf8._4_4_,0.0 - (float)local_9bf8);
        uStack_7f80._0_4_ = 0.0 - (float)uStack_9bf0;
        uStack_7f80._4_4_ = 0.0 - uStack_9bf0._4_4_;
        local_7d68 = 0;
        uStack_7d60 = 0;
        local_7fc8 = 0x3f8000003f800000;
        uStack_7fc0 = 0x3f8000003f800000;
        local_7d48 = local_7f88;
        uStack_7d40 = uStack_7f80;
        local_7d58 = 0x42b0c0a542b0c0a5;
        uStack_7d50 = 0x42b0c0a542b0c0a5;
        auVar89._8_8_ = uStack_7f80;
        auVar89._0_8_ = local_7f88;
        auVar88._8_8_ = 0x42b0c0a542b0c0a5;
        auVar88._0_8_ = 0x42b0c0a542b0c0a5;
        auVar177 = minps(auVar89,auVar88);
        local_7f88 = auVar177._0_8_;
        uStack_7f80 = auVar177._8_8_;
        local_7d78 = local_7f88;
        uStack_7d70 = uStack_7f80;
        local_7d88 = 0xc2b0c0a5c2b0c0a5;
        uStack_7d80 = 0xc2b0c0a5c2b0c0a5;
        auVar87._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar87._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar177 = maxps(auVar177,auVar87);
        local_7f88 = auVar177._0_8_;
        uStack_7f80 = auVar177._8_8_;
        local_7f18 = local_7f88;
        uVar5 = local_7f18;
        uStack_7f10 = uStack_7f80;
        uVar6 = uStack_7f10;
        local_7f28 = 0x3fb8aa3b3fb8aa3b;
        uStack_7f20 = 0x3fb8aa3b3fb8aa3b;
        local_7f18._0_4_ = auVar177._0_4_;
        local_7f18._4_4_ = auVar177._4_4_;
        uStack_7f10._0_4_ = auVar177._8_4_;
        uStack_7f10._4_4_ = auVar177._12_4_;
        local_7c48 = CONCAT44(local_7f18._4_4_ * 1.442695,(float)local_7f18 * 1.442695);
        uStack_7c40 = CONCAT44(uStack_7f10._4_4_ * 1.442695,(float)uStack_7f10 * 1.442695);
        local_7c58 = 0x3f0000003f000000;
        uStack_7c50 = 0x3f0000003f000000;
        fVar173 = (float)local_7f18 * 1.442695 + 0.5;
        fVar183 = local_7f18._4_4_ * 1.442695 + 0.5;
        fVar191 = (float)uStack_7f10 * 1.442695 + 0.5;
        fVar199 = uStack_7f10._4_4_ * 1.442695 + 0.5;
        local_6a68 = CONCAT44(fVar183,fVar173);
        uStack_6a60 = CONCAT44(fVar199,fVar191);
        local_7f78 = CONCAT44((int)fVar183,(int)fVar173);
        uStack_7f70 = CONCAT44((int)fVar199,(int)fVar191);
        local_7fa8 = (float)(int)fVar173;
        fStack_7fa4 = (float)(int)fVar183;
        fStack_7fa0 = (float)(int)fVar191;
        fStack_7f9c = (float)(int)fVar199;
        local_7f98 = CONCAT44(fStack_7fa4,local_7fa8);
        uStack_7f90 = CONCAT44(fStack_7f9c,fStack_7fa0);
        local_6898 = CONCAT44(fVar183,fVar173);
        uStack_6890 = CONCAT44(fVar199,fVar191);
        local_6888 = local_7f98;
        uStack_6880 = uStack_7f90;
        local_7fd8 = CONCAT44(-(uint)(fVar183 < fStack_7fa4),-(uint)(fVar173 < local_7fa8));
        uStack_7fd0 = CONCAT44(-(uint)(fVar199 < fStack_7f9c),-(uint)(fVar191 < fStack_7fa0));
        local_6708 = local_7fd8;
        uStack_6700 = uStack_7fd0;
        local_6718 = 0x3f8000003f800000;
        uStack_6710 = 0x3f8000003f800000;
        local_7fd8 = local_7fd8 & 0x3f8000003f800000;
        uStack_7fd0 = uStack_7fd0 & 0x3f8000003f800000;
        local_6ca8 = local_7f98;
        uStack_6ca0 = uStack_7f90;
        local_6cb8._0_4_ = (float)local_7fd8;
        local_6cb8._4_4_ = (float)(local_7fd8 >> 0x20);
        uStack_6cb0._0_4_ = (float)uStack_7fd0;
        uStack_6cb0._4_4_ = (float)(uStack_7fd0 >> 0x20);
        local_7fa8 = local_7fa8 - (float)local_6cb8;
        fStack_7fa4 = fStack_7fa4 - local_6cb8._4_4_;
        fStack_7fa0 = fStack_7fa0 - (float)uStack_6cb0;
        fStack_7f9c = fStack_7f9c - uStack_6cb0._4_4_;
        local_6240 = &local_7fa8;
        local_61e8 = ::_ps_cephes_exp_C1;
        local_7f00 = &local_7f88;
        local_61a8 = local_7f88;
        uStack_61a0 = uStack_7f80;
        local_61c8 = CONCAT44(fStack_7fa4,local_7fa8);
        uStack_61c0 = CONCAT44(fStack_7f9c,fStack_7fa0);
        local_61d8[0] = 0.6933594;
        local_61d8[1] = 0.6933594;
        afStack_61d0[0] = 0.6933594;
        afStack_61d0[1] = 0.6933594;
        local_61b8 = local_7fa8 * 0.6933594;
        fStack_61b4 = fStack_7fa4 * 0.6933594;
        fStack_61b0 = fStack_7fa0 * 0.6933594;
        fStack_61ac = fStack_7f9c * 0.6933594;
        local_7f88 = CONCAT44(local_7f18._4_4_ - fStack_61b4,(float)local_7f18 - local_61b8);
        uStack_7f80._0_4_ = (float)uStack_7f10 - fStack_61b0;
        uStack_7f80._4_4_ = uStack_7f10._4_4_ - fStack_61ac;
        local_6248 = ::_ps_cephes_exp_C2;
        local_6208 = local_7f88;
        uStack_6200 = uStack_7f80;
        local_6228 = CONCAT44(fStack_7fa4,local_7fa8);
        uStack_6220 = CONCAT44(fStack_7f9c,fStack_7fa0);
        local_6238[0] = -0.00021219444;
        local_6238[1] = -0.00021219444;
        afStack_6230[0] = -0.00021219444;
        afStack_6230[1] = -0.00021219444;
        local_6218 = local_7fa8 * -0.00021219444;
        fStack_6214 = fStack_7fa4 * -0.00021219444;
        fStack_6210 = fStack_7fa0 * -0.00021219444;
        fStack_620c = fStack_7f9c * -0.00021219444;
        fVar173 = ((float)local_7f18 - local_61b8) - local_6218;
        fVar183 = (local_7f18._4_4_ - fStack_61b4) - fStack_6214;
        fVar191 = ((float)uStack_7f10 - fStack_61b0) - fStack_6210;
        fVar199 = (uStack_7f10._4_4_ - fStack_61ac) - fStack_620c;
        local_7f88 = CONCAT44(fVar183,fVar173);
        uStack_7f80._0_4_ = fVar191;
        uStack_7f80._4_4_ = fVar199;
        local_7f38 = local_7f88;
        uStack_7f30 = uStack_7f80;
        local_7f48 = local_7f88;
        uStack_7f40 = uStack_7f80;
        local_7f98 = CONCAT44(fVar183 * fVar183,fVar173 * fVar173);
        uStack_7f90 = CONCAT44(fVar199 * fVar199,fVar191 * fVar191);
        local_7ef0 = &local_7fe8;
        local_7dc0 = ::_ps_cephes_exp_p1;
        local_7d98 = 0x3950696739506967;
        uStack_7d90 = 0x3950696739506967;
        local_7da8 = local_7f88;
        uStack_7da0 = uStack_7f80;
        local_7d28 = fVar173 * 0.00019875691;
        fStack_7d24 = fVar183 * 0.00019875691;
        fStack_7d20 = fVar191 * 0.00019875691;
        fStack_7d1c = fVar199 * 0.00019875691;
        local_7d38[0] = 0.0013981999;
        local_7d38[1] = 0.0013981999;
        afStack_7d30[0] = 0.0013981999;
        afStack_7d30[1] = 0.0013981999;
        local_7fe8 = CONCAT44(fStack_7d24 + 0.0013981999,local_7d28 + 0.0013981999);
        uStack_7fe0 = CONCAT44(fStack_7d1c + 0.0013981999,fStack_7d20 + 0.0013981999);
        local_7e00 = ::_ps_cephes_exp_p2;
        local_7dd8 = local_7fe8;
        uStack_7dd0 = uStack_7fe0;
        local_7de8 = local_7f88;
        uStack_7de0 = uStack_7f80;
        local_7d08 = (local_7d28 + 0.0013981999) * fVar173;
        fStack_7d04 = (fStack_7d24 + 0.0013981999) * fVar183;
        fStack_7d00 = (fStack_7d20 + 0.0013981999) * fVar191;
        fStack_7cfc = (fStack_7d1c + 0.0013981999) * fVar199;
        local_7d18[0] = 0.008333452;
        local_7d18[1] = 0.008333452;
        afStack_7d10[0] = 0.008333452;
        afStack_7d10[1] = 0.008333452;
        local_7fe8 = CONCAT44(fStack_7d04 + 0.008333452,local_7d08 + 0.008333452);
        uStack_7fe0 = CONCAT44(fStack_7cfc + 0.008333452,fStack_7d00 + 0.008333452);
        local_7e40 = ::_ps_cephes_exp_p3;
        local_7e18 = local_7fe8;
        uStack_7e10 = uStack_7fe0;
        local_7e28 = local_7f88;
        uStack_7e20 = uStack_7f80;
        local_7ce8 = (local_7d08 + 0.008333452) * fVar173;
        fStack_7ce4 = (fStack_7d04 + 0.008333452) * fVar183;
        fStack_7ce0 = (fStack_7d00 + 0.008333452) * fVar191;
        fStack_7cdc = (fStack_7cfc + 0.008333452) * fVar199;
        local_7cf8[0] = 0.041665796;
        local_7cf8[1] = 0.041665796;
        afStack_7cf0[0] = 0.041665796;
        afStack_7cf0[1] = 0.041665796;
        local_7fe8 = CONCAT44(fStack_7ce4 + 0.041665796,local_7ce8 + 0.041665796);
        uStack_7fe0 = CONCAT44(fStack_7cdc + 0.041665796,fStack_7ce0 + 0.041665796);
        local_7e80 = ::_ps_cephes_exp_p4;
        local_7e58 = local_7fe8;
        uStack_7e50 = uStack_7fe0;
        local_7e68 = local_7f88;
        uStack_7e60 = uStack_7f80;
        local_7cc8 = (local_7ce8 + 0.041665796) * fVar173;
        fStack_7cc4 = (fStack_7ce4 + 0.041665796) * fVar183;
        fStack_7cc0 = (fStack_7ce0 + 0.041665796) * fVar191;
        fStack_7cbc = (fStack_7cdc + 0.041665796) * fVar199;
        local_7cd8[0] = 0.16666666;
        local_7cd8[1] = 0.16666666;
        afStack_7cd0[0] = 0.16666666;
        afStack_7cd0[1] = 0.16666666;
        local_7fe8 = CONCAT44(fStack_7cc4 + 0.16666666,local_7cc8 + 0.16666666);
        uStack_7fe0 = CONCAT44(fStack_7cbc + 0.16666666,fStack_7cc0 + 0.16666666);
        local_7ec0 = ::_ps_cephes_exp_p5;
        local_7e98 = local_7fe8;
        uStack_7e90 = uStack_7fe0;
        local_7ea8 = local_7f88;
        uStack_7ea0 = uStack_7f80;
        local_7ca8 = (local_7cc8 + 0.16666666) * fVar173;
        fStack_7ca4 = (fStack_7cc4 + 0.16666666) * fVar183;
        fStack_7ca0 = (fStack_7cc0 + 0.16666666) * fVar191;
        fStack_7c9c = (fStack_7cbc + 0.16666666) * fVar199;
        local_7cb8[0] = 0.5;
        local_7cb8[1] = 0.5;
        afStack_7cb0[0] = 0.5;
        afStack_7cb0[1] = 0.5;
        local_7fe8 = CONCAT44(fStack_7ca4 + 0.5,local_7ca8 + 0.5);
        uStack_7fe0 = CONCAT44(fStack_7c9c + 0.5,fStack_7ca0 + 0.5);
        local_7ef8 = &local_7f98;
        local_7ed8 = local_7fe8;
        uStack_7ed0 = uStack_7fe0;
        local_7ee8 = local_7f98;
        uStack_7ee0 = uStack_7f90;
        local_7c88 = (local_7ca8 + 0.5) * fVar173 * fVar173;
        fStack_7c84 = (fStack_7ca4 + 0.5) * fVar183 * fVar183;
        fStack_7c80 = (fStack_7ca0 + 0.5) * fVar191 * fVar191;
        fStack_7c7c = (fStack_7c9c + 0.5) * fVar199 * fVar199;
        local_7c98 = local_7f88;
        uStack_7c90 = uStack_7f80;
        local_7fe8 = CONCAT44(fStack_7c84 + fVar183,local_7c88 + fVar173);
        uStack_7fe0 = CONCAT44(fStack_7c7c + fVar199,fStack_7c80 + fVar191);
        local_7c68 = local_7fe8;
        uStack_7c60 = uStack_7fe0;
        local_7c78 = 0x3f8000003f800000;
        uStack_7c70 = 0x3f8000003f800000;
        local_9ad8 = local_7c88 + fVar173 + 1.0;
        fStack_9ad4 = fStack_7c84 + fVar183 + 1.0;
        fStack_9ad0 = fStack_7c80 + fVar191 + 1.0;
        fStack_9acc = fStack_7c7c + fVar199 + 1.0;
        local_7fe8 = CONCAT44(fStack_9ad4,local_9ad8);
        uStack_7fe0 = CONCAT44(fStack_9acc,fStack_9ad0);
        local_6a78 = CONCAT44(fStack_7fa4,local_7fa8);
        uStack_6a70 = CONCAT44(fStack_7f9c,fStack_7fa0);
        local_5bc8 = CONCAT44((int)fStack_7fa4,(int)local_7fa8);
        uStack_5bc0 = CONCAT44((int)fStack_7f9c,(int)fStack_7fa0);
        local_5bd8 = 0x7f0000007f;
        uStack_5bd0 = 0x7f0000007f;
        iVar203 = (int)local_7fa8 + 0x7f;
        fStack_7fb4 = (float)((int)fStack_7fa4 + 0x7f);
        fStack_7fb0 = (float)((int)fStack_7fa0 + 0x7f);
        fStack_7fac = (float)((int)fStack_7f9c + 0x7f);
        local_5a48 = CONCAT44(fStack_7fb4,iVar203);
        uStack_5a40 = CONCAT44(fStack_7fac,fStack_7fb0);
        local_5a4c = 0x17;
        local_7fb8 = (float)(iVar203 * 0x800000);
        local_7ff8 = CONCAT44(fStack_7fb4,local_7fb8);
        uStack_7ff0 = CONCAT44(fStack_7fac,fStack_7fb0);
        local_7f58 = local_7fe8;
        uStack_7f50 = uStack_7fe0;
        local_9ad8 = local_9ad8 * local_7fb8;
        fStack_9ad4 = fStack_9ad4 * fStack_7fb4;
        fStack_9ad0 = fStack_9ad0 * fStack_7fb0;
        fStack_9acc = fStack_9acc * fStack_7fac;
        local_7fe8 = CONCAT44(fStack_9ad4,local_9ad8);
        uStack_7fe0 = CONCAT44(fStack_9acc,fStack_9ad0);
        local_9d78 = local_7fe8;
        uStack_9d70 = uStack_7fe0;
        local_9ad8 = local_9ad8 + 1.0;
        fStack_9ad4 = fStack_9ad4 + 1.0;
        fStack_9ad0 = fStack_9ad0 + 1.0;
        fStack_9acc = fStack_9acc + 1.0;
        auVar57._8_8_ = 0x3f8000003f800000;
        auVar57._0_8_ = 0x3f8000003f800000;
        auVar56._4_4_ = fStack_9ad4;
        auVar56._0_4_ = local_9ad8;
        auVar56._8_4_ = fStack_9ad0;
        auVar56._12_4_ = fStack_9acc;
        _local_bb48 = divps(auVar57,auVar56);
        local_9d68 = local_a738;
        uStack_9d60 = uStack_a730;
        local_9ac8 = local_a738;
        uStack_9ac0 = uStack_a730;
        local_7f68 = local_7ff8;
        uStack_7f60 = uStack_7ff0;
        local_7f18 = uVar5;
        uStack_7f10 = uVar6;
        local_7eb8 = local_7f00;
        local_7eb0 = local_7ef0;
        local_7e78 = local_7f00;
        local_7e70 = local_7ef0;
        local_7e38 = local_7f00;
        local_7e30 = local_7ef0;
        local_7df8 = local_7f00;
        local_7df0 = local_7ef0;
        local_7db8 = local_7f00;
        local_7db0 = local_7ef0;
        local_6cb8 = local_7fd8;
        uStack_6cb0 = uStack_7fd0;
        local_6250 = local_7f00;
        local_61f0 = local_7f00;
        local_61e0 = local_6240;
        local_5918 = local_7ff8;
        uStack_5910 = uStack_7ff0;
        break;
      case 5:
        local_a558 = local_c0b8;
        uStack_a550 = uStack_c0b0;
        local_93e8 = 0;
        uStack_93e0 = 0;
        local_9648 = 0x3f8000003f800000;
        uStack_9640 = 0x3f8000003f800000;
        local_93c8 = local_c0b8;
        uStack_93c0 = uStack_c0b0;
        local_93d8 = 0x42b0c0a542b0c0a5;
        uStack_93d0 = 0x42b0c0a542b0c0a5;
        auVar71._8_8_ = uStack_c0b0;
        auVar71._0_8_ = local_c0b8;
        auVar70._8_8_ = 0x42b0c0a542b0c0a5;
        auVar70._0_8_ = 0x42b0c0a542b0c0a5;
        auVar177 = minps(auVar71,auVar70);
        local_9608 = auVar177._0_8_;
        uStack_9600 = auVar177._8_8_;
        local_93f8 = local_9608;
        uStack_93f0 = uStack_9600;
        local_9408 = 0xc2b0c0a5c2b0c0a5;
        uStack_9400 = 0xc2b0c0a5c2b0c0a5;
        auVar69._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar69._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar177 = maxps(auVar177,auVar69);
        local_9608 = auVar177._0_8_;
        uStack_9600 = auVar177._8_8_;
        local_9598 = local_9608;
        uVar5 = local_9598;
        uStack_9590 = uStack_9600;
        uVar6 = uStack_9590;
        local_95a8 = 0x3fb8aa3b3fb8aa3b;
        uStack_95a0 = 0x3fb8aa3b3fb8aa3b;
        local_9598._0_4_ = auVar177._0_4_;
        local_9598._4_4_ = auVar177._4_4_;
        uStack_9590._0_4_ = auVar177._8_4_;
        uStack_9590._4_4_ = auVar177._12_4_;
        local_92c8 = CONCAT44(local_9598._4_4_ * 1.442695,(float)local_9598 * 1.442695);
        uStack_92c0 = CONCAT44(uStack_9590._4_4_ * 1.442695,(float)uStack_9590 * 1.442695);
        local_92d8 = 0x3f0000003f000000;
        uStack_92d0 = 0x3f0000003f000000;
        fVar173 = (float)local_9598 * 1.442695 + 0.5;
        fVar183 = local_9598._4_4_ * 1.442695 + 0.5;
        fVar191 = (float)uStack_9590 * 1.442695 + 0.5;
        fVar199 = uStack_9590._4_4_ * 1.442695 + 0.5;
        local_69a8 = CONCAT44(fVar183,fVar173);
        uStack_69a0 = CONCAT44(fVar199,fVar191);
        local_95f8 = CONCAT44((int)fVar183,(int)fVar173);
        uStack_95f0 = CONCAT44((int)fVar199,(int)fVar191);
        local_9628 = (float)(int)fVar173;
        fStack_9624 = (float)(int)fVar183;
        fStack_9620 = (float)(int)fVar191;
        fStack_961c = (float)(int)fVar199;
        local_9618 = CONCAT44(fStack_9624,local_9628);
        uStack_9610 = CONCAT44(fStack_961c,fStack_9620);
        local_67d8 = CONCAT44(fVar183,fVar173);
        uStack_67d0 = CONCAT44(fVar199,fVar191);
        local_67c8 = local_9618;
        uStack_67c0 = uStack_9610;
        local_9658 = CONCAT44(-(uint)(fVar183 < fStack_9624),-(uint)(fVar173 < local_9628));
        uStack_9650 = CONCAT44(-(uint)(fVar199 < fStack_961c),-(uint)(fVar191 < fStack_9620));
        local_6648 = local_9658;
        uStack_6640 = uStack_9650;
        local_6658 = 0x3f8000003f800000;
        uStack_6650 = 0x3f8000003f800000;
        local_9658 = local_9658 & 0x3f8000003f800000;
        uStack_9650 = uStack_9650 & 0x3f8000003f800000;
        local_6be8 = local_9618;
        uStack_6be0 = uStack_9610;
        local_6bf8._0_4_ = (float)local_9658;
        local_6bf8._4_4_ = (float)(local_9658 >> 0x20);
        uStack_6bf0._0_4_ = (float)uStack_9650;
        uStack_6bf0._4_4_ = (float)(uStack_9650 >> 0x20);
        local_9628 = local_9628 - (float)local_6bf8;
        fStack_9624 = fStack_9624 - local_6bf8._4_4_;
        fStack_9620 = fStack_9620 - (float)uStack_6bf0;
        fStack_961c = fStack_961c - uStack_6bf0._4_4_;
        local_5dc0 = &local_9628;
        local_5d68 = ::_ps_cephes_exp_C1;
        local_9580 = &local_9608;
        local_5d28 = local_9608;
        uStack_5d20 = uStack_9600;
        local_5d48 = CONCAT44(fStack_9624,local_9628);
        uStack_5d40 = CONCAT44(fStack_961c,fStack_9620);
        local_5d58[0] = 0.6933594;
        local_5d58[1] = 0.6933594;
        afStack_5d50[0] = 0.6933594;
        afStack_5d50[1] = 0.6933594;
        local_5d38 = local_9628 * 0.6933594;
        fStack_5d34 = fStack_9624 * 0.6933594;
        fStack_5d30 = fStack_9620 * 0.6933594;
        fStack_5d2c = fStack_961c * 0.6933594;
        local_9608 = CONCAT44(local_9598._4_4_ - fStack_5d34,(float)local_9598 - local_5d38);
        uStack_9600._0_4_ = (float)uStack_9590 - fStack_5d30;
        uStack_9600._4_4_ = uStack_9590._4_4_ - fStack_5d2c;
        local_5dc8 = ::_ps_cephes_exp_C2;
        local_5d88 = local_9608;
        uStack_5d80 = uStack_9600;
        local_5da8 = CONCAT44(fStack_9624,local_9628);
        uStack_5da0 = CONCAT44(fStack_961c,fStack_9620);
        local_5db8[0] = -0.00021219444;
        local_5db8[1] = -0.00021219444;
        afStack_5db0[0] = -0.00021219444;
        afStack_5db0[1] = -0.00021219444;
        local_5d98 = local_9628 * -0.00021219444;
        fStack_5d94 = fStack_9624 * -0.00021219444;
        fStack_5d90 = fStack_9620 * -0.00021219444;
        fStack_5d8c = fStack_961c * -0.00021219444;
        fVar173 = ((float)local_9598 - local_5d38) - local_5d98;
        fVar183 = (local_9598._4_4_ - fStack_5d34) - fStack_5d94;
        fVar191 = ((float)uStack_9590 - fStack_5d30) - fStack_5d90;
        fVar199 = (uStack_9590._4_4_ - fStack_5d2c) - fStack_5d8c;
        local_9608 = CONCAT44(fVar183,fVar173);
        uStack_9600._0_4_ = fVar191;
        uStack_9600._4_4_ = fVar199;
        local_95b8 = local_9608;
        uStack_95b0 = uStack_9600;
        local_95c8 = local_9608;
        uStack_95c0 = uStack_9600;
        local_9618 = CONCAT44(fVar183 * fVar183,fVar173 * fVar173);
        uStack_9610 = CONCAT44(fVar199 * fVar199,fVar191 * fVar191);
        local_9570 = &local_9668;
        local_9440 = ::_ps_cephes_exp_p1;
        local_9418 = 0x3950696739506967;
        uStack_9410 = 0x3950696739506967;
        local_9428 = local_9608;
        uStack_9420 = uStack_9600;
        local_93a8 = fVar173 * 0.00019875691;
        fStack_93a4 = fVar183 * 0.00019875691;
        fStack_93a0 = fVar191 * 0.00019875691;
        fStack_939c = fVar199 * 0.00019875691;
        local_93b8[0] = 0.0013981999;
        local_93b8[1] = 0.0013981999;
        afStack_93b0[0] = 0.0013981999;
        afStack_93b0[1] = 0.0013981999;
        local_9668 = CONCAT44(fStack_93a4 + 0.0013981999,local_93a8 + 0.0013981999);
        uStack_9660 = CONCAT44(fStack_939c + 0.0013981999,fStack_93a0 + 0.0013981999);
        local_9480 = ::_ps_cephes_exp_p2;
        local_9458 = local_9668;
        uStack_9450 = uStack_9660;
        local_9468 = local_9608;
        uStack_9460 = uStack_9600;
        local_9388 = (local_93a8 + 0.0013981999) * fVar173;
        fStack_9384 = (fStack_93a4 + 0.0013981999) * fVar183;
        fStack_9380 = (fStack_93a0 + 0.0013981999) * fVar191;
        fStack_937c = (fStack_939c + 0.0013981999) * fVar199;
        local_9398[0] = 0.008333452;
        local_9398[1] = 0.008333452;
        afStack_9390[0] = 0.008333452;
        afStack_9390[1] = 0.008333452;
        local_9668 = CONCAT44(fStack_9384 + 0.008333452,local_9388 + 0.008333452);
        uStack_9660 = CONCAT44(fStack_937c + 0.008333452,fStack_9380 + 0.008333452);
        local_94c0 = ::_ps_cephes_exp_p3;
        local_9498 = local_9668;
        uStack_9490 = uStack_9660;
        local_94a8 = local_9608;
        uStack_94a0 = uStack_9600;
        local_9368 = (local_9388 + 0.008333452) * fVar173;
        fStack_9364 = (fStack_9384 + 0.008333452) * fVar183;
        fStack_9360 = (fStack_9380 + 0.008333452) * fVar191;
        fStack_935c = (fStack_937c + 0.008333452) * fVar199;
        local_9378[0] = 0.041665796;
        local_9378[1] = 0.041665796;
        afStack_9370[0] = 0.041665796;
        afStack_9370[1] = 0.041665796;
        local_9668 = CONCAT44(fStack_9364 + 0.041665796,local_9368 + 0.041665796);
        uStack_9660 = CONCAT44(fStack_935c + 0.041665796,fStack_9360 + 0.041665796);
        local_9500 = ::_ps_cephes_exp_p4;
        local_94d8 = local_9668;
        uStack_94d0 = uStack_9660;
        local_94e8 = local_9608;
        uStack_94e0 = uStack_9600;
        local_9348 = (local_9368 + 0.041665796) * fVar173;
        fStack_9344 = (fStack_9364 + 0.041665796) * fVar183;
        fStack_9340 = (fStack_9360 + 0.041665796) * fVar191;
        fStack_933c = (fStack_935c + 0.041665796) * fVar199;
        local_9358[0] = 0.16666666;
        local_9358[1] = 0.16666666;
        afStack_9350[0] = 0.16666666;
        afStack_9350[1] = 0.16666666;
        local_9668 = CONCAT44(fStack_9344 + 0.16666666,local_9348 + 0.16666666);
        uStack_9660 = CONCAT44(fStack_933c + 0.16666666,fStack_9340 + 0.16666666);
        local_9540 = ::_ps_cephes_exp_p5;
        local_9518 = local_9668;
        uStack_9510 = uStack_9660;
        local_9528 = local_9608;
        uStack_9520 = uStack_9600;
        local_9328 = (local_9348 + 0.16666666) * fVar173;
        fStack_9324 = (fStack_9344 + 0.16666666) * fVar183;
        fStack_9320 = (fStack_9340 + 0.16666666) * fVar191;
        fStack_931c = (fStack_933c + 0.16666666) * fVar199;
        local_9338[0] = 0.5;
        local_9338[1] = 0.5;
        afStack_9330[0] = 0.5;
        afStack_9330[1] = 0.5;
        local_9668 = CONCAT44(fStack_9324 + 0.5,local_9328 + 0.5);
        uStack_9660 = CONCAT44(fStack_931c + 0.5,fStack_9320 + 0.5);
        local_9578 = &local_9618;
        local_9558 = local_9668;
        uStack_9550 = uStack_9660;
        local_9568 = local_9618;
        uStack_9560 = uStack_9610;
        local_9308 = (local_9328 + 0.5) * fVar173 * fVar173;
        fStack_9304 = (fStack_9324 + 0.5) * fVar183 * fVar183;
        fStack_9300 = (fStack_9320 + 0.5) * fVar191 * fVar191;
        fStack_92fc = (fStack_931c + 0.5) * fVar199 * fVar199;
        local_9318 = local_9608;
        uStack_9310 = uStack_9600;
        local_9668 = CONCAT44(fStack_9304 + fVar183,local_9308 + fVar173);
        uStack_9660 = CONCAT44(fStack_92fc + fVar199,fStack_9300 + fVar191);
        local_92e8 = local_9668;
        uStack_92e0 = uStack_9660;
        local_92f8 = 0x3f8000003f800000;
        uStack_92f0 = 0x3f8000003f800000;
        fVar173 = local_9308 + fVar173 + 1.0;
        fVar183 = fStack_9304 + fVar183 + 1.0;
        fVar191 = fStack_9300 + fVar191 + 1.0;
        fVar199 = fStack_92fc + fVar199 + 1.0;
        local_9668 = CONCAT44(fVar183,fVar173);
        uStack_9660 = CONCAT44(fVar199,fVar191);
        local_69b8 = CONCAT44(fStack_9624,local_9628);
        uStack_69b0 = CONCAT44(fStack_961c,fStack_9620);
        local_5b08 = CONCAT44((int)fStack_9624,(int)local_9628);
        uStack_5b00 = CONCAT44((int)fStack_961c,(int)fStack_9620);
        local_5b18 = 0x7f0000007f;
        uStack_5b10 = 0x7f0000007f;
        iVar203 = (int)local_9628 + 0x7f;
        fStack_9634 = (float)((int)fStack_9624 + 0x7f);
        fStack_9630 = (float)((int)fStack_9620 + 0x7f);
        fStack_962c = (float)((int)fStack_961c + 0x7f);
        local_5988 = CONCAT44(fStack_9634,iVar203);
        uStack_5980 = CONCAT44(fStack_962c,fStack_9630);
        local_598c = 0x17;
        local_9638 = (float)(iVar203 * 0x800000);
        local_9678 = CONCAT44(fStack_9634,local_9638);
        uStack_9670 = CONCAT44(fStack_962c,fStack_9630);
        local_95d8 = local_9668;
        uStack_95d0 = uStack_9660;
        fVar173 = fVar173 * local_9638;
        fVar183 = fVar183 * fStack_9634;
        fVar191 = fVar191 * fStack_9630;
        fVar199 = fVar199 * fStack_962c;
        local_9668 = CONCAT44(fVar183,fVar173);
        uStack_9660 = CONCAT44(fVar199,fVar191);
        local_a52c = 0x3f800000;
        local_a548 = 0x3f800000;
        uStack_a544 = 0x3f800000;
        uStack_a540 = 0x3f800000;
        uStack_a53c = 0x3f800000;
        local_9e38 = 0x3f8000003f800000;
        uStack_9e30 = 0x3f8000003f800000;
        local_9e28 = local_9668;
        uStack_9e20 = uStack_9660;
        fVar173 = fVar173 + 1.0;
        fVar183 = fVar183 + 1.0;
        fVar191 = fVar191 + 1.0;
        fVar199 = fVar199 + 1.0;
        local_28a8 = CONCAT44(fVar183,fVar173);
        uStack_28a0._0_4_ = fVar191;
        uStack_28a0._4_4_ = fVar199;
        local_28c8 = 0x3f8000003f800000;
        uStack_28c0 = 0x3f8000003f800000;
        local_2588 = 0;
        uStack_2580 = 0;
        local_908 = local_28a8;
        uStack_900 = uStack_28a0;
        local_918 = 0;
        uStack_910 = 0;
        local_28d8 = -(uint)(fVar173 <= 0.0);
        iStack_28d4 = -(uint)(fVar183 <= 0.0);
        iStack_28d0 = -(uint)(fVar191 <= 0.0);
        iStack_28cc = -(uint)(fVar199 <= 0.0);
        local_2598 = local_28a8;
        uStack_2590 = uStack_28a0;
        local_25a8 = 0x80000000800000;
        uStack_25a0 = 0x80000000800000;
        auVar135._8_8_ = uStack_28a0;
        auVar135._0_8_ = local_28a8;
        auVar134._8_8_ = 0x80000000800000;
        auVar134._0_8_ = 0x80000000800000;
        auVar177 = maxps(auVar135,auVar134);
        local_28a8 = auVar177._0_8_;
        uStack_28a0 = auVar177._8_8_;
        local_7d8 = local_28a8;
        uStack_7d0 = uStack_28a0;
        local_848 = local_28a8;
        uVar166 = local_848;
        uStack_840 = uStack_28a0;
        uVar167 = uStack_840;
        local_84c = 0x17;
        local_848._0_4_ = auVar177._0_4_;
        local_848._4_4_ = auVar177._4_4_;
        uStack_840._0_4_ = auVar177._8_4_;
        uStack_840._4_4_ = auVar177._12_4_;
        local_2348 = local_28a8;
        uStack_2340 = uStack_28a0;
        local_2358 = 0x807fffff807fffff;
        uStack_2350 = 0x807fffff807fffff;
        local_688 = local_28a8 & 0x807fffff807fffff;
        uStack_680 = uStack_28a0 & 0x807fffff807fffff;
        local_698 = 0x3f0000003f000000;
        uStack_690 = 0x3f0000003f000000;
        local_23a8 = local_688 | 0x3f0000003f000000;
        uStack_23a0 = uStack_680 | 0x3f0000003f000000;
        local_4e8 = CONCAT44(local_848._4_4_ >> 0x17,(uint)local_848 >> 0x17);
        uStack_4e0 = CONCAT44(uStack_840._4_4_ >> 0x17,(uint)uStack_840 >> 0x17);
        local_4f8 = 0x7f0000007f;
        uStack_4f0 = 0x7f0000007f;
        local_28b8 = ((uint)local_848 >> 0x17) - 0x7f;
        iStack_28b4 = (local_848._4_4_ >> 0x17) - 0x7f;
        iStack_28b0 = ((uint)uStack_840 >> 0x17) - 0x7f;
        iStack_28ac = (uStack_840._4_4_ >> 0x17) - 0x7f;
        local_2898 = CONCAT44(iStack_28b4,local_28b8);
        uStack_2890 = CONCAT44(iStack_28ac,iStack_28b0);
        local_23e8 = CONCAT44((float)iStack_28b4,(float)local_28b8);
        uStack_23e0 = CONCAT44((float)iStack_28ac,(float)iStack_28b0);
        local_23f8 = 0x3f8000003f800000;
        uStack_23f0 = 0x3f8000003f800000;
        local_28e8 = (float)local_28b8 + 1.0;
        fStack_28e4 = (float)iStack_28b4 + 1.0;
        fStack_28e0 = (float)iStack_28b0 + 1.0;
        fStack_28dc = (float)iStack_28ac + 1.0;
        local_438 = 0x3f3504f33f3504f3;
        uStack_430 = 0x3f3504f33f3504f3;
        local_428._0_4_ = (float)local_23a8;
        local_428._4_4_ = (float)(local_23a8 >> 0x20);
        uStack_420._0_4_ = (float)uStack_23a0;
        uStack_420._4_4_ = (float)(uStack_23a0 >> 0x20);
        local_28f8 = -(uint)((float)local_428 < 0.70710677);
        iStack_28f4 = -(uint)(local_428._4_4_ < 0.70710677);
        iStack_28f0 = -(uint)((float)uStack_420 < 0.70710677);
        iStack_28ec = -(uint)(uStack_420._4_4_ < 0.70710677);
        local_2378 = CONCAT44(iStack_28f4,local_28f8);
        uStack_2370 = CONCAT44(iStack_28ec,iStack_28f0);
        local_2908 = local_23a8 & local_2378;
        uStack_2900 = uStack_23a0 & uStack_2370;
        local_23b8 = 0x3f8000003f800000;
        uStack_23b0 = 0x3f8000003f800000;
        local_28a8 = CONCAT44(local_428._4_4_ - 1.0,(float)local_428 - 1.0);
        uStack_28a0._0_4_ = (float)uStack_420 - 1.0;
        uStack_28a0._4_4_ = uStack_420._4_4_ - 1.0;
        local_23c8 = CONCAT44(fStack_28e4,local_28e8);
        uStack_23c0 = CONCAT44(fStack_28dc,fStack_28e0);
        local_2398 = CONCAT44(iStack_28f4,local_28f8);
        uStack_2390 = CONCAT44(iStack_28ec,iStack_28f0);
        local_2388 = 0x3f8000003f800000;
        uStack_2380 = 0x3f8000003f800000;
        uVar204 = local_2398 & 0x3f8000003f800000;
        uVar205 = uStack_2390 & 0x3f8000003f800000;
        local_23d8._0_4_ = (float)uVar204;
        local_23d8._4_4_ = (float)(uVar204 >> 0x20);
        uStack_23d0._0_4_ = (float)uVar205;
        uStack_23d0._4_4_ = (float)(uVar205 >> 0x20);
        local_28e8 = local_28e8 - (float)local_23d8;
        fStack_28e4 = fStack_28e4 - local_23d8._4_4_;
        fStack_28e0 = fStack_28e0 - (float)uStack_23d0;
        fStack_28dc = fStack_28dc - uStack_23d0._4_4_;
        local_2408 = local_28a8;
        uStack_2400 = uStack_28a0;
        local_2418._0_4_ = (float)local_2908;
        local_2418._4_4_ = (float)(local_2908 >> 0x20);
        uStack_2410._0_4_ = (float)uStack_2900;
        uStack_2410._4_4_ = (float)(uStack_2900 >> 0x20);
        local_2418._0_4_ = ((float)local_428 - 1.0) + (float)local_2418;
        local_2418._4_4_ = (local_428._4_4_ - 1.0) + local_2418._4_4_;
        uStack_2410._0_4_ = ((float)uStack_420 - 1.0) + (float)uStack_2410;
        uStack_2410._4_4_ = (uStack_420._4_4_ - 1.0) + uStack_2410._4_4_;
        local_28a8 = CONCAT44(local_2418._4_4_,(float)local_2418);
        uStack_28a0._0_4_ = (float)uStack_2410;
        uStack_28a0._4_4_ = uStack_2410._4_4_;
        local_2838 = local_28a8;
        uStack_2830 = uStack_28a0;
        local_2848 = local_28a8;
        uStack_2840 = uStack_28a0;
        local_2918 = (float)local_2418 * (float)local_2418;
        fStack_2914 = local_2418._4_4_ * local_2418._4_4_;
        fStack_2910 = (float)uStack_2410 * (float)uStack_2410;
        fStack_290c = uStack_2410._4_4_ * uStack_2410._4_4_;
        local_27e0 = &local_2928;
        local_2820 = &local_28a8;
        local_25e0 = ::_ps_cephes_log_p1;
        local_25b8 = 0x3d9021bb3d9021bb;
        uStack_25b0 = 0x3d9021bb3d9021bb;
        local_25c8 = local_28a8;
        uStack_25c0 = uStack_28a0;
        local_2568 = (float)local_2418 * 0.070376836;
        fStack_2564 = local_2418._4_4_ * 0.070376836;
        fStack_2560 = (float)uStack_2410 * 0.070376836;
        fStack_255c = uStack_2410._4_4_ * 0.070376836;
        local_2578[0] = -0.1151461;
        local_2578[1] = -0.1151461;
        afStack_2570[0] = -0.1151461;
        afStack_2570[1] = -0.1151461;
        local_2928 = CONCAT44(fStack_2564 + -0.1151461,local_2568 + -0.1151461);
        uStack_2920 = CONCAT44(fStack_255c + -0.1151461,fStack_2560 + -0.1151461);
        local_2620 = ::_ps_cephes_log_p2;
        local_25f8 = local_2928;
        uStack_25f0 = uStack_2920;
        local_2608 = local_28a8;
        uStack_2600 = uStack_28a0;
        local_2548 = (local_2568 + -0.1151461) * (float)local_2418;
        fStack_2544 = (fStack_2564 + -0.1151461) * local_2418._4_4_;
        fStack_2540 = (fStack_2560 + -0.1151461) * (float)uStack_2410;
        fStack_253c = (fStack_255c + -0.1151461) * uStack_2410._4_4_;
        local_2558[0] = 0.116769984;
        local_2558[1] = 0.116769984;
        afStack_2550[0] = 0.116769984;
        afStack_2550[1] = 0.116769984;
        local_2928 = CONCAT44(fStack_2544 + 0.116769984,local_2548 + 0.116769984);
        uStack_2920 = CONCAT44(fStack_253c + 0.116769984,fStack_2540 + 0.116769984);
        local_2660 = ::_ps_cephes_log_p3;
        local_2638 = local_2928;
        uStack_2630 = uStack_2920;
        local_2648 = local_28a8;
        uStack_2640 = uStack_28a0;
        local_2528 = (local_2548 + 0.116769984) * (float)local_2418;
        fStack_2524 = (fStack_2544 + 0.116769984) * local_2418._4_4_;
        fStack_2520 = (fStack_2540 + 0.116769984) * (float)uStack_2410;
        fStack_251c = (fStack_253c + 0.116769984) * uStack_2410._4_4_;
        local_2538[0] = -0.12420141;
        local_2538[1] = -0.12420141;
        afStack_2530[0] = -0.12420141;
        afStack_2530[1] = -0.12420141;
        local_2928 = CONCAT44(fStack_2524 + -0.12420141,local_2528 + -0.12420141);
        uStack_2920 = CONCAT44(fStack_251c + -0.12420141,fStack_2520 + -0.12420141);
        local_26a0 = ::_ps_cephes_log_p4;
        local_2678 = local_2928;
        uStack_2670 = uStack_2920;
        local_2688 = local_28a8;
        uStack_2680 = uStack_28a0;
        local_2508 = (local_2528 + -0.12420141) * (float)local_2418;
        fStack_2504 = (fStack_2524 + -0.12420141) * local_2418._4_4_;
        fStack_2500 = (fStack_2520 + -0.12420141) * (float)uStack_2410;
        fStack_24fc = (fStack_251c + -0.12420141) * uStack_2410._4_4_;
        local_2518[0] = 0.14249323;
        local_2518[1] = 0.14249323;
        afStack_2510[0] = 0.14249323;
        afStack_2510[1] = 0.14249323;
        local_2928 = CONCAT44(fStack_2504 + 0.14249323,local_2508 + 0.14249323);
        uStack_2920 = CONCAT44(fStack_24fc + 0.14249323,fStack_2500 + 0.14249323);
        local_26e0 = ::_ps_cephes_log_p5;
        local_26b8 = local_2928;
        uStack_26b0 = uStack_2920;
        local_26c8 = local_28a8;
        uStack_26c0 = uStack_28a0;
        local_24e8 = (local_2508 + 0.14249323) * (float)local_2418;
        fStack_24e4 = (fStack_2504 + 0.14249323) * local_2418._4_4_;
        fStack_24e0 = (fStack_2500 + 0.14249323) * (float)uStack_2410;
        fStack_24dc = (fStack_24fc + 0.14249323) * uStack_2410._4_4_;
        local_24f8[0] = -0.16668057;
        local_24f8[1] = -0.16668057;
        afStack_24f0[0] = -0.16668057;
        afStack_24f0[1] = -0.16668057;
        local_2928 = CONCAT44(fStack_24e4 + -0.16668057,local_24e8 + -0.16668057);
        uStack_2920 = CONCAT44(fStack_24dc + -0.16668057,fStack_24e0 + -0.16668057);
        local_2720 = ::_ps_cephes_log_p6;
        local_26f8 = local_2928;
        uStack_26f0 = uStack_2920;
        local_2708 = local_28a8;
        uStack_2700 = uStack_28a0;
        local_24c8 = (local_24e8 + -0.16668057) * (float)local_2418;
        fStack_24c4 = (fStack_24e4 + -0.16668057) * local_2418._4_4_;
        fStack_24c0 = (fStack_24e0 + -0.16668057) * (float)uStack_2410;
        fStack_24bc = (fStack_24dc + -0.16668057) * uStack_2410._4_4_;
        local_24d8[0] = 0.20000714;
        local_24d8[1] = 0.20000714;
        afStack_24d0[0] = 0.20000714;
        afStack_24d0[1] = 0.20000714;
        local_2928 = CONCAT44(fStack_24c4 + 0.20000714,local_24c8 + 0.20000714);
        uStack_2920 = CONCAT44(fStack_24bc + 0.20000714,fStack_24c0 + 0.20000714);
        local_2760 = ::_ps_cephes_log_p7;
        local_2738 = local_2928;
        uStack_2730 = uStack_2920;
        local_2748 = local_28a8;
        uStack_2740 = uStack_28a0;
        local_24a8 = (local_24c8 + 0.20000714) * (float)local_2418;
        fStack_24a4 = (fStack_24c4 + 0.20000714) * local_2418._4_4_;
        fStack_24a0 = (fStack_24c0 + 0.20000714) * (float)uStack_2410;
        fStack_249c = (fStack_24bc + 0.20000714) * uStack_2410._4_4_;
        local_24b8[0] = -0.24999994;
        local_24b8[1] = -0.24999994;
        afStack_24b0[0] = -0.24999994;
        afStack_24b0[1] = -0.24999994;
        local_2928 = CONCAT44(fStack_24a4 + -0.24999994,local_24a8 + -0.24999994);
        uStack_2920 = CONCAT44(fStack_249c + -0.24999994,fStack_24a0 + -0.24999994);
        local_27a0 = ::_ps_cephes_log_p8;
        local_2778 = local_2928;
        uStack_2770 = uStack_2920;
        local_2788 = local_28a8;
        uStack_2780 = uStack_28a0;
        local_2488 = (local_24a8 + -0.24999994) * (float)local_2418;
        fStack_2484 = (fStack_24a4 + -0.24999994) * local_2418._4_4_;
        fStack_2480 = (fStack_24a0 + -0.24999994) * (float)uStack_2410;
        fStack_247c = (fStack_249c + -0.24999994) * uStack_2410._4_4_;
        local_2498[0] = 0.3333333;
        local_2498[1] = 0.3333333;
        afStack_2490[0] = 0.3333333;
        afStack_2490[1] = 0.3333333;
        local_2928 = CONCAT44(fStack_2484 + 0.3333333,local_2488 + 0.3333333);
        uStack_2920 = CONCAT44(fStack_247c + 0.3333333,fStack_2480 + 0.3333333);
        local_2858 = local_2928;
        uStack_2850 = uStack_2920;
        local_2868 = local_28a8;
        uStack_2860 = uStack_28a0;
        fVar173 = (local_2488 + 0.3333333) * (float)local_2418;
        fVar183 = (fStack_2484 + 0.3333333) * local_2418._4_4_;
        fVar191 = (fStack_2480 + 0.3333333) * (float)uStack_2410;
        fVar199 = (fStack_247c + 0.3333333) * uStack_2410._4_4_;
        local_2928 = CONCAT44(fVar183,fVar173);
        uStack_2920 = CONCAT44(fVar199,fVar191);
        local_2888 = CONCAT44(fStack_2914,local_2918);
        uStack_2880 = CONCAT44(fStack_290c,fStack_2910);
        local_2878 = local_2928;
        uStack_2870 = uStack_2920;
        fVar173 = fVar173 * local_2918;
        fVar183 = fVar183 * fStack_2914;
        fVar191 = fVar191 * fStack_2910;
        fVar199 = fVar199 * fStack_290c;
        local_2928 = CONCAT44(fVar183,fVar173);
        uStack_2920 = CONCAT44(fVar199,fVar191);
        local_2810 = &local_28e8;
        local_27d8 = ::_ps_cephes_log_q1;
        local_27b8 = CONCAT44(fStack_28e4,local_28e8);
        uStack_27b0 = CONCAT44(fStack_28dc,fStack_28e0);
        local_27c8[0] = -0.00021219444;
        local_27c8[1] = -0.00021219444;
        afStack_27c0[0] = -0.00021219444;
        afStack_27c0[1] = -0.00021219444;
        local_2468 = local_28e8 * -0.00021219444;
        fStack_2464 = fStack_28e4 * -0.00021219444;
        fStack_2460 = fStack_28e0 * -0.00021219444;
        fStack_245c = fStack_28dc * -0.00021219444;
        local_2478 = local_2928;
        uStack_2470 = uStack_2920;
        fVar173 = local_2468 + fVar173;
        fVar183 = fStack_2464 + fVar183;
        fVar191 = fStack_2460 + fVar191;
        fVar199 = fStack_245c + fVar199;
        local_2928 = CONCAT44(fVar183,fVar173);
        uStack_2920 = CONCAT44(fVar199,fVar191);
        local_2320 = &local_2918;
        local_2328 = ::_ps_0p5;
        local_22e8 = local_2928;
        uStack_22e0 = uStack_2920;
        local_2308 = CONCAT44(fStack_2914,local_2918);
        uStack_2300 = CONCAT44(fStack_290c,fStack_2910);
        local_2318[0] = 0.5;
        local_2318[1] = 0.5;
        afStack_2310[0] = 0.5;
        afStack_2310[1] = 0.5;
        local_22f8 = local_2918 * 0.5;
        fStack_22f4 = fStack_2914 * 0.5;
        fStack_22f0 = fStack_2910 * 0.5;
        fStack_22ec = fStack_290c * 0.5;
        fVar173 = fVar173 - local_22f8;
        fVar183 = fVar183 - fStack_22f4;
        fVar191 = fVar191 - fStack_22f0;
        fVar199 = fVar199 - fStack_22ec;
        local_2928 = CONCAT44(fVar183,fVar173);
        uStack_2920 = CONCAT44(fVar199,fVar191);
        local_2428 = local_28a8;
        uStack_2420 = uStack_28a0;
        local_2438 = local_2928;
        uStack_2430 = uStack_2920;
        local_2418._0_4_ = (float)local_2418 + fVar173;
        local_2418._4_4_ = local_2418._4_4_ + fVar183;
        uStack_2410._0_4_ = (float)uStack_2410 + fVar191;
        uStack_2410._4_4_ = uStack_2410._4_4_ + fVar199;
        local_28a8 = CONCAT44(local_2418._4_4_,(float)local_2418);
        uStack_28a0._0_4_ = (float)uStack_2410;
        uStack_28a0._4_4_ = uStack_2410._4_4_;
        local_2818 = ::_ps_cephes_log_q2;
        local_27f8 = CONCAT44(fStack_28e4,local_28e8);
        uStack_27f0 = CONCAT44(fStack_28dc,fStack_28e0);
        local_2808[0] = 0.6933594;
        local_2808[1] = 0.6933594;
        afStack_2800[0] = 0.6933594;
        afStack_2800[1] = 0.6933594;
        local_2448 = local_28e8 * 0.6933594;
        fStack_2444 = fStack_28e4 * 0.6933594;
        fStack_2440 = fStack_28e0 * 0.6933594;
        fStack_243c = fStack_28dc * 0.6933594;
        local_2458 = local_28a8;
        uStack_2450 = uStack_28a0;
        local_28a8 = CONCAT44(fStack_2444 + local_2418._4_4_,local_2448 + (float)local_2418);
        uStack_28a0._0_4_ = fStack_2440 + (float)uStack_2410;
        uStack_28a0._4_4_ = fStack_243c + uStack_2410._4_4_;
        local_6b8 = CONCAT44(iStack_28d4,local_28d8);
        uStack_6b0 = CONCAT44(iStack_28cc,iStack_28d0);
        local_6a8 = local_28a8;
        uStack_6a0 = uStack_28a0;
        local_5168 = local_28a8 | local_6b8;
        uStack_5160 = uStack_28a0 | uStack_6b0;
        uStack_28a0 = uStack_5160;
        local_28a8 = local_5168;
        local_511c = 0x3f800000;
        local_5138 = 0x3f800000;
        uStack_5134 = 0x3f800000;
        uStack_5130 = 0x3f800000;
        uStack_512c = 0x3f800000;
        local_5178 = 0x3f8000003f800000;
        uStack_5170 = 0x3f8000003f800000;
        local_513c = 0x40000000;
        local_5158 = 0x40000000;
        uStack_5154 = 0x40000000;
        uStack_5150 = 0x40000000;
        uStack_514c = 0x40000000;
        local_5188 = 0x4000000040000000;
        uStack_5180 = 0x4000000040000000;
        local_50e8._0_4_ = (float)local_5168;
        local_50e8._4_4_ = (float)(local_5168 >> 0x20);
        uStack_50e0._0_4_ = (float)uStack_5160;
        uStack_50e0._4_4_ = (float)(uStack_5160 >> 0x20);
        local_50c8 = (float)local_50e8 * 2.0;
        fStack_50c4 = local_50e8._4_4_ * 2.0;
        fStack_50c0 = (float)uStack_50e0 * 2.0;
        fStack_50bc = uStack_50e0._4_4_ * 2.0;
        local_509c = 0x3f800000;
        local_50b8 = 0x3f800000;
        uStack_50b4 = 0x3f800000;
        uStack_50b0 = 0x3f800000;
        uStack_50ac = 0x3f800000;
        local_50d8 = 0x3f8000003f800000;
        uStack_50d0 = 0x3f8000003f800000;
        local_5098 = 0;
        uStack_5090 = 0;
        local_4c68 = CONCAT44(fStack_50c4,local_50c8);
        uStack_4c60 = CONCAT44(fStack_50bc,fStack_50c0);
        local_4c58 = 0;
        uStack_4c50 = 0;
        local_4fd8 = CONCAT44(0.0 - fStack_50c4,0.0 - local_50c8);
        uStack_4fd0._0_4_ = 0.0 - fStack_50c0;
        uStack_4fd0._4_4_ = 0.0 - fStack_50bc;
        local_4db8 = 0;
        uStack_4db0 = 0;
        local_5018 = 0x3f8000003f800000;
        uStack_5010 = 0x3f8000003f800000;
        local_4d98 = local_4fd8;
        uStack_4d90 = uStack_4fd0;
        local_4da8 = 0x42b0c0a542b0c0a5;
        uStack_4da0 = 0x42b0c0a542b0c0a5;
        auVar111._8_8_ = uStack_4fd0;
        auVar111._0_8_ = local_4fd8;
        auVar110._8_8_ = 0x42b0c0a542b0c0a5;
        auVar110._0_8_ = 0x42b0c0a542b0c0a5;
        auVar177 = minps(auVar111,auVar110);
        local_4fd8 = auVar177._0_8_;
        uStack_4fd0 = auVar177._8_8_;
        local_4dc8 = local_4fd8;
        uStack_4dc0 = uStack_4fd0;
        local_4dd8 = 0xc2b0c0a5c2b0c0a5;
        uStack_4dd0 = 0xc2b0c0a5c2b0c0a5;
        auVar109._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar109._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar177 = maxps(auVar177,auVar109);
        local_4fd8 = auVar177._0_8_;
        uStack_4fd0 = auVar177._8_8_;
        local_4f68 = local_4fd8;
        uVar161 = local_4f68;
        uStack_4f60 = uStack_4fd0;
        uVar164 = uStack_4f60;
        local_4f78 = 0x3fb8aa3b3fb8aa3b;
        uStack_4f70 = 0x3fb8aa3b3fb8aa3b;
        local_4f68._0_4_ = auVar177._0_4_;
        local_4f68._4_4_ = auVar177._4_4_;
        uStack_4f60._0_4_ = auVar177._8_4_;
        uStack_4f60._4_4_ = auVar177._12_4_;
        local_4c98 = CONCAT44(local_4f68._4_4_ * 1.442695,(float)local_4f68 * 1.442695);
        uStack_4c90 = CONCAT44(uStack_4f60._4_4_ * 1.442695,(float)uStack_4f60 * 1.442695);
        local_4ca8 = 0x3f0000003f000000;
        uStack_4ca0 = 0x3f0000003f000000;
        fVar173 = (float)local_4f68 * 1.442695 + 0.5;
        fVar183 = local_4f68._4_4_ * 1.442695 + 0.5;
        fVar191 = (float)uStack_4f60 * 1.442695 + 0.5;
        fVar199 = uStack_4f60._4_4_ * 1.442695 + 0.5;
        local_4c18 = CONCAT44(fVar183,fVar173);
        uStack_4c10 = CONCAT44(fVar199,fVar191);
        local_4fc8 = CONCAT44((int)fVar183,(int)fVar173);
        uStack_4fc0 = CONCAT44((int)fVar199,(int)fVar191);
        local_4ff8 = (float)(int)fVar173;
        fStack_4ff4 = (float)(int)fVar183;
        fStack_4ff0 = (float)(int)fVar191;
        fStack_4fec = (float)(int)fVar199;
        local_4bf8 = CONCAT44(fStack_4ff4,local_4ff8);
        uStack_4bf0 = CONCAT44(fStack_4fec,fStack_4ff0);
        local_4c08 = CONCAT44(fVar183,fVar173);
        uStack_4c00 = CONCAT44(fVar199,fVar191);
        local_5028 = CONCAT44(-(uint)(fVar183 < fStack_4ff4),-(uint)(fVar173 < local_4ff8));
        uStack_5020 = CONCAT44(-(uint)(fVar199 < fStack_4fec),-(uint)(fVar191 < fStack_4ff0));
        local_4bd8 = local_5028;
        uStack_4bd0 = uStack_5020;
        local_4be8 = 0x3f8000003f800000;
        uStack_4be0 = 0x3f8000003f800000;
        local_5028 = local_5028 & 0x3f8000003f800000;
        uStack_5020 = uStack_5020 & 0x3f8000003f800000;
        local_4c78 = CONCAT44(fStack_4ff4,local_4ff8);
        uStack_4c70 = CONCAT44(fStack_4fec,fStack_4ff0);
        local_4c88._0_4_ = (float)local_5028;
        local_4c88._4_4_ = (float)(local_5028 >> 0x20);
        uStack_4c80._0_4_ = (float)uStack_5020;
        uStack_4c80._4_4_ = (float)(uStack_5020 >> 0x20);
        local_4ff8 = local_4ff8 - (float)local_4c88;
        fStack_4ff4 = fStack_4ff4 - local_4c88._4_4_;
        fStack_4ff0 = fStack_4ff0 - (float)uStack_4c80;
        fStack_4fec = fStack_4fec - uStack_4c80._4_4_;
        local_4bb0 = &local_4ff8;
        local_4b58 = ::_ps_cephes_exp_C1;
        local_4f50 = &local_4fd8;
        local_4b18 = local_4fd8;
        uStack_4b10 = uStack_4fd0;
        local_4b38 = CONCAT44(fStack_4ff4,local_4ff8);
        uStack_4b30 = CONCAT44(fStack_4fec,fStack_4ff0);
        local_4b48[0] = 0.6933594;
        local_4b48[1] = 0.6933594;
        afStack_4b40[0] = 0.6933594;
        afStack_4b40[1] = 0.6933594;
        local_4b28 = local_4ff8 * 0.6933594;
        fStack_4b24 = fStack_4ff4 * 0.6933594;
        fStack_4b20 = fStack_4ff0 * 0.6933594;
        fStack_4b1c = fStack_4fec * 0.6933594;
        local_4fd8 = CONCAT44(local_4f68._4_4_ - fStack_4b24,(float)local_4f68 - local_4b28);
        uStack_4fd0._0_4_ = (float)uStack_4f60 - fStack_4b20;
        uStack_4fd0._4_4_ = uStack_4f60._4_4_ - fStack_4b1c;
        local_4bb8 = ::_ps_cephes_exp_C2;
        local_4b78 = local_4fd8;
        uStack_4b70 = uStack_4fd0;
        local_4b98 = CONCAT44(fStack_4ff4,local_4ff8);
        uStack_4b90 = CONCAT44(fStack_4fec,fStack_4ff0);
        local_4ba8[0] = -0.00021219444;
        local_4ba8[1] = -0.00021219444;
        afStack_4ba0[0] = -0.00021219444;
        afStack_4ba0[1] = -0.00021219444;
        local_4b88 = local_4ff8 * -0.00021219444;
        fStack_4b84 = fStack_4ff4 * -0.00021219444;
        fStack_4b80 = fStack_4ff0 * -0.00021219444;
        fStack_4b7c = fStack_4fec * -0.00021219444;
        fVar173 = ((float)local_4f68 - local_4b28) - local_4b88;
        fVar183 = (local_4f68._4_4_ - fStack_4b24) - fStack_4b84;
        fVar191 = ((float)uStack_4f60 - fStack_4b20) - fStack_4b80;
        fVar199 = (uStack_4f60._4_4_ - fStack_4b1c) - fStack_4b7c;
        local_4fd8 = CONCAT44(fVar183,fVar173);
        uStack_4fd0._0_4_ = fVar191;
        uStack_4fd0._4_4_ = fVar199;
        local_4f88 = local_4fd8;
        uStack_4f80 = uStack_4fd0;
        local_4f98 = local_4fd8;
        uStack_4f90 = uStack_4fd0;
        local_4fe8 = fVar173 * fVar173;
        fStack_4fe4 = fVar183 * fVar183;
        fStack_4fe0 = fVar191 * fVar191;
        fStack_4fdc = fVar199 * fVar199;
        local_4f40 = &local_5038;
        local_4e10 = ::_ps_cephes_exp_p1;
        local_4de8 = 0x3950696739506967;
        uStack_4de0 = 0x3950696739506967;
        local_4df8 = local_4fd8;
        uStack_4df0 = uStack_4fd0;
        local_4d78 = fVar173 * 0.00019875691;
        fStack_4d74 = fVar183 * 0.00019875691;
        fStack_4d70 = fVar191 * 0.00019875691;
        fStack_4d6c = fVar199 * 0.00019875691;
        local_4d88[0] = 0.0013981999;
        local_4d88[1] = 0.0013981999;
        afStack_4d80[0] = 0.0013981999;
        afStack_4d80[1] = 0.0013981999;
        local_5038 = CONCAT44(fStack_4d74 + 0.0013981999,local_4d78 + 0.0013981999);
        uStack_5030 = CONCAT44(fStack_4d6c + 0.0013981999,fStack_4d70 + 0.0013981999);
        local_4e50 = ::_ps_cephes_exp_p2;
        local_4e28 = local_5038;
        uStack_4e20 = uStack_5030;
        local_4e38 = local_4fd8;
        uStack_4e30 = uStack_4fd0;
        local_4d58 = (local_4d78 + 0.0013981999) * fVar173;
        fStack_4d54 = (fStack_4d74 + 0.0013981999) * fVar183;
        fStack_4d50 = (fStack_4d70 + 0.0013981999) * fVar191;
        fStack_4d4c = (fStack_4d6c + 0.0013981999) * fVar199;
        local_4d68[0] = 0.008333452;
        local_4d68[1] = 0.008333452;
        afStack_4d60[0] = 0.008333452;
        afStack_4d60[1] = 0.008333452;
        local_5038 = CONCAT44(fStack_4d54 + 0.008333452,local_4d58 + 0.008333452);
        uStack_5030 = CONCAT44(fStack_4d4c + 0.008333452,fStack_4d50 + 0.008333452);
        local_4e90 = ::_ps_cephes_exp_p3;
        local_4e68 = local_5038;
        uStack_4e60 = uStack_5030;
        local_4e78 = local_4fd8;
        uStack_4e70 = uStack_4fd0;
        local_4d38 = (local_4d58 + 0.008333452) * fVar173;
        fStack_4d34 = (fStack_4d54 + 0.008333452) * fVar183;
        fStack_4d30 = (fStack_4d50 + 0.008333452) * fVar191;
        fStack_4d2c = (fStack_4d4c + 0.008333452) * fVar199;
        local_4d48[0] = 0.041665796;
        local_4d48[1] = 0.041665796;
        afStack_4d40[0] = 0.041665796;
        afStack_4d40[1] = 0.041665796;
        local_5038 = CONCAT44(fStack_4d34 + 0.041665796,local_4d38 + 0.041665796);
        uStack_5030 = CONCAT44(fStack_4d2c + 0.041665796,fStack_4d30 + 0.041665796);
        local_4ed0 = ::_ps_cephes_exp_p4;
        local_4ea8 = local_5038;
        uStack_4ea0 = uStack_5030;
        local_4eb8 = local_4fd8;
        uStack_4eb0 = uStack_4fd0;
        local_4d18 = (local_4d38 + 0.041665796) * fVar173;
        fStack_4d14 = (fStack_4d34 + 0.041665796) * fVar183;
        fStack_4d10 = (fStack_4d30 + 0.041665796) * fVar191;
        fStack_4d0c = (fStack_4d2c + 0.041665796) * fVar199;
        local_4d28[0] = 0.16666666;
        local_4d28[1] = 0.16666666;
        afStack_4d20[0] = 0.16666666;
        afStack_4d20[1] = 0.16666666;
        local_5038 = CONCAT44(fStack_4d14 + 0.16666666,local_4d18 + 0.16666666);
        uStack_5030 = CONCAT44(fStack_4d0c + 0.16666666,fStack_4d10 + 0.16666666);
        local_4f10 = ::_ps_cephes_exp_p5;
        local_4ee8 = local_5038;
        uStack_4ee0 = uStack_5030;
        local_4ef8 = local_4fd8;
        uStack_4ef0 = uStack_4fd0;
        local_4cf8 = (local_4d18 + 0.16666666) * fVar173;
        fStack_4cf4 = (fStack_4d14 + 0.16666666) * fVar183;
        fStack_4cf0 = (fStack_4d10 + 0.16666666) * fVar191;
        fStack_4cec = (fStack_4d0c + 0.16666666) * fVar199;
        local_4d08[0] = 0.5;
        local_4d08[1] = 0.5;
        afStack_4d00[0] = 0.5;
        afStack_4d00[1] = 0.5;
        local_5038 = CONCAT44(fStack_4cf4 + 0.5,local_4cf8 + 0.5);
        uStack_5030 = CONCAT44(fStack_4cec + 0.5,fStack_4cf0 + 0.5);
        local_4f48 = &local_4fe8;
        local_4f28 = local_5038;
        uStack_4f20 = uStack_5030;
        local_4f38 = CONCAT44(fStack_4fe4,local_4fe8);
        uStack_4f30 = CONCAT44(fStack_4fdc,fStack_4fe0);
        local_4cd8 = (local_4cf8 + 0.5) * local_4fe8;
        fStack_4cd4 = (fStack_4cf4 + 0.5) * fStack_4fe4;
        fStack_4cd0 = (fStack_4cf0 + 0.5) * fStack_4fe0;
        fStack_4ccc = (fStack_4cec + 0.5) * fStack_4fdc;
        local_4ce8 = local_4fd8;
        uStack_4ce0 = uStack_4fd0;
        local_5038 = CONCAT44(fStack_4cd4 + fVar183,local_4cd8 + fVar173);
        uStack_5030 = CONCAT44(fStack_4ccc + fVar199,fStack_4cd0 + fVar191);
        local_4cb8 = local_5038;
        uStack_4cb0 = uStack_5030;
        local_4cc8 = 0x3f8000003f800000;
        uStack_4cc0 = 0x3f8000003f800000;
        local_5068 = local_4cd8 + fVar173 + 1.0;
        fStack_5064 = fStack_4cd4 + fVar183 + 1.0;
        fStack_5060 = fStack_4cd0 + fVar191 + 1.0;
        fStack_505c = fStack_4ccc + fVar199 + 1.0;
        local_5038 = CONCAT44(fStack_5064,local_5068);
        uStack_5030 = CONCAT44(fStack_505c,fStack_5060);
        local_4c28 = CONCAT44(fStack_4ff4,local_4ff8);
        uStack_4c20 = CONCAT44(fStack_4fec,fStack_4ff0);
        local_4af8 = CONCAT44((int)fStack_4ff4,(int)local_4ff8);
        uStack_4af0 = CONCAT44((int)fStack_4fec,(int)fStack_4ff0);
        local_4b08 = 0x7f0000007f;
        uStack_4b00 = 0x7f0000007f;
        iVar203 = (int)local_4ff8 + 0x7f;
        fStack_5004 = (float)((int)fStack_4ff4 + 0x7f);
        fStack_5000 = (float)((int)fStack_4ff0 + 0x7f);
        fStack_4ffc = (float)((int)fStack_4fec + 0x7f);
        local_4ad8 = CONCAT44(fStack_5004,iVar203);
        uStack_4ad0 = CONCAT44(fStack_4ffc,fStack_5000);
        local_4adc = 0x17;
        local_5008 = (float)(iVar203 * 0x800000);
        local_5048 = CONCAT44(fStack_5004,local_5008);
        uStack_5040 = CONCAT44(fStack_4ffc,fStack_5000);
        local_4fa8 = local_5038;
        uStack_4fa0 = uStack_5030;
        local_5068 = local_5068 * local_5008;
        fStack_5064 = fStack_5064 * fStack_5004;
        fStack_5060 = fStack_5060 * fStack_5000;
        fStack_505c = fStack_505c * fStack_4ffc;
        local_5038 = CONCAT44(fStack_5064,local_5068);
        uStack_5030 = CONCAT44(fStack_505c,fStack_5060);
        local_5088 = local_5038;
        uStack_5080 = uStack_5030;
        local_5068 = local_5068 + 1.0;
        fStack_5064 = fStack_5064 + 1.0;
        fStack_5060 = fStack_5060 + 1.0;
        fStack_505c = fStack_505c + 1.0;
        auVar108._8_8_ = 0x3f8000003f800000;
        auVar108._0_8_ = 0x3f8000003f800000;
        auVar107._4_4_ = fStack_5064;
        auVar107._0_4_ = local_5068;
        auVar107._8_4_ = fStack_5060;
        auVar107._12_4_ = fStack_505c;
        _local_5108 = divps(auVar108,auVar107);
        local_4c38 = (float)local_5108._0_4_ * 2.0;
        fStack_4c34 = (float)local_5108._4_4_ * 2.0;
        fStack_4c30 = fStack_5100 * 2.0;
        fStack_4c2c = fStack_50fc * 2.0;
        local_a528 = local_4c38 - 1.0;
        fStack_a524 = fStack_4c34 - 1.0;
        fStack_a520 = fStack_4c30 - 1.0;
        fStack_a51c = fStack_4c2c - 1.0;
        local_a518 = local_c0b8;
        uStack_a510 = uStack_c0b0;
        local_bb48._4_4_ = local_9bf8._4_4_ * fStack_a524;
        local_bb48._0_4_ = (float)local_9bf8 * local_a528;
        uStack_bb40._0_4_ = (float)uStack_9bf0 * fStack_a520;
        uStack_bb40._4_4_ = uStack_9bf0._4_4_ * fStack_a51c;
        local_95e8 = local_9678;
        uStack_95e0 = uStack_9670;
        local_9598 = uVar5;
        uStack_9590 = uVar6;
        local_9538 = local_9580;
        local_9530 = local_9570;
        local_94f8 = local_9580;
        local_94f0 = local_9570;
        local_94b8 = local_9580;
        local_94b0 = local_9570;
        local_9478 = local_9580;
        local_9470 = local_9570;
        local_9438 = local_9580;
        local_9430 = local_9570;
        local_6bf8 = local_9658;
        uStack_6bf0 = uStack_9650;
        local_5dd0 = local_9580;
        local_5d70 = local_9580;
        local_5d60 = local_5dc0;
        local_58b8 = local_9678;
        uStack_58b0 = uStack_9670;
        local_5118 = local_5188;
        uStack_5110 = uStack_5180;
        local_50f8 = local_5188;
        uStack_50f0 = uStack_5180;
        local_50e8 = local_5168;
        uStack_50e0 = uStack_5160;
        local_5078 = local_50d8;
        uStack_5070 = uStack_50d0;
        local_5058 = local_50d8;
        uStack_5050 = uStack_50d0;
        local_4fb8 = local_5048;
        uStack_4fb0 = uStack_5040;
        local_4f68 = uVar161;
        uStack_4f60 = uVar164;
        local_4f08 = local_4f50;
        local_4f00 = local_4f40;
        local_4ec8 = local_4f50;
        local_4ec0 = local_4f40;
        local_4e88 = local_4f50;
        local_4e80 = local_4f40;
        local_4e48 = local_4f50;
        local_4e40 = local_4f40;
        local_4e08 = local_4f50;
        local_4e00 = local_4f40;
        local_4c88 = local_5028;
        uStack_4c80 = uStack_5020;
        local_4c48 = local_5178;
        uStack_4c40 = uStack_5170;
        local_4bc0 = local_4f50;
        local_4b60 = local_4f50;
        local_4b50 = local_4bb0;
        local_4ac8 = local_5048;
        uStack_4ac0 = uStack_5040;
        local_27d0 = local_2810;
        local_2798 = local_2820;
        local_2790 = local_27e0;
        local_2758 = local_2820;
        local_2750 = local_27e0;
        local_2718 = local_2820;
        local_2710 = local_27e0;
        local_26d8 = local_2820;
        local_26d0 = local_27e0;
        local_2698 = local_2820;
        local_2690 = local_27e0;
        local_2658 = local_2820;
        local_2650 = local_27e0;
        local_2618 = local_2820;
        local_2610 = local_27e0;
        local_25d8 = local_2820;
        local_25d0 = local_27e0;
        local_2418 = local_2908;
        uStack_2410 = uStack_2900;
        local_23d8 = uVar204;
        uStack_23d0 = uVar205;
        local_2368 = local_23a8;
        uStack_2360 = uStack_23a0;
        local_2330 = local_27e0;
        local_848 = uVar166;
        uStack_840 = uVar167;
        local_428 = local_23a8;
        uStack_420 = uStack_23a0;
        break;
      case 6:
        local_bb28 = 0;
        local_bac8 = *(float *)*in_stack_00000008;
        local_bb98 = CONCAT44(local_bac8,local_bac8);
        uStack_bb90 = CONCAT44(local_bac8,local_bac8);
        local_bb38 = 1;
        local_bae8 = *(float *)(*in_stack_00000008 + 4);
        local_bba8 = CONCAT44(local_bae8,local_bae8);
        uStack_bba0 = CONCAT44(local_bae8,local_bae8);
        local_a0c8 = local_c0b8;
        uStack_a0c0 = uStack_c0b0;
        local_a09c = 0x3f800000;
        local_a0b8 = 0x3f800000;
        uStack_a0b4 = 0x3f800000;
        uStack_a0b0 = 0x3f800000;
        uStack_a0ac = 0x3f800000;
        local_a0f8 = 0x3f8000003f800000;
        uStack_a0f0 = 0x3f8000003f800000;
        local_a068 = local_c0b8;
        uStack_a060 = uStack_c0b0;
        local_9ee8 = (float)local_9bf8 * local_bac8;
        fStack_9ee4 = local_9bf8._4_4_ * local_bac8;
        fStack_9ee0 = (float)uStack_9bf0 * local_bac8;
        fStack_9edc = uStack_9bf0._4_4_ * local_bac8;
        local_a0e8._4_4_ = fStack_9ee4 + local_bae8;
        local_a0e8._0_4_ = local_9ee8 + local_bae8;
        uStack_a0e0._0_4_ = fStack_9ee0 + local_bae8;
        uStack_a0e0._4_4_ = fStack_9edc + local_bae8;
        local_a038 = 0;
        uStack_a030 = 0;
        local_a048 = local_a0e8;
        uStack_a040 = uStack_a0e0;
        local_a058 = 0;
        uStack_a050 = 0;
        auVar50._8_8_ = uStack_a0e0;
        auVar50._0_8_ = local_a0e8;
        auVar177 = maxps(auVar50,ZEXT816(0));
        local_a0e8 = auVar177._0_8_;
        uStack_a0e0 = auVar177._8_8_;
        local_a018 = local_a0e8;
        uStack_a010 = uStack_a0e0;
        auVar51._8_8_ = 0x3f8000003f800000;
        auVar51._0_8_ = 0x3f8000003f800000;
        _local_a0e8 = minps(auVar177,auVar51);
        local_a088 = local_a0e8;
        uVar5 = local_a088;
        uStack_a080 = uStack_a0e0;
        uVar6 = uStack_a080;
        local_a098 = local_c0b8;
        uStack_a090 = uStack_c0b0;
        local_a088._0_4_ = local_a0e8._0_4_;
        local_a088._4_4_ = local_a0e8._4_4_;
        uStack_a080._0_4_ = local_a0e8._8_4_;
        uStack_a080._4_4_ = local_a0e8._12_4_;
        local_bb48._4_4_ = local_a088._4_4_ * local_9bf8._4_4_;
        local_bb48._0_4_ = (float)local_a088 * (float)local_9bf8;
        uStack_bb40._0_4_ = (float)uStack_a080 * (float)uStack_9bf0;
        uStack_bb40._4_4_ = uStack_a080._4_4_ * uStack_9bf0._4_4_;
        fStack_bae4 = local_bae8;
        fStack_bae0 = local_bae8;
        fStack_badc = local_bae8;
        local_bacc = local_bae8;
        fStack_bac4 = local_bac8;
        fStack_bac0 = local_bac8;
        fStack_babc = local_bac8;
        local_baac = local_bac8;
        local_a0d8 = local_bb98;
        uStack_a0d0 = uStack_bb90;
        local_a088 = uVar5;
        uStack_a080 = uVar6;
        local_a078 = local_bb98;
        uStack_a070 = uStack_bb90;
        local_a028 = local_a0f8;
        uStack_a020 = uStack_a0f0;
        local_9ef8 = local_bba8;
        uStack_9ef0 = uStack_bba0;
        break;
      default:
        uStack_bb40 = uStack_c0b0;
        local_bb48 = (undefined1  [8])local_c0b8;
      }
      local_bdc8 = local_c008;
      uStack_bdc0 = uStack_c000;
      local_bdb8._0_4_ = local_ba08._0_4_;
      local_bdb8._4_4_ = local_ba08._4_4_;
      uStack_bdb0._0_4_ = local_ba08._8_4_;
      uStack_bdb0._4_4_ = local_ba08._12_4_;
      local_c0a8 = CONCAT44(local_bdb8._4_4_ * local_bd48._4_4_,
                            (float)local_bdb8 * (float)local_bd48);
      uStack_c0a0 = CONCAT44(uStack_bdb0._4_4_ * uStack_bd40._4_4_,
                             (float)uStack_bdb0 * (float)uStack_bd40);
      local_bde8 = local_c018;
      uStack_bde0 = uStack_c010;
      local_bdd8._0_4_ = local_bb48._0_4_;
      local_bdd8._4_4_ = local_bb48._4_4_;
      uStack_bdd0._0_4_ = local_bb48._8_4_;
      uStack_bdd0._4_4_ = local_bb48._12_4_;
      local_c0b8 = CONCAT44(local_bdd8._4_4_ * local_bd68._4_4_,
                            (float)local_bdd8 * (float)local_bd68);
      uStack_c0b0 = CONCAT44(uStack_bdd0._4_4_ * uStack_bd60._4_4_,
                             (float)uStack_bdd0 * (float)uStack_bd60);
      local_b4a0 = &local_c0a8;
      local_b4a8 = &local_c0b8;
      local_b47c = 0x3f000000;
      local_b498 = 0x3f000000;
      local_b4b8 = 0x3f0000003f000000;
      uStack_b4b0 = 0x3f0000003f000000;
      local_3ec = 0x80000000;
      local_188 = 0x80000000;
      local_b4c8 = 0x8000000080000000;
      uStack_b4c0 = 0x8000000080000000;
      local_6568 = local_c0a8;
      uStack_6560 = uStack_c0a0;
      local_b4d8 = local_c0a8 & 0x8000000080000000;
      uStack_b4d0 = uStack_c0a0 & 0x8000000080000000;
      local_6588 = local_c0b8;
      uStack_6580 = uStack_c0b0;
      local_b4e8 = local_c0b8 & 0x8000000080000000;
      uStack_b4e0 = uStack_c0b0 & 0x8000000080000000;
      local_b4f8 = local_b4d8 | 0x3f0000003f000000;
      uStack_b4f0 = uStack_b4d0 | 0x3f0000003f000000;
      local_b508 = local_b4e8 | 0x3f0000003f000000;
      uStack_b500 = uStack_b4e0 | 0x3f0000003f000000;
      local_9b08 = local_c0a8;
      uStack_9b00 = uStack_c0a0;
      local_9b18._0_4_ = (float)local_b4f8;
      local_9b18._4_4_ = (float)(local_b4f8 >> 0x20);
      uStack_9b10._0_4_ = (float)uStack_b4f0;
      uStack_9b10._4_4_ = (float)(uStack_b4f0 >> 0x20);
      local_b518 = (float)local_bdb8 * (float)local_bd48 + (float)local_9b18;
      fStack_b514 = local_bdb8._4_4_ * local_bd48._4_4_ + local_9b18._4_4_;
      fStack_b510 = (float)uStack_bdb0 * (float)uStack_bd40 + (float)uStack_9b10;
      fStack_b50c = uStack_bdb0._4_4_ * uStack_bd40._4_4_ + uStack_9b10._4_4_;
      local_9b28 = local_c0b8;
      uStack_9b20 = uStack_c0b0;
      local_9b38._0_4_ = (float)local_b508;
      local_9b38._4_4_ = (float)(local_b508 >> 0x20);
      uStack_9b30._0_4_ = (float)uStack_b500;
      uStack_9b30._4_4_ = (float)(uStack_b500 >> 0x20);
      local_b528 = (float)local_bdd8 * (float)local_bd68 + (float)local_9b38;
      fStack_b524 = local_bdd8._4_4_ * local_bd68._4_4_ + local_9b38._4_4_;
      fStack_b520 = (float)uStack_bdd0 * (float)uStack_bd60 + (float)uStack_9b30;
      fStack_b51c = uStack_bdd0._4_4_ * uStack_bd60._4_4_ + uStack_9b30._4_4_;
      local_6928 = CONCAT44(fStack_b514,local_b518);
      uStack_6920 = CONCAT44(fStack_b50c,fStack_b510);
      local_b538 = (int)local_b518;
      iStack_b534 = (int)fStack_b514;
      iStack_b530 = (int)fStack_b510;
      iStack_b52c = (int)fStack_b50c;
      local_6938 = CONCAT44(fStack_b524,local_b528);
      uStack_6930 = CONCAT44(fStack_b51c,fStack_b520);
      local_b548 = (int)local_b528;
      iStack_b544 = (int)fStack_b524;
      iStack_b540 = (int)fStack_b520;
      iStack_b53c = (int)fStack_b51c;
      local_378 = CONCAT44(iStack_b534,local_b538);
      uStack_370 = CONCAT44(iStack_b52c,iStack_b530);
      local_388 = CONCAT44(iStack_b544,local_b548);
      uStack_380 = CONCAT44(iStack_b53c,iStack_b540);
      auVar151._8_8_ = uStack_370;
      auVar151._0_8_ = local_378;
      auVar150._8_8_ = uStack_380;
      auVar150._0_8_ = local_388;
      auVar177 = packssdw(auVar151,auVar150);
      local_b558 = auVar177._0_8_;
      uVar5 = local_b558;
      uStack_b550 = auVar177._8_8_;
      uVar6 = uStack_b550;
      local_2da = 0x7f;
      local_108 = 0x7f;
      local_308 = 0x7f007f007f007f;
      uStack_300 = 0x7f007f007f007f;
      local_2f8._0_2_ = auVar177._0_2_;
      local_2f8._2_2_ = auVar177._2_2_;
      local_2f8._4_2_ = auVar177._4_2_;
      local_2f8._6_2_ = auVar177._6_2_;
      uStack_2f0._0_2_ = auVar177._8_2_;
      uStack_2f0._2_2_ = auVar177._10_2_;
      uStack_2f0._4_2_ = auVar177._12_2_;
      uStack_2f0._6_2_ = auVar177._14_2_;
      uVar169 = (ushort)(0x7f < (short)local_2f8) * 0x7f |
                (ushort)(0x7f >= (short)local_2f8) * (short)local_2f8;
      uVar178 = (ushort)(0x7f < local_2f8._2_2_) * 0x7f |
                (ushort)(0x7f >= local_2f8._2_2_) * local_2f8._2_2_;
      uVar179 = (ushort)(0x7f < local_2f8._4_2_) * 0x7f |
                (ushort)(0x7f >= local_2f8._4_2_) * local_2f8._4_2_;
      uVar186 = (ushort)(0x7f < local_2f8._6_2_) * 0x7f |
                (ushort)(0x7f >= local_2f8._6_2_) * local_2f8._6_2_;
      uVar187 = (ushort)(0x7f < (short)uStack_2f0) * 0x7f |
                (ushort)(0x7f >= (short)uStack_2f0) * (short)uStack_2f0;
      uVar194 = (ushort)(0x7f < uStack_2f0._2_2_) * 0x7f |
                (ushort)(0x7f >= uStack_2f0._2_2_) * uStack_2f0._2_2_;
      uVar195 = (ushort)(0x7f < uStack_2f0._4_2_) * 0x7f |
                (ushort)(0x7f >= uStack_2f0._4_2_) * uStack_2f0._4_2_;
      uVar202 = (ushort)(0x7f < uStack_2f0._6_2_) * 0x7f |
                (ushort)(0x7f >= uStack_2f0._6_2_) * uStack_2f0._6_2_;
      local_b558._0_4_ = CONCAT22(uVar178,uVar169);
      local_b558._0_6_ = CONCAT24(uVar179,(undefined4)local_b558);
      local_b558 = CONCAT26(uVar186,(undefined6)local_b558);
      uStack_b550._0_2_ = uVar187;
      uStack_b550._2_2_ = uVar194;
      uStack_b550._4_2_ = uVar195;
      uStack_b550._6_2_ = uVar202;
      local_268 = local_b558;
      uStack_260 = uStack_b550;
      local_2dc = 0xff81;
      local_e8 = 0xff81;
      local_278 = 0xff81ff81ff81ff81;
      uStack_270 = 0xff81ff81ff81ff81;
      local_b558._0_4_ =
           CONCAT22((ushort)((short)uVar178 < -0x7f) * -0x7f | ((short)uVar178 >= -0x7f) * uVar178,
                    (ushort)((short)uVar169 < -0x7f) * -0x7f | ((short)uVar169 >= -0x7f) * uVar169);
      local_b558._0_6_ =
           CONCAT24((ushort)((short)uVar179 < -0x7f) * -0x7f | ((short)uVar179 >= -0x7f) * uVar179,
                    (undefined4)local_b558);
      local_b558 = CONCAT26((ushort)((short)uVar186 < -0x7f) * -0x7f |
                            ((short)uVar186 >= -0x7f) * uVar186,(undefined6)local_b558);
      uStack_b550._0_2_ =
           (ushort)((short)uVar187 < -0x7f) * -0x7f | ((short)uVar187 >= -0x7f) * uVar187;
      uStack_b550._2_2_ =
           (ushort)((short)uVar194 < -0x7f) * -0x7f | ((short)uVar194 >= -0x7f) * uVar194;
      uStack_b550._4_2_ =
           (ushort)((short)uVar195 < -0x7f) * -0x7f | ((short)uVar195 >= -0x7f) * uVar195;
      uStack_b550._6_2_ =
           (ushort)((short)uVar202 < -0x7f) * -0x7f | ((short)uVar202 >= -0x7f) * uVar202;
      local_1f8 = local_b558;
      uStack_1f0 = uStack_b550;
      auVar159._8_8_ = uStack_b550;
      auVar159._0_8_ = local_b558;
      auVar158._8_8_ = uStack_b550;
      auVar158._0_8_ = local_b558;
      local_b568 = packsswb(auVar159,auVar158);
      local_1a8 = local_b568._0_8_;
      uStack_1a0 = local_b568._8_8_;
      *local_bf98 = local_b568._0_8_;
      local_bf90 = local_bf90 + 8;
      local_bf98 = local_bf98 + 1;
      local_c08c = local_c08c + 8;
      local_be88 = uVar3;
      uStack_be80 = uVar4;
      local_be78 = uVar1;
      uStack_be70 = uVar2;
      local_bdd8 = local_bb48;
      uStack_bdd0 = uStack_bb40;
      local_bdb8 = local_ba08;
      uStack_bdb0 = uStack_ba00;
      uStack_b494 = local_b498;
      uStack_b490 = local_b498;
      uStack_b48c = local_b498;
      local_9c18 = local_c078;
      uStack_9c10 = uStack_c070;
      local_9bf8 = local_c088;
      uStack_9bf0 = uStack_c080;
      local_9b38 = local_b508;
      uStack_9b30 = uStack_b500;
      local_9b18 = local_b4f8;
      uStack_9b10 = uStack_b4f0;
      local_6598 = local_b4c8;
      uStack_6590 = uStack_b4c0;
      local_6578 = local_b4c8;
      uStack_6570 = uStack_b4c0;
      local_5868 = local_b4c8;
      uStack_5860 = uStack_b4c0;
      local_5b8 = local_b4e8;
      uStack_5b0 = uStack_b4e0;
      local_5a8 = local_b4b8;
      uStack_5a0 = uStack_b4b0;
      local_598 = local_b4d8;
      uStack_590 = uStack_b4d0;
      local_588 = local_b4b8;
      uStack_580 = uStack_b4b0;
      local_2f8 = uVar5;
      uStack_2f0 = uVar6;
      local_1e8 = local_1f8;
      uStack_1e0 = uStack_1f0;
      local_198 = local_b4c8;
      uStack_190 = uStack_b4c0;
      local_184 = local_188;
      local_180 = local_188;
      local_17c = local_188;
      local_118 = local_308;
      uStack_110 = uStack_300;
      local_106 = local_108;
      local_104 = local_108;
      local_102 = local_108;
      local_100 = local_108;
      local_fe = local_108;
      local_fc = local_108;
      local_fa = local_108;
      local_f8 = local_278;
      uStack_f0 = uStack_270;
      local_e6 = local_e8;
      local_e4 = local_e8;
      local_e2 = local_e8;
      local_e0 = local_e8;
      local_de = local_e8;
      local_dc = local_e8;
      local_da = local_e8;
    }
    for (; local_bf58 = local_c064, fStack_bf54 = local_c064, fStack_bf50 = local_c064,
        fStack_bf4c = local_c064, local_bf48 = local_c064, local_c08c + 3 < local_bfc4;
        local_c08c = local_c08c + 4) {
      local_be38 = local_bf90;
      uVar3 = *(undefined8 *)local_bf90;
      uVar4 = *(undefined8 *)(local_bf90 + 2);
      local_be98._0_4_ = (int)uVar3;
      local_be98._4_4_ = (int)((ulong)uVar3 >> 0x20);
      uStack_be90._0_4_ = (int)uVar4;
      uStack_be90._4_4_ = (int)((ulong)uVar4 >> 0x20);
      local_c0c8 = CONCAT44((float)local_be98._4_4_,(float)(int)local_be98);
      uStack_c0c0 = CONCAT44((float)uStack_be90._4_4_,(float)(int)uStack_be90);
      local_b100 = &local_c0c8;
      local_b108 = &local_bfd8;
      local_b110 = &local_c078;
      local_b0e8 = local_c0c8;
      uStack_b0e0 = uStack_c0c0;
      local_b0f8 = local_bfd8;
      uStack_b0f0 = uStack_bfd0;
      local_9bc8 = (float)(int)local_be98 * (float)local_bd08;
      fStack_9bc4 = (float)local_be98._4_4_ * local_bd08._4_4_;
      fStack_9bc0 = (float)(int)uStack_be90 * (float)uStack_bd00;
      fStack_9bbc = (float)uStack_be90._4_4_ * uStack_bd00._4_4_;
      local_9bd8 = local_c078;
      uStack_9bd0 = uStack_c070;
      fVar173 = local_9bc8 + (float)local_9c18;
      fVar183 = fStack_9bc4 + local_9c18._4_4_;
      fVar191 = fStack_9bc0 + (float)uStack_9c10;
      fVar199 = fStack_9bbc + uStack_9c10._4_4_;
      local_c0c8 = CONCAT44(fVar183,fVar173);
      uStack_c0c0 = CONCAT44(fVar199,fVar191);
      local_bc98 = local_c0c8;
      uStack_bc90 = uStack_c0c0;
      switch(in_R9D) {
      case 1:
        local_ae88 = 0;
        uStack_ae80 = 0;
        local_af08 = local_c0c8;
        uStack_af00 = uStack_c0c0;
        local_af18 = 0;
        uStack_af10 = 0;
        auVar22._8_8_ = uStack_c0c0;
        auVar22._0_8_ = local_c0c8;
        _local_bc88 = maxps(auVar22,ZEXT816(0));
        break;
      case 2:
        local_bc38 = 0;
        local_aa8c = *(float *)*in_stack_00000008;
        local_aa88 = local_c0c8;
        uStack_aa80 = uStack_c0c0;
        local_aa08 = 0;
        uStack_aa00 = 0;
        local_aa28 = 0;
        uStack_aa20 = 0;
        local_aa38 = local_c0c8;
        uStack_aa30 = uStack_c0c0;
        auVar30._8_8_ = uStack_c0c0;
        auVar30._0_8_ = local_c0c8;
        local_aaa8 = maxps(ZEXT816(0),auVar30);
        local_aa18 = 0;
        uStack_aa10 = 0;
        local_a9e8 = 0;
        uStack_a9e0 = 0;
        local_a9f8 = local_c0c8;
        uStack_a9f0 = uStack_c0c0;
        auVar31._8_8_ = uStack_c0c0;
        auVar31._0_8_ = local_c0c8;
        local_aab8 = minps(ZEXT816(0),auVar31);
        local_aa48 = CONCAT44(local_aa8c,local_aa8c);
        uStack_aa40 = CONCAT44(local_aa8c,local_aa8c);
        local_aa58 = local_aab8._0_8_;
        uVar5 = local_aa58;
        uStack_aa50 = local_aab8._8_8_;
        uVar6 = uStack_aa50;
        local_aa58._0_4_ = local_aab8._0_4_;
        local_aa58._4_4_ = local_aab8._4_4_;
        uStack_aa50._0_4_ = local_aab8._8_4_;
        uStack_aa50._4_4_ = local_aab8._12_4_;
        local_9cd8 = local_aa8c * (float)local_aa58;
        fStack_9cd4 = local_aa8c * local_aa58._4_4_;
        fStack_9cd0 = local_aa8c * (float)uStack_aa50;
        fStack_9ccc = local_aa8c * uStack_aa50._4_4_;
        local_9cc8 = local_aaa8._0_8_;
        uVar161 = local_9cc8;
        uStack_9cc0 = local_aaa8._8_8_;
        uVar164 = uStack_9cc0;
        local_9cc8._0_4_ = local_aaa8._0_4_;
        local_9cc8._4_4_ = local_aaa8._4_4_;
        uStack_9cc0._0_4_ = local_aaa8._8_4_;
        uStack_9cc0._4_4_ = local_aaa8._12_4_;
        local_bc88._4_4_ = local_9cc8._4_4_ + fStack_9cd4;
        local_bc88._0_4_ = (float)local_9cc8 + local_9cd8;
        uStack_bc80._0_4_ = (float)uStack_9cc0 + fStack_9cd0;
        uStack_bc80._4_4_ = uStack_9cc0._4_4_ + fStack_9ccc;
        local_aa78 = local_aa8c;
        fStack_aa74 = local_aa8c;
        fStack_aa70 = local_aa8c;
        fStack_aa6c = local_aa8c;
        local_aa68 = local_aa8c;
        local_aa58 = uVar5;
        uStack_aa50 = uVar6;
        local_9cc8 = uVar161;
        uStack_9cc0 = uVar164;
        break;
      case 3:
        local_bc48 = 0;
        local_bbc8 = *(undefined4 *)*in_stack_00000008;
        local_bcb8 = CONCAT44(local_bbc8,local_bbc8);
        uStack_bcb0 = CONCAT44(local_bbc8,local_bbc8);
        local_bc58 = 1;
        local_bbe8 = *(undefined4 *)(*in_stack_00000008 + 4);
        local_bcc8 = CONCAT44(local_bbe8,local_bbe8);
        uStack_bcc0 = CONCAT44(local_bbe8,local_bbe8);
        local_aee8 = local_c0c8;
        uStack_aee0 = uStack_c0c0;
        auVar24._8_8_ = uStack_c0c0;
        auVar24._0_8_ = local_c0c8;
        auVar23._8_8_ = uStack_bcb0;
        auVar23._0_8_ = local_bcb8;
        local_a888 = maxps(auVar24,auVar23);
        auVar42._8_8_ = uStack_bcc0;
        auVar42._0_8_ = local_bcc8;
        _local_bc88 = minps(local_a888,auVar42);
        uStack_bbe4 = local_bbe8;
        uStack_bbe0 = local_bbe8;
        uStack_bbdc = local_bbe8;
        local_bbd8 = local_bbe8;
        uStack_bbc4 = local_bbc8;
        uStack_bbc0 = local_bbc8;
        uStack_bbbc = local_bbc8;
        local_bbac = local_bbc8;
        local_aef8 = local_bcb8;
        uStack_aef0 = uStack_bcb0;
        local_a898 = local_bcc8;
        uStack_a890 = uStack_bcc0;
        break;
      case 4:
        local_a6d8 = local_c0c8;
        uStack_a6d0 = uStack_c0c0;
        local_a6ac = 0x3f800000;
        local_a6c8 = 0x3f800000;
        uStack_a6c4 = 0x3f800000;
        uStack_a6c0 = 0x3f800000;
        uStack_a6bc = 0x3f800000;
        local_a6e8 = 0x3f8000003f800000;
        uStack_a6e0 = 0x3f8000003f800000;
        local_a6a8 = 0;
        uStack_a6a0 = 0;
        local_6ba8 = 0;
        uStack_6ba0 = 0;
        local_6bb8 = local_c0c8;
        uStack_6bb0 = uStack_c0c0;
        local_8348 = CONCAT44(0.0 - fVar183,0.0 - fVar173);
        uStack_8340._0_4_ = 0.0 - fVar191;
        uStack_8340._4_4_ = 0.0 - fVar199;
        local_8128 = 0;
        uStack_8120 = 0;
        local_8388 = 0x3f8000003f800000;
        uStack_8380 = 0x3f8000003f800000;
        local_8108 = local_8348;
        uStack_8100 = uStack_8340;
        local_8118 = 0x42b0c0a542b0c0a5;
        uStack_8110 = 0x42b0c0a542b0c0a5;
        auVar86._8_8_ = uStack_8340;
        auVar86._0_8_ = local_8348;
        auVar85._8_8_ = 0x42b0c0a542b0c0a5;
        auVar85._0_8_ = 0x42b0c0a542b0c0a5;
        auVar177 = minps(auVar86,auVar85);
        local_8348 = auVar177._0_8_;
        uStack_8340 = auVar177._8_8_;
        local_8138 = local_8348;
        uStack_8130 = uStack_8340;
        local_8148 = 0xc2b0c0a5c2b0c0a5;
        uStack_8140 = 0xc2b0c0a5c2b0c0a5;
        auVar84._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar84._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar177 = maxps(auVar177,auVar84);
        local_8348 = auVar177._0_8_;
        uStack_8340 = auVar177._8_8_;
        local_82d8 = local_8348;
        uVar5 = local_82d8;
        uStack_82d0 = uStack_8340;
        uVar6 = uStack_82d0;
        local_82e8 = 0x3fb8aa3b3fb8aa3b;
        uStack_82e0 = 0x3fb8aa3b3fb8aa3b;
        local_82d8._0_4_ = auVar177._0_4_;
        local_82d8._4_4_ = auVar177._4_4_;
        uStack_82d0._0_4_ = auVar177._8_4_;
        uStack_82d0._4_4_ = auVar177._12_4_;
        local_8008 = CONCAT44(local_82d8._4_4_ * 1.442695,(float)local_82d8 * 1.442695);
        uStack_8000 = CONCAT44(uStack_82d0._4_4_ * 1.442695,(float)uStack_82d0 * 1.442695);
        local_8018 = 0x3f0000003f000000;
        uStack_8010 = 0x3f0000003f000000;
        fVar173 = (float)local_82d8 * 1.442695 + 0.5;
        fVar183 = local_82d8._4_4_ * 1.442695 + 0.5;
        fVar191 = (float)uStack_82d0 * 1.442695 + 0.5;
        fVar199 = uStack_82d0._4_4_ * 1.442695 + 0.5;
        local_6a48 = CONCAT44(fVar183,fVar173);
        uStack_6a40 = CONCAT44(fVar199,fVar191);
        local_8338 = CONCAT44((int)fVar183,(int)fVar173);
        uStack_8330 = CONCAT44((int)fVar199,(int)fVar191);
        local_8368 = (float)(int)fVar173;
        fStack_8364 = (float)(int)fVar183;
        fStack_8360 = (float)(int)fVar191;
        fStack_835c = (float)(int)fVar199;
        local_8358 = CONCAT44(fStack_8364,local_8368);
        uStack_8350 = CONCAT44(fStack_835c,fStack_8360);
        local_6878 = CONCAT44(fVar183,fVar173);
        uStack_6870 = CONCAT44(fVar199,fVar191);
        local_6868 = local_8358;
        uStack_6860 = uStack_8350;
        local_8398 = CONCAT44(-(uint)(fVar183 < fStack_8364),-(uint)(fVar173 < local_8368));
        uStack_8390 = CONCAT44(-(uint)(fVar199 < fStack_835c),-(uint)(fVar191 < fStack_8360));
        local_66e8 = local_8398;
        uStack_66e0 = uStack_8390;
        local_66f8 = 0x3f8000003f800000;
        uStack_66f0 = 0x3f8000003f800000;
        local_8398 = local_8398 & 0x3f8000003f800000;
        uStack_8390 = uStack_8390 & 0x3f8000003f800000;
        local_6c88 = local_8358;
        uStack_6c80 = uStack_8350;
        local_6c98._0_4_ = (float)local_8398;
        local_6c98._4_4_ = (float)(local_8398 >> 0x20);
        uStack_6c90._0_4_ = (float)uStack_8390;
        uStack_6c90._4_4_ = (float)(uStack_8390 >> 0x20);
        local_8368 = local_8368 - (float)local_6c98;
        fStack_8364 = fStack_8364 - local_6c98._4_4_;
        fStack_8360 = fStack_8360 - (float)uStack_6c90;
        fStack_835c = fStack_835c - uStack_6c90._4_4_;
        local_6180 = &local_8368;
        local_6128 = ::_ps_cephes_exp_C1;
        local_82c0 = &local_8348;
        local_60e8 = local_8348;
        uStack_60e0 = uStack_8340;
        local_6108 = CONCAT44(fStack_8364,local_8368);
        uStack_6100 = CONCAT44(fStack_835c,fStack_8360);
        local_6118[0] = 0.6933594;
        local_6118[1] = 0.6933594;
        afStack_6110[0] = 0.6933594;
        afStack_6110[1] = 0.6933594;
        local_60f8 = local_8368 * 0.6933594;
        fStack_60f4 = fStack_8364 * 0.6933594;
        fStack_60f0 = fStack_8360 * 0.6933594;
        fStack_60ec = fStack_835c * 0.6933594;
        local_8348 = CONCAT44(local_82d8._4_4_ - fStack_60f4,(float)local_82d8 - local_60f8);
        uStack_8340._0_4_ = (float)uStack_82d0 - fStack_60f0;
        uStack_8340._4_4_ = uStack_82d0._4_4_ - fStack_60ec;
        local_6188 = ::_ps_cephes_exp_C2;
        local_6148 = local_8348;
        uStack_6140 = uStack_8340;
        local_6168 = CONCAT44(fStack_8364,local_8368);
        uStack_6160 = CONCAT44(fStack_835c,fStack_8360);
        local_6178[0] = -0.00021219444;
        local_6178[1] = -0.00021219444;
        afStack_6170[0] = -0.00021219444;
        afStack_6170[1] = -0.00021219444;
        local_6158 = local_8368 * -0.00021219444;
        fStack_6154 = fStack_8364 * -0.00021219444;
        fStack_6150 = fStack_8360 * -0.00021219444;
        fStack_614c = fStack_835c * -0.00021219444;
        fVar173 = ((float)local_82d8 - local_60f8) - local_6158;
        fVar183 = (local_82d8._4_4_ - fStack_60f4) - fStack_6154;
        fVar191 = ((float)uStack_82d0 - fStack_60f0) - fStack_6150;
        fVar199 = (uStack_82d0._4_4_ - fStack_60ec) - fStack_614c;
        local_8348 = CONCAT44(fVar183,fVar173);
        uStack_8340._0_4_ = fVar191;
        uStack_8340._4_4_ = fVar199;
        local_82f8 = local_8348;
        uStack_82f0 = uStack_8340;
        local_8308 = local_8348;
        uStack_8300 = uStack_8340;
        local_8358 = CONCAT44(fVar183 * fVar183,fVar173 * fVar173);
        uStack_8350 = CONCAT44(fVar199 * fVar199,fVar191 * fVar191);
        local_82b0 = &local_83a8;
        local_8180 = ::_ps_cephes_exp_p1;
        local_8158 = 0x3950696739506967;
        uStack_8150 = 0x3950696739506967;
        local_8168 = local_8348;
        uStack_8160 = uStack_8340;
        local_80e8 = fVar173 * 0.00019875691;
        fStack_80e4 = fVar183 * 0.00019875691;
        fStack_80e0 = fVar191 * 0.00019875691;
        fStack_80dc = fVar199 * 0.00019875691;
        local_80f8[0] = 0.0013981999;
        local_80f8[1] = 0.0013981999;
        afStack_80f0[0] = 0.0013981999;
        afStack_80f0[1] = 0.0013981999;
        local_83a8 = CONCAT44(fStack_80e4 + 0.0013981999,local_80e8 + 0.0013981999);
        uStack_83a0 = CONCAT44(fStack_80dc + 0.0013981999,fStack_80e0 + 0.0013981999);
        local_81c0 = ::_ps_cephes_exp_p2;
        local_8198 = local_83a8;
        uStack_8190 = uStack_83a0;
        local_81a8 = local_8348;
        uStack_81a0 = uStack_8340;
        local_80c8 = (local_80e8 + 0.0013981999) * fVar173;
        fStack_80c4 = (fStack_80e4 + 0.0013981999) * fVar183;
        fStack_80c0 = (fStack_80e0 + 0.0013981999) * fVar191;
        fStack_80bc = (fStack_80dc + 0.0013981999) * fVar199;
        local_80d8[0] = 0.008333452;
        local_80d8[1] = 0.008333452;
        afStack_80d0[0] = 0.008333452;
        afStack_80d0[1] = 0.008333452;
        local_83a8 = CONCAT44(fStack_80c4 + 0.008333452,local_80c8 + 0.008333452);
        uStack_83a0 = CONCAT44(fStack_80bc + 0.008333452,fStack_80c0 + 0.008333452);
        local_8200 = ::_ps_cephes_exp_p3;
        local_81d8 = local_83a8;
        uStack_81d0 = uStack_83a0;
        local_81e8 = local_8348;
        uStack_81e0 = uStack_8340;
        local_80a8 = (local_80c8 + 0.008333452) * fVar173;
        fStack_80a4 = (fStack_80c4 + 0.008333452) * fVar183;
        fStack_80a0 = (fStack_80c0 + 0.008333452) * fVar191;
        fStack_809c = (fStack_80bc + 0.008333452) * fVar199;
        local_80b8[0] = 0.041665796;
        local_80b8[1] = 0.041665796;
        afStack_80b0[0] = 0.041665796;
        afStack_80b0[1] = 0.041665796;
        local_83a8 = CONCAT44(fStack_80a4 + 0.041665796,local_80a8 + 0.041665796);
        uStack_83a0 = CONCAT44(fStack_809c + 0.041665796,fStack_80a0 + 0.041665796);
        local_8240 = ::_ps_cephes_exp_p4;
        local_8218 = local_83a8;
        uStack_8210 = uStack_83a0;
        local_8228 = local_8348;
        uStack_8220 = uStack_8340;
        local_8088 = (local_80a8 + 0.041665796) * fVar173;
        fStack_8084 = (fStack_80a4 + 0.041665796) * fVar183;
        fStack_8080 = (fStack_80a0 + 0.041665796) * fVar191;
        fStack_807c = (fStack_809c + 0.041665796) * fVar199;
        local_8098[0] = 0.16666666;
        local_8098[1] = 0.16666666;
        afStack_8090[0] = 0.16666666;
        afStack_8090[1] = 0.16666666;
        local_83a8 = CONCAT44(fStack_8084 + 0.16666666,local_8088 + 0.16666666);
        uStack_83a0 = CONCAT44(fStack_807c + 0.16666666,fStack_8080 + 0.16666666);
        local_8280 = ::_ps_cephes_exp_p5;
        local_8258 = local_83a8;
        uStack_8250 = uStack_83a0;
        local_8268 = local_8348;
        uStack_8260 = uStack_8340;
        local_8068 = (local_8088 + 0.16666666) * fVar173;
        fStack_8064 = (fStack_8084 + 0.16666666) * fVar183;
        fStack_8060 = (fStack_8080 + 0.16666666) * fVar191;
        fStack_805c = (fStack_807c + 0.16666666) * fVar199;
        local_8078[0] = 0.5;
        local_8078[1] = 0.5;
        afStack_8070[0] = 0.5;
        afStack_8070[1] = 0.5;
        local_83a8 = CONCAT44(fStack_8064 + 0.5,local_8068 + 0.5);
        uStack_83a0 = CONCAT44(fStack_805c + 0.5,fStack_8060 + 0.5);
        local_82b8 = &local_8358;
        local_8298 = local_83a8;
        uStack_8290 = uStack_83a0;
        local_82a8 = local_8358;
        uStack_82a0 = uStack_8350;
        local_8048 = (local_8068 + 0.5) * fVar173 * fVar173;
        fStack_8044 = (fStack_8064 + 0.5) * fVar183 * fVar183;
        fStack_8040 = (fStack_8060 + 0.5) * fVar191 * fVar191;
        fStack_803c = (fStack_805c + 0.5) * fVar199 * fVar199;
        local_8058 = local_8348;
        uStack_8050 = uStack_8340;
        local_83a8 = CONCAT44(fStack_8044 + fVar183,local_8048 + fVar173);
        uStack_83a0 = CONCAT44(fStack_803c + fVar199,fStack_8040 + fVar191);
        local_8028 = local_83a8;
        uStack_8020 = uStack_83a0;
        local_8038 = 0x3f8000003f800000;
        uStack_8030 = 0x3f8000003f800000;
        local_9af8 = local_8048 + fVar173 + 1.0;
        fStack_9af4 = fStack_8044 + fVar183 + 1.0;
        fStack_9af0 = fStack_8040 + fVar191 + 1.0;
        fStack_9aec = fStack_803c + fVar199 + 1.0;
        local_83a8 = CONCAT44(fStack_9af4,local_9af8);
        uStack_83a0 = CONCAT44(fStack_9aec,fStack_9af0);
        local_6a58 = CONCAT44(fStack_8364,local_8368);
        uStack_6a50 = CONCAT44(fStack_835c,fStack_8360);
        local_5ba8 = CONCAT44((int)fStack_8364,(int)local_8368);
        uStack_5ba0 = CONCAT44((int)fStack_835c,(int)fStack_8360);
        local_5bb8 = 0x7f0000007f;
        uStack_5bb0 = 0x7f0000007f;
        iVar203 = (int)local_8368 + 0x7f;
        fStack_8374 = (float)((int)fStack_8364 + 0x7f);
        fStack_8370 = (float)((int)fStack_8360 + 0x7f);
        fStack_836c = (float)((int)fStack_835c + 0x7f);
        local_5a28 = CONCAT44(fStack_8374,iVar203);
        uStack_5a20 = CONCAT44(fStack_836c,fStack_8370);
        local_5a2c = 0x17;
        local_8378 = (float)(iVar203 * 0x800000);
        local_83b8 = CONCAT44(fStack_8374,local_8378);
        uStack_83b0 = CONCAT44(fStack_836c,fStack_8370);
        local_8318 = local_83a8;
        uStack_8310 = uStack_83a0;
        local_9af8 = local_9af8 * local_8378;
        fStack_9af4 = fStack_9af4 * fStack_8374;
        fStack_9af0 = fStack_9af0 * fStack_8370;
        fStack_9aec = fStack_9aec * fStack_836c;
        local_83a8 = CONCAT44(fStack_9af4,local_9af8);
        uStack_83a0 = CONCAT44(fStack_9aec,fStack_9af0);
        local_9d98 = local_83a8;
        uStack_9d90 = uStack_83a0;
        local_9af8 = local_9af8 + 1.0;
        fStack_9af4 = fStack_9af4 + 1.0;
        fStack_9af0 = fStack_9af0 + 1.0;
        fStack_9aec = fStack_9aec + 1.0;
        auVar55._8_8_ = 0x3f8000003f800000;
        auVar55._0_8_ = 0x3f8000003f800000;
        auVar54._4_4_ = fStack_9af4;
        auVar54._0_4_ = local_9af8;
        auVar54._8_4_ = fStack_9af0;
        auVar54._12_4_ = fStack_9aec;
        _local_bc88 = divps(auVar55,auVar54);
        local_9d88 = local_a6e8;
        uStack_9d80 = uStack_a6e0;
        local_9ae8 = local_a6e8;
        uStack_9ae0 = uStack_a6e0;
        local_8328 = local_83b8;
        uStack_8320 = uStack_83b0;
        local_82d8 = uVar5;
        uStack_82d0 = uVar6;
        local_8278 = local_82c0;
        local_8270 = local_82b0;
        local_8238 = local_82c0;
        local_8230 = local_82b0;
        local_81f8 = local_82c0;
        local_81f0 = local_82b0;
        local_81b8 = local_82c0;
        local_81b0 = local_82b0;
        local_8178 = local_82c0;
        local_8170 = local_82b0;
        local_6c98 = local_8398;
        uStack_6c90 = uStack_8390;
        local_6190 = local_82c0;
        local_6130 = local_82c0;
        local_6120 = local_6180;
        local_5908 = local_83b8;
        uStack_5900 = uStack_83b0;
        break;
      case 5:
        local_a508 = local_c0c8;
        uStack_a500 = uStack_c0c0;
        local_97a8 = 0;
        uStack_97a0 = 0;
        local_9a08 = 0x3f8000003f800000;
        uStack_9a00 = 0x3f8000003f800000;
        local_9788 = local_c0c8;
        uStack_9780 = uStack_c0c0;
        local_9798 = 0x42b0c0a542b0c0a5;
        uStack_9790 = 0x42b0c0a542b0c0a5;
        auVar68._8_8_ = uStack_c0c0;
        auVar68._0_8_ = local_c0c8;
        auVar67._8_8_ = 0x42b0c0a542b0c0a5;
        auVar67._0_8_ = 0x42b0c0a542b0c0a5;
        auVar177 = minps(auVar68,auVar67);
        local_99c8 = auVar177._0_8_;
        uStack_99c0 = auVar177._8_8_;
        local_97b8 = local_99c8;
        uStack_97b0 = uStack_99c0;
        local_97c8 = 0xc2b0c0a5c2b0c0a5;
        uStack_97c0 = 0xc2b0c0a5c2b0c0a5;
        auVar66._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar66._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar177 = maxps(auVar177,auVar66);
        local_99c8 = auVar177._0_8_;
        uStack_99c0 = auVar177._8_8_;
        local_9958 = local_99c8;
        uVar5 = local_9958;
        uStack_9950 = uStack_99c0;
        uVar6 = uStack_9950;
        local_9968 = 0x3fb8aa3b3fb8aa3b;
        uStack_9960 = 0x3fb8aa3b3fb8aa3b;
        local_9958._0_4_ = auVar177._0_4_;
        local_9958._4_4_ = auVar177._4_4_;
        uStack_9950._0_4_ = auVar177._8_4_;
        uStack_9950._4_4_ = auVar177._12_4_;
        local_9688 = CONCAT44(local_9958._4_4_ * 1.442695,(float)local_9958 * 1.442695);
        uStack_9680 = CONCAT44(uStack_9950._4_4_ * 1.442695,(float)uStack_9950 * 1.442695);
        local_9698 = 0x3f0000003f000000;
        uStack_9690 = 0x3f0000003f000000;
        fVar175 = (float)local_9958 * 1.442695 + 0.5;
        fVar185 = local_9958._4_4_ * 1.442695 + 0.5;
        fVar193 = (float)uStack_9950 * 1.442695 + 0.5;
        fVar201 = uStack_9950._4_4_ * 1.442695 + 0.5;
        local_6988 = CONCAT44(fVar185,fVar175);
        uStack_6980 = CONCAT44(fVar201,fVar193);
        local_99b8 = CONCAT44((int)fVar185,(int)fVar175);
        uStack_99b0 = CONCAT44((int)fVar201,(int)fVar193);
        local_99e8 = (float)(int)fVar175;
        fStack_99e4 = (float)(int)fVar185;
        fStack_99e0 = (float)(int)fVar193;
        fStack_99dc = (float)(int)fVar201;
        local_99d8 = CONCAT44(fStack_99e4,local_99e8);
        uStack_99d0 = CONCAT44(fStack_99dc,fStack_99e0);
        local_67b8 = CONCAT44(fVar185,fVar175);
        uStack_67b0 = CONCAT44(fVar201,fVar193);
        local_67a8 = local_99d8;
        uStack_67a0 = uStack_99d0;
        local_9a18 = CONCAT44(-(uint)(fVar185 < fStack_99e4),-(uint)(fVar175 < local_99e8));
        uStack_9a10 = CONCAT44(-(uint)(fVar201 < fStack_99dc),-(uint)(fVar193 < fStack_99e0));
        local_6628 = local_9a18;
        uStack_6620 = uStack_9a10;
        local_6638 = 0x3f8000003f800000;
        uStack_6630 = 0x3f8000003f800000;
        local_9a18 = local_9a18 & 0x3f8000003f800000;
        uStack_9a10 = uStack_9a10 & 0x3f8000003f800000;
        local_6bc8 = local_99d8;
        uStack_6bc0 = uStack_99d0;
        local_6bd8._0_4_ = (float)local_9a18;
        local_6bd8._4_4_ = (float)(local_9a18 >> 0x20);
        uStack_6bd0._0_4_ = (float)uStack_9a10;
        uStack_6bd0._4_4_ = (float)(uStack_9a10 >> 0x20);
        local_99e8 = local_99e8 - (float)local_6bd8;
        fStack_99e4 = fStack_99e4 - local_6bd8._4_4_;
        fStack_99e0 = fStack_99e0 - (float)uStack_6bd0;
        fStack_99dc = fStack_99dc - uStack_6bd0._4_4_;
        local_5d00 = &local_99e8;
        local_5ca8 = ::_ps_cephes_exp_C1;
        local_9940 = &local_99c8;
        local_5c68 = local_99c8;
        uStack_5c60 = uStack_99c0;
        local_5c88 = CONCAT44(fStack_99e4,local_99e8);
        uStack_5c80 = CONCAT44(fStack_99dc,fStack_99e0);
        local_5c98[0] = 0.6933594;
        local_5c98[1] = 0.6933594;
        afStack_5c90[0] = 0.6933594;
        afStack_5c90[1] = 0.6933594;
        local_5c78 = local_99e8 * 0.6933594;
        fStack_5c74 = fStack_99e4 * 0.6933594;
        fStack_5c70 = fStack_99e0 * 0.6933594;
        fStack_5c6c = fStack_99dc * 0.6933594;
        local_99c8 = CONCAT44(local_9958._4_4_ - fStack_5c74,(float)local_9958 - local_5c78);
        uStack_99c0._0_4_ = (float)uStack_9950 - fStack_5c70;
        uStack_99c0._4_4_ = uStack_9950._4_4_ - fStack_5c6c;
        local_5d08 = ::_ps_cephes_exp_C2;
        local_5cc8 = local_99c8;
        uStack_5cc0 = uStack_99c0;
        local_5ce8 = CONCAT44(fStack_99e4,local_99e8);
        uStack_5ce0 = CONCAT44(fStack_99dc,fStack_99e0);
        local_5cf8[0] = -0.00021219444;
        local_5cf8[1] = -0.00021219444;
        afStack_5cf0[0] = -0.00021219444;
        afStack_5cf0[1] = -0.00021219444;
        local_5cd8 = local_99e8 * -0.00021219444;
        fStack_5cd4 = fStack_99e4 * -0.00021219444;
        fStack_5cd0 = fStack_99e0 * -0.00021219444;
        fStack_5ccc = fStack_99dc * -0.00021219444;
        fVar175 = ((float)local_9958 - local_5c78) - local_5cd8;
        fVar185 = (local_9958._4_4_ - fStack_5c74) - fStack_5cd4;
        fVar193 = ((float)uStack_9950 - fStack_5c70) - fStack_5cd0;
        fVar201 = (uStack_9950._4_4_ - fStack_5c6c) - fStack_5ccc;
        local_99c8 = CONCAT44(fVar185,fVar175);
        uStack_99c0._0_4_ = fVar193;
        uStack_99c0._4_4_ = fVar201;
        local_9978 = local_99c8;
        uStack_9970 = uStack_99c0;
        local_9988 = local_99c8;
        uStack_9980 = uStack_99c0;
        local_99d8 = CONCAT44(fVar185 * fVar185,fVar175 * fVar175);
        uStack_99d0 = CONCAT44(fVar201 * fVar201,fVar193 * fVar193);
        local_9930 = &local_9a28;
        local_9800 = ::_ps_cephes_exp_p1;
        local_97d8 = 0x3950696739506967;
        uStack_97d0 = 0x3950696739506967;
        local_97e8 = local_99c8;
        uStack_97e0 = uStack_99c0;
        local_9768 = fVar175 * 0.00019875691;
        fStack_9764 = fVar185 * 0.00019875691;
        fStack_9760 = fVar193 * 0.00019875691;
        fStack_975c = fVar201 * 0.00019875691;
        local_9778[0] = 0.0013981999;
        local_9778[1] = 0.0013981999;
        afStack_9770[0] = 0.0013981999;
        afStack_9770[1] = 0.0013981999;
        local_9a28 = CONCAT44(fStack_9764 + 0.0013981999,local_9768 + 0.0013981999);
        uStack_9a20 = CONCAT44(fStack_975c + 0.0013981999,fStack_9760 + 0.0013981999);
        local_9840 = ::_ps_cephes_exp_p2;
        local_9818 = local_9a28;
        uStack_9810 = uStack_9a20;
        local_9828 = local_99c8;
        uStack_9820 = uStack_99c0;
        local_9748 = (local_9768 + 0.0013981999) * fVar175;
        fStack_9744 = (fStack_9764 + 0.0013981999) * fVar185;
        fStack_9740 = (fStack_9760 + 0.0013981999) * fVar193;
        fStack_973c = (fStack_975c + 0.0013981999) * fVar201;
        local_9758[0] = 0.008333452;
        local_9758[1] = 0.008333452;
        afStack_9750[0] = 0.008333452;
        afStack_9750[1] = 0.008333452;
        local_9a28 = CONCAT44(fStack_9744 + 0.008333452,local_9748 + 0.008333452);
        uStack_9a20 = CONCAT44(fStack_973c + 0.008333452,fStack_9740 + 0.008333452);
        local_9880 = ::_ps_cephes_exp_p3;
        local_9858 = local_9a28;
        uStack_9850 = uStack_9a20;
        local_9868 = local_99c8;
        uStack_9860 = uStack_99c0;
        local_9728 = (local_9748 + 0.008333452) * fVar175;
        fStack_9724 = (fStack_9744 + 0.008333452) * fVar185;
        fStack_9720 = (fStack_9740 + 0.008333452) * fVar193;
        fStack_971c = (fStack_973c + 0.008333452) * fVar201;
        local_9738[0] = 0.041665796;
        local_9738[1] = 0.041665796;
        afStack_9730[0] = 0.041665796;
        afStack_9730[1] = 0.041665796;
        local_9a28 = CONCAT44(fStack_9724 + 0.041665796,local_9728 + 0.041665796);
        uStack_9a20 = CONCAT44(fStack_971c + 0.041665796,fStack_9720 + 0.041665796);
        local_98c0 = ::_ps_cephes_exp_p4;
        local_9898 = local_9a28;
        uStack_9890 = uStack_9a20;
        local_98a8 = local_99c8;
        uStack_98a0 = uStack_99c0;
        local_9708 = (local_9728 + 0.041665796) * fVar175;
        fStack_9704 = (fStack_9724 + 0.041665796) * fVar185;
        fStack_9700 = (fStack_9720 + 0.041665796) * fVar193;
        fStack_96fc = (fStack_971c + 0.041665796) * fVar201;
        local_9718[0] = 0.16666666;
        local_9718[1] = 0.16666666;
        afStack_9710[0] = 0.16666666;
        afStack_9710[1] = 0.16666666;
        local_9a28 = CONCAT44(fStack_9704 + 0.16666666,local_9708 + 0.16666666);
        uStack_9a20 = CONCAT44(fStack_96fc + 0.16666666,fStack_9700 + 0.16666666);
        local_9900 = ::_ps_cephes_exp_p5;
        local_98d8 = local_9a28;
        uStack_98d0 = uStack_9a20;
        local_98e8 = local_99c8;
        uStack_98e0 = uStack_99c0;
        local_96e8 = (local_9708 + 0.16666666) * fVar175;
        fStack_96e4 = (fStack_9704 + 0.16666666) * fVar185;
        fStack_96e0 = (fStack_9700 + 0.16666666) * fVar193;
        fStack_96dc = (fStack_96fc + 0.16666666) * fVar201;
        local_96f8[0] = 0.5;
        local_96f8[1] = 0.5;
        afStack_96f0[0] = 0.5;
        afStack_96f0[1] = 0.5;
        local_9a28 = CONCAT44(fStack_96e4 + 0.5,local_96e8 + 0.5);
        uStack_9a20 = CONCAT44(fStack_96dc + 0.5,fStack_96e0 + 0.5);
        local_9938 = &local_99d8;
        local_9918 = local_9a28;
        uStack_9910 = uStack_9a20;
        local_9928 = local_99d8;
        uStack_9920 = uStack_99d0;
        local_96c8 = (local_96e8 + 0.5) * fVar175 * fVar175;
        fStack_96c4 = (fStack_96e4 + 0.5) * fVar185 * fVar185;
        fStack_96c0 = (fStack_96e0 + 0.5) * fVar193 * fVar193;
        fStack_96bc = (fStack_96dc + 0.5) * fVar201 * fVar201;
        local_96d8 = local_99c8;
        uStack_96d0 = uStack_99c0;
        local_9a28 = CONCAT44(fStack_96c4 + fVar185,local_96c8 + fVar175);
        uStack_9a20 = CONCAT44(fStack_96bc + fVar201,fStack_96c0 + fVar193);
        local_96a8 = local_9a28;
        uStack_96a0 = uStack_9a20;
        local_96b8 = 0x3f8000003f800000;
        uStack_96b0 = 0x3f8000003f800000;
        fVar175 = local_96c8 + fVar175 + 1.0;
        fVar185 = fStack_96c4 + fVar185 + 1.0;
        fVar193 = fStack_96c0 + fVar193 + 1.0;
        fVar201 = fStack_96bc + fVar201 + 1.0;
        local_9a28 = CONCAT44(fVar185,fVar175);
        uStack_9a20 = CONCAT44(fVar201,fVar193);
        local_6998 = CONCAT44(fStack_99e4,local_99e8);
        uStack_6990 = CONCAT44(fStack_99dc,fStack_99e0);
        local_5ae8 = CONCAT44((int)fStack_99e4,(int)local_99e8);
        uStack_5ae0 = CONCAT44((int)fStack_99dc,(int)fStack_99e0);
        local_5af8 = 0x7f0000007f;
        uStack_5af0 = 0x7f0000007f;
        iVar203 = (int)local_99e8 + 0x7f;
        fStack_99f4 = (float)((int)fStack_99e4 + 0x7f);
        fStack_99f0 = (float)((int)fStack_99e0 + 0x7f);
        fStack_99ec = (float)((int)fStack_99dc + 0x7f);
        local_5968 = CONCAT44(fStack_99f4,iVar203);
        uStack_5960 = CONCAT44(fStack_99ec,fStack_99f0);
        local_596c = 0x17;
        local_99f8 = (float)(iVar203 * 0x800000);
        local_9a38 = CONCAT44(fStack_99f4,local_99f8);
        uStack_9a30 = CONCAT44(fStack_99ec,fStack_99f0);
        local_9998 = local_9a28;
        uStack_9990 = uStack_9a20;
        fVar175 = fVar175 * local_99f8;
        fVar185 = fVar185 * fStack_99f4;
        fVar193 = fVar193 * fStack_99f0;
        fVar201 = fVar201 * fStack_99ec;
        local_9a28 = CONCAT44(fVar185,fVar175);
        uStack_9a20 = CONCAT44(fVar201,fVar193);
        local_a4dc = 0x3f800000;
        local_a4f8 = 0x3f800000;
        uStack_a4f4 = 0x3f800000;
        uStack_a4f0 = 0x3f800000;
        uStack_a4ec = 0x3f800000;
        local_9e58 = 0x3f8000003f800000;
        uStack_9e50 = 0x3f8000003f800000;
        local_9e48 = local_9a28;
        uStack_9e40 = uStack_9a20;
        fVar175 = fVar175 + 1.0;
        fVar185 = fVar185 + 1.0;
        fVar193 = fVar193 + 1.0;
        fVar201 = fVar201 + 1.0;
        local_2ef8 = CONCAT44(fVar185,fVar175);
        uStack_2ef0._0_4_ = fVar193;
        uStack_2ef0._4_4_ = fVar201;
        local_2f18 = 0x3f8000003f800000;
        uStack_2f10 = 0x3f8000003f800000;
        local_2bd8 = 0;
        uStack_2bd0 = 0;
        local_8e8 = local_2ef8;
        uStack_8e0 = uStack_2ef0;
        local_8f8 = 0;
        uStack_8f0 = 0;
        local_2f28 = -(uint)(fVar175 <= 0.0);
        iStack_2f24 = -(uint)(fVar185 <= 0.0);
        iStack_2f20 = -(uint)(fVar193 <= 0.0);
        iStack_2f1c = -(uint)(fVar201 <= 0.0);
        local_2be8 = local_2ef8;
        uStack_2be0 = uStack_2ef0;
        local_2bf8 = 0x80000000800000;
        uStack_2bf0 = 0x80000000800000;
        auVar133._8_8_ = uStack_2ef0;
        auVar133._0_8_ = local_2ef8;
        auVar132._8_8_ = 0x80000000800000;
        auVar132._0_8_ = 0x80000000800000;
        auVar177 = maxps(auVar133,auVar132);
        local_2ef8 = auVar177._0_8_;
        uStack_2ef0 = auVar177._8_8_;
        local_7c8 = local_2ef8;
        uStack_7c0 = uStack_2ef0;
        local_828 = local_2ef8;
        uVar166 = local_828;
        uStack_820 = uStack_2ef0;
        uVar167 = uStack_820;
        local_82c = 0x17;
        local_828._0_4_ = auVar177._0_4_;
        local_828._4_4_ = auVar177._4_4_;
        uStack_820._0_4_ = auVar177._8_4_;
        uStack_820._4_4_ = auVar177._12_4_;
        local_2998 = local_2ef8;
        uStack_2990 = uStack_2ef0;
        local_29a8 = 0x807fffff807fffff;
        uStack_29a0 = 0x807fffff807fffff;
        local_648 = local_2ef8 & 0x807fffff807fffff;
        uStack_640 = uStack_2ef0 & 0x807fffff807fffff;
        local_658 = 0x3f0000003f000000;
        uStack_650 = 0x3f0000003f000000;
        local_29f8 = local_648 | 0x3f0000003f000000;
        uStack_29f0 = uStack_640 | 0x3f0000003f000000;
        local_4c8 = CONCAT44(local_828._4_4_ >> 0x17,(uint)local_828 >> 0x17);
        uStack_4c0 = CONCAT44(uStack_820._4_4_ >> 0x17,(uint)uStack_820 >> 0x17);
        local_4d8 = 0x7f0000007f;
        uStack_4d0 = 0x7f0000007f;
        local_2f08 = ((uint)local_828 >> 0x17) - 0x7f;
        iStack_2f04 = (local_828._4_4_ >> 0x17) - 0x7f;
        iStack_2f00 = ((uint)uStack_820 >> 0x17) - 0x7f;
        iStack_2efc = (uStack_820._4_4_ >> 0x17) - 0x7f;
        local_2ee8 = CONCAT44(iStack_2f04,local_2f08);
        uStack_2ee0 = CONCAT44(iStack_2efc,iStack_2f00);
        local_2a38 = CONCAT44((float)iStack_2f04,(float)local_2f08);
        uStack_2a30 = CONCAT44((float)iStack_2efc,(float)iStack_2f00);
        local_2a48 = 0x3f8000003f800000;
        uStack_2a40 = 0x3f8000003f800000;
        local_2f38 = (float)local_2f08 + 1.0;
        fStack_2f34 = (float)iStack_2f04 + 1.0;
        fStack_2f30 = (float)iStack_2f00 + 1.0;
        fStack_2f2c = (float)iStack_2efc + 1.0;
        local_418 = 0x3f3504f33f3504f3;
        uStack_410 = 0x3f3504f33f3504f3;
        local_408._0_4_ = (float)local_29f8;
        local_408._4_4_ = (float)(local_29f8 >> 0x20);
        uStack_400._0_4_ = (float)uStack_29f0;
        uStack_400._4_4_ = (float)(uStack_29f0 >> 0x20);
        local_2f48 = -(uint)((float)local_408 < 0.70710677);
        iStack_2f44 = -(uint)(local_408._4_4_ < 0.70710677);
        iStack_2f40 = -(uint)((float)uStack_400 < 0.70710677);
        iStack_2f3c = -(uint)(uStack_400._4_4_ < 0.70710677);
        local_29c8 = CONCAT44(iStack_2f44,local_2f48);
        uStack_29c0 = CONCAT44(iStack_2f3c,iStack_2f40);
        local_2f58 = local_29f8 & local_29c8;
        uStack_2f50 = uStack_29f0 & uStack_29c0;
        local_2a08 = 0x3f8000003f800000;
        uStack_2a00 = 0x3f8000003f800000;
        local_2ef8 = CONCAT44(local_408._4_4_ - 1.0,(float)local_408 - 1.0);
        uStack_2ef0._0_4_ = (float)uStack_400 - 1.0;
        uStack_2ef0._4_4_ = uStack_400._4_4_ - 1.0;
        local_2a18 = CONCAT44(fStack_2f34,local_2f38);
        uStack_2a10 = CONCAT44(fStack_2f2c,fStack_2f30);
        local_29e8 = CONCAT44(iStack_2f44,local_2f48);
        uStack_29e0 = CONCAT44(iStack_2f3c,iStack_2f40);
        local_29d8 = 0x3f8000003f800000;
        uStack_29d0 = 0x3f8000003f800000;
        uVar204 = local_29e8 & 0x3f8000003f800000;
        uVar205 = uStack_29e0 & 0x3f8000003f800000;
        local_2a28._0_4_ = (float)uVar204;
        local_2a28._4_4_ = (float)(uVar204 >> 0x20);
        uStack_2a20._0_4_ = (float)uVar205;
        uStack_2a20._4_4_ = (float)(uVar205 >> 0x20);
        local_2f38 = local_2f38 - (float)local_2a28;
        fStack_2f34 = fStack_2f34 - local_2a28._4_4_;
        fStack_2f30 = fStack_2f30 - (float)uStack_2a20;
        fStack_2f2c = fStack_2f2c - uStack_2a20._4_4_;
        local_2a58 = local_2ef8;
        uStack_2a50 = uStack_2ef0;
        local_2a68._0_4_ = (float)local_2f58;
        local_2a68._4_4_ = (float)(local_2f58 >> 0x20);
        uStack_2a60._0_4_ = (float)uStack_2f50;
        uStack_2a60._4_4_ = (float)(uStack_2f50 >> 0x20);
        local_2a68._0_4_ = ((float)local_408 - 1.0) + (float)local_2a68;
        local_2a68._4_4_ = (local_408._4_4_ - 1.0) + local_2a68._4_4_;
        uStack_2a60._0_4_ = ((float)uStack_400 - 1.0) + (float)uStack_2a60;
        uStack_2a60._4_4_ = (uStack_400._4_4_ - 1.0) + uStack_2a60._4_4_;
        local_2ef8 = CONCAT44(local_2a68._4_4_,(float)local_2a68);
        uStack_2ef0._0_4_ = (float)uStack_2a60;
        uStack_2ef0._4_4_ = uStack_2a60._4_4_;
        local_2e88 = local_2ef8;
        uStack_2e80 = uStack_2ef0;
        local_2e98 = local_2ef8;
        uStack_2e90 = uStack_2ef0;
        local_2f68 = (float)local_2a68 * (float)local_2a68;
        fStack_2f64 = local_2a68._4_4_ * local_2a68._4_4_;
        fStack_2f60 = (float)uStack_2a60 * (float)uStack_2a60;
        fStack_2f5c = uStack_2a60._4_4_ * uStack_2a60._4_4_;
        local_2e30 = &local_2f78;
        local_2e70 = &local_2ef8;
        local_2c30 = ::_ps_cephes_log_p1;
        local_2c08 = 0x3d9021bb3d9021bb;
        uStack_2c00 = 0x3d9021bb3d9021bb;
        local_2c18 = local_2ef8;
        uStack_2c10 = uStack_2ef0;
        local_2bb8 = (float)local_2a68 * 0.070376836;
        fStack_2bb4 = local_2a68._4_4_ * 0.070376836;
        fStack_2bb0 = (float)uStack_2a60 * 0.070376836;
        fStack_2bac = uStack_2a60._4_4_ * 0.070376836;
        local_2bc8[0] = -0.1151461;
        local_2bc8[1] = -0.1151461;
        afStack_2bc0[0] = -0.1151461;
        afStack_2bc0[1] = -0.1151461;
        local_2f78 = CONCAT44(fStack_2bb4 + -0.1151461,local_2bb8 + -0.1151461);
        uStack_2f70 = CONCAT44(fStack_2bac + -0.1151461,fStack_2bb0 + -0.1151461);
        local_2c70 = ::_ps_cephes_log_p2;
        local_2c48 = local_2f78;
        uStack_2c40 = uStack_2f70;
        local_2c58 = local_2ef8;
        uStack_2c50 = uStack_2ef0;
        local_2b98 = (local_2bb8 + -0.1151461) * (float)local_2a68;
        fStack_2b94 = (fStack_2bb4 + -0.1151461) * local_2a68._4_4_;
        fStack_2b90 = (fStack_2bb0 + -0.1151461) * (float)uStack_2a60;
        fStack_2b8c = (fStack_2bac + -0.1151461) * uStack_2a60._4_4_;
        local_2ba8[0] = 0.116769984;
        local_2ba8[1] = 0.116769984;
        afStack_2ba0[0] = 0.116769984;
        afStack_2ba0[1] = 0.116769984;
        local_2f78 = CONCAT44(fStack_2b94 + 0.116769984,local_2b98 + 0.116769984);
        uStack_2f70 = CONCAT44(fStack_2b8c + 0.116769984,fStack_2b90 + 0.116769984);
        local_2cb0 = ::_ps_cephes_log_p3;
        local_2c88 = local_2f78;
        uStack_2c80 = uStack_2f70;
        local_2c98 = local_2ef8;
        uStack_2c90 = uStack_2ef0;
        local_2b78 = (local_2b98 + 0.116769984) * (float)local_2a68;
        fStack_2b74 = (fStack_2b94 + 0.116769984) * local_2a68._4_4_;
        fStack_2b70 = (fStack_2b90 + 0.116769984) * (float)uStack_2a60;
        fStack_2b6c = (fStack_2b8c + 0.116769984) * uStack_2a60._4_4_;
        local_2b88[0] = -0.12420141;
        local_2b88[1] = -0.12420141;
        afStack_2b80[0] = -0.12420141;
        afStack_2b80[1] = -0.12420141;
        local_2f78 = CONCAT44(fStack_2b74 + -0.12420141,local_2b78 + -0.12420141);
        uStack_2f70 = CONCAT44(fStack_2b6c + -0.12420141,fStack_2b70 + -0.12420141);
        local_2cf0 = ::_ps_cephes_log_p4;
        local_2cc8 = local_2f78;
        uStack_2cc0 = uStack_2f70;
        local_2cd8 = local_2ef8;
        uStack_2cd0 = uStack_2ef0;
        local_2b58 = (local_2b78 + -0.12420141) * (float)local_2a68;
        fStack_2b54 = (fStack_2b74 + -0.12420141) * local_2a68._4_4_;
        fStack_2b50 = (fStack_2b70 + -0.12420141) * (float)uStack_2a60;
        fStack_2b4c = (fStack_2b6c + -0.12420141) * uStack_2a60._4_4_;
        local_2b68[0] = 0.14249323;
        local_2b68[1] = 0.14249323;
        afStack_2b60[0] = 0.14249323;
        afStack_2b60[1] = 0.14249323;
        local_2f78 = CONCAT44(fStack_2b54 + 0.14249323,local_2b58 + 0.14249323);
        uStack_2f70 = CONCAT44(fStack_2b4c + 0.14249323,fStack_2b50 + 0.14249323);
        local_2d30 = ::_ps_cephes_log_p5;
        local_2d08 = local_2f78;
        uStack_2d00 = uStack_2f70;
        local_2d18 = local_2ef8;
        uStack_2d10 = uStack_2ef0;
        local_2b38 = (local_2b58 + 0.14249323) * (float)local_2a68;
        fStack_2b34 = (fStack_2b54 + 0.14249323) * local_2a68._4_4_;
        fStack_2b30 = (fStack_2b50 + 0.14249323) * (float)uStack_2a60;
        fStack_2b2c = (fStack_2b4c + 0.14249323) * uStack_2a60._4_4_;
        local_2b48[0] = -0.16668057;
        local_2b48[1] = -0.16668057;
        afStack_2b40[0] = -0.16668057;
        afStack_2b40[1] = -0.16668057;
        local_2f78 = CONCAT44(fStack_2b34 + -0.16668057,local_2b38 + -0.16668057);
        uStack_2f70 = CONCAT44(fStack_2b2c + -0.16668057,fStack_2b30 + -0.16668057);
        local_2d70 = ::_ps_cephes_log_p6;
        local_2d48 = local_2f78;
        uStack_2d40 = uStack_2f70;
        local_2d58 = local_2ef8;
        uStack_2d50 = uStack_2ef0;
        local_2b18 = (local_2b38 + -0.16668057) * (float)local_2a68;
        fStack_2b14 = (fStack_2b34 + -0.16668057) * local_2a68._4_4_;
        fStack_2b10 = (fStack_2b30 + -0.16668057) * (float)uStack_2a60;
        fStack_2b0c = (fStack_2b2c + -0.16668057) * uStack_2a60._4_4_;
        local_2b28[0] = 0.20000714;
        local_2b28[1] = 0.20000714;
        afStack_2b20[0] = 0.20000714;
        afStack_2b20[1] = 0.20000714;
        local_2f78 = CONCAT44(fStack_2b14 + 0.20000714,local_2b18 + 0.20000714);
        uStack_2f70 = CONCAT44(fStack_2b0c + 0.20000714,fStack_2b10 + 0.20000714);
        local_2db0 = ::_ps_cephes_log_p7;
        local_2d88 = local_2f78;
        uStack_2d80 = uStack_2f70;
        local_2d98 = local_2ef8;
        uStack_2d90 = uStack_2ef0;
        local_2af8 = (local_2b18 + 0.20000714) * (float)local_2a68;
        fStack_2af4 = (fStack_2b14 + 0.20000714) * local_2a68._4_4_;
        fStack_2af0 = (fStack_2b10 + 0.20000714) * (float)uStack_2a60;
        fStack_2aec = (fStack_2b0c + 0.20000714) * uStack_2a60._4_4_;
        local_2b08[0] = -0.24999994;
        local_2b08[1] = -0.24999994;
        afStack_2b00[0] = -0.24999994;
        afStack_2b00[1] = -0.24999994;
        local_2f78 = CONCAT44(fStack_2af4 + -0.24999994,local_2af8 + -0.24999994);
        uStack_2f70 = CONCAT44(fStack_2aec + -0.24999994,fStack_2af0 + -0.24999994);
        local_2df0 = ::_ps_cephes_log_p8;
        local_2dc8 = local_2f78;
        uStack_2dc0 = uStack_2f70;
        local_2dd8 = local_2ef8;
        uStack_2dd0 = uStack_2ef0;
        local_2ad8 = (local_2af8 + -0.24999994) * (float)local_2a68;
        fStack_2ad4 = (fStack_2af4 + -0.24999994) * local_2a68._4_4_;
        fStack_2ad0 = (fStack_2af0 + -0.24999994) * (float)uStack_2a60;
        fStack_2acc = (fStack_2aec + -0.24999994) * uStack_2a60._4_4_;
        local_2ae8[0] = 0.3333333;
        local_2ae8[1] = 0.3333333;
        afStack_2ae0[0] = 0.3333333;
        afStack_2ae0[1] = 0.3333333;
        local_2f78 = CONCAT44(fStack_2ad4 + 0.3333333,local_2ad8 + 0.3333333);
        uStack_2f70 = CONCAT44(fStack_2acc + 0.3333333,fStack_2ad0 + 0.3333333);
        local_2ea8 = local_2f78;
        uStack_2ea0 = uStack_2f70;
        local_2eb8 = local_2ef8;
        uStack_2eb0 = uStack_2ef0;
        fVar175 = (local_2ad8 + 0.3333333) * (float)local_2a68;
        fVar185 = (fStack_2ad4 + 0.3333333) * local_2a68._4_4_;
        fVar193 = (fStack_2ad0 + 0.3333333) * (float)uStack_2a60;
        fVar201 = (fStack_2acc + 0.3333333) * uStack_2a60._4_4_;
        local_2f78 = CONCAT44(fVar185,fVar175);
        uStack_2f70 = CONCAT44(fVar201,fVar193);
        local_2ed8 = CONCAT44(fStack_2f64,local_2f68);
        uStack_2ed0 = CONCAT44(fStack_2f5c,fStack_2f60);
        local_2ec8 = local_2f78;
        uStack_2ec0 = uStack_2f70;
        fVar175 = fVar175 * local_2f68;
        fVar185 = fVar185 * fStack_2f64;
        fVar193 = fVar193 * fStack_2f60;
        fVar201 = fVar201 * fStack_2f5c;
        local_2f78 = CONCAT44(fVar185,fVar175);
        uStack_2f70 = CONCAT44(fVar201,fVar193);
        local_2e60 = &local_2f38;
        local_2e28 = ::_ps_cephes_log_q1;
        local_2e08 = CONCAT44(fStack_2f34,local_2f38);
        uStack_2e00 = CONCAT44(fStack_2f2c,fStack_2f30);
        local_2e18[0] = -0.00021219444;
        local_2e18[1] = -0.00021219444;
        afStack_2e10[0] = -0.00021219444;
        afStack_2e10[1] = -0.00021219444;
        local_2ab8 = local_2f38 * -0.00021219444;
        fStack_2ab4 = fStack_2f34 * -0.00021219444;
        fStack_2ab0 = fStack_2f30 * -0.00021219444;
        fStack_2aac = fStack_2f2c * -0.00021219444;
        local_2ac8 = local_2f78;
        uStack_2ac0 = uStack_2f70;
        fVar175 = local_2ab8 + fVar175;
        fVar185 = fStack_2ab4 + fVar185;
        fVar193 = fStack_2ab0 + fVar193;
        fVar201 = fStack_2aac + fVar201;
        local_2f78 = CONCAT44(fVar185,fVar175);
        uStack_2f70 = CONCAT44(fVar201,fVar193);
        local_2970 = &local_2f68;
        local_2978 = ::_ps_0p5;
        local_2938 = local_2f78;
        uStack_2930 = uStack_2f70;
        local_2958 = CONCAT44(fStack_2f64,local_2f68);
        uStack_2950 = CONCAT44(fStack_2f5c,fStack_2f60);
        local_2968[0] = 0.5;
        local_2968[1] = 0.5;
        afStack_2960[0] = 0.5;
        afStack_2960[1] = 0.5;
        local_2948 = local_2f68 * 0.5;
        fStack_2944 = fStack_2f64 * 0.5;
        fStack_2940 = fStack_2f60 * 0.5;
        fStack_293c = fStack_2f5c * 0.5;
        fVar175 = fVar175 - local_2948;
        fVar185 = fVar185 - fStack_2944;
        fVar193 = fVar193 - fStack_2940;
        fVar201 = fVar201 - fStack_293c;
        local_2f78 = CONCAT44(fVar185,fVar175);
        uStack_2f70 = CONCAT44(fVar201,fVar193);
        local_2a78 = local_2ef8;
        uStack_2a70 = uStack_2ef0;
        local_2a88 = local_2f78;
        uStack_2a80 = uStack_2f70;
        local_2a68._0_4_ = (float)local_2a68 + fVar175;
        local_2a68._4_4_ = local_2a68._4_4_ + fVar185;
        uStack_2a60._0_4_ = (float)uStack_2a60 + fVar193;
        uStack_2a60._4_4_ = uStack_2a60._4_4_ + fVar201;
        local_2ef8 = CONCAT44(local_2a68._4_4_,(float)local_2a68);
        uStack_2ef0._0_4_ = (float)uStack_2a60;
        uStack_2ef0._4_4_ = uStack_2a60._4_4_;
        local_2e68 = ::_ps_cephes_log_q2;
        local_2e48 = CONCAT44(fStack_2f34,local_2f38);
        uStack_2e40 = CONCAT44(fStack_2f2c,fStack_2f30);
        local_2e58[0] = 0.6933594;
        local_2e58[1] = 0.6933594;
        afStack_2e50[0] = 0.6933594;
        afStack_2e50[1] = 0.6933594;
        local_2a98 = local_2f38 * 0.6933594;
        fStack_2a94 = fStack_2f34 * 0.6933594;
        fStack_2a90 = fStack_2f30 * 0.6933594;
        fStack_2a8c = fStack_2f2c * 0.6933594;
        local_2aa8 = local_2ef8;
        uStack_2aa0 = uStack_2ef0;
        local_2ef8 = CONCAT44(fStack_2a94 + local_2a68._4_4_,local_2a98 + (float)local_2a68);
        uStack_2ef0._0_4_ = fStack_2a90 + (float)uStack_2a60;
        uStack_2ef0._4_4_ = fStack_2a8c + uStack_2a60._4_4_;
        local_678 = CONCAT44(iStack_2f24,local_2f28);
        uStack_670 = CONCAT44(iStack_2f1c,iStack_2f20);
        local_668 = local_2ef8;
        uStack_660 = uStack_2ef0;
        local_5838 = local_2ef8 | local_678;
        uStack_5830 = uStack_2ef0 | uStack_670;
        uStack_2ef0 = uStack_5830;
        local_2ef8 = local_5838;
        local_57ec = 0x3f800000;
        local_5808 = 0x3f800000;
        uStack_5804 = 0x3f800000;
        uStack_5800 = 0x3f800000;
        uStack_57fc = 0x3f800000;
        local_5848 = 0x3f8000003f800000;
        uStack_5840 = 0x3f8000003f800000;
        local_580c = 0x40000000;
        local_5828 = 0x40000000;
        uStack_5824 = 0x40000000;
        uStack_5820 = 0x40000000;
        uStack_581c = 0x40000000;
        local_5858 = 0x4000000040000000;
        uStack_5850 = 0x4000000040000000;
        local_57b8._0_4_ = (float)local_5838;
        local_57b8._4_4_ = (float)(local_5838 >> 0x20);
        uStack_57b0._0_4_ = (float)uStack_5830;
        uStack_57b0._4_4_ = (float)(uStack_5830 >> 0x20);
        local_5798 = (float)local_57b8 * 2.0;
        fStack_5794 = local_57b8._4_4_ * 2.0;
        fStack_5790 = (float)uStack_57b0 * 2.0;
        fStack_578c = uStack_57b0._4_4_ * 2.0;
        local_576c = 0x3f800000;
        local_5788 = 0x3f800000;
        uStack_5784 = 0x3f800000;
        uStack_5780 = 0x3f800000;
        uStack_577c = 0x3f800000;
        local_57a8 = 0x3f8000003f800000;
        uStack_57a0 = 0x3f8000003f800000;
        local_5768 = 0;
        uStack_5760 = 0;
        local_5338 = CONCAT44(fStack_5794,local_5798);
        uStack_5330 = CONCAT44(fStack_578c,fStack_5790);
        local_5328 = 0;
        uStack_5320 = 0;
        local_56a8 = CONCAT44(0.0 - fStack_5794,0.0 - local_5798);
        uStack_56a0._0_4_ = 0.0 - fStack_5790;
        uStack_56a0._4_4_ = 0.0 - fStack_578c;
        local_5488 = 0;
        uStack_5480 = 0;
        local_56e8 = 0x3f8000003f800000;
        uStack_56e0 = 0x3f8000003f800000;
        local_5468 = local_56a8;
        uStack_5460 = uStack_56a0;
        local_5478 = 0x42b0c0a542b0c0a5;
        uStack_5470 = 0x42b0c0a542b0c0a5;
        auVar106._8_8_ = uStack_56a0;
        auVar106._0_8_ = local_56a8;
        auVar105._8_8_ = 0x42b0c0a542b0c0a5;
        auVar105._0_8_ = 0x42b0c0a542b0c0a5;
        auVar177 = minps(auVar106,auVar105);
        local_56a8 = auVar177._0_8_;
        uStack_56a0 = auVar177._8_8_;
        local_5498 = local_56a8;
        uStack_5490 = uStack_56a0;
        local_54a8 = 0xc2b0c0a5c2b0c0a5;
        uStack_54a0 = 0xc2b0c0a5c2b0c0a5;
        auVar104._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar104._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar177 = maxps(auVar177,auVar104);
        local_56a8 = auVar177._0_8_;
        uStack_56a0 = auVar177._8_8_;
        local_5638 = local_56a8;
        uVar161 = local_5638;
        uStack_5630 = uStack_56a0;
        uVar164 = uStack_5630;
        local_5648 = 0x3fb8aa3b3fb8aa3b;
        uStack_5640 = 0x3fb8aa3b3fb8aa3b;
        local_5638._0_4_ = auVar177._0_4_;
        local_5638._4_4_ = auVar177._4_4_;
        uStack_5630._0_4_ = auVar177._8_4_;
        uStack_5630._4_4_ = auVar177._12_4_;
        local_5368 = CONCAT44(local_5638._4_4_ * 1.442695,(float)local_5638 * 1.442695);
        uStack_5360 = CONCAT44(uStack_5630._4_4_ * 1.442695,(float)uStack_5630 * 1.442695);
        local_5378 = 0x3f0000003f000000;
        uStack_5370 = 0x3f0000003f000000;
        fVar175 = (float)local_5638 * 1.442695 + 0.5;
        fVar185 = local_5638._4_4_ * 1.442695 + 0.5;
        fVar193 = (float)uStack_5630 * 1.442695 + 0.5;
        fVar201 = uStack_5630._4_4_ * 1.442695 + 0.5;
        local_52e8 = CONCAT44(fVar185,fVar175);
        uStack_52e0 = CONCAT44(fVar201,fVar193);
        local_5698 = CONCAT44((int)fVar185,(int)fVar175);
        uStack_5690 = CONCAT44((int)fVar201,(int)fVar193);
        local_56c8 = (float)(int)fVar175;
        fStack_56c4 = (float)(int)fVar185;
        fStack_56c0 = (float)(int)fVar193;
        fStack_56bc = (float)(int)fVar201;
        local_52c8 = CONCAT44(fStack_56c4,local_56c8);
        uStack_52c0 = CONCAT44(fStack_56bc,fStack_56c0);
        local_52d8 = CONCAT44(fVar185,fVar175);
        uStack_52d0 = CONCAT44(fVar201,fVar193);
        local_56f8 = CONCAT44(-(uint)(fVar185 < fStack_56c4),-(uint)(fVar175 < local_56c8));
        uStack_56f0 = CONCAT44(-(uint)(fVar201 < fStack_56bc),-(uint)(fVar193 < fStack_56c0));
        local_52a8 = local_56f8;
        uStack_52a0 = uStack_56f0;
        local_52b8 = 0x3f8000003f800000;
        uStack_52b0 = 0x3f8000003f800000;
        local_56f8 = local_56f8 & 0x3f8000003f800000;
        uStack_56f0 = uStack_56f0 & 0x3f8000003f800000;
        local_5348 = CONCAT44(fStack_56c4,local_56c8);
        uStack_5340 = CONCAT44(fStack_56bc,fStack_56c0);
        local_5358._0_4_ = (float)local_56f8;
        local_5358._4_4_ = (float)(local_56f8 >> 0x20);
        uStack_5350._0_4_ = (float)uStack_56f0;
        uStack_5350._4_4_ = (float)(uStack_56f0 >> 0x20);
        local_56c8 = local_56c8 - (float)local_5358;
        fStack_56c4 = fStack_56c4 - local_5358._4_4_;
        fStack_56c0 = fStack_56c0 - (float)uStack_5350;
        fStack_56bc = fStack_56bc - uStack_5350._4_4_;
        local_5280 = &local_56c8;
        local_5228 = ::_ps_cephes_exp_C1;
        local_5620 = &local_56a8;
        local_51e8 = local_56a8;
        uStack_51e0 = uStack_56a0;
        local_5208 = CONCAT44(fStack_56c4,local_56c8);
        uStack_5200 = CONCAT44(fStack_56bc,fStack_56c0);
        local_5218[0] = 0.6933594;
        local_5218[1] = 0.6933594;
        afStack_5210[0] = 0.6933594;
        afStack_5210[1] = 0.6933594;
        local_51f8 = local_56c8 * 0.6933594;
        fStack_51f4 = fStack_56c4 * 0.6933594;
        fStack_51f0 = fStack_56c0 * 0.6933594;
        fStack_51ec = fStack_56bc * 0.6933594;
        local_56a8 = CONCAT44(local_5638._4_4_ - fStack_51f4,(float)local_5638 - local_51f8);
        uStack_56a0._0_4_ = (float)uStack_5630 - fStack_51f0;
        uStack_56a0._4_4_ = uStack_5630._4_4_ - fStack_51ec;
        local_5288 = ::_ps_cephes_exp_C2;
        local_5248 = local_56a8;
        uStack_5240 = uStack_56a0;
        local_5268 = CONCAT44(fStack_56c4,local_56c8);
        uStack_5260 = CONCAT44(fStack_56bc,fStack_56c0);
        local_5278[0] = -0.00021219444;
        local_5278[1] = -0.00021219444;
        afStack_5270[0] = -0.00021219444;
        afStack_5270[1] = -0.00021219444;
        local_5258 = local_56c8 * -0.00021219444;
        fStack_5254 = fStack_56c4 * -0.00021219444;
        fStack_5250 = fStack_56c0 * -0.00021219444;
        fStack_524c = fStack_56bc * -0.00021219444;
        fVar175 = ((float)local_5638 - local_51f8) - local_5258;
        fVar185 = (local_5638._4_4_ - fStack_51f4) - fStack_5254;
        fVar193 = ((float)uStack_5630 - fStack_51f0) - fStack_5250;
        fVar201 = (uStack_5630._4_4_ - fStack_51ec) - fStack_524c;
        local_56a8 = CONCAT44(fVar185,fVar175);
        uStack_56a0._0_4_ = fVar193;
        uStack_56a0._4_4_ = fVar201;
        local_5658 = local_56a8;
        uStack_5650 = uStack_56a0;
        local_5668 = local_56a8;
        uStack_5660 = uStack_56a0;
        local_56b8 = fVar175 * fVar175;
        fStack_56b4 = fVar185 * fVar185;
        fStack_56b0 = fVar193 * fVar193;
        fStack_56ac = fVar201 * fVar201;
        local_5610 = &local_5708;
        local_54e0 = ::_ps_cephes_exp_p1;
        local_54b8 = 0x3950696739506967;
        uStack_54b0 = 0x3950696739506967;
        local_54c8 = local_56a8;
        uStack_54c0 = uStack_56a0;
        local_5448 = fVar175 * 0.00019875691;
        fStack_5444 = fVar185 * 0.00019875691;
        fStack_5440 = fVar193 * 0.00019875691;
        fStack_543c = fVar201 * 0.00019875691;
        local_5458[0] = 0.0013981999;
        local_5458[1] = 0.0013981999;
        afStack_5450[0] = 0.0013981999;
        afStack_5450[1] = 0.0013981999;
        local_5708 = CONCAT44(fStack_5444 + 0.0013981999,local_5448 + 0.0013981999);
        uStack_5700 = CONCAT44(fStack_543c + 0.0013981999,fStack_5440 + 0.0013981999);
        local_5520 = ::_ps_cephes_exp_p2;
        local_54f8 = local_5708;
        uStack_54f0 = uStack_5700;
        local_5508 = local_56a8;
        uStack_5500 = uStack_56a0;
        local_5428 = (local_5448 + 0.0013981999) * fVar175;
        fStack_5424 = (fStack_5444 + 0.0013981999) * fVar185;
        fStack_5420 = (fStack_5440 + 0.0013981999) * fVar193;
        fStack_541c = (fStack_543c + 0.0013981999) * fVar201;
        local_5438[0] = 0.008333452;
        local_5438[1] = 0.008333452;
        afStack_5430[0] = 0.008333452;
        afStack_5430[1] = 0.008333452;
        local_5708 = CONCAT44(fStack_5424 + 0.008333452,local_5428 + 0.008333452);
        uStack_5700 = CONCAT44(fStack_541c + 0.008333452,fStack_5420 + 0.008333452);
        local_5560 = ::_ps_cephes_exp_p3;
        local_5538 = local_5708;
        uStack_5530 = uStack_5700;
        local_5548 = local_56a8;
        uStack_5540 = uStack_56a0;
        local_5408 = (local_5428 + 0.008333452) * fVar175;
        fStack_5404 = (fStack_5424 + 0.008333452) * fVar185;
        fStack_5400 = (fStack_5420 + 0.008333452) * fVar193;
        fStack_53fc = (fStack_541c + 0.008333452) * fVar201;
        local_5418[0] = 0.041665796;
        local_5418[1] = 0.041665796;
        afStack_5410[0] = 0.041665796;
        afStack_5410[1] = 0.041665796;
        local_5708 = CONCAT44(fStack_5404 + 0.041665796,local_5408 + 0.041665796);
        uStack_5700 = CONCAT44(fStack_53fc + 0.041665796,fStack_5400 + 0.041665796);
        local_55a0 = ::_ps_cephes_exp_p4;
        local_5578 = local_5708;
        uStack_5570 = uStack_5700;
        local_5588 = local_56a8;
        uStack_5580 = uStack_56a0;
        local_53e8 = (local_5408 + 0.041665796) * fVar175;
        fStack_53e4 = (fStack_5404 + 0.041665796) * fVar185;
        fStack_53e0 = (fStack_5400 + 0.041665796) * fVar193;
        fStack_53dc = (fStack_53fc + 0.041665796) * fVar201;
        local_53f8[0] = 0.16666666;
        local_53f8[1] = 0.16666666;
        afStack_53f0[0] = 0.16666666;
        afStack_53f0[1] = 0.16666666;
        local_5708 = CONCAT44(fStack_53e4 + 0.16666666,local_53e8 + 0.16666666);
        uStack_5700 = CONCAT44(fStack_53dc + 0.16666666,fStack_53e0 + 0.16666666);
        local_55e0 = ::_ps_cephes_exp_p5;
        local_55b8 = local_5708;
        uStack_55b0 = uStack_5700;
        local_55c8 = local_56a8;
        uStack_55c0 = uStack_56a0;
        local_53c8 = (local_53e8 + 0.16666666) * fVar175;
        fStack_53c4 = (fStack_53e4 + 0.16666666) * fVar185;
        fStack_53c0 = (fStack_53e0 + 0.16666666) * fVar193;
        fStack_53bc = (fStack_53dc + 0.16666666) * fVar201;
        local_53d8[0] = 0.5;
        local_53d8[1] = 0.5;
        afStack_53d0[0] = 0.5;
        afStack_53d0[1] = 0.5;
        local_5708 = CONCAT44(fStack_53c4 + 0.5,local_53c8 + 0.5);
        uStack_5700 = CONCAT44(fStack_53bc + 0.5,fStack_53c0 + 0.5);
        local_5618 = &local_56b8;
        local_55f8 = local_5708;
        uStack_55f0 = uStack_5700;
        local_5608 = CONCAT44(fStack_56b4,local_56b8);
        uStack_5600 = CONCAT44(fStack_56ac,fStack_56b0);
        local_53a8 = (local_53c8 + 0.5) * local_56b8;
        fStack_53a4 = (fStack_53c4 + 0.5) * fStack_56b4;
        fStack_53a0 = (fStack_53c0 + 0.5) * fStack_56b0;
        fStack_539c = (fStack_53bc + 0.5) * fStack_56ac;
        local_53b8 = local_56a8;
        uStack_53b0 = uStack_56a0;
        local_5708 = CONCAT44(fStack_53a4 + fVar185,local_53a8 + fVar175);
        uStack_5700 = CONCAT44(fStack_539c + fVar201,fStack_53a0 + fVar193);
        local_5388 = local_5708;
        uStack_5380 = uStack_5700;
        local_5398 = 0x3f8000003f800000;
        uStack_5390 = 0x3f8000003f800000;
        local_5738 = local_53a8 + fVar175 + 1.0;
        fStack_5734 = fStack_53a4 + fVar185 + 1.0;
        fStack_5730 = fStack_53a0 + fVar193 + 1.0;
        fStack_572c = fStack_539c + fVar201 + 1.0;
        local_5708 = CONCAT44(fStack_5734,local_5738);
        uStack_5700 = CONCAT44(fStack_572c,fStack_5730);
        local_52f8 = CONCAT44(fStack_56c4,local_56c8);
        uStack_52f0 = CONCAT44(fStack_56bc,fStack_56c0);
        local_51c8 = CONCAT44((int)fStack_56c4,(int)local_56c8);
        uStack_51c0 = CONCAT44((int)fStack_56bc,(int)fStack_56c0);
        local_51d8 = 0x7f0000007f;
        uStack_51d0 = 0x7f0000007f;
        iVar203 = (int)local_56c8 + 0x7f;
        fStack_56d4 = (float)((int)fStack_56c4 + 0x7f);
        fStack_56d0 = (float)((int)fStack_56c0 + 0x7f);
        fStack_56cc = (float)((int)fStack_56bc + 0x7f);
        local_51a8 = CONCAT44(fStack_56d4,iVar203);
        uStack_51a0 = CONCAT44(fStack_56cc,fStack_56d0);
        local_51ac = 0x17;
        local_56d8 = (float)(iVar203 * 0x800000);
        local_5718 = CONCAT44(fStack_56d4,local_56d8);
        uStack_5710 = CONCAT44(fStack_56cc,fStack_56d0);
        local_5678 = local_5708;
        uStack_5670 = uStack_5700;
        local_5738 = local_5738 * local_56d8;
        fStack_5734 = fStack_5734 * fStack_56d4;
        fStack_5730 = fStack_5730 * fStack_56d0;
        fStack_572c = fStack_572c * fStack_56cc;
        local_5708 = CONCAT44(fStack_5734,local_5738);
        uStack_5700 = CONCAT44(fStack_572c,fStack_5730);
        local_5758 = local_5708;
        uStack_5750 = uStack_5700;
        local_5738 = local_5738 + 1.0;
        fStack_5734 = fStack_5734 + 1.0;
        fStack_5730 = fStack_5730 + 1.0;
        fStack_572c = fStack_572c + 1.0;
        auVar103._8_8_ = 0x3f8000003f800000;
        auVar103._0_8_ = 0x3f8000003f800000;
        auVar102._4_4_ = fStack_5734;
        auVar102._0_4_ = local_5738;
        auVar102._8_4_ = fStack_5730;
        auVar102._12_4_ = fStack_572c;
        _local_57d8 = divps(auVar103,auVar102);
        local_5308 = (float)local_57d8._0_4_ * 2.0;
        fStack_5304 = (float)local_57d8._4_4_ * 2.0;
        fStack_5300 = fStack_57d0 * 2.0;
        fStack_52fc = fStack_57cc * 2.0;
        local_a4d8 = local_5308 - 1.0;
        fStack_a4d4 = fStack_5304 - 1.0;
        fStack_a4d0 = fStack_5300 - 1.0;
        fStack_a4cc = fStack_52fc - 1.0;
        local_a4c8 = local_c0c8;
        uStack_a4c0 = uStack_c0c0;
        local_bc88._4_4_ = fVar183 * fStack_a4d4;
        local_bc88._0_4_ = fVar173 * local_a4d8;
        uStack_bc80._0_4_ = fVar191 * fStack_a4d0;
        uStack_bc80._4_4_ = fVar199 * fStack_a4cc;
        local_99a8 = local_9a38;
        uStack_99a0 = uStack_9a30;
        local_9958 = uVar5;
        uStack_9950 = uVar6;
        local_98f8 = local_9940;
        local_98f0 = local_9930;
        local_98b8 = local_9940;
        local_98b0 = local_9930;
        local_9878 = local_9940;
        local_9870 = local_9930;
        local_9838 = local_9940;
        local_9830 = local_9930;
        local_97f8 = local_9940;
        local_97f0 = local_9930;
        local_6bd8 = local_9a18;
        uStack_6bd0 = uStack_9a10;
        local_5d10 = local_9940;
        local_5cb0 = local_9940;
        local_5ca0 = local_5d00;
        local_58a8 = local_9a38;
        uStack_58a0 = uStack_9a30;
        local_57e8 = local_5858;
        uStack_57e0 = uStack_5850;
        local_57c8 = local_5858;
        uStack_57c0 = uStack_5850;
        local_57b8 = local_5838;
        uStack_57b0 = uStack_5830;
        local_5748 = local_57a8;
        uStack_5740 = uStack_57a0;
        local_5728 = local_57a8;
        uStack_5720 = uStack_57a0;
        local_5688 = local_5718;
        uStack_5680 = uStack_5710;
        local_5638 = uVar161;
        uStack_5630 = uVar164;
        local_55d8 = local_5620;
        local_55d0 = local_5610;
        local_5598 = local_5620;
        local_5590 = local_5610;
        local_5558 = local_5620;
        local_5550 = local_5610;
        local_5518 = local_5620;
        local_5510 = local_5610;
        local_54d8 = local_5620;
        local_54d0 = local_5610;
        local_5358 = local_56f8;
        uStack_5350 = uStack_56f0;
        local_5318 = local_5848;
        uStack_5310 = uStack_5840;
        local_5290 = local_5620;
        local_5230 = local_5620;
        local_5220 = local_5280;
        local_5198 = local_5718;
        uStack_5190 = uStack_5710;
        local_2e20 = local_2e60;
        local_2de8 = local_2e70;
        local_2de0 = local_2e30;
        local_2da8 = local_2e70;
        local_2da0 = local_2e30;
        local_2d68 = local_2e70;
        local_2d60 = local_2e30;
        local_2d28 = local_2e70;
        local_2d20 = local_2e30;
        local_2ce8 = local_2e70;
        local_2ce0 = local_2e30;
        local_2ca8 = local_2e70;
        local_2ca0 = local_2e30;
        local_2c68 = local_2e70;
        local_2c60 = local_2e30;
        local_2c28 = local_2e70;
        local_2c20 = local_2e30;
        local_2a68 = local_2f58;
        uStack_2a60 = uStack_2f50;
        local_2a28 = uVar204;
        uStack_2a20 = uVar205;
        local_29b8 = local_29f8;
        uStack_29b0 = uStack_29f0;
        local_2980 = local_2e30;
        local_828 = uVar166;
        uStack_820 = uVar167;
        local_408 = local_29f8;
        uStack_400 = uStack_29f0;
        break;
      case 6:
        local_bc68 = 0;
        local_bc08 = *(float *)*in_stack_00000008;
        local_bcd8 = CONCAT44(local_bc08,local_bc08);
        uStack_bcd0 = CONCAT44(local_bc08,local_bc08);
        local_bc78 = 1;
        local_bc28 = *(float *)(*in_stack_00000008 + 4);
        local_bce8 = CONCAT44(local_bc28,local_bc28);
        uStack_bce0 = CONCAT44(local_bc28,local_bc28);
        local_9fd8 = local_c0c8;
        uStack_9fd0 = uStack_c0c0;
        local_9fac = 0x3f800000;
        local_9fc8 = 0x3f800000;
        uStack_9fc4 = 0x3f800000;
        uStack_9fc0 = 0x3f800000;
        uStack_9fbc = 0x3f800000;
        local_a008 = 0x3f8000003f800000;
        uStack_a000 = 0x3f8000003f800000;
        local_9f78 = local_c0c8;
        uStack_9f70 = uStack_c0c0;
        local_9f08 = fVar173 * local_bc08;
        fStack_9f04 = fVar183 * local_bc08;
        fStack_9f00 = fVar191 * local_bc08;
        fStack_9efc = fVar199 * local_bc08;
        local_9ff8._4_4_ = fStack_9f04 + local_bc28;
        local_9ff8._0_4_ = local_9f08 + local_bc28;
        uStack_9ff0._0_4_ = fStack_9f00 + local_bc28;
        uStack_9ff0._4_4_ = fStack_9efc + local_bc28;
        local_9f48 = 0;
        uStack_9f40 = 0;
        local_9f58 = local_9ff8;
        uStack_9f50 = uStack_9ff0;
        local_9f68 = 0;
        uStack_9f60 = 0;
        auVar52._8_8_ = uStack_9ff0;
        auVar52._0_8_ = local_9ff8;
        auVar177 = maxps(auVar52,ZEXT816(0));
        local_9ff8 = auVar177._0_8_;
        uStack_9ff0 = auVar177._8_8_;
        local_9f28 = local_9ff8;
        uStack_9f20 = uStack_9ff0;
        auVar53._8_8_ = 0x3f8000003f800000;
        auVar53._0_8_ = 0x3f8000003f800000;
        _local_9ff8 = minps(auVar177,auVar53);
        local_9f98 = local_9ff8;
        uVar5 = local_9f98;
        uStack_9f90 = uStack_9ff0;
        uVar6 = uStack_9f90;
        local_9fa8 = local_c0c8;
        uStack_9fa0 = uStack_c0c0;
        local_9f98._0_4_ = local_9ff8._0_4_;
        local_9f98._4_4_ = local_9ff8._4_4_;
        uStack_9f90._0_4_ = local_9ff8._8_4_;
        uStack_9f90._4_4_ = local_9ff8._12_4_;
        local_bc88._4_4_ = local_9f98._4_4_ * fVar183;
        local_bc88._0_4_ = (float)local_9f98 * fVar173;
        uStack_bc80._0_4_ = (float)uStack_9f90 * fVar191;
        uStack_bc80._4_4_ = uStack_9f90._4_4_ * fVar199;
        fStack_bc24 = local_bc28;
        fStack_bc20 = local_bc28;
        fStack_bc1c = local_bc28;
        local_bc0c = local_bc28;
        fStack_bc04 = local_bc08;
        fStack_bc00 = local_bc08;
        fStack_bbfc = local_bc08;
        local_bbec = local_bc08;
        local_9fe8 = local_bcd8;
        uStack_9fe0 = uStack_bcd0;
        local_9f98 = uVar5;
        uStack_9f90 = uVar6;
        local_9f88 = local_bcd8;
        uStack_9f80 = uStack_bcd0;
        local_9f38 = local_a008;
        uStack_9f30 = uStack_a000;
        local_9f18 = local_bce8;
        uStack_9f10 = uStack_bce0;
        break;
      default:
        uStack_bc80 = uStack_c0c0;
        local_bc88 = (undefined1  [8])local_c0c8;
      }
      local_be08 = local_c008;
      uStack_be00 = uStack_c000;
      local_bdf8._0_4_ = local_bc88._0_4_;
      local_bdf8._4_4_ = local_bc88._4_4_;
      uStack_bdf0._0_4_ = local_bc88._8_4_;
      uStack_bdf0._4_4_ = local_bc88._12_4_;
      local_c0c8 = CONCAT44(local_bdf8._4_4_ * local_bd48._4_4_,
                            (float)local_bdf8 * (float)local_bd48);
      uStack_c0c0 = CONCAT44(uStack_bdf0._4_4_ * uStack_bd40._4_4_,
                             (float)uStack_bdf0 * (float)uStack_bd40);
      local_b300 = &local_c0c8;
      local_b2dc = 0x3f000000;
      local_b2f8 = 0x3f000000;
      local_b318 = 0x3f0000003f000000;
      uStack_b310 = 0x3f0000003f000000;
      local_3f4 = 0x80000000;
      local_148 = 0x80000000;
      local_b328 = 0x8000000080000000;
      uStack_b320 = 0x8000000080000000;
      local_65e8 = local_c0c8;
      uStack_65e0 = uStack_c0c0;
      local_b338 = local_c0c8 & 0x8000000080000000;
      uStack_b330 = uStack_c0c0 & 0x8000000080000000;
      local_b348 = local_b338 | 0x3f0000003f000000;
      uStack_b340 = uStack_b330 | 0x3f0000003f000000;
      local_9b88 = local_c0c8;
      uStack_9b80 = uStack_c0c0;
      local_9b98._0_4_ = (float)local_b348;
      local_9b98._4_4_ = (float)(local_b348 >> 0x20);
      uStack_9b90._0_4_ = (float)uStack_b340;
      uStack_9b90._4_4_ = (float)(uStack_b340 >> 0x20);
      local_b358 = (float)local_bdf8 * (float)local_bd48 + (float)local_9b98;
      fStack_b354 = local_bdf8._4_4_ * local_bd48._4_4_ + local_9b98._4_4_;
      fStack_b350 = (float)uStack_bdf0 * (float)uStack_bd40 + (float)uStack_9b90;
      fStack_b34c = uStack_bdf0._4_4_ * uStack_bd40._4_4_ + uStack_9b90._4_4_;
      local_6968 = CONCAT44(fStack_b354,local_b358);
      uStack_6960 = CONCAT44(fStack_b34c,fStack_b350);
      local_b368 = (int)local_b358;
      iStack_b364 = (int)fStack_b354;
      iStack_b360 = (int)fStack_b350;
      iStack_b35c = (int)fStack_b34c;
      local_3c8 = CONCAT44(iStack_b364,local_b368);
      uStack_3c0 = CONCAT44(iStack_b35c,iStack_b360);
      auVar147._8_8_ = uStack_3c0;
      auVar147._0_8_ = local_3c8;
      auVar146._8_8_ = uStack_3c0;
      auVar146._0_8_ = local_3c8;
      auVar177 = packssdw(auVar147,auVar146);
      local_b378 = auVar177._0_8_;
      uVar5 = local_b378;
      uStack_b370 = auVar177._8_8_;
      uVar6 = uStack_b370;
      local_2e2 = 0x7f;
      local_88 = 0x7f;
      local_348 = 0x7f007f007f007f;
      uStack_340 = 0x7f007f007f007f;
      local_338._0_2_ = auVar177._0_2_;
      local_338._2_2_ = auVar177._2_2_;
      local_338._4_2_ = auVar177._4_2_;
      local_338._6_2_ = auVar177._6_2_;
      uStack_330._0_2_ = auVar177._8_2_;
      uStack_330._2_2_ = auVar177._10_2_;
      uStack_330._4_2_ = auVar177._12_2_;
      uStack_330._6_2_ = auVar177._14_2_;
      uVar169 = (ushort)(0x7f < (short)local_338) * 0x7f |
                (ushort)(0x7f >= (short)local_338) * (short)local_338;
      uVar178 = (ushort)(0x7f < local_338._2_2_) * 0x7f |
                (ushort)(0x7f >= local_338._2_2_) * local_338._2_2_;
      uVar179 = (ushort)(0x7f < local_338._4_2_) * 0x7f |
                (ushort)(0x7f >= local_338._4_2_) * local_338._4_2_;
      uVar186 = (ushort)(0x7f < local_338._6_2_) * 0x7f |
                (ushort)(0x7f >= local_338._6_2_) * local_338._6_2_;
      uVar187 = (ushort)(0x7f < (short)uStack_330) * 0x7f |
                (ushort)(0x7f >= (short)uStack_330) * (short)uStack_330;
      uVar194 = (ushort)(0x7f < uStack_330._2_2_) * 0x7f |
                (ushort)(0x7f >= uStack_330._2_2_) * uStack_330._2_2_;
      uVar195 = (ushort)(0x7f < uStack_330._4_2_) * 0x7f |
                (ushort)(0x7f >= uStack_330._4_2_) * uStack_330._4_2_;
      uVar202 = (ushort)(0x7f < uStack_330._6_2_) * 0x7f |
                (ushort)(0x7f >= uStack_330._6_2_) * uStack_330._6_2_;
      local_b378._0_4_ = CONCAT22(uVar178,uVar169);
      local_b378._0_6_ = CONCAT24(uVar179,(undefined4)local_b378);
      local_b378 = CONCAT26(uVar186,(undefined6)local_b378);
      uStack_b370._0_2_ = uVar187;
      uStack_b370._2_2_ = uVar194;
      uStack_b370._4_2_ = uVar195;
      uStack_b370._6_2_ = uVar202;
      local_2a8 = local_b378;
      uStack_2a0 = uStack_b370;
      local_2e4 = 0xff81;
      local_68 = 0xff81;
      local_2b8 = 0xff81ff81ff81ff81;
      uStack_2b0 = 0xff81ff81ff81ff81;
      local_b378._0_4_ =
           CONCAT22((ushort)((short)uVar178 < -0x7f) * -0x7f | ((short)uVar178 >= -0x7f) * uVar178,
                    (ushort)((short)uVar169 < -0x7f) * -0x7f | ((short)uVar169 >= -0x7f) * uVar169);
      local_b378._0_6_ =
           CONCAT24((ushort)((short)uVar179 < -0x7f) * -0x7f | ((short)uVar179 >= -0x7f) * uVar179,
                    (undefined4)local_b378);
      local_b378 = CONCAT26((ushort)((short)uVar186 < -0x7f) * -0x7f |
                            ((short)uVar186 >= -0x7f) * uVar186,(undefined6)local_b378);
      uStack_b370._0_2_ =
           (ushort)((short)uVar187 < -0x7f) * -0x7f | ((short)uVar187 >= -0x7f) * uVar187;
      uStack_b370._2_2_ =
           (ushort)((short)uVar194 < -0x7f) * -0x7f | ((short)uVar194 >= -0x7f) * uVar194;
      uStack_b370._4_2_ =
           (ushort)((short)uVar195 < -0x7f) * -0x7f | ((short)uVar195 >= -0x7f) * uVar195;
      uStack_b370._6_2_ =
           (ushort)((short)uVar202 < -0x7f) * -0x7f | ((short)uVar202 >= -0x7f) * uVar202;
      local_238 = local_b378;
      uStack_230 = uStack_b370;
      auVar155._8_8_ = uStack_b370;
      auVar155._0_8_ = local_b378;
      auVar154._8_8_ = uStack_b370;
      auVar154._0_8_ = local_b378;
      local_b388 = packsswb(auVar155,auVar154);
      local_1c8 = local_b388._0_8_;
      uStack_1c0 = local_b388._8_8_;
      *(char *)local_bf98 = local_b388[0];
      *(char *)((long)local_bf98 + 1) = local_b388[1];
      *(char *)((long)local_bf98 + 2) = local_b388[2];
      *(char *)((long)local_bf98 + 3) = local_b388[3];
      local_bf90 = local_bf90 + 4;
      local_bf98 = (undefined8 *)((long)local_bf98 + 4);
      local_be98 = uVar3;
      uStack_be90 = uVar4;
      local_bdf8 = local_bc88;
      uStack_bdf0 = uStack_bc80;
      uStack_b2f4 = local_b2f8;
      uStack_b2f0 = local_b2f8;
      uStack_b2ec = local_b2f8;
      local_9b98 = local_b348;
      uStack_9b90 = uStack_b340;
      local_65f8 = local_b328;
      uStack_65f0 = uStack_b320;
      local_5888 = local_b328;
      uStack_5880 = uStack_b320;
      local_618 = local_b338;
      uStack_610 = uStack_b330;
      local_608 = local_b318;
      uStack_600 = uStack_b310;
      local_3b8 = local_3c8;
      uStack_3b0 = uStack_3c0;
      local_338 = uVar5;
      uStack_330 = uVar6;
      local_228 = local_238;
      uStack_220 = uStack_230;
      local_158 = local_b328;
      uStack_150 = uStack_b320;
      local_144 = local_148;
      local_140 = local_148;
      local_13c = local_148;
      local_98 = local_348;
      uStack_90 = uStack_340;
      local_86 = local_88;
      local_84 = local_88;
      local_82 = local_88;
      local_80 = local_88;
      local_7e = local_88;
      local_7c = local_88;
      local_7a = local_88;
      local_78 = local_2b8;
      uStack_70 = uStack_2b0;
      local_66 = local_68;
      local_64 = local_68;
      local_62 = local_68;
      local_60 = local_68;
      local_5e = local_68;
      local_5c = local_68;
      local_5a = local_68;
    }
    for (; uStack_9c10 = uVar2, local_9c18 = uVar1, local_c08c < local_bfc4;
        local_c08c = local_c08c + 1) {
      local_c22c = (float)*local_bf90 * local_bfc8 + local_c064;
      local_b208 = local_bfb4;
      local_b204[0] = local_c22c;
      switch(local_bfb4) {
      case 1:
        if (local_c22c <= 0.0) {
          local_b204[0] = 0.0;
        }
        break;
      case 2:
        local_b1c0 = 0;
        local_b214 = *(float *)*in_stack_00000008;
        if (local_c22c <= 0.0) {
          local_c22c = local_c22c * local_b214;
        }
        local_b204[0] = local_c22c;
        break;
      case 3:
        local_b1d0 = 0;
        local_b218 = *(float *)*in_stack_00000008;
        local_b1e0 = 1;
        local_b21c = *(float *)(*in_stack_00000008 + 4);
        if (local_c22c < local_b218) {
          local_b204[0] = local_b218;
        }
        if (local_b21c < local_b204[0]) {
          local_b204[0] = local_b21c;
        }
        break;
      case 4:
        local_b220 = 88.37626;
        pfVar168 = std::min<float>(local_b204,&local_b220);
        local_b204[0] = *pfVar168;
        local_b224 = -88.37626;
        pfVar168 = std::max<float>(local_b204,&local_b224);
        local_b204[0] = *pfVar168;
        fVar173 = expf(-local_b204[0]);
        local_b204[0] = 1.0 / (fVar173 + 1.0);
        break;
      case 5:
        fVar173 = expf(local_c22c);
        fVar173 = logf(fVar173 + 1.0);
        local_b204[0] = tanhf(fVar173);
        local_b204[0] = local_c22c * local_b204[0];
        break;
      case 6:
        local_b1f0 = 0;
        local_b228 = *(float *)*in_stack_00000008;
        local_b204[1] = 1.4013e-45;
        local_b204[2] = 0.0;
        local_b22c = *(float *)(*in_stack_00000008 + 4);
        local_b230 = -local_b22c / local_b228;
        local_b234 = 1.0 / local_b228 + local_b230;
        if (local_b230 <= local_c22c) {
          if (local_c22c <= local_b234) {
            local_b204[0] = local_c22c * (local_c22c * local_b228 + local_b22c);
          }
        }
        else {
          local_b204[0] = 0.0;
        }
      }
      local_b124 = local_b204[0] * local_bfec;
      dVar176 = std::round((double)(ulong)(uint)local_b124);
      local_b128 = (int)SUB84(dVar176,0);
      if (local_b128 < 0x80) {
        if (local_b128 < -0x7f) {
          local_b11d = 0x81;
        }
        else {
          local_b11d = (undefined1)local_b128;
        }
      }
      else {
        local_b11d = 0x7f;
      }
      *(undefined1 *)local_bf98 = local_b11d;
      local_bf90 = local_bf90 + 1;
      local_bf98 = (undefined8 *)((long)local_bf98 + 1);
      uVar1 = local_9c18;
      uVar2 = uStack_9c10;
    }
  }
  return;
}

Assistant:

static void requantize(const int* intptr, signed char* ptr, const Mat& scale_in_data, const Mat& bias_data, const Mat& scale_out_data, int activation_type, const Mat& activation_params, int elemcount, int elempack)
{
    const int scale_in_data_size = scale_in_data.w;
    const int bias_data_size = bias_data.w;
    const int scale_out_data_size = scale_out_data.w;
    const int size = elemcount * elempack;

    // NCNN_LOGE("requantize %d %d %d   %d %d", scale_in_data_size, bias_data_size, scale_out_data_size, elemcount, elempack);

    float scale_in = scale_in_data[0];
#if __SSE2__
    __m128 _scale_in0 = _mm_set1_ps(scale_in);
#if __AVX__
    __m256 _scale_in_avx = _mm256_set1_ps(scale_in);
#if __AVX512F__
    __m512 _scale_in_avx512 = _mm512_set1_ps(scale_in);
#endif // __AVX512F__
#else  // __AVX__
    __m128 _scale_in1 = _scale_in0;
#endif // __AVX__
    if (scale_in_data_size > 1)
    {
#if __AVX512F__
        if (elempack == 16)
        {
            _scale_in_avx512 = _mm512_loadu_ps((const float*)scale_in_data);
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
#if __AVX__
            _scale_in_avx = _mm256_loadu_ps((const float*)scale_in_data);
#if __AVX512F__
            _scale_in_avx512 = combine8x2_ps(_scale_in_avx, _scale_in_avx);
#endif // __AVX512F__
#else  // __AVX__
            _scale_in0 = _mm_loadu_ps((const float*)scale_in_data);
            _scale_in1 = _mm_loadu_ps((const float*)scale_in_data + 4);
#endif // __AVX__
        }
    }
#endif // __SSE2__

    float scale_out = scale_out_data[0];
#if __SSE2__
    __m128 _scale_out0 = _mm_set1_ps(scale_out);
#if __AVX__
    __m256 _scale_out_avx = _mm256_set1_ps(scale_out);
#if __AVX512F__
    __m512 _scale_out_avx512 = _mm512_set1_ps(scale_out);
#endif // __AVX512F__
#else  // __AVX__
    __m128 _scale_out1 = _scale_out0;
#endif // __AVX__
    if (scale_out_data_size > 1)
    {
#if __AVX512F__
        if (elempack == 16)
        {
            _scale_out_avx512 = _mm512_loadu_ps((const float*)scale_out_data);
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
#if __AVX__
            _scale_out_avx = _mm256_loadu_ps((const float*)scale_out_data);
#if __AVX512F__
            _scale_out_avx512 = combine8x2_ps(_scale_out_avx, _scale_out_avx);
#endif // __AVX512F__
#else  // __AVX__
            _scale_out0 = _mm_loadu_ps((const float*)scale_out_data);
            _scale_out1 = _mm_loadu_ps((const float*)scale_out_data + 4);
#endif // __AVX__
        }
    }
#endif // __SSE2__

    if (bias_data_size == 0)
    {
        int i = 0;
#if __SSE2__
#if __AVX__
        for (; i + 15 < size; i += 16)
        {
#if __AVX512F__
            __m512 _v = _mm512_cvtepi32_ps(_mm512_loadu_si512((const __m512i*)intptr));
            _v = _mm512_mul_ps(_v, _scale_in_avx512);
            _v = activation_avx512(_v, activation_type, activation_params);
            _v = _mm512_mul_ps(_v, _scale_out_avx512);
            _mm_storeu_si128((__m128i*)ptr, float2int8_avx512(_v));
#else  // __AVX512F__
            __m256 _v0 = _mm256_cvtepi32_ps(_mm256_loadu_si256((const __m256i*)intptr));
            __m256 _v1 = _mm256_cvtepi32_ps(_mm256_loadu_si256((const __m256i*)(intptr + 8)));
            _v0 = _mm256_mul_ps(_v0, _scale_in_avx);
            _v1 = _mm256_mul_ps(_v1, _scale_in_avx);
            _v0 = activation_avx(_v0, activation_type, activation_params);
            _v1 = activation_avx(_v1, activation_type, activation_params);
            _v0 = _mm256_mul_ps(_v0, _scale_out_avx);
            _v1 = _mm256_mul_ps(_v1, _scale_out_avx);
            _mm_storeu_si128((__m128i*)ptr, float2int8_avx(_v0, _v1));
#endif // __AVX512F__
            intptr += 16;
            ptr += 16;
        }
#endif // __AVX__
        for (; i + 7 < size; i += 8)
        {
#if __AVX__
            __m256 _v = _mm256_cvtepi32_ps(_mm256_loadu_si256((const __m256i*)intptr));
            _v = _mm256_mul_ps(_v, _scale_in_avx);
            _v = activation_avx(_v, activation_type, activation_params);
            _v = _mm256_mul_ps(_v, _scale_out_avx);
            *(int64_t*)ptr = float2int8_avx(_v);
#else  // __AVX__
            __m128 _v0 = _mm_cvtepi32_ps(_mm_loadu_si128((const __m128i*)intptr));
            __m128 _v1 = _mm_cvtepi32_ps(_mm_loadu_si128((const __m128i*)(intptr + 4)));
            _v0 = _mm_mul_ps(_v0, _scale_in0);
            _v1 = _mm_mul_ps(_v1, _scale_in1);
            _v0 = activation_sse(_v0, activation_type, activation_params);
            _v1 = activation_sse(_v1, activation_type, activation_params);
            _v0 = _mm_mul_ps(_v0, _scale_out0);
            _v1 = _mm_mul_ps(_v1, _scale_out1);
            *(int64_t*)ptr = float2int8_sse(_v0, _v1);
#endif // __AVX__
            intptr += 8;
            ptr += 8;
        }
        for (; i + 3 < size; i += 4)
        {
            __m128 _v = _mm_cvtepi32_ps(_mm_loadu_si128((const __m128i*)intptr));
            _v = _mm_mul_ps(_v, _scale_in0);
            _v = activation_sse(_v, activation_type, activation_params);
            _v = _mm_mul_ps(_v, _scale_out0);
            int32_t v = float2int8_sse(_v);
            ptr[0] = (v >> 0) & 0xff;
            ptr[1] = (v >> 8) & 0xff;
            ptr[2] = (v >> 16) & 0xff;
            ptr[3] = (v >> 24) & 0xff;
            intptr += 4;
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            float v = *intptr * scale_in;
            v = activation_ss(v, activation_type, activation_params);
            *ptr = float2int8(v * scale_out);
            intptr++;
            ptr++;
        }
    }
    else
    {
        float bias = bias_data[0];
#if __SSE2__
        __m128 _bias0 = _mm_set1_ps(bias);
#if __AVX__
        __m256 _bias_avx = _mm256_set1_ps(bias);
#if __AVX512F__
        __m512 _bias_avx512 = _mm512_set1_ps(bias);
#endif // __AVX512F__
#else  // __AVX__
        __m128 _bias1 = _bias0;
#endif // __AVX__
        if (bias_data_size > 1)
        {
#if __AVX512F__
            if (elempack == 16)
            {
                _bias_avx512 = _mm512_loadu_ps((const float*)bias_data);
            }
#endif // __AVX512F__
            if (elempack == 8)
            {
#if __AVX__
                _bias_avx = _mm256_loadu_ps((const float*)bias_data);
#if __AVX512F__
                _bias_avx512 = combine8x2_ps(_bias_avx, _bias_avx);
#endif // __AVX512F__
#else  // __AVX__
                _bias0 = _mm_loadu_ps((const float*)bias_data);
                _bias1 = _mm_loadu_ps((const float*)bias_data + 4);
#endif // __AVX__
            }
        }
#endif // __SSE2__

        int i = 0;
#if __SSE2__
#if __AVX__
        for (; i + 15 < size; i += 16)
        {
#if __AVX512F__
            __m512 _v = _mm512_cvtepi32_ps(_mm512_loadu_si512((const __m512i*)intptr));
            _v = _mm512_fmadd_ps(_v, _scale_in_avx512, _bias_avx512);
            _v = activation_avx512(_v, activation_type, activation_params);
            _v = _mm512_mul_ps(_v, _scale_out_avx512);
            _mm_storeu_si128((__m128i*)ptr, float2int8_avx512(_v));
#else  // __AVX512F__
            __m256 _v0 = _mm256_cvtepi32_ps(_mm256_loadu_si256((const __m256i*)intptr));
            __m256 _v1 = _mm256_cvtepi32_ps(_mm256_loadu_si256((const __m256i*)(intptr + 8)));
            _v0 = _mm256_comp_fmadd_ps(_v0, _scale_in_avx, _bias_avx);
            _v1 = _mm256_comp_fmadd_ps(_v1, _scale_in_avx, _bias_avx);
            _v0 = activation_avx(_v0, activation_type, activation_params);
            _v1 = activation_avx(_v1, activation_type, activation_params);
            _v0 = _mm256_mul_ps(_v0, _scale_out_avx);
            _v1 = _mm256_mul_ps(_v1, _scale_out_avx);
            _mm_storeu_si128((__m128i*)ptr, float2int8_avx(_v0, _v1));
#endif // __AVX512F__
            intptr += 16;
            ptr += 16;
        }
#endif // __AVX__
        for (; i + 7 < size; i += 8)
        {
#if __AVX__
            __m256 _v = _mm256_cvtepi32_ps(_mm256_loadu_si256((const __m256i*)intptr));
            _v = _mm256_comp_fmadd_ps(_v, _scale_in_avx, _bias_avx);
            _v = activation_avx(_v, activation_type, activation_params);
            _v = _mm256_mul_ps(_v, _scale_out_avx);
            *(int64_t*)ptr = float2int8_avx(_v);
#else  // __AVX__
            __m128 _v0 = _mm_cvtepi32_ps(_mm_loadu_si128((const __m128i*)intptr));
            __m128 _v1 = _mm_cvtepi32_ps(_mm_loadu_si128((const __m128i*)(intptr + 4)));
            _v0 = _mm_comp_fmadd_ps(_v0, _scale_in0, _bias0);
            _v1 = _mm_comp_fmadd_ps(_v1, _scale_in1, _bias1);
            _v0 = activation_sse(_v0, activation_type, activation_params);
            _v1 = activation_sse(_v1, activation_type, activation_params);
            _v0 = _mm_mul_ps(_v0, _scale_out0);
            _v1 = _mm_mul_ps(_v1, _scale_out1);
            *(int64_t*)ptr = float2int8_sse(_v0, _v1);
#endif // __AVX__
            intptr += 8;
            ptr += 8;
        }
        for (; i + 3 < size; i += 4)
        {
            __m128 _v = _mm_cvtepi32_ps(_mm_loadu_si128((const __m128i*)intptr));
            _v = _mm_comp_fmadd_ps(_v, _scale_in0, _bias0);
            _v = activation_sse(_v, activation_type, activation_params);
            _v = _mm_mul_ps(_v, _scale_out0);
            int32_t v = float2int8_sse(_v);
            ptr[0] = (v >> 0) & 0xff;
            ptr[1] = (v >> 8) & 0xff;
            ptr[2] = (v >> 16) & 0xff;
            ptr[3] = (v >> 24) & 0xff;
            intptr += 4;
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            float v = *intptr * scale_in + bias;
            v = activation_ss(v, activation_type, activation_params);
            *ptr = float2int8(v * scale_out);
            intptr++;
            ptr++;
        }
    }
}